

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86_avx512::forward
          (Convolution_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  undefined4 uVar6;
  Allocator *pAVar4;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  uint dilation_w;
  uint dilation_h;
  uint stride_h;
  size_t sVar18;
  Layer *pLVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  bool bVar253;
  uint uVar254;
  uint uVar255;
  bool bVar256;
  byte bVar257;
  bool bVar258;
  byte bVar259;
  int q;
  int iVar260;
  int iVar261;
  uint uVar262;
  int iVar263;
  int iVar264;
  int iVar265;
  undefined1 (*pauVar266) [64];
  int *piVar267;
  ulong uVar268;
  undefined1 (*pauVar269) [32];
  undefined1 (*pauVar270) [16];
  long lVar271;
  long lVar272;
  long lVar273;
  long lVar274;
  long lVar275;
  long lVar276;
  long lVar277;
  ulong uVar278;
  long lVar279;
  long lVar280;
  ulong uVar281;
  long lVar282;
  undefined8 *puVar283;
  long lVar284;
  long lVar285;
  long lVar286;
  long lVar287;
  float *pfVar288;
  uint uVar289;
  uint uVar290;
  uint uVar291;
  void *pvVar292;
  undefined4 *puVar293;
  undefined4 *puVar294;
  long lVar295;
  long lVar296;
  int iVar297;
  undefined1 (*pauVar298) [32];
  long lVar299;
  long lVar300;
  long lVar301;
  undefined1 (*pauVar302) [64];
  long lVar303;
  void *pvVar304;
  void *pvVar305;
  undefined1 (*pauVar306) [32];
  undefined1 (*pauVar307) [16];
  undefined1 (*pauVar308) [16];
  undefined8 *puVar309;
  undefined8 *puVar310;
  float *pfVar311;
  void *pvVar312;
  void *pvVar313;
  undefined1 __ptr [8];
  uint uVar314;
  int iVar315;
  void *pvVar316;
  ulong uVar317;
  ulong uVar318;
  int m_3;
  int iVar319;
  int iVar320;
  ulong uVar321;
  undefined1 (*pauVar322) [32];
  undefined1 (*pauVar323) [32];
  int q_2;
  ulong uVar324;
  undefined1 (*pauVar325) [32];
  uint *puVar326;
  undefined1 (*pauVar327) [16];
  int j;
  int iVar328;
  undefined1 (*pauVar329) [32];
  int m_13;
  uint uVar330;
  uint uVar331;
  undefined1 (*pauVar332) [32];
  undefined1 (*pauVar333) [16];
  float *pfVar334;
  undefined4 *puVar335;
  int m_5;
  uint uVar336;
  int iVar337;
  uint uVar338;
  uint uVar339;
  uint *puVar340;
  undefined4 *puVar341;
  int k;
  int iVar342;
  int iVar343;
  void *pvVar344;
  void *pvVar345;
  uint *puVar346;
  int m_2;
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  Option *opt_00;
  void *pvVar347;
  void *pvVar348;
  bool bVar349;
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [64];
  undefined1 auVar395 [64];
  undefined1 auVar396 [64];
  undefined1 auVar397 [64];
  undefined1 auVar398 [64];
  undefined1 auVar399 [64];
  undefined1 auVar400 [64];
  undefined1 auVar401 [64];
  undefined1 auVar402 [64];
  undefined1 auVar403 [64];
  undefined1 auVar404 [64];
  undefined1 auVar405 [64];
  undefined1 auVar406 [64];
  undefined4 uVar407;
  undefined8 uVar408;
  undefined1 auVar409 [16];
  undefined8 uVar418;
  undefined8 uVar419;
  undefined1 auVar410 [32];
  undefined1 auVar411 [32];
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  undefined1 auVar414 [32];
  undefined1 auVar415 [32];
  undefined8 uVar420;
  undefined1 auVar416 [32];
  undefined1 auVar417 [32];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [32];
  undefined1 auVar430 [32];
  undefined1 auVar431 [32];
  undefined1 auVar432 [32];
  undefined1 auVar433 [32];
  undefined1 auVar434 [32];
  undefined1 auVar435 [32];
  undefined1 auVar436 [32];
  undefined1 auVar438 [32];
  undefined1 auVar439 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [32];
  undefined1 auVar454 [32];
  undefined1 auVar455 [32];
  undefined1 auVar456 [32];
  undefined1 auVar457 [32];
  undefined1 auVar458 [32];
  undefined1 auVar459 [32];
  undefined1 auVar460 [32];
  undefined1 auVar461 [32];
  undefined1 auVar462 [32];
  undefined1 auVar463 [32];
  undefined1 auVar464 [32];
  undefined1 auVar465 [32];
  undefined1 auVar466 [32];
  undefined1 auVar467 [32];
  undefined1 auVar468 [32];
  undefined1 auVar469 [32];
  undefined1 auVar470 [32];
  undefined1 auVar472 [32];
  undefined1 auVar446 [16];
  undefined1 auVar473 [32];
  undefined1 auVar474 [32];
  undefined1 auVar476 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [32];
  undefined1 auVar486 [32];
  undefined1 auVar487 [32];
  undefined1 auVar488 [32];
  undefined1 auVar489 [32];
  undefined1 auVar490 [32];
  undefined1 auVar491 [32];
  undefined1 auVar492 [32];
  undefined1 auVar493 [32];
  undefined1 auVar494 [32];
  undefined1 auVar495 [32];
  undefined1 auVar496 [32];
  undefined1 auVar497 [32];
  undefined1 auVar498 [32];
  undefined1 auVar499 [32];
  undefined1 auVar500 [32];
  undefined1 auVar501 [32];
  undefined1 auVar502 [32];
  undefined1 auVar477 [16];
  undefined1 auVar503 [32];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [32];
  undefined1 auVar513 [32];
  undefined1 auVar514 [32];
  undefined1 auVar515 [32];
  undefined1 auVar516 [32];
  undefined1 auVar517 [32];
  undefined1 auVar518 [32];
  undefined1 auVar519 [32];
  undefined1 auVar520 [32];
  undefined1 auVar521 [32];
  undefined1 auVar522 [32];
  undefined1 auVar523 [32];
  undefined1 auVar524 [32];
  undefined1 auVar525 [32];
  undefined1 auVar526 [32];
  undefined1 auVar527 [32];
  undefined1 auVar528 [32];
  undefined1 auVar529 [32];
  undefined1 auVar530 [32];
  undefined1 auVar531 [32];
  undefined1 auVar532 [32];
  float fVar534;
  float fVar554;
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  float fVar552;
  float fVar553;
  float fVar555;
  float fVar556;
  float fVar557;
  undefined1 auVar540 [32];
  undefined1 auVar541 [32];
  undefined1 auVar542 [32];
  undefined1 auVar543 [32];
  undefined1 auVar544 [32];
  undefined1 auVar545 [32];
  undefined1 auVar546 [32];
  undefined1 auVar547 [32];
  undefined1 auVar548 [32];
  undefined1 auVar549 [32];
  undefined1 auVar550 [32];
  float fVar558;
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [32];
  undefined1 auVar567 [32];
  undefined1 auVar568 [32];
  undefined1 auVar569 [32];
  undefined1 auVar570 [32];
  undefined1 auVar571 [32];
  undefined1 auVar572 [32];
  undefined1 auVar573 [32];
  undefined1 auVar574 [32];
  undefined1 auVar575 [32];
  undefined1 auVar576 [32];
  undefined1 auVar577 [32];
  undefined1 auVar578 [32];
  undefined1 auVar579 [32];
  undefined1 auVar580 [32];
  undefined1 auVar581 [32];
  undefined1 auVar582 [32];
  undefined1 auVar583 [32];
  undefined1 auVar561 [16];
  undefined1 auVar584 [32];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [32];
  undefined1 auVar591 [32];
  undefined1 auVar592 [32];
  undefined1 auVar593 [32];
  undefined1 auVar594 [32];
  undefined1 auVar595 [32];
  undefined1 auVar596 [32];
  undefined1 auVar597 [32];
  undefined1 auVar598 [32];
  undefined1 auVar599 [32];
  undefined1 auVar600 [32];
  undefined1 auVar601 [32];
  undefined1 auVar602 [32];
  undefined1 auVar603 [32];
  undefined1 auVar604 [32];
  undefined1 auVar605 [32];
  undefined1 auVar606 [32];
  undefined1 auVar607 [32];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [32];
  undefined1 auVar611 [32];
  undefined1 auVar612 [32];
  undefined1 auVar613 [32];
  undefined1 auVar614 [32];
  undefined1 auVar615 [32];
  undefined1 auVar616 [32];
  undefined1 auVar617 [32];
  undefined1 auVar618 [32];
  undefined1 auVar619 [32];
  undefined1 auVar620 [32];
  undefined1 auVar621 [32];
  undefined1 auVar622 [16];
  undefined1 auVar623 [16];
  undefined1 auVar624 [16];
  undefined1 auVar625 [16];
  undefined1 auVar626 [16];
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar629 [16];
  undefined1 auVar630 [16];
  undefined1 auVar631 [16];
  undefined1 auVar632 [16];
  undefined1 auVar633 [16];
  undefined1 auVar634 [16];
  undefined1 auVar635 [32];
  undefined1 auVar636 [32];
  undefined1 auVar637 [32];
  undefined1 auVar638 [32];
  undefined1 auVar639 [32];
  undefined1 auVar640 [32];
  undefined1 auVar641 [32];
  undefined1 auVar642 [32];
  undefined1 auVar643 [32];
  undefined1 auVar644 [32];
  undefined1 auVar645 [32];
  undefined1 auVar646 [32];
  undefined1 auVar647 [32];
  undefined1 auVar648 [32];
  undefined1 auVar649 [16];
  undefined1 auVar650 [16];
  undefined1 auVar651 [16];
  undefined1 auVar652 [16];
  undefined1 auVar653 [16];
  undefined1 auVar654 [16];
  undefined1 auVar655 [16];
  undefined1 auVar656 [16];
  undefined1 auVar657 [16];
  undefined1 auVar658 [16];
  undefined1 auVar659 [32];
  undefined1 auVar660 [32];
  undefined1 auVar661 [32];
  undefined1 auVar662 [32];
  undefined1 auVar663 [32];
  undefined1 auVar664 [32];
  undefined1 auVar665 [32];
  undefined1 auVar666 [32];
  undefined1 auVar667 [32];
  undefined1 auVar668 [32];
  undefined1 auVar669 [32];
  undefined1 auVar670 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar671 [16];
  undefined1 auVar672 [16];
  undefined1 auVar673 [16];
  undefined1 auVar674 [16];
  undefined1 auVar675 [16];
  undefined1 auVar676 [16];
  undefined1 auVar677 [16];
  undefined1 auVar678 [16];
  undefined1 auVar679 [16];
  undefined1 auVar680 [16];
  undefined1 auVar681 [16];
  undefined1 auVar682 [32];
  undefined1 auVar683 [32];
  undefined1 auVar684 [32];
  undefined1 auVar685 [32];
  undefined1 auVar686 [32];
  undefined1 auVar687 [32];
  undefined1 auVar688 [32];
  undefined1 auVar689 [32];
  undefined1 auVar690 [32];
  undefined1 auVar691 [32];
  undefined1 auVar692 [32];
  undefined1 auVar693 [32];
  undefined1 auVar694 [32];
  undefined1 auVar695 [32];
  undefined1 in_ZMM11 [64];
  undefined1 auVar696 [16];
  undefined1 auVar697 [16];
  undefined1 auVar698 [16];
  undefined1 auVar699 [16];
  undefined1 auVar700 [16];
  undefined1 auVar701 [16];
  undefined1 auVar702 [16];
  undefined1 auVar703 [16];
  undefined1 auVar704 [16];
  undefined1 auVar705 [16];
  undefined1 auVar706 [32];
  undefined1 auVar707 [32];
  undefined1 auVar708 [32];
  undefined1 auVar709 [32];
  undefined1 auVar710 [32];
  undefined1 auVar711 [32];
  undefined1 auVar712 [32];
  undefined1 auVar713 [32];
  undefined1 auVar714 [32];
  undefined1 auVar715 [32];
  undefined1 auVar716 [32];
  undefined1 auVar717 [32];
  undefined1 auVar718 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar719 [16];
  undefined1 auVar720 [16];
  undefined1 auVar721 [16];
  undefined1 auVar722 [16];
  undefined1 auVar723 [16];
  undefined1 auVar724 [16];
  undefined1 auVar725 [16];
  undefined1 auVar726 [32];
  undefined1 auVar727 [32];
  undefined1 auVar728 [32];
  undefined1 auVar729 [32];
  undefined1 auVar730 [32];
  undefined1 auVar731 [32];
  undefined1 auVar732 [32];
  undefined1 auVar733 [32];
  undefined1 auVar734 [32];
  undefined1 auVar735 [32];
  undefined1 auVar736 [32];
  undefined1 auVar737 [16];
  undefined1 auVar738 [16];
  undefined1 auVar739 [16];
  undefined1 auVar740 [16];
  undefined1 auVar741 [16];
  undefined1 auVar742 [16];
  undefined1 auVar743 [32];
  undefined1 auVar744 [32];
  undefined1 auVar745 [32];
  undefined1 auVar746 [32];
  undefined1 auVar747 [32];
  undefined1 auVar748 [32];
  undefined1 auVar749 [32];
  undefined1 auVar750 [32];
  undefined1 auVar751 [32];
  undefined1 auVar752 [16];
  undefined1 auVar753 [16];
  undefined1 auVar754 [16];
  undefined1 auVar755 [32];
  undefined1 auVar756 [32];
  undefined1 auVar757 [32];
  undefined1 auVar758 [32];
  undefined1 auVar759 [32];
  undefined1 auVar760 [32];
  undefined1 auVar761 [64];
  undefined1 auVar762 [64];
  undefined1 auVar763 [64];
  undefined1 auVar764 [64];
  int TILE_N;
  int TILE_M;
  int TILE_K;
  Mat m;
  Mat m_1;
  float tmp [2] [4] [16];
  size_t sVar765;
  uint local_f20;
  int local_f1c;
  long local_f18;
  ulong local_f10;
  long local_f08;
  ulong local_f00;
  long local_ef8;
  ulong local_ef0;
  undefined8 local_ee8;
  ulong local_ee0;
  void *local_ed8;
  ulong local_ed0;
  int local_ec4;
  Mat local_ec0;
  ulong local_e70;
  void *local_e68;
  undefined1 local_e60 [8];
  float fStack_e58;
  undefined4 uStack_e54;
  byte local_e50;
  undefined7 uStack_e4f;
  float local_e48;
  Allocator *local_e40;
  int iStack_e38;
  float fStack_e34;
  float fStack_e30;
  int iStack_e2c;
  int iStack_e28;
  size_t local_e20;
  long local_e18;
  ulong local_e10;
  ulong local_e08;
  ulong local_e00;
  ulong local_df8;
  void *local_df0;
  void *local_de8;
  ulong local_de0;
  long local_dd8;
  ulong local_dd0;
  Mat local_dc8;
  ulong local_d80;
  long local_d78;
  Mat local_d70;
  ulong local_d28;
  ulong local_d20;
  ulong local_d18;
  void *local_d10;
  int local_d08;
  int local_d04;
  ulong local_d00;
  ulong local_cf8;
  long local_cf0;
  int local_ce4;
  ulong local_ce0;
  int local_cd8;
  int local_cd4;
  Mat local_cd0;
  ulong local_c88;
  undefined1 local_c80 [8];
  float afStack_c78 [2];
  undefined8 uStack_c70;
  float afStack_c68 [2];
  Allocator *pAStack_c60;
  int iStack_c58;
  float fStack_c54;
  float fStack_c50;
  int iStack_c4c;
  int iStack_c48;
  float fStack_c44;
  size_t local_c40;
  float afStack_c38 [6];
  float afStack_c20 [8];
  float local_c00 [4];
  undefined8 auStack_bf0 [2];
  float afStack_be0 [8];
  float local_bc0 [8];
  float afStack_ba0 [8];
  undefined8 local_b80 [4];
  undefined1 auStack_b60 [32];
  undefined8 local_b40 [8];
  undefined8 local_b00 [8];
  undefined1 local_ac0 [64];
  undefined1 auStack_a80 [64];
  undefined1 auStack_a40 [64];
  undefined1 auStack_a00 [128];
  undefined1 auStack_980 [256];
  undefined1 auStack_880 [128];
  undefined1 auStack_800 [128];
  undefined1 auStack_780 [256];
  undefined1 auStack_680 [512];
  undefined1 auStack_480 [512];
  undefined1 auStack_280 [512];
  undefined1 auStack_80 [80];
  undefined1 auVar437 [32];
  undefined1 auVar440 [32];
  undefined1 auVar471 [32];
  undefined1 auVar475 [32];
  undefined1 auVar504 [32];
  undefined1 auVar533 [32];
  undefined1 auVar551 [32];
  undefined1 auVar585 [32];
  
  auVar360 = in_ZMM1._0_16_;
  if ((opt->use_int8_inference == true) && ((this->super_Convolution).int8_scale_term != 0)) {
    iVar260 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar260;
  }
  iVar260 = (this->super_Convolution).kernel_w;
  iVar342 = (this->super_Convolution).kernel_h;
  if (iVar342 != 1 || (iVar260 != 1 || bottom_blob->dims != 1)) {
    iVar261 = bottom_blob->c;
    sVar765 = bottom_blob->elemsize;
    opt_00 = (Option *)(long)bottom_blob->elempack;
    iVar328 = (this->super_Convolution).dilation_w;
    iVar343 = (this->super_Convolution).dilation_h;
    local_d70.cstep = 0;
    local_d70.data = (void *)0x0;
    local_d70.refcount._0_4_ = 0;
    local_d70.refcount._4_4_ = 0;
    local_d70.elemsize = 0;
    local_d70.elempack = 0;
    local_d70.allocator = (Allocator *)0x0;
    local_d70.dims = 0;
    local_d70.w = 0;
    local_d70.h = 0;
    local_d70.d = 0;
    local_d70.c = 0;
    Convolution::make_padding(&this->super_Convolution,bottom_blob,&local_d70,opt);
    iVar319 = local_d70.h;
    iVar297 = local_d70.w;
    iVar263 = -100;
    if ((local_d70.data != (void *)0x0) && ((long)local_d70.c * local_d70.cstep != 0)) {
      iVar260 = (~((iVar260 + -1) * iVar328) + local_d70.w) / (this->super_Convolution).stride_w + 1
      ;
      iVar342 = (~((iVar342 + -1) * iVar343) + local_d70.h) / (this->super_Convolution).stride_h + 1
      ;
      uVar291 = (this->super_Convolution).num_output;
      if (opt->use_packing_layout == true) {
        if ((uVar291 & 0xf) == 0) {
          uVar278 = 0x10;
        }
        else if ((uVar291 & 7) == 0) {
          uVar278 = 8;
        }
        else {
          uVar278 = (ulong)((uint)((uVar291 & 3) == 0) * 3 + 1);
        }
      }
      else {
        uVar278 = 1;
      }
      uVar330 = (uint)uVar278;
      Mat::create(top_blob,iVar260,iVar342,(int)uVar291 / (int)uVar330,
                  uVar278 * (sVar765 / (ulong)opt_00),uVar330,opt->blob_allocator);
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        if (((opt->use_packing_layout == false) &&
            ((((((this->super_Convolution).kernel_w == (this->super_Convolution).kernel_h &&
                (iVar328 = (this->super_Convolution).dilation_w, iVar328 != 1)) &&
               (iVar343 = (this->super_Convolution).dilation_h, iVar343 == iVar328)) &&
              (((this->super_Convolution).stride_w == 1 && ((this->super_Convolution).stride_h == 1)
               ))) && (iVar328 <= iVar260)))) && (iVar343 <= iVar342)) {
          iVar263 = forwardDilation_x86(this,&local_d70,top_blob,opt);
        }
        else {
          iVar261 = iVar261 * (int)opt_00;
          bVar349 = opt->use_winograd23_convolution;
          uVar407 = (undefined4)((ulong)top_blob >> 0x20);
          if (((bVar349 == false) && (opt->use_winograd43_convolution == false)) &&
             (opt->use_winograd63_convolution != true)) {
            bVar258 = false;
          }
          else {
            bVar258 = true;
            if (iVar261 < 9) {
              bVar258 = 8 < (this->super_Convolution).num_output;
            }
          }
          auVar421._0_4_ = (this->super_Convolution).kernel_w;
          auVar421._4_4_ = (this->super_Convolution).kernel_h;
          auVar421._8_4_ = (this->super_Convolution).dilation_w;
          auVar421._12_4_ = (this->super_Convolution).dilation_h;
          if ((((auVar421 == _DAT_00539040) && ((this->super_Convolution).stride_w == 1)) &&
              ((this->super_Convolution).stride_h == 1)) &&
             ((opt->use_winograd_convolution != false && (bVar258)))) {
            iVar260 = (this->super_Convolution).num_output;
            bVar257 = test_prefer_winograd63(iVar261,iVar260,iVar297,iVar319);
            bVar258 = test_prefer_winograd23(iVar261,iVar260,iVar297,iVar319);
            if ((bVar258) &&
               (((bVar349 == false || ((this->weight_winograd23_data).data == (void *)0x0)) ||
                ((long)(this->weight_winograd23_data).c * (this->weight_winograd23_data).cstep == 0)
                ))) {
              bVar259 = 1;
              bVar258 = false;
              bVar256 = false;
              if (bVar257 == 0) {
LAB_0017b95d:
                bVar253 = bVar256;
                if (((opt->use_winograd43_convolution == true) &&
                    ((this->weight_winograd43_data).data != (void *)0x0)) &&
                   (bVar349 = true,
                   (long)(this->weight_winograd43_data).c * (this->weight_winograd43_data).cstep !=
                   0)) goto LAB_0017b9d6;
                if (((opt->use_winograd63_convolution == true) &&
                    ((this->weight_winograd63_data).data != (void *)0x0)) &&
                   ((long)(this->weight_winograd63_data).c * (this->weight_winograd63_data).cstep !=
                    0)) goto LAB_0017b9cc;
                bVar258 = true;
              }
              else {
LAB_0017b914:
                bVar256 = false;
                if (((opt->use_winograd63_convolution != true) ||
                    ((this->weight_winograd63_data).data == (void *)0x0)) ||
                   (bVar349 = (long)(this->weight_winograd63_data).c *
                              (this->weight_winograd63_data).cstep == 0, bVar256 = !bVar349,
                   bVar259 != 0 || bVar349)) goto LAB_0017b95d;
LAB_0017b9cc:
                bVar253 = true;
              }
              bVar349 = false;
            }
            else {
              if (bVar257 != 0) {
                bVar259 = (bVar258 | bVar257) ^ 1;
                goto LAB_0017b914;
              }
              bVar253 = false;
              bVar349 = false;
              bVar256 = false;
              if ((bVar258 | bVar257) == 0) goto LAB_0017b95d;
            }
LAB_0017b9d6:
            iVar260 = this->nT;
            iVar342 = iVar260;
            if (iVar260 == 0) {
              iVar342 = opt->num_threads;
            }
            if (opt->num_threads != iVar260 && iVar260 != 0) {
              uVar407 = 0;
              fprintf(_stderr,
                      "opt.num_threads %d changed, convolution winograd will use load-time value %d"
                     );
              fputc(10,_stderr);
            }
            if (bVar258 == false) {
              if (bVar349) {
                uVar3 = top_blob->w;
                uVar6 = top_blob->h;
                auVar365._4_4_ = uVar6;
                auVar365._0_4_ = uVar3;
                auVar360._8_4_ = 3;
                auVar360._0_8_ = 0x300000003;
                auVar360._12_4_ = 3;
                auVar365._8_8_ = 0;
                auVar360 = vpaddd_avx512vl(auVar365,auVar360);
                auVar421 = vpsrad_avx(auVar360,0x1f);
                auVar421 = vpsrld_avx(auVar421,0x1e);
                auVar360 = vpaddd_avx(auVar360,auVar421);
                auVar421 = vpsrad_avx(auVar360,2);
                auVar360 = vpshufd_avx(auVar421,0x55);
                auVar360 = vpmulld_avx(auVar360,auVar421);
                uVar330 = top_blob->elempack * top_blob->c;
                uVar278 = (ulong)uVar330;
                iVar261 = auVar360._0_4_;
                lVar271 = CONCAT44(uVar407,iVar261);
                uVar336 = local_d70.elempack * local_d70.c;
                uVar281 = (ulong)uVar336;
                get_optimal_tile_mnk
                          (uVar330,iVar261,uVar336,&local_f1c,(int *)&local_f20,&local_ec4,iVar342);
                iVar260 = local_ec4;
                uVar291 = local_f20;
                local_cf8 = (long)(int)(uVar330 + local_f1c + -1) / (long)local_f1c & 0xffffffff;
                iVar261 = (int)(iVar261 + local_f20 + -1) / (int)local_f20;
                iVar343 = (int)(local_ec4 + uVar336 + -1) / local_ec4;
                local_e20 = 0;
                iVar328 = local_ec4 * local_f20;
                local_e60 = (undefined1  [8])0x0;
                fStack_e58 = 0.0;
                uStack_e54 = 0;
                local_e50 = 0;
                uStack_e4f = 0;
                local_e48 = 0.0;
                local_e40 = (Allocator *)0x0;
                iStack_e38 = 0;
                fStack_e34 = 0.0;
                fStack_e30 = 0.0;
                iStack_e2c = 0;
                iStack_e28 = 0;
                Mat::create((Mat *)local_e60,iVar328,0x24,iVar343,iVar261,4,opt->workspace_allocator
                           );
                iVar263 = -100;
                local_e00 = uVar281;
                local_cf0 = lVar271;
                local_ce0 = uVar278;
                if ((local_e60 != (undefined1  [8])0x0) && ((long)iStack_e28 * local_e20 != 0)) {
                  iVar261 = iVar261 * iVar343;
                  iVar328 = iVar328 * 0x24;
                  if ((iVar342 < 2) || (iVar342 <= iVar261)) {
                    local_c40 = 0;
                    local_c80 = (undefined1  [8])0x0;
                    afStack_c78[0] = 0.0;
                    afStack_c78[1] = 0.0;
                    uStack_c70 = 0;
                    afStack_c68[0] = 0.0;
                    pAStack_c60 = (Allocator *)0x0;
                    iStack_c58 = 0;
                    fStack_c54 = 0.0;
                    fStack_c50 = 0.0;
                    iStack_c4c = 0;
                    iStack_c48 = 0;
                    Mat::create((Mat *)local_c80,iVar328,1,iVar342,4,opt->workspace_allocator);
                    if ((local_c80 != (undefined1  [8])0x0) && ((long)iStack_c48 * local_c40 != 0))
                    {
                      iVar328 = 0;
                      if (iVar261 < 1) {
                        iVar261 = 0;
                      }
                      for (; iVar261 != iVar328; iVar328 = iVar328 + 1) {
                        iVar263 = iVar328 / iVar343;
                        uVar336 = iVar328 % iVar343;
                        iVar297 = iVar263 * uVar291;
                        iVar319 = uVar336 * iVar260;
                        uVar330 = (int)local_cf0 - iVar297;
                        if ((int)uVar291 < (int)uVar330) {
                          uVar330 = uVar291;
                        }
                        iVar337 = (int)local_e00 - iVar319;
                        if (iVar260 < iVar337) {
                          iVar337 = iVar260;
                        }
                        iVar315 = get_omp_thread_num();
                        local_ec0.data =
                             (void *)((long)iVar315 * local_c40 * uStack_c70 + (long)local_c80);
                        local_ec0.refcount._0_4_ = 0;
                        local_ec0.refcount._4_4_ = 0;
                        local_ec0.elemsize = uStack_c70;
                        local_ec0.elempack = (int)afStack_c68[0];
                        local_ec0.allocator = pAStack_c60;
                        local_ec0.w = (int)fStack_c54;
                        local_ec0.h = (int)fStack_c50;
                        local_ec0.d = 1;
                        local_ec0.c = iStack_c4c;
                        local_ec0.dims = iStack_c58 + -1;
                        local_ec0.cstep =
                             (uStack_c70 * (long)(int)fStack_c50 * (long)(int)fStack_c54 + 0xf &
                             0xfffffffffffffff0) / uStack_c70;
                        if (iStack_c58 == 4) {
                          local_ec0.cstep = (long)(int)fStack_c50 * (long)(int)fStack_c54;
                        }
                        conv3x3s1_winograd43_transform_input_tile
                                  (&local_d70,&local_ec0,iVar297,uVar330,iVar319,iVar337,iVar328);
                        local_dc8.elemsize = CONCAT71(uStack_e4f,local_e50);
                        local_dc8.cstep = (long)(int)fStack_e30 * (long)(int)fStack_e34;
                        local_dc8.data =
                             (void *)((long)local_e60 +
                                     uVar336 * local_dc8.elemsize * local_dc8.cstep +
                                     (long)iVar263 * local_e20 * local_dc8.elemsize);
                        local_dc8.refcount = (int *)0x0;
                        local_dc8.elempack = (int)local_e48;
                        local_dc8.allocator = local_e40;
                        local_dc8.dims = 2;
                        local_dc8.w = (int)fStack_e34;
                        local_dc8.h = (int)fStack_e30;
                        local_dc8.d = 1;
                        local_dc8.c = 1;
                        transpose_pack_B_tile
                                  (&local_ec0,&local_dc8,0x24,uVar330,iVar337,(int)local_dc8.cstep);
                      }
                      piVar267 = (int *)CONCAT44(afStack_c78[1],afStack_c78[0]);
                      if (piVar267 != (int *)0x0) {
                        LOCK();
                        *piVar267 = *piVar267 + -1;
                        UNLOCK();
                        if (*piVar267 == 0) {
                          if (pAStack_c60 == (Allocator *)0x0) goto LAB_0018406d;
                          (*pAStack_c60->_vptr_Allocator[3])();
                        }
                      }
                      goto LAB_00184075;
                    }
                    piVar267 = (int *)CONCAT44(afStack_c78[1],afStack_c78[0]);
                    if (piVar267 != (int *)0x0) {
                      LOCK();
                      *piVar267 = *piVar267 + -1;
                      UNLOCK();
                      if (*piVar267 == 0) {
                        if (pAStack_c60 == (Allocator *)0x0) goto LAB_001838ca;
                        (*pAStack_c60->_vptr_Allocator[3])();
                      }
                    }
                  }
                  else {
                    local_c40 = 0;
                    local_c80 = (undefined1  [8])0x0;
                    afStack_c78[0] = 0.0;
                    afStack_c78[1] = 0.0;
                    uStack_c70 = 0;
                    afStack_c68[0] = 0.0;
                    pAStack_c60 = (Allocator *)0x0;
                    iStack_c58 = 0;
                    fStack_c54 = 0.0;
                    fStack_c50 = 0.0;
                    iStack_c4c = 0;
                    iStack_c48 = 0;
                    Mat::create((Mat *)local_c80,iVar328,4,opt->workspace_allocator);
                    if ((local_c80 == (undefined1  [8])0x0) || ((long)iStack_c48 * local_c40 == 0))
                    {
                      piVar267 = (int *)CONCAT44(afStack_c78[1],afStack_c78[0]);
                      if (piVar267 != (int *)0x0) {
                        LOCK();
                        *piVar267 = *piVar267 + -1;
                        UNLOCK();
                        if (*piVar267 == 0) {
                          if (pAStack_c60 == (Allocator *)0x0) {
LAB_001838ca:
                            free((void *)local_c80);
                          }
                          else {
                            (*pAStack_c60->_vptr_Allocator[3])();
                          }
                        }
                      }
                    }
                    else {
                      iVar328 = 0;
                      if (iVar261 < 1) {
                        iVar261 = 0;
                        iVar328 = 0;
                      }
                      for (; iVar261 != iVar328; iVar328 = iVar328 + 1) {
                        lVar271 = (long)iVar328;
                        iVar263 = iVar328 / iVar343;
                        iVar297 = iVar263 * uVar291;
                        iVar319 = (int)(lVar271 % (long)iVar343) * iVar260;
                        uVar330 = (int)local_cf0 - iVar297;
                        if ((int)uVar291 < (int)uVar330) {
                          uVar330 = uVar291;
                        }
                        iVar337 = (int)local_e00 - iVar319;
                        if (iVar260 < iVar337) {
                          iVar337 = iVar260;
                        }
                        conv3x3s1_winograd43_transform_input_tile
                                  (&local_d70,(Mat *)local_c80,iVar297,uVar330,iVar319,iVar337,
                                   iVar328);
                        local_ec0.elemsize = CONCAT71(uStack_e4f,local_e50);
                        local_ec0.cstep = (long)(int)fStack_e30 * (long)(int)fStack_e34;
                        local_ec0.data =
                             (void *)((long)local_e60 +
                                     (lVar271 % (long)iVar343 & 0xffffffffU) * local_ec0.elemsize *
                                     local_ec0.cstep +
                                     (long)iVar263 * local_e20 * local_ec0.elemsize);
                        local_ec0.refcount._0_4_ = 0;
                        local_ec0.refcount._4_4_ = 0;
                        local_ec0.elempack = (int)local_e48;
                        local_ec0.allocator = local_e40;
                        local_ec0.dims = 2;
                        local_ec0.w = (int)fStack_e34;
                        local_ec0.h = (int)fStack_e30;
                        local_ec0.d = 1;
                        local_ec0.c = 1;
                        transpose_pack_B_tile
                                  ((Mat *)local_c80,&local_ec0,0x24,uVar330,iVar337,
                                   (int)local_ec0.cstep);
                      }
                      piVar267 = (int *)CONCAT44(afStack_c78[1],afStack_c78[0]);
                      if (piVar267 != (int *)0x0) {
                        LOCK();
                        *piVar267 = *piVar267 + -1;
                        UNLOCK();
                        if (*piVar267 == 0) {
                          if (pAStack_c60 == (Allocator *)0x0) {
LAB_0018406d:
                            free((void *)local_c80);
                          }
                          else {
                            (*pAStack_c60->_vptr_Allocator[3])();
                          }
                        }
                      }
LAB_00184075:
                      local_ec0.cstep = 0;
                      local_ec0.data = (void *)0x0;
                      local_ec0.refcount._0_4_ = 0;
                      local_ec0.refcount._4_4_ = 0;
                      local_ec0.elemsize = 0;
                      local_ec0.elempack = 0;
                      local_ec0.allocator = (Allocator *)0x0;
                      local_ec0.dims = 0;
                      local_ec0.w = 0;
                      local_ec0.h = 0;
                      local_ec0.d = 0;
                      local_ec0.c = 0;
                      Mat::create(&local_ec0,local_f20 * local_f1c * 0x24,1,iVar342,4,
                                  opt->workspace_allocator);
                      iVar263 = -100;
                      if ((local_ec0.data != (void *)0x0) &&
                         ((long)local_ec0.c * local_ec0.cstep != 0)) {
                        iVar260 = (int)local_cf8;
                        local_cf8 = local_cf8 & 0xffffffff;
                        if (iVar260 < 1) {
                          local_cf8 = 0;
                        }
                        uVar278 = 0;
                        while (iVar260 = local_f1c, iVar263 = 0, uVar278 != local_cf8) {
                          local_d18 = uVar278;
                          iVar342 = get_omp_thread_num();
                          local_dc8.data =
                               (void *)((long)iVar342 * local_ec0.cstep * local_ec0.elemsize +
                                       (long)local_ec0.data);
                          local_dc8.refcount = (int *)0x0;
                          local_dc8.elemsize = local_ec0.elemsize;
                          local_dc8.elempack = local_ec0.elempack;
                          local_dc8.allocator = local_ec0.allocator;
                          local_dc8.w = local_ec0.w;
                          local_dc8.h = local_ec0.h;
                          local_dc8.c = local_ec0.d;
                          local_dc8.d = 1;
                          local_dc8.dims = local_ec0.dims + -1;
                          local_dc8.cstep =
                               (local_ec0.elemsize * (long)local_ec0.h * (long)local_ec0.w + 0xf &
                               0xfffffffffffffff0) / local_ec0.elemsize;
                          if (local_ec0.dims == 4) {
                            local_dc8.cstep = (long)local_ec0.h * (long)local_ec0.w;
                          }
                          uVar291 = iVar260 * (int)local_d18;
                          local_d20 = (ulong)uVar291;
                          local_d04 = (int)local_ce0 - uVar291;
                          if (iVar260 < local_d04) {
                            local_d04 = iVar260;
                          }
                          local_de0 = (ulong)(int)uVar291;
                          local_e18 = (long)local_d04;
                          uVar278 = 0;
                          auVar398 = vbroadcastss_avx512f(ZEXT416(0x3f3504f3));
                          auVar399 = vbroadcastss_avx512f(ZEXT416(0x3fb504f3));
                          auVar395 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
                          auVar397 = vbroadcastss_avx512f(ZEXT416(0x40000000));
                          auVar396 = vbroadcastss_avx512f(ZEXT416(0x3eb504f3));
                          auVar394 = vbroadcastss_avx512f(ZEXT416(0x403504f3));
                          auVar360 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
                          auVar761 = ZEXT1664(auVar360);
                          auVar360 = vbroadcastss_avx512vl(ZEXT416(0x3fb504f3));
                          auVar762 = ZEXT1664(auVar360);
                          auVar360 = vbroadcastss_avx512vl(ZEXT416(0x3eb504f3));
                          auVar763 = ZEXT1664(auVar360);
                          auVar360 = vbroadcastss_avx512vl(ZEXT416(0x403504f3));
                          auVar764 = ZEXT1664(auVar360);
                          while (iVar260 = local_ec4, uVar291 = (int)local_cf0 - (int)uVar278,
                                uVar291 != 0 && (int)uVar278 <= (int)local_cf0) {
                            local_d80 = CONCAT44(local_d80._4_4_,local_f20);
                            if ((int)local_f20 < (int)uVar291) {
                              uVar291 = local_f20;
                            }
                            local_e68 = (void *)(ulong)uVar291;
                            iVar342 = 0;
                            uVar281 = local_e00 & 0xffffffff;
                            local_ef0 = uVar278;
                            while( true ) {
                              iVar343 = (int)uVar281;
                              iVar328 = (int)local_e68;
                              iVar261 = (int)local_ef0;
                              if ((int)local_e00 <= iVar342) break;
                              iVar263 = iVar343;
                              if (iVar260 < iVar343) {
                                iVar263 = iVar260;
                              }
                              fStack_c54 = (float)(this->weight_winograd43_data).w;
                              fStack_c50 = (float)(this->weight_winograd43_data).h;
                              uStack_c70 = (this->weight_winograd43_data).elemsize;
                              afStack_c68[0] = (float)(this->weight_winograd43_data).elempack;
                              pAStack_c60 = (this->weight_winograd43_data).allocator;
                              local_c40 = (long)(int)fStack_c50 * (long)(int)fStack_c54;
                              local_c80 = (undefined1  [8])
                                          ((long)(this->weight_winograd43_data).data +
                                          uStack_c70 * local_c40 * (long)(iVar342 / iVar260) +
                                          (this->weight_winograd43_data).cstep * local_d18 *
                                          uStack_c70);
                              afStack_c78[0] = 0.0;
                              afStack_c78[1] = 0.0;
                              local_cd0.dims = 2;
                              iStack_c4c = 1;
                              iStack_c48 = 1;
                              local_cd0.elemsize = CONCAT71(uStack_e4f,local_e50);
                              local_cd0.cstep = (long)(int)fStack_e30 * (long)(int)fStack_e34;
                              local_cd0.data =
                                   (void *)((long)local_e60 +
                                           local_cd0.cstep * local_cd0.elemsize *
                                           (long)(iVar342 / iVar260) +
                                           (long)(int)((long)((ulong)(uint)(iVar261 >> 0x1f) << 0x20
                                                             | local_ef0 & 0xffffffff) /
                                                      (long)(int)local_d80) * local_e20 *
                                           local_cd0.elemsize);
                              local_cd0.refcount = (int *)0x0;
                              local_cd0.elempack = (int)local_e48;
                              local_cd0.allocator = local_e40;
                              local_cd0.w = (int)fStack_e34;
                              local_cd0.h = (int)fStack_e30;
                              local_cd0.d = 1;
                              local_cd0.c = 1;
                              iStack_c58 = local_cd0.dims;
                              gemm_transB_packed_tile
                                        ((Mat *)local_c80,&local_cd0,&local_dc8,0x24,local_d04,
                                         iVar328,iVar342,iVar263);
                              auVar360 = vbroadcastss_avx512vl(ZEXT416(0x403504f3));
                              auVar764 = ZEXT1664(auVar360);
                              auVar360 = vbroadcastss_avx512vl(ZEXT416(0x3eb504f3));
                              auVar763 = ZEXT1664(auVar360);
                              auVar360 = vbroadcastss_avx512vl(ZEXT416(0x3fb504f3));
                              auVar762 = ZEXT1664(auVar360);
                              auVar360 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
                              auVar761 = ZEXT1664(auVar360);
                              auVar394 = vbroadcastss_avx512f(ZEXT416(0x403504f3));
                              auVar396 = vbroadcastss_avx512f(ZEXT416(0x3eb504f3));
                              auVar397 = vbroadcastss_avx512f(ZEXT416(0x40000000));
                              auVar395 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
                              auVar399 = vbroadcastss_avx512f(ZEXT416(0x3fb504f3));
                              auVar398 = vbroadcastss_avx512f(ZEXT416(0x3f3504f3));
                              iVar342 = iVar342 + iVar260;
                              uVar281 = (ulong)(uint)-(iVar260 - iVar343);
                            }
                            iVar260 = top_blob->w;
                            iVar342 = top_blob->elempack;
                            iVar343 = top_blob->h;
                            iVar297 = (int)top_blob->cstep * iVar342;
                            iVar263 = (iVar260 + 3) / 4;
                            local_e08 = CONCAT44(local_e08._4_4_,iVar263);
                            lVar296 = (long)iVar297;
                            lVar271 = (long)(iVar297 * 2);
                            lVar272 = (long)(iVar297 * 3);
                            lVar273 = (long)(iVar297 * 4);
                            lVar274 = (long)(iVar297 * 5);
                            lVar275 = (long)(iVar297 * 6);
                            lVar276 = (long)(iVar297 * 7);
                            lVar277 = (long)(iVar297 * 8);
                            lVar295 = (long)(iVar297 * 9);
                            lVar279 = (long)(iVar297 * 10);
                            lVar280 = (long)(iVar297 * 0xb);
                            lVar299 = (long)(iVar297 * 0xc);
                            lVar300 = (long)(iVar297 * 0xd);
                            lVar282 = (long)(iVar297 * 0xe);
                            lVar284 = (long)(iVar297 * 0xf);
                            local_d28 = CONCAT44(local_d28._4_4_,iVar328 * 0x24);
                            uVar291 = 0;
                            local_ed0 = 0;
                            if (0 < iVar328) {
                              local_ed0 = (ulong)local_e68 & 0xffffffff;
                            }
                            lVar285 = (long)(iVar342 * iVar260);
                            local_e70 = (long)(iVar328 * 0x50) * 4;
                            local_ed8 = (void *)((long)(iVar328 * 0x60) * 4);
                            local_d10 = (void *)((long)(iVar328 << 6) * 4);
                            local_e10 = (long)(iVar328 * 0x30) * 4;
                            local_ee0 = (long)(iVar328 << 5) * 4;
                            local_df8 = (long)(iVar328 << 4) * 4;
                            local_df0 = (this->super_Convolution).bias_data.data;
                            local_de8 = (void *)((long)local_df0 + local_de0 * 4);
                            local_dd0 = CONCAT44(local_dd0._4_4_,iVar328 * 0x240);
                            uVar278 = 0;
                            auVar621._8_4_ = 0x3f3504f3;
                            auVar621._0_8_ = 0x3f3504f33f3504f3;
                            auVar621._12_4_ = 0x3f3504f3;
                            auVar621._16_4_ = 0x3f3504f3;
                            auVar621._20_4_ = 0x3f3504f3;
                            auVar621._24_4_ = 0x3f3504f3;
                            auVar621._28_4_ = 0x3f3504f3;
                            auVar647._8_4_ = 0x3fb504f3;
                            auVar647._0_8_ = 0x3fb504f33fb504f3;
                            auVar647._12_4_ = 0x3fb504f3;
                            auVar647._16_4_ = 0x3fb504f3;
                            auVar647._20_4_ = 0x3fb504f3;
                            auVar647._24_4_ = 0x3fb504f3;
                            auVar647._28_4_ = 0x3fb504f3;
                            auVar670._8_4_ = 0x3f000000;
                            auVar670._0_8_ = 0x3f0000003f000000;
                            auVar670._12_4_ = 0x3f000000;
                            auVar670._16_4_ = 0x3f000000;
                            auVar670._20_4_ = 0x3f000000;
                            auVar670._24_4_ = 0x3f000000;
                            auVar670._28_4_ = 0x3f000000;
                            auVar694._8_4_ = 0x40000000;
                            auVar694._0_8_ = 0x4000000040000000;
                            auVar694._12_4_ = 0x40000000;
                            auVar694._16_4_ = 0x40000000;
                            auVar694._20_4_ = 0x40000000;
                            auVar694._24_4_ = 0x40000000;
                            auVar694._28_4_ = 0x40000000;
                            auVar717._8_4_ = 0x3eb504f3;
                            auVar717._0_8_ = 0x3eb504f33eb504f3;
                            auVar717._12_4_ = 0x3eb504f3;
                            auVar717._16_4_ = 0x3eb504f3;
                            auVar717._20_4_ = 0x3eb504f3;
                            auVar717._24_4_ = 0x3eb504f3;
                            auVar717._28_4_ = 0x3eb504f3;
                            auVar735._8_4_ = 0x403504f3;
                            auVar735._0_8_ = 0x403504f3403504f3;
                            auVar735._12_4_ = 0x403504f3;
                            auVar735._16_4_ = 0x403504f3;
                            auVar735._20_4_ = 0x403504f3;
                            auVar735._24_4_ = 0x403504f3;
                            auVar735._28_4_ = 0x403504f3;
                            auVar360 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                            auVar421 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
                            for (; iVar319 = (int)local_d20, (long)(uVar278 | 0xf) < local_e18;
                                uVar278 = uVar278 + 0x10) {
                              if (local_df0 == (void *)0x0) {
                                auVar400 = ZEXT1664((undefined1  [16])0x0);
                              }
                              else {
                                auVar400 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                                              ((long)local_de8 + uVar278 * 4));
                              }
                              lVar286 = (long)(int)uVar291;
                              iVar319 = iVar319 + (int)uVar278;
                              local_dd8 = CONCAT44(local_dd8._4_4_,iVar319);
                              lVar287 = 0;
                              uVar281 = 0;
                              while (uVar318 = uVar281, lVar303 = lVar287, uVar318 != local_ed0) {
                                lVar287 = (long)local_dc8.data + lVar303;
                                for (lVar301 = -0x180; lVar301 != 0; lVar301 = lVar301 + 0x40) {
                                  auVar403 = *(undefined1 (*) [64])
                                              (lVar287 + local_df8 + lVar286 * 4);
                                  auVar404 = *(undefined1 (*) [64])
                                              (lVar287 + local_ee0 + lVar286 * 4);
                                  auVar405 = *(undefined1 (*) [64])
                                              (lVar287 + local_e10 + lVar286 * 4);
                                  auVar406 = *(undefined1 (*) [64])
                                              ((long)local_d10 + lVar287 + lVar286 * 4);
                                  auVar401 = vaddps_avx512f(auVar404,auVar403);
                                  auVar402 = vaddps_avx512f(auVar406,auVar405);
                                  auVar403 = vsubps_avx512f(auVar403,auVar404);
                                  auVar404 = vsubps_avx512f(auVar405,auVar406);
                                  auVar405 = vaddps_avx512f(auVar401,*(undefined1 (*) [64])
                                                                      (lVar287 + lVar286 * 4));
                                  auVar405 = vaddps_avx512f(auVar405,auVar402);
                                  auVar406 = vmulps_avx512f(auVar403,auVar398);
                                  auVar406 = vfmadd231ps_avx512f(auVar406,auVar404,auVar399);
                                  auVar401 = vmulps_avx512f(auVar401,auVar395);
                                  auVar403 = vfmadd213ps_avx512f(auVar403,auVar396,
                                                                 *(undefined1 (*) [64])
                                                                  (lVar287 + local_e70 + lVar286 * 4
                                                                  ));
                                  auVar401 = vfmadd231ps_avx512f(auVar401,auVar402,auVar397);
                                  auVar403 = vfmadd231ps_avx512f(auVar403,auVar404,auVar394);
                                  *(undefined1 (*) [64])((long)local_b00 + lVar301) = auVar405;
                                  *(undefined1 (*) [64])(auStack_980 + lVar301) = auVar406;
                                  *(undefined1 (*) [64])(auStack_800 + lVar301) = auVar401;
                                  *(undefined1 (*) [64])(auStack_680 + lVar301) = auVar403;
                                  lVar287 = lVar287 + (long)local_ed8;
                                }
                                iVar315 = iVar261 + (int)uVar318;
                                iVar337 = iVar315 % iVar263;
                                uVar330 = iVar315 / iVar263 << 2;
                                pauVar266 = (undefined1 (*) [64])
                                            ((long)top_blob->data +
                                            (long)(iVar337 * 4 * iVar342) * 4 +
                                            (long)top_blob->w * top_blob->elemsize *
                                            (long)(int)uVar330 +
                                            (long)(iVar319 / iVar342) * top_blob->cstep *
                                            top_blob->elemsize);
                                iVar315 = iVar337 * 4 + 1;
                                iVar320 = iVar337 * 4 + 2;
                                iVar337 = iVar337 * 4 + 3;
                                pauVar302 = (undefined1 (*) [64])local_b40;
                                for (lVar287 = 0; lVar287 != 4; lVar287 = lVar287 + 1) {
                                  if ((int)(uVar330 | (uint)lVar287) < iVar343) {
                                    auVar403 = vaddps_avx512f(pauVar302[-3],pauVar302[-4]);
                                    auVar404 = vaddps_avx512f(pauVar302[-1],pauVar302[-2]);
                                    auVar405 = vsubps_avx512f(pauVar302[-4],pauVar302[-3]);
                                    auVar406 = vsubps_avx512f(pauVar302[-2],pauVar302[-1]);
                                    auVar401 = vaddps_avx512f(auVar400,pauVar302[-5]);
                                    auVar401 = vaddps_avx512f(auVar401,auVar403);
                                    auVar401 = vaddps_avx512f(auVar401,auVar404);
                                    auVar402 = vfmadd231ps_avx512f(auVar400,auVar405,auVar398);
                                    auVar403 = vfmadd132ps_avx512f(auVar403,auVar400,auVar395);
                                    auVar403 = vfmadd231ps_avx512f(auVar403,auVar404,auVar397);
                                    auVar404 = vaddps_avx512f(auVar400,*pauVar302);
                                    auVar402 = vfmadd231ps_avx512f(auVar402,auVar406,auVar399);
                                    auVar404 = vfmadd231ps_avx512f(auVar404,auVar405,auVar396);
                                    auVar404 = vfmadd231ps_avx512f(auVar404,auVar406,auVar394);
                                    auVar361 = auVar401._0_16_;
                                    auVar362 = auVar402._0_16_;
                                    auVar363 = auVar403._0_16_;
                                    auVar364 = auVar404._0_16_;
                                    if (iVar342 == 1) {
                                      *(int *)*pauVar266 = auVar401._0_4_;
                                      uVar407 = vextractps_avx(auVar361,1);
                                      *(undefined4 *)(*pauVar266 + lVar296 * 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar361,2);
                                      *(undefined4 *)(*pauVar266 + lVar271 * 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar361,3);
                                      *(undefined4 *)(*pauVar266 + lVar272 * 4) = uVar407;
                                      auVar361 = auVar401._16_16_;
                                      *(int *)(*pauVar266 + lVar273 * 4) = auVar401._16_4_;
                                      uVar407 = vextractps_avx(auVar361,1);
                                      *(undefined4 *)(*pauVar266 + lVar274 * 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar361,2);
                                      *(undefined4 *)(*pauVar266 + lVar275 * 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar361,3);
                                      *(undefined4 *)(*pauVar266 + lVar276 * 4) = uVar407;
                                      auVar361 = vextracti32x4_avx512f(auVar401,2);
                                      *(int *)(*pauVar266 + lVar277 * 4) = auVar361._0_4_;
                                      uVar407 = vextractps_avx(auVar361,1);
                                      *(undefined4 *)(*pauVar266 + lVar295 * 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar361,2);
                                      *(undefined4 *)(*pauVar266 + lVar279 * 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar361,3);
                                      *(undefined4 *)(*pauVar266 + lVar280 * 4) = uVar407;
                                      auVar361 = vextracti32x4_avx512f(auVar401,3);
                                      *(int *)(*pauVar266 + lVar299 * 4) = auVar361._0_4_;
                                      uVar407 = vextractps_avx(auVar361,1);
                                      *(undefined4 *)(*pauVar266 + lVar300 * 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar361,2);
                                      *(undefined4 *)(*pauVar266 + lVar282 * 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar361,3);
                                      *(undefined4 *)(*pauVar266 + lVar284 * 4) = uVar407;
                                      if (iVar315 < iVar260) {
                                        *(int *)(*pauVar266 + 4) = auVar402._0_4_;
                                        uVar407 = vextractps_avx(auVar362,1);
                                        *(undefined4 *)(*pauVar266 + lVar296 * 4 + 4) = uVar407;
                                        uVar407 = vextractps_avx(auVar362,2);
                                        *(undefined4 *)(*pauVar266 + lVar271 * 4 + 4) = uVar407;
                                        uVar407 = vextractps_avx(auVar362,3);
                                        *(undefined4 *)(*pauVar266 + lVar272 * 4 + 4) = uVar407;
                                        auVar362 = auVar402._16_16_;
                                        *(int *)(*pauVar266 + lVar273 * 4 + 4) = auVar402._16_4_;
                                        uVar407 = vextractps_avx(auVar362,1);
                                        *(undefined4 *)(*pauVar266 + lVar274 * 4 + 4) = uVar407;
                                        uVar407 = vextractps_avx(auVar362,2);
                                        *(undefined4 *)(*pauVar266 + lVar275 * 4 + 4) = uVar407;
                                        uVar407 = vextractps_avx(auVar362,3);
                                        *(undefined4 *)(*pauVar266 + lVar276 * 4 + 4) = uVar407;
                                        auVar362 = vextracti32x4_avx512f(auVar402,2);
                                        *(int *)(*pauVar266 + lVar277 * 4 + 4) = auVar362._0_4_;
                                        uVar407 = vextractps_avx(auVar362,1);
                                        *(undefined4 *)(*pauVar266 + lVar295 * 4 + 4) = uVar407;
                                        uVar407 = vextractps_avx(auVar362,2);
                                        *(undefined4 *)(*pauVar266 + lVar279 * 4 + 4) = uVar407;
                                        uVar407 = vextractps_avx(auVar362,3);
                                        *(undefined4 *)(*pauVar266 + lVar280 * 4 + 4) = uVar407;
                                        auVar362 = vextracti32x4_avx512f(auVar402,3);
                                        *(int *)(*pauVar266 + lVar299 * 4 + 4) = auVar362._0_4_;
                                        uVar407 = vextractps_avx(auVar362,1);
                                        *(undefined4 *)(*pauVar266 + lVar300 * 4 + 4) = uVar407;
                                        uVar407 = vextractps_avx(auVar362,2);
                                        *(undefined4 *)(*pauVar266 + lVar282 * 4 + 4) = uVar407;
                                        uVar407 = vextractps_avx(auVar362,3);
                                        *(undefined4 *)(*pauVar266 + lVar284 * 4 + 4) = uVar407;
                                      }
                                      if (iVar320 < iVar260) {
                                        *(int *)(*pauVar266 + 8) = auVar403._0_4_;
                                        uVar407 = vextractps_avx(auVar363,1);
                                        *(undefined4 *)(*pauVar266 + lVar296 * 4 + 8) = uVar407;
                                        uVar407 = vextractps_avx(auVar363,2);
                                        *(undefined4 *)(*pauVar266 + lVar271 * 4 + 8) = uVar407;
                                        uVar407 = vextractps_avx(auVar363,3);
                                        *(undefined4 *)(*pauVar266 + lVar272 * 4 + 8) = uVar407;
                                        auVar363 = auVar403._16_16_;
                                        *(int *)(*pauVar266 + lVar273 * 4 + 8) = auVar403._16_4_;
                                        uVar407 = vextractps_avx(auVar363,1);
                                        *(undefined4 *)(*pauVar266 + lVar274 * 4 + 8) = uVar407;
                                        uVar407 = vextractps_avx(auVar363,2);
                                        *(undefined4 *)(*pauVar266 + lVar275 * 4 + 8) = uVar407;
                                        uVar407 = vextractps_avx(auVar363,3);
                                        *(undefined4 *)(*pauVar266 + lVar276 * 4 + 8) = uVar407;
                                        auVar363 = vextracti32x4_avx512f(auVar403,2);
                                        *(int *)(*pauVar266 + lVar277 * 4 + 8) = auVar363._0_4_;
                                        uVar407 = vextractps_avx(auVar363,1);
                                        *(undefined4 *)(*pauVar266 + lVar295 * 4 + 8) = uVar407;
                                        uVar407 = vextractps_avx(auVar363,2);
                                        *(undefined4 *)(*pauVar266 + lVar279 * 4 + 8) = uVar407;
                                        uVar407 = vextractps_avx(auVar363,3);
                                        *(undefined4 *)(*pauVar266 + lVar280 * 4 + 8) = uVar407;
                                        auVar363 = vextracti32x4_avx512f(auVar403,3);
                                        *(int *)(*pauVar266 + lVar299 * 4 + 8) = auVar363._0_4_;
                                        uVar407 = vextractps_avx(auVar363,1);
                                        *(undefined4 *)(*pauVar266 + lVar300 * 4 + 8) = uVar407;
                                        uVar407 = vextractps_avx(auVar363,2);
                                        *(undefined4 *)(*pauVar266 + lVar282 * 4 + 8) = uVar407;
                                        uVar407 = vextractps_avx(auVar363,3);
                                        *(undefined4 *)(*pauVar266 + lVar284 * 4 + 8) = uVar407;
                                      }
                                      if (iVar337 < iVar260) {
                                        *(int *)(*pauVar266 + 0xc) = auVar404._0_4_;
                                        uVar407 = vextractps_avx(auVar364,1);
                                        *(undefined4 *)(*pauVar266 + lVar296 * 4 + 0xc) = uVar407;
                                        uVar407 = vextractps_avx(auVar364,2);
                                        *(undefined4 *)(*pauVar266 + lVar271 * 4 + 0xc) = uVar407;
                                        uVar407 = vextractps_avx(auVar364,3);
                                        *(undefined4 *)(*pauVar266 + lVar272 * 4 + 0xc) = uVar407;
                                        auVar364 = auVar404._16_16_;
                                        *(int *)(*pauVar266 + lVar273 * 4 + 0xc) = auVar404._16_4_;
                                        uVar407 = vextractps_avx(auVar364,1);
                                        *(undefined4 *)(*pauVar266 + lVar274 * 4 + 0xc) = uVar407;
                                        uVar407 = vextractps_avx(auVar364,2);
                                        *(undefined4 *)(*pauVar266 + lVar275 * 4 + 0xc) = uVar407;
                                        uVar407 = vextractps_avx(auVar364,3);
                                        *(undefined4 *)(*pauVar266 + lVar276 * 4 + 0xc) = uVar407;
                                        auVar364 = vextracti32x4_avx512f(auVar404,2);
                                        *(int *)(*pauVar266 + lVar277 * 4 + 0xc) = auVar364._0_4_;
                                        uVar407 = vextractps_avx(auVar364,1);
                                        *(undefined4 *)(*pauVar266 + lVar295 * 4 + 0xc) = uVar407;
                                        uVar407 = vextractps_avx(auVar364,2);
                                        *(undefined4 *)(*pauVar266 + lVar279 * 4 + 0xc) = uVar407;
                                        uVar407 = vextractps_avx(auVar364,3);
                                        *(undefined4 *)(*pauVar266 + lVar280 * 4 + 0xc) = uVar407;
                                        auVar364 = vextracti32x4_avx512f(auVar404,3);
                                        *(int *)(*pauVar266 + lVar299 * 4 + 0xc) = auVar364._0_4_;
                                        uVar407 = vextractps_avx(auVar364,1);
                                        *(undefined4 *)(*pauVar266 + lVar300 * 4 + 0xc) = uVar407;
                                        uVar407 = vextractps_avx(auVar364,2);
                                        *(undefined4 *)(*pauVar266 + lVar282 * 4 + 0xc) = uVar407;
                                        uVar407 = vextractps_avx(auVar364,3);
                                        *(undefined4 *)(*pauVar266 + lVar284 * 4 + 0xc) = uVar407;
                                      }
                                    }
                                    else if (iVar342 == 4) {
                                      *(undefined1 (*) [16])*pauVar266 = auVar361;
                                      auVar361 = vextractf32x4_avx512f(auVar401,1);
                                      *(undefined1 (*) [16])(*pauVar266 + lVar296 * 4) = auVar361;
                                      auVar361 = vextractf32x4_avx512f(auVar401,2);
                                      *(undefined1 (*) [16])(*pauVar266 + lVar271 * 4) = auVar361;
                                      auVar361 = vextractf32x4_avx512f(auVar401,3);
                                      *(undefined1 (*) [16])(*pauVar266 + lVar272 * 4) = auVar361;
                                      if (iVar315 < iVar260) {
                                        *(undefined1 (*) [16])(*pauVar266 + 0x10) = auVar362;
                                        auVar362 = vextractf32x4_avx512f(auVar402,1);
                                        *(undefined1 (*) [16])(*pauVar266 + lVar296 * 4 + 8) =
                                             auVar362;
                                        auVar362 = vextractf32x4_avx512f(auVar402,2);
                                        *(undefined1 (*) [16])(*pauVar266 + lVar271 * 4 + 8) =
                                             auVar362;
                                        auVar362 = vextractf32x4_avx512f(auVar402,3);
                                        *(undefined1 (*) [16])(*pauVar266 + lVar272 * 4 + 8) =
                                             auVar362;
                                      }
                                      if (iVar320 < iVar260) {
                                        *(undefined1 (*) [16])(*pauVar266 + 0x20) = auVar363;
                                        auVar363 = vextractf32x4_avx512f(auVar403,1);
                                        *(undefined1 (*) [16])(*pauVar266 + lVar296 * 4 + 0x10) =
                                             auVar363;
                                        auVar363 = vextractf32x4_avx512f(auVar403,2);
                                        *(undefined1 (*) [16])(*pauVar266 + lVar271 * 4 + 0x10) =
                                             auVar363;
                                        auVar363 = vextractf32x4_avx512f(auVar403,3);
                                        *(undefined1 (*) [16])(*pauVar266 + lVar272 * 4 + 0x10) =
                                             auVar363;
                                      }
                                      if (iVar337 < iVar260) {
                                        *(undefined1 (*) [16])(*pauVar266 + 0x30) = auVar364;
                                        auVar364 = vextractf32x4_avx512f(auVar404,1);
                                        *(undefined1 (*) [16])(*pauVar266 + lVar296 * 4 + 0x18) =
                                             auVar364;
                                        auVar364 = vextractf32x4_avx512f(auVar404,2);
                                        *(undefined1 (*) [16])(*pauVar266 + lVar271 * 4 + 0x18) =
                                             auVar364;
                                        auVar364 = vextractf32x4_avx512f(auVar404,3);
                                        *(undefined1 (*) [16])(*pauVar266 + lVar272 * 4 + 0x18) =
                                             auVar364;
                                      }
                                    }
                                    else if (iVar342 == 8) {
                                      *(undefined1 (*) [32])*pauVar266 = auVar401._0_32_;
                                      auVar393 = vextractf64x4_avx512f(auVar401,1);
                                      *(undefined1 (*) [32])(*pauVar266 + lVar296 * 4) = auVar393;
                                      if (iVar315 < iVar260) {
                                        *(undefined1 (*) [32])(*pauVar266 + 0x20) = auVar402._0_32_;
                                        auVar393 = vextractf64x4_avx512f(auVar402,1);
                                        *(undefined1 (*) [32])(*pauVar266 + lVar296 * 4 + 0x10) =
                                             auVar393;
                                      }
                                      if (iVar320 < iVar260) {
                                        *(undefined1 (*) [32])pauVar266[1] = auVar403._0_32_;
                                        auVar393 = vextractf64x4_avx512f(auVar403,1);
                                        *(undefined1 (*) [32])(*pauVar266 + lVar296 * 4 + 0x20) =
                                             auVar393;
                                      }
                                      if (iVar337 < iVar260) {
                                        *(undefined1 (*) [32])(pauVar266[1] + 0x20) =
                                             auVar404._0_32_;
                                        auVar393 = vextractf64x4_avx512f(auVar404,1);
                                        *(undefined1 (*) [32])(*pauVar266 + lVar296 * 4 + 0x30) =
                                             auVar393;
                                      }
                                    }
                                    else if (iVar342 == 0x10) {
                                      *pauVar266 = auVar401;
                                      if (iVar315 < iVar260) {
                                        pauVar266[1] = auVar402;
                                      }
                                      if (iVar320 < iVar260) {
                                        pauVar266[2] = auVar403;
                                      }
                                      if (iVar337 < iVar260) {
                                        pauVar266[3] = auVar404;
                                      }
                                    }
                                    pauVar266 = (undefined1 (*) [64])(*pauVar266 + lVar285 * 4);
                                  }
                                  pauVar302 = pauVar302 + 6;
                                }
                                lVar287 = lVar303 + 0x40;
                                local_f10 = uVar318;
                                local_d78 = lVar303;
                                uVar281 = uVar318 + 1;
                              }
                              uVar291 = uVar291 + iVar328 * 0x240;
                            }
                            local_f18 = (long)(iVar328 * 8);
                            local_ee8 = CONCAT44(iVar297 * 0xf >> 0x1f,iVar328 * 0x120);
                            lVar277 = (long)(iVar328 * 0x18) * 4;
                            local_ef8 = local_f18 * 4;
                            for (; (long)(uVar278 | 7) < local_e18; uVar278 = uVar278 + 8) {
                              if (local_df0 == (void *)0x0) {
                                auVar393 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                              }
                              else {
                                auVar393 = *(undefined1 (*) [32])((long)local_de8 + uVar278 * 4);
                              }
                              lVar295 = (long)(int)uVar291;
                              lVar279 = 0;
                              for (uVar281 = 0; uVar281 != local_ed0; uVar281 = uVar281 + 1) {
                                lVar280 = (long)local_dc8.data + lVar279;
                                for (lVar299 = -0xc0; lVar299 != 0; lVar299 = lVar299 + 0x20) {
                                  auVar376 = *(undefined1 (*) [32])
                                              (lVar280 + local_ef8 + lVar295 * 4);
                                  auVar14 = *(undefined1 (*) [32])
                                             (lVar280 + local_df8 + lVar295 * 4);
                                  auVar15 = *(undefined1 (*) [32])(lVar280 + lVar277 + lVar295 * 4);
                                  auVar387 = *(undefined1 (*) [32])
                                              (lVar280 + local_ee0 + lVar295 * 4);
                                  fVar534 = auVar14._0_4_ + auVar376._0_4_;
                                  fVar552 = auVar14._4_4_ + auVar376._4_4_;
                                  fVar553 = auVar14._8_4_ + auVar376._8_4_;
                                  fVar554 = auVar14._12_4_ + auVar376._12_4_;
                                  fVar555 = auVar14._16_4_ + auVar376._16_4_;
                                  fVar556 = auVar14._20_4_ + auVar376._20_4_;
                                  fVar557 = auVar14._24_4_ + auVar376._24_4_;
                                  fVar558 = auVar14._28_4_ + auVar376._28_4_;
                                  auVar582._0_4_ = auVar387._0_4_ + auVar15._0_4_;
                                  auVar582._4_4_ = auVar387._4_4_ + auVar15._4_4_;
                                  auVar582._8_4_ = auVar387._8_4_ + auVar15._8_4_;
                                  auVar582._12_4_ = auVar387._12_4_ + auVar15._12_4_;
                                  auVar582._16_4_ = auVar387._16_4_ + auVar15._16_4_;
                                  auVar582._20_4_ = auVar387._20_4_ + auVar15._20_4_;
                                  auVar582._24_4_ = auVar387._24_4_ + auVar15._24_4_;
                                  auVar582._28_4_ = auVar387._28_4_ + auVar15._28_4_;
                                  auVar376 = vsubps_avx(auVar376,auVar14);
                                  auVar14 = vsubps_avx(auVar15,auVar387);
                                  pfVar311 = (float *)(lVar280 + lVar295 * 4);
                                  auVar503._0_4_ = fVar534 + *pfVar311 + auVar582._0_4_;
                                  auVar503._4_4_ = fVar552 + pfVar311[1] + auVar582._4_4_;
                                  auVar503._8_4_ = fVar553 + pfVar311[2] + auVar582._8_4_;
                                  auVar503._12_4_ = fVar554 + pfVar311[3] + auVar582._12_4_;
                                  auVar503._16_4_ = fVar555 + pfVar311[4] + auVar582._16_4_;
                                  auVar503._20_4_ = fVar556 + pfVar311[5] + auVar582._20_4_;
                                  auVar503._24_4_ = fVar557 + pfVar311[6] + auVar582._24_4_;
                                  auVar503._28_4_ = fVar558 + pfVar311[7] + auVar582._28_4_;
                                  auVar251._4_4_ = auVar376._4_4_ * 0.70710677;
                                  auVar251._0_4_ = auVar376._0_4_ * 0.70710677;
                                  auVar251._8_4_ = auVar376._8_4_ * 0.70710677;
                                  auVar251._12_4_ = auVar376._12_4_ * 0.70710677;
                                  auVar251._16_4_ = auVar376._16_4_ * 0.70710677;
                                  auVar251._20_4_ = auVar376._20_4_ * 0.70710677;
                                  auVar251._24_4_ = auVar376._24_4_ * 0.70710677;
                                  auVar251._28_4_ = auVar387._28_4_;
                                  auVar363 = vfmadd231ps_fma(auVar251,auVar14,auVar647);
                                  auVar252._4_4_ = fVar552 * 0.5;
                                  auVar252._0_4_ = fVar534 * 0.5;
                                  auVar252._8_4_ = fVar553 * 0.5;
                                  auVar252._12_4_ = fVar554 * 0.5;
                                  auVar252._16_4_ = fVar555 * 0.5;
                                  auVar252._20_4_ = fVar556 * 0.5;
                                  auVar252._24_4_ = fVar557 * 0.5;
                                  auVar252._28_4_ = fVar558;
                                  auVar364 = vfmadd213ps_fma(auVar376,auVar717,
                                                             *(undefined1 (*) [32])
                                                              (lVar280 +
                                                              (long)(iVar328 * 0x28) * 4 +
                                                              lVar295 * 4));
                                  auVar362 = vfmadd231ps_fma(auVar252,auVar582,auVar694);
                                  auVar364 = vfmadd231ps_fma(ZEXT1632(auVar364),auVar14,auVar735);
                                  *(undefined1 (*) [32])((long)local_bc0 + lVar299) = auVar503;
                                  *(undefined1 (*) [32])((long)local_b00 + lVar299) =
                                       ZEXT1632(auVar363);
                                  *(undefined1 (*) [32])(auStack_a40 + lVar299) = ZEXT1632(auVar362)
                                  ;
                                  *(undefined1 (*) [32])(auStack_980 + lVar299) = ZEXT1632(auVar364)
                                  ;
                                  lVar280 = lVar280 + local_e10;
                                }
                                iVar337 = iVar261 + (int)uVar281;
                                iVar297 = iVar337 % iVar263;
                                uVar330 = iVar337 / iVar263 << 2;
                                pauVar306 = (undefined1 (*) [32])
                                            ((long)top_blob->data +
                                            (long)(iVar297 * 4 * iVar342) * 4 +
                                            (long)top_blob->w * top_blob->elemsize *
                                            (long)(int)uVar330 +
                                            (long)((iVar319 + (int)uVar278) / iVar342) *
                                            top_blob->cstep * top_blob->elemsize);
                                iVar337 = iVar297 * 4 + 1;
                                iVar315 = iVar297 * 4 + 2;
                                iVar297 = iVar297 * 4 + 3;
                                pfVar311 = afStack_be0;
                                for (lVar280 = 0; lVar280 != 4; lVar280 = lVar280 + 1) {
                                  if ((int)(uVar330 | (uint)lVar280) < iVar343) {
                                    auVar376 = *(undefined1 (*) [32])(pfVar311 + -0x20);
                                    auVar14 = *(undefined1 (*) [32])(pfVar311 + -0x18);
                                    auVar15 = *(undefined1 (*) [32])(pfVar311 + -0x10);
                                    auVar387 = *(undefined1 (*) [32])(pfVar311 + -8);
                                    auVar472._0_4_ = auVar14._0_4_ + auVar376._0_4_;
                                    auVar472._4_4_ = auVar14._4_4_ + auVar376._4_4_;
                                    auVar472._8_4_ = auVar14._8_4_ + auVar376._8_4_;
                                    auVar472._12_4_ = auVar14._12_4_ + auVar376._12_4_;
                                    auVar472._16_4_ = auVar14._16_4_ + auVar376._16_4_;
                                    auVar472._20_4_ = auVar14._20_4_ + auVar376._20_4_;
                                    auVar472._24_4_ = auVar14._24_4_ + auVar376._24_4_;
                                    auVar472._28_4_ = auVar14._28_4_ + auVar376._28_4_;
                                    auVar583._0_4_ = auVar387._0_4_ + auVar15._0_4_;
                                    auVar583._4_4_ = auVar387._4_4_ + auVar15._4_4_;
                                    auVar583._8_4_ = auVar387._8_4_ + auVar15._8_4_;
                                    auVar583._12_4_ = auVar387._12_4_ + auVar15._12_4_;
                                    auVar583._16_4_ = auVar387._16_4_ + auVar15._16_4_;
                                    auVar583._20_4_ = auVar387._20_4_ + auVar15._20_4_;
                                    auVar583._24_4_ = auVar387._24_4_ + auVar15._24_4_;
                                    auVar583._28_4_ = auVar387._28_4_ + auVar15._28_4_;
                                    auVar376 = vsubps_avx(auVar376,auVar14);
                                    auVar14 = vsubps_avx(auVar15,auVar387);
                                    auVar370._0_4_ =
                                         auVar393._0_4_ + pfVar311[-0x28] + auVar472._0_4_ +
                                         auVar583._0_4_;
                                    auVar370._4_4_ =
                                         auVar393._4_4_ + pfVar311[-0x27] + auVar472._4_4_ +
                                         auVar583._4_4_;
                                    auVar370._8_4_ =
                                         auVar393._8_4_ + pfVar311[-0x26] + auVar472._8_4_ +
                                         auVar583._8_4_;
                                    auVar370._12_4_ =
                                         auVar393._12_4_ + pfVar311[-0x25] + auVar472._12_4_ +
                                         auVar583._12_4_;
                                    auVar531._16_4_ =
                                         auVar393._16_4_ + pfVar311[-0x24] + auVar472._16_4_ +
                                         auVar583._16_4_;
                                    auVar531._0_16_ = auVar370;
                                    auVar531._20_4_ =
                                         auVar393._20_4_ + pfVar311[-0x23] + auVar472._20_4_ +
                                         auVar583._20_4_;
                                    auVar531._24_4_ =
                                         auVar393._24_4_ + pfVar311[-0x22] + auVar472._24_4_ +
                                         auVar583._24_4_;
                                    auVar531._28_4_ =
                                         auVar393._28_4_ + pfVar311[-0x21] + auVar472._28_4_ +
                                         auVar583._28_4_;
                                    auVar363 = vfmadd231ps_fma(auVar393,auVar376,auVar621);
                                    auVar364 = vfmadd132ps_fma(auVar472,auVar393,auVar670);
                                    auVar364 = vfmadd231ps_fma(ZEXT1632(auVar364),auVar583,auVar694)
                                    ;
                                    auVar438._0_4_ = auVar393._0_4_ + *pfVar311;
                                    auVar438._4_4_ = auVar393._4_4_ + pfVar311[1];
                                    auVar438._8_4_ = auVar393._8_4_ + pfVar311[2];
                                    auVar438._12_4_ = auVar393._12_4_ + pfVar311[3];
                                    auVar438._16_4_ = auVar393._16_4_ + pfVar311[4];
                                    auVar438._20_4_ = auVar393._20_4_ + pfVar311[5];
                                    auVar438._24_4_ = auVar393._24_4_ + pfVar311[6];
                                    auVar438._28_4_ = auVar393._28_4_ + pfVar311[7];
                                    auVar363 = vfmadd231ps_fma(ZEXT1632(auVar363),auVar14,auVar647);
                                    auVar362 = vfmadd231ps_fma(auVar438,auVar376,auVar717);
                                    auVar362 = vfmadd231ps_fma(ZEXT1632(auVar362),auVar14,auVar735);
                                    auVar361 = auVar531._16_16_;
                                    if (iVar342 == 1) {
                                      *(float *)*pauVar306 = auVar370._0_4_;
                                      uVar407 = vextractps_avx(auVar370,1);
                                      *(undefined4 *)(*pauVar306 + lVar296 * 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar370,2);
                                      *(undefined4 *)(*pauVar306 + lVar271 * 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar370,3);
                                      *(undefined4 *)(*pauVar306 + lVar272 * 4) = uVar407;
                                      *(float *)(*pauVar306 + lVar273 * 4) = auVar531._16_4_;
                                      uVar407 = vextractps_avx(auVar361,1);
                                      *(undefined4 *)(*pauVar306 + lVar274 * 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar361,2);
                                      *(undefined4 *)(*pauVar306 + lVar275 * 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar361,3);
                                      *(undefined4 *)(*pauVar306 + lVar276 * 4) = uVar407;
                                      if (iVar337 < iVar260) {
                                        *(int *)(*pauVar306 + 4) = auVar363._0_4_;
                                        uVar407 = vextractps_avx(auVar363,1);
                                        *(undefined4 *)(*pauVar306 + lVar296 * 4 + 4) = uVar407;
                                        uVar407 = vextractps_avx(auVar363,2);
                                        *(undefined4 *)(*pauVar306 + lVar271 * 4 + 4) = uVar407;
                                        uVar407 = vextractps_avx(auVar363,3);
                                        *(undefined4 *)(*pauVar306 + lVar272 * 4 + 4) = uVar407;
                                        *(undefined4 *)(*pauVar306 + lVar273 * 4 + 4) = 0;
                                        uVar407 = vextractps_avx((undefined1  [16])0x0,1);
                                        *(undefined4 *)(*pauVar306 + lVar274 * 4 + 4) = uVar407;
                                        uVar407 = vextractps_avx((undefined1  [16])0x0,2);
                                        *(undefined4 *)(*pauVar306 + lVar275 * 4 + 4) = uVar407;
                                        uVar407 = vextractps_avx((undefined1  [16])0x0,3);
                                        *(undefined4 *)(*pauVar306 + lVar276 * 4 + 4) = uVar407;
                                      }
                                      if (iVar315 < iVar260) {
                                        *(int *)(*pauVar306 + 8) = auVar364._0_4_;
                                        uVar407 = vextractps_avx(auVar364,1);
                                        *(undefined4 *)(*pauVar306 + lVar296 * 4 + 8) = uVar407;
                                        uVar407 = vextractps_avx(auVar364,2);
                                        *(undefined4 *)(*pauVar306 + lVar271 * 4 + 8) = uVar407;
                                        uVar407 = vextractps_avx(auVar364,3);
                                        *(undefined4 *)(*pauVar306 + lVar272 * 4 + 8) = uVar407;
                                        *(undefined4 *)(*pauVar306 + lVar273 * 4 + 8) = 0;
                                        uVar407 = vextractps_avx((undefined1  [16])0x0,1);
                                        *(undefined4 *)(*pauVar306 + lVar274 * 4 + 8) = uVar407;
                                        uVar407 = vextractps_avx((undefined1  [16])0x0,2);
                                        *(undefined4 *)(*pauVar306 + lVar275 * 4 + 8) = uVar407;
                                        uVar407 = vextractps_avx((undefined1  [16])0x0,3);
                                        *(undefined4 *)(*pauVar306 + lVar276 * 4 + 8) = uVar407;
                                      }
                                      if (iVar297 < iVar260) {
                                        *(int *)(*pauVar306 + 0xc) = auVar362._0_4_;
                                        uVar407 = vextractps_avx(auVar362,1);
                                        *(undefined4 *)(*pauVar306 + lVar296 * 4 + 0xc) = uVar407;
                                        uVar407 = vextractps_avx(auVar362,2);
                                        *(undefined4 *)(*pauVar306 + lVar271 * 4 + 0xc) = uVar407;
                                        uVar407 = vextractps_avx(auVar362,3);
                                        *(undefined4 *)(*pauVar306 + lVar272 * 4 + 0xc) = uVar407;
                                        *(undefined4 *)(*pauVar306 + lVar273 * 4 + 0xc) = 0;
                                        uVar407 = vextractps_avx((undefined1  [16])0x0,1);
                                        *(undefined4 *)(*pauVar306 + lVar274 * 4 + 0xc) = uVar407;
                                        uVar407 = vextractps_avx((undefined1  [16])0x0,2);
                                        *(undefined4 *)(*pauVar306 + lVar275 * 4 + 0xc) = uVar407;
                                        uVar407 = vextractps_avx((undefined1  [16])0x0,3);
                                        *(undefined4 *)(*pauVar306 + lVar276 * 4 + 0xc) = uVar407;
                                      }
                                    }
                                    else if (iVar342 == 4) {
                                      *(undefined1 (*) [16])*pauVar306 = auVar370;
                                      *(undefined1 (*) [16])(*pauVar306 + lVar296 * 4) = auVar361;
                                      if (iVar337 < iVar260) {
                                        *(undefined1 (*) [16])(*pauVar306 + 0x10) = auVar363;
                                        *(undefined1 (*) [16])(*pauVar306 + lVar296 * 4 + 0x10) =
                                             (undefined1  [16])0x0;
                                      }
                                      if (iVar315 < iVar260) {
                                        *(undefined1 (*) [16])pauVar306[1] = auVar364;
                                        *(undefined1 (*) [16])(pauVar306[1] + lVar296 * 4) =
                                             (undefined1  [16])0x0;
                                      }
                                      if (iVar297 < iVar260) {
                                        *(undefined1 (*) [16])(pauVar306[1] + 0x10) = auVar362;
                                        *(undefined1 (*) [16])(pauVar306[1] + lVar296 * 4 + 0x10) =
                                             (undefined1  [16])0x0;
                                      }
                                    }
                                    else if (iVar342 == 8) {
                                      *pauVar306 = auVar531;
                                      if (iVar337 < iVar260) {
                                        pauVar306[1] = ZEXT1632(auVar363);
                                      }
                                      if (iVar315 < iVar260) {
                                        pauVar306[2] = ZEXT1632(auVar364);
                                      }
                                      if (iVar297 < iVar260) {
                                        pauVar306[3] = ZEXT1632(auVar362);
                                      }
                                    }
                                    pauVar306 = (undefined1 (*) [32])(*pauVar306 + lVar285 * 4);
                                  }
                                  pfVar311 = pfVar311 + 0x30;
                                }
                                lVar279 = lVar279 + 0x20;
                              }
                              uVar291 = uVar291 + iVar328 * 0x120;
                            }
                            lVar273 = (long)(iVar328 * 4);
                            lVar274 = (long)(iVar328 * 0xc) * 4;
                            local_f08 = lVar273 * 4;
                            for (; (long)(uVar278 | 3) < local_e18; uVar278 = uVar278 + 4) {
                              if (local_df0 == (void *)0x0) {
                                auVar364 = (undefined1  [16])0x0;
                              }
                              else {
                                auVar364 = *(undefined1 (*) [16])((long)local_de8 + uVar278 * 4);
                              }
                              lVar275 = (long)(int)uVar291;
                              lVar276 = 0;
                              for (uVar281 = 0; uVar281 != local_ed0; uVar281 = uVar281 + 1) {
                                lVar279 = (long)local_dc8.data + lVar276;
                                lVar295 = -0x60;
                                while( true ) {
                                  if (lVar295 == 0) break;
                                  auVar363 = *(undefined1 (*) [16])
                                              (lVar279 + local_f08 + lVar275 * 4);
                                  auVar362 = *(undefined1 (*) [16])
                                              (lVar279 + local_ef8 + lVar275 * 4);
                                  auVar361 = *(undefined1 (*) [16])(lVar279 + lVar274 + lVar275 * 4)
                                  ;
                                  auVar365 = *(undefined1 (*) [16])
                                              (lVar279 + local_df8 + lVar275 * 4);
                                  auVar535._0_4_ = auVar362._0_4_ + auVar363._0_4_;
                                  auVar535._4_4_ = auVar362._4_4_ + auVar363._4_4_;
                                  auVar535._8_4_ = auVar362._8_4_ + auVar363._8_4_;
                                  auVar535._12_4_ = auVar362._12_4_ + auVar363._12_4_;
                                  auVar559._0_4_ = auVar365._0_4_ + auVar361._0_4_;
                                  auVar559._4_4_ = auVar365._4_4_ + auVar361._4_4_;
                                  auVar559._8_4_ = auVar365._8_4_ + auVar361._8_4_;
                                  auVar559._12_4_ = auVar365._12_4_ + auVar361._12_4_;
                                  auVar363 = vsubps_avx(auVar363,auVar362);
                                  auVar362 = vsubps_avx(auVar361,auVar365);
                                  pfVar311 = (float *)(lVar279 + lVar275 * 4);
                                  auVar478._0_4_ = auVar535._0_4_ + *pfVar311 + auVar559._0_4_;
                                  auVar478._4_4_ = auVar535._4_4_ + pfVar311[1] + auVar559._4_4_;
                                  auVar478._8_4_ = auVar535._8_4_ + pfVar311[2] + auVar559._8_4_;
                                  auVar478._12_4_ = auVar535._12_4_ + pfVar311[3] + auVar559._12_4_;
                                  auVar361 = vmulps_avx512vl(auVar363,auVar761._0_16_);
                                  auVar361 = vfmadd231ps_avx512vl(auVar361,auVar362,auVar762._0_16_)
                                  ;
                                  auVar365 = vmulps_avx512vl(auVar535,auVar360);
                                  auVar363 = vfmadd213ps_avx512vl
                                                       (auVar363,auVar763._0_16_,
                                                        *(undefined1 (*) [16])
                                                         (lVar279 +
                                                         (long)(iVar328 * 0x14) * 4 + lVar275 * 4));
                                  auVar365 = vfmadd231ps_avx512vl(auVar365,auVar559,auVar421);
                                  auVar363 = vfmadd231ps_avx512vl(auVar363,auVar362,auVar764._0_16_)
                                  ;
                                  *(undefined1 (*) [16])((long)afStack_c20 + lVar295) = auVar478;
                                  *(undefined1 (*) [16])((long)local_bc0 + lVar295) = auVar361;
                                  *(undefined1 (*) [16])(auStack_b60 + lVar295) = auVar365;
                                  *(undefined1 (*) [16])((long)local_b00 + lVar295) = auVar363;
                                  lVar295 = lVar295 + 0x10;
                                  lVar279 = lVar279 + lVar277;
                                }
                                iVar337 = iVar261 + (int)uVar281;
                                iVar297 = iVar337 % iVar263;
                                uVar330 = iVar337 / iVar263 << 2;
                                pauVar270 = (undefined1 (*) [16])
                                            ((long)top_blob->data +
                                            (long)(iVar297 * 4 * iVar342) * 4 +
                                            (long)top_blob->w * top_blob->elemsize *
                                            (long)(int)uVar330 +
                                            (long)((iVar319 + (int)uVar278) / iVar342) *
                                            top_blob->cstep * top_blob->elemsize);
                                iVar337 = iVar297 * 4 + 1;
                                iVar315 = iVar297 * 4 + 2;
                                iVar297 = iVar297 * 4 + 3;
                                pfVar311 = afStack_c38 + 2;
                                for (lVar295 = 0; lVar295 != 4; lVar295 = lVar295 + 1) {
                                  if ((int)(uVar330 | (uint)lVar295) < iVar343) {
                                    auVar363 = *(undefined1 (*) [16])(pfVar311 + -0x10);
                                    auVar362 = *(undefined1 (*) [16])(pfVar311 + -0xc);
                                    auVar361 = *(undefined1 (*) [16])(pfVar311 + -8);
                                    auVar365 = *(undefined1 (*) [16])(pfVar311 + -4);
                                    auVar445._0_4_ = auVar362._0_4_ + auVar363._0_4_;
                                    auVar445._4_4_ = auVar362._4_4_ + auVar363._4_4_;
                                    auVar445._8_4_ = auVar362._8_4_ + auVar363._8_4_;
                                    auVar445._12_4_ = auVar362._12_4_ + auVar363._12_4_;
                                    auVar560._0_4_ = auVar365._0_4_ + auVar361._0_4_;
                                    auVar560._4_4_ = auVar365._4_4_ + auVar361._4_4_;
                                    auVar560._8_4_ = auVar365._8_4_ + auVar361._8_4_;
                                    auVar560._12_4_ = auVar365._12_4_ + auVar361._12_4_;
                                    auVar363 = vsubps_avx(auVar363,auVar362);
                                    auVar362 = vsubps_avx(auVar361,auVar365);
                                    auVar506._0_4_ =
                                         auVar364._0_4_ + pfVar311[-0x14] + auVar445._0_4_ +
                                         auVar560._0_4_;
                                    auVar506._4_4_ =
                                         auVar364._4_4_ + pfVar311[-0x13] + auVar445._4_4_ +
                                         auVar560._4_4_;
                                    auVar506._8_4_ =
                                         auVar364._8_4_ + pfVar311[-0x12] + auVar445._8_4_ +
                                         auVar560._8_4_;
                                    auVar506._12_4_ =
                                         auVar364._12_4_ + pfVar311[-0x11] + auVar445._12_4_ +
                                         auVar560._12_4_;
                                    auVar361 = vfmadd231ps_avx512vl
                                                         (auVar364,auVar363,auVar761._0_16_);
                                    auVar365 = vfmadd132ps_avx512vl(auVar445,auVar364,auVar360);
                                    auVar365 = vfmadd231ps_avx512vl(auVar365,auVar560,auVar421);
                                    auVar366._0_4_ = auVar364._0_4_ + *pfVar311;
                                    auVar366._4_4_ = auVar364._4_4_ + pfVar311[1];
                                    auVar366._8_4_ = auVar364._8_4_ + pfVar311[2];
                                    auVar366._12_4_ = auVar364._12_4_ + pfVar311[3];
                                    auVar361 = vfmadd231ps_avx512vl
                                                         (auVar361,auVar362,auVar762._0_16_);
                                    auVar363 = vfmadd231ps_avx512vl
                                                         (auVar366,auVar363,auVar763._0_16_);
                                    auVar363 = vfmadd231ps_avx512vl
                                                         (auVar363,auVar362,auVar764._0_16_);
                                    if (iVar342 == 1) {
                                      *(float *)*pauVar270 = auVar506._0_4_;
                                      uVar407 = vextractps_avx(auVar506,1);
                                      *(undefined4 *)(*pauVar270 + lVar296 * 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar506,2);
                                      *(undefined4 *)(*pauVar270 + lVar271 * 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar506,3);
                                      *(undefined4 *)(*pauVar270 + lVar272 * 4) = uVar407;
                                      if (iVar337 < iVar260) {
                                        *(int *)(*pauVar270 + 4) = auVar361._0_4_;
                                        uVar407 = vextractps_avx(auVar361,1);
                                        *(undefined4 *)(*pauVar270 + lVar296 * 4 + 4) = uVar407;
                                        uVar407 = vextractps_avx(auVar361,2);
                                        *(undefined4 *)(*pauVar270 + lVar271 * 4 + 4) = uVar407;
                                        uVar407 = vextractps_avx(auVar361,3);
                                        *(undefined4 *)(*pauVar270 + lVar272 * 4 + 4) = uVar407;
                                      }
                                      if (iVar315 < iVar260) {
                                        *(int *)(*pauVar270 + 8) = auVar365._0_4_;
                                        uVar407 = vextractps_avx(auVar365,1);
                                        *(undefined4 *)(*pauVar270 + lVar296 * 4 + 8) = uVar407;
                                        uVar407 = vextractps_avx(auVar365,2);
                                        *(undefined4 *)(*pauVar270 + lVar271 * 4 + 8) = uVar407;
                                        uVar407 = vextractps_avx(auVar365,3);
                                        *(undefined4 *)(*pauVar270 + lVar272 * 4 + 8) = uVar407;
                                      }
                                      if (iVar297 < iVar260) {
                                        *(int *)(*pauVar270 + 0xc) = auVar363._0_4_;
                                        uVar407 = vextractps_avx(auVar363,1);
                                        *(undefined4 *)(*pauVar270 + lVar296 * 4 + 0xc) = uVar407;
                                        uVar407 = vextractps_avx(auVar363,2);
                                        *(undefined4 *)(*pauVar270 + lVar271 * 4 + 0xc) = uVar407;
                                        uVar407 = vextractps_avx(auVar363,3);
                                        *(undefined4 *)(*pauVar270 + lVar272 * 4 + 0xc) = uVar407;
                                      }
                                    }
                                    else if (iVar342 == 4) {
                                      *pauVar270 = auVar506;
                                      if (iVar337 < iVar260) {
                                        pauVar270[1] = auVar361;
                                      }
                                      if (iVar315 < iVar260) {
                                        pauVar270[2] = auVar365;
                                      }
                                      if (iVar297 < iVar260) {
                                        pauVar270[3] = auVar363;
                                      }
                                    }
                                    pauVar270 = (undefined1 (*) [16])(*pauVar270 + lVar285 * 4);
                                  }
                                  pfVar311 = pfVar311 + 0x18;
                                }
                                lVar276 = lVar276 + 0x10;
                              }
                              uVar291 = uVar291 + iVar328 * 0x90;
                            }
                            for (; (long)(uVar278 | 1) < local_e18; uVar278 = uVar278 + 2) {
                              lVar271 = uVar278 + local_de0;
                              if (local_df0 == (void *)0x0) {
                                auVar364 = (undefined1  [16])0x0;
                                auVar363 = (undefined1  [16])0x0;
                              }
                              else {
                                auVar364 = ZEXT416(*(uint *)((long)local_df0 + lVar271 * 4));
                                auVar363 = ZEXT416(*(uint *)((long)local_df0 + lVar271 * 4 + 4));
                              }
                              iVar342 = top_blob->w;
                              sVar765 = top_blob->cstep;
                              sVar18 = top_blob->elemsize;
                              pvVar348 = top_blob->data;
                              puVar310 = (undefined8 *)
                                         ((long)(int)uVar291 * 4 + (long)local_dc8.data);
                              for (uVar281 = 0; uVar281 != local_ed0; uVar281 = uVar281 + 1) {
                                puVar283 = puVar310;
                                for (lVar272 = -6; lVar272 != 0; lVar272 = lVar272 + 1) {
                                  uVar318 = *(ulong *)((long)puVar283 + (long)(iVar328 * 2) * 4);
                                  auVar446._8_8_ = 0;
                                  auVar446._0_8_ = uVar318;
                                  uVar268 = *(ulong *)((long)puVar283 + lVar273 * 4);
                                  auVar479._8_8_ = 0;
                                  auVar479._0_8_ = uVar268;
                                  auVar507._0_4_ = (float)uVar268 + (float)uVar318;
                                  auVar507._4_4_ =
                                       (float)(uVar268 >> 0x20) + (float)(uVar318 >> 0x20);
                                  auVar507._8_8_ = 0;
                                  uVar318 = *(ulong *)((long)puVar283 + (long)(iVar328 * 6) * 4);
                                  auVar536._8_8_ = 0;
                                  auVar536._0_8_ = uVar318;
                                  uVar268 = *(ulong *)((long)puVar283 + local_f18 * 4);
                                  auVar561._8_8_ = 0;
                                  auVar561._0_8_ = uVar268;
                                  auVar586._0_4_ = (float)uVar268 + (float)uVar318;
                                  auVar586._4_4_ =
                                       (float)(uVar268 >> 0x20) + (float)(uVar318 >> 0x20);
                                  auVar586._8_8_ = 0;
                                  auVar608._0_4_ =
                                       auVar586._0_4_ + auVar507._0_4_ + (float)*puVar283;
                                  auVar608._4_4_ =
                                       auVar586._4_4_ + auVar507._4_4_ +
                                       (float)((ulong)*puVar283 >> 0x20);
                                  auVar608._8_8_ = 0;
                                  uVar408 = vmovlps_avx(auVar608);
                                  *(undefined8 *)(&fStack_c50 + lVar272 * 2) = uVar408;
                                  auVar362 = vinsertps_avx(auVar536,auVar446,0x50);
                                  auVar361 = vinsertps_avx(auVar561,auVar479,0x50);
                                  auVar365 = vsubps_avx(auVar362,auVar361);
                                  auVar362 = vinsertps_avx(auVar446,auVar536,0x50);
                                  auVar361 = vinsertps_avx(auVar479,auVar561,0x50);
                                  auVar362 = vsubps_avx(auVar362,auVar361);
                                  auVar480._0_4_ = auVar365._0_4_ * 1.4142135;
                                  auVar480._4_4_ = auVar365._4_4_ * 0.70710677;
                                  auVar480._8_4_ = auVar365._8_4_ * 0.0;
                                  auVar480._12_4_ = auVar365._12_4_ * 0.0;
                                  auVar361 = vfmadd231ps_fma(auVar480,auVar362,_DAT_005391e0);
                                  uVar408 = vmovlps_avx(auVar361);
                                  *(undefined8 *)(afStack_c20 + lVar272 * 2) = uVar408;
                                  auVar361 = vmulps_avx512vl(auVar507,auVar360);
                                  auVar361 = vfmadd231ps_avx512vl(auVar361,auVar586,auVar421);
                                  uVar408 = vmovlps_avx(auVar361);
                                  *(undefined8 *)(local_c00 + (lVar272 + 2) * 2) = uVar408;
                                  auVar481._8_8_ = 0;
                                  auVar481._0_8_ =
                                       *(ulong *)((long)puVar283 + (long)(iVar328 * 10) * 4);
                                  auVar361 = vfmadd231ps_fma(auVar481,auVar365,_DAT_005391f0);
                                  auVar362 = vfmadd231ps_fma(auVar361,auVar362,_DAT_00539200);
                                  uVar408 = vmovlps_avx(auVar362);
                                  *(undefined8 *)(local_bc0 + lVar272 * 2) = uVar408;
                                  puVar283 = (undefined8 *)((long)puVar283 + lVar274);
                                }
                                iVar319 = iVar261 + (int)uVar281;
                                iVar297 = iVar319 % iVar263;
                                uVar330 = iVar319 / iVar263 << 2;
                                pfVar311 = (float *)((long)pvVar348 +
                                                    (long)(iVar297 * 4) * 4 +
                                                    (long)(int)uVar330 * (long)iVar342 * sVar18 +
                                                    lVar271 * sVar765 * sVar18);
                                pfVar288 = &fStack_c54;
                                for (lVar272 = 0; lVar272 != 4; lVar272 = lVar272 + 1) {
                                  if ((int)(uVar330 | (uint)lVar272) < iVar343) {
                                    fVar534 = pfVar288[-5];
                                    fVar552 = pfVar288[-4];
                                    fVar553 = pfVar288[-3];
                                    fVar554 = pfVar288[-2];
                                    fVar558 = pfVar288[-7] + pfVar288[-9];
                                    fVar1 = pfVar288[-6] + pfVar288[-8];
                                    fVar20 = fVar553 + fVar534;
                                    fVar21 = fVar554 + fVar552;
                                    fVar555 = pfVar288[-10];
                                    auVar367 = ZEXT416((uint)(pfVar288[-9] - pfVar288[-7]));
                                    auVar362 = vfmadd213ss_fma(ZEXT416(0x3eb504f3),auVar367,auVar364
                                                              );
                                    fVar556 = pfVar288[-1];
                                    auVar366 = ZEXT416((uint)(pfVar288[-8] - pfVar288[-6]));
                                    auVar361 = vfmadd213ss_fma(ZEXT416(0x3eb504f3),auVar366,auVar363
                                                              );
                                    fVar557 = *pfVar288;
                                    *pfVar311 = auVar364._0_4_ + pfVar288[-0xb] + fVar558 + fVar20;
                                    pfVar311[lVar296] = auVar363._0_4_ + fVar555 + fVar1 + fVar21;
                                    auVar370 = ZEXT416((uint)(fVar552 - fVar554));
                                    auVar365 = ZEXT416((uint)(fVar534 - fVar553));
                                    if (iVar297 * 4 + 1 < iVar260) {
                                      auVar366 = vfmadd213ss_fma(auVar366,SUB6416(ZEXT464(0x3f3504f3
                                                                                         ),0),
                                                                 auVar363);
                                      auVar369 = vfmadd231ss_fma(auVar366,auVar370,
                                                                 SUB6416(ZEXT464(0x3fb504f3),0));
                                      auVar366 = vfmadd213ss_fma(auVar367,SUB6416(ZEXT464(0x3f3504f3
                                                                                         ),0),
                                                                 auVar364);
                                      auVar366 = vfmadd231ss_fma(auVar366,auVar365,
                                                                 SUB6416(ZEXT464(0x3fb504f3),0));
                                      pfVar311[1] = auVar366._0_4_;
                                      pfVar311[lVar296 + 1] = auVar369._0_4_;
                                    }
                                    if (iVar297 * 4 + 2 < iVar260) {
                                      auVar366 = vfmadd213ss_avx512f(ZEXT416((uint)fVar558),
                                                                     ZEXT416(0x3f000000),auVar364);
                                      auVar366 = vfmadd213ss_avx512f(ZEXT416((uint)fVar20),
                                                                     ZEXT416(0x40000000),auVar366);
                                      auVar367 = vfmadd213ss_avx512f(ZEXT416((uint)fVar1),
                                                                     ZEXT416(0x3f000000),auVar363);
                                      auVar367 = vfmadd213ss_avx512f(ZEXT416((uint)fVar21),
                                                                     ZEXT416(0x40000000),auVar367);
                                      pfVar311[2] = auVar366._0_4_;
                                      pfVar311[lVar296 + 2] = auVar367._0_4_;
                                    }
                                    if (iVar297 * 4 + 3 < iVar260) {
                                      auVar362 = vfmadd213ss_avx512f(auVar365,ZEXT416(0x403504f3),
                                                                     ZEXT416((uint)(auVar362._0_4_ +
                                                                                   fVar556)));
                                      auVar361 = vfmadd213ss_avx512f(auVar370,ZEXT416(0x403504f3),
                                                                     ZEXT416((uint)(auVar361._0_4_ +
                                                                                   fVar557)));
                                      pfVar311[3] = auVar362._0_4_;
                                      pfVar311[lVar296 + 3] = auVar361._0_4_;
                                    }
                                    pfVar311 = pfVar311 + iVar260;
                                  }
                                  pfVar288 = pfVar288 + 0xc;
                                }
                                puVar310 = puVar310 + 1;
                              }
                              uVar291 = uVar291 + iVar328 * 0x48;
                            }
                            for (; local_f00 = (ulong)uVar291, (long)uVar278 < local_e18;
                                uVar278 = uVar278 + 1) {
                              if (local_df0 == (void *)0x0) {
                                auVar360 = (undefined1  [16])0x0;
                              }
                              else {
                                auVar360 = ZEXT416(*(uint *)((long)local_df0 +
                                                            (uVar278 + local_de0) * 4));
                              }
                              iVar342 = top_blob->w;
                              sVar765 = top_blob->cstep;
                              sVar18 = top_blob->elemsize;
                              pvVar348 = top_blob->data;
                              pfVar311 = (float *)((long)(int)uVar291 * 4 + (long)local_dc8.data);
                              for (uVar281 = 0; uVar281 != local_ed0; uVar281 = uVar281 + 1) {
                                lVar271 = -6;
                                pfVar288 = pfVar311;
                                while( true ) {
                                  if (lVar271 == 0) break;
                                  fVar553 = pfVar288[iVar328 * 2] + pfVar288[iVar328];
                                  fVar534 = pfVar288[iVar328 * 3];
                                  fVar552 = pfVar288[lVar273];
                                  fVar554 = fVar552 + fVar534;
                                  fVar555 = pfVar288[iVar328] - pfVar288[iVar328 * 2];
                                  afStack_c68[lVar271] = fVar553 + *pfVar288 + fVar554;
                                  auVar364 = ZEXT416((uint)(fVar534 - fVar552));
                                  auVar421 = vfmadd231ss_fma(ZEXT416((uint)(fVar555 * 0.70710677)),
                                                             auVar364,SUB6416(ZEXT464(0x3fb504f3),0)
                                                            );
                                  (&fStack_c50)[lVar271] = auVar421._0_4_;
                                  auVar421 = vmulss_avx512f(ZEXT416((uint)fVar553),
                                                            ZEXT416(0x3f000000));
                                  auVar421 = vfmadd231ss_avx512f(auVar421,ZEXT416((uint)fVar554),
                                                                 ZEXT416(0x40000000));
                                  afStack_c38[lVar271] = auVar421._0_4_;
                                  auVar421 = vfmadd213ss_avx512f(ZEXT416((uint)fVar555),
                                                                 ZEXT416(0x3eb504f3),
                                                                 ZEXT416((uint)pfVar288[iVar328 * 5]
                                                                        ));
                                  auVar421 = vfmadd231ss_avx512f(auVar421,auVar364,
                                                                 ZEXT416(0x403504f3));
                                  afStack_c20[lVar271] = auVar421._0_4_;
                                  lVar271 = lVar271 + 1;
                                  pfVar288 = pfVar288 + iVar328 * 6;
                                }
                                iVar319 = iVar261 + (int)uVar281;
                                iVar297 = iVar319 % iVar263;
                                uVar330 = iVar319 / iVar263 << 2;
                                pfVar288 = (float *)((long)pvVar348 +
                                                    (long)(iVar297 * 4) * 4 +
                                                    (long)(int)uVar330 * (long)iVar342 * sVar18 +
                                                    (uVar278 + local_de0) * sVar765 * sVar18);
                                pfVar334 = (float *)((long)&uStack_c70 + 4);
                                for (lVar271 = 0; lVar271 != 4; lVar271 = lVar271 + 1) {
                                  if ((int)(uVar330 | (uint)lVar271) < iVar343) {
                                    fVar534 = pfVar334[-3] + pfVar334[-4];
                                    fVar552 = pfVar334[-1] + pfVar334[-2];
                                    auVar421 = vfmadd132ss_avx512f(ZEXT416((uint)fVar534),auVar360,
                                                                   ZEXT416(0x3f000000));
                                    auVar363 = ZEXT416((uint)(pfVar334[-4] - pfVar334[-3]));
                                    auVar364 = vfmadd231ss_avx512f(auVar360,auVar363,
                                                                   ZEXT416(0x3eb504f3));
                                    auVar421 = vfmadd231ss_avx512f(auVar421,ZEXT416((uint)fVar552),
                                                                   ZEXT416(0x40000000));
                                    auVar362 = ZEXT416((uint)(pfVar334[-2] - pfVar334[-1]));
                                    auVar364 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar364._0_4_ +
                                                                                 *pfVar334)),
                                                                   auVar362,ZEXT416(0x403504f3));
                                    *pfVar288 = auVar360._0_4_ + pfVar334[-5] + fVar534 + fVar552;
                                    if (iVar297 * 4 + 1 < iVar260) {
                                      auVar363 = vfmadd132ss_fma(auVar363,auVar360,
                                                                 SUB6416(ZEXT464(0x3f3504f3),0));
                                      auVar363 = vfmadd231ss_fma(auVar363,auVar362,
                                                                 SUB6416(ZEXT464(0x3fb504f3),0));
                                      pfVar288[1] = auVar363._0_4_;
                                    }
                                    if (iVar297 * 4 + 2 < iVar260) {
                                      pfVar288[2] = auVar421._0_4_;
                                    }
                                    if (iVar297 * 4 + 3 < iVar260) {
                                      pfVar288[3] = auVar364._0_4_;
                                    }
                                    pfVar288 = pfVar288 + iVar260;
                                  }
                                  pfVar334 = pfVar334 + 6;
                                }
                                pfVar311 = pfVar311 + 1;
                              }
                              uVar291 = uVar291 + iVar328 * 0x24;
                            }
                            uVar278 = (ulong)(uint)((int)local_d80 + iVar261);
                          }
                          if (local_dc8.refcount != (int *)0x0) {
                            LOCK();
                            *local_dc8.refcount = *local_dc8.refcount + -1;
                            UNLOCK();
                            if (*local_dc8.refcount == 0) {
                              if (local_dc8.allocator == (Allocator *)0x0) {
                                free(local_dc8.data);
                              }
                              else {
                                (*(local_dc8.allocator)->_vptr_Allocator[3])();
                              }
                            }
                          }
                          uVar278 = local_d18 + 1;
                        }
                      }
                      piVar267 = (int *)CONCAT44(local_ec0.refcount._4_4_,local_ec0.refcount._0_4_);
                      if (piVar267 != (int *)0x0) {
                        LOCK();
                        *piVar267 = *piVar267 + -1;
                        UNLOCK();
                        if (*piVar267 == 0) {
                          if (local_ec0.allocator == (Allocator *)0x0) {
                            free(local_ec0.data);
                          }
                          else {
                            (*(local_ec0.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                    }
                  }
                }
                piVar267 = (int *)CONCAT44(uStack_e54,fStack_e58);
                if (piVar267 != (int *)0x0) {
                  LOCK();
                  *piVar267 = *piVar267 + -1;
                  UNLOCK();
                  if (*piVar267 == 0) {
                    if (local_e40 == (Allocator *)0x0) goto LAB_00185ff0;
                    (*local_e40->_vptr_Allocator[3])();
                  }
                }
                goto LAB_00185ffe;
              }
              if (bVar253) {
                uVar336 = top_blob->elempack * top_blob->c;
                uVar281 = (ulong)uVar336;
                uVar338 = ((top_blob->h + 5) / 6) * ((top_blob->w + 5) / 6);
                uVar318 = (ulong)uVar338;
                uVar330 = local_d70.elempack * local_d70.c;
                uVar278 = (ulong)uVar330;
                get_optimal_tile_mnk
                          (uVar336,uVar338,uVar330,&local_f1c,(int *)&local_f20,&local_ec4,iVar342);
                iVar261 = local_ec4;
                uVar291 = local_f20;
                local_d08 = (int)(uVar336 + local_f1c + -1) / local_f1c;
                iVar260 = (int)(local_f20 + uVar338 + -1) / (int)local_f20;
                uVar330 = (int)(uVar330 + local_ec4 + -1) / local_ec4;
                local_e20 = 0;
                iVar328 = local_ec4 * local_f20;
                local_e60 = (undefined1  [8])0x0;
                fStack_e58 = 0.0;
                uStack_e54 = 0;
                local_e50 = 0;
                uStack_e4f = 0;
                local_e48 = 0.0;
                local_e40 = (Allocator *)0x0;
                iStack_e38 = 0;
                fStack_e34 = 0.0;
                fStack_e30 = 0.0;
                iStack_e2c = 0;
                iStack_e28 = 0;
                uVar268 = (ulong)uVar330;
                Mat::create((Mat *)local_e60,iVar328,0x40,uVar330,iVar260,4,opt->workspace_allocator
                           );
                iVar263 = -100;
                local_dd0 = uVar278;
                local_d00 = uVar318;
                local_c88 = uVar281;
                if ((local_e60 != (undefined1  [8])0x0) && ((long)iStack_e28 * local_e20 != 0)) {
                  iVar260 = iVar260 * (int)uVar268;
                  iVar328 = iVar328 * 0x40;
                  if ((iVar342 < 2) || (iVar342 <= iVar260)) {
                    local_c40 = 0;
                    local_c80 = (undefined1  [8])0x0;
                    afStack_c78[0] = 0.0;
                    afStack_c78[1] = 0.0;
                    uStack_c70 = 0;
                    afStack_c68[0] = 0.0;
                    pAStack_c60 = (Allocator *)0x0;
                    iStack_c58 = 0;
                    fStack_c54 = 0.0;
                    fStack_c50 = 0.0;
                    iStack_c4c = 0;
                    iStack_c48 = 0;
                    Mat::create((Mat *)local_c80,iVar328,1,iVar342,4,opt->workspace_allocator);
                    if ((local_c80 != (undefined1  [8])0x0) && ((long)iStack_c48 * local_c40 != 0))
                    {
                      iVar328 = 0;
                      if (iVar260 < 1) {
                        iVar260 = iVar328;
                      }
                      for (; iVar260 != iVar328; iVar328 = iVar328 + 1) {
                        iVar343 = iVar328 / (int)uVar268;
                        uVar336 = iVar328 % (int)uVar268;
                        iVar263 = iVar343 * uVar291;
                        iVar297 = uVar336 * iVar261;
                        uVar330 = (int)local_d00 - iVar263;
                        if ((int)uVar291 < (int)uVar330) {
                          uVar330 = uVar291;
                        }
                        iVar319 = (int)local_dd0 - iVar297;
                        if (iVar261 < iVar319) {
                          iVar319 = iVar261;
                        }
                        iVar337 = get_omp_thread_num();
                        local_ec0.data =
                             (void *)((long)iVar337 * local_c40 * uStack_c70 + (long)local_c80);
                        local_ec0.refcount._0_4_ = 0;
                        local_ec0.refcount._4_4_ = 0;
                        local_ec0.elemsize = uStack_c70;
                        local_ec0.elempack = (int)afStack_c68[0];
                        local_ec0.allocator = pAStack_c60;
                        local_ec0.w = (int)fStack_c54;
                        local_ec0.h = (int)fStack_c50;
                        local_ec0.d = 1;
                        local_ec0.c = iStack_c4c;
                        local_ec0.dims = iStack_c58 + -1;
                        local_ec0.cstep =
                             (uStack_c70 * (long)(int)fStack_c50 * (long)(int)fStack_c54 + 0xf &
                             0xfffffffffffffff0) / uStack_c70;
                        if (iStack_c58 == 4) {
                          local_ec0.cstep = (long)(int)fStack_c50 * (long)(int)fStack_c54;
                        }
                        conv3x3s1_winograd63_transform_input_tile
                                  (&local_d70,&local_ec0,iVar263,uVar330,iVar297,iVar319,
                                   (int)uVar268);
                        local_dc8.elemsize = CONCAT71(uStack_e4f,local_e50);
                        local_dc8.cstep = (long)(int)fStack_e30 * (long)(int)fStack_e34;
                        local_dc8.data =
                             (void *)((long)local_e60 +
                                     uVar336 * local_dc8.elemsize * local_dc8.cstep +
                                     (long)iVar343 * local_e20 * local_dc8.elemsize);
                        local_dc8.refcount = (int *)0x0;
                        local_dc8.elempack = (int)local_e48;
                        local_dc8.allocator = local_e40;
                        local_dc8.dims = 2;
                        local_dc8.w = (int)fStack_e34;
                        local_dc8.h = (int)fStack_e30;
                        local_dc8.d = 1;
                        local_dc8.c = 1;
                        transpose_pack_B_tile
                                  (&local_ec0,&local_dc8,0x40,uVar330,iVar319,(int)local_dc8.cstep);
                      }
                      piVar267 = (int *)CONCAT44(afStack_c78[1],afStack_c78[0]);
                      if (piVar267 != (int *)0x0) {
                        LOCK();
                        *piVar267 = *piVar267 + -1;
                        UNLOCK();
                        if (*piVar267 == 0) {
                          if (pAStack_c60 == (Allocator *)0x0) goto LAB_00186089;
                          (*pAStack_c60->_vptr_Allocator[3])();
                        }
                      }
                      goto LAB_00186091;
                    }
                    piVar267 = (int *)CONCAT44(afStack_c78[1],afStack_c78[0]);
                    if (piVar267 != (int *)0x0) {
                      LOCK();
                      *piVar267 = *piVar267 + -1;
                      UNLOCK();
                      if (*piVar267 == 0) {
                        if (pAStack_c60 == (Allocator *)0x0) goto LAB_00185fad;
                        (*pAStack_c60->_vptr_Allocator[3])();
                      }
                    }
                  }
                  else {
                    local_c40 = 0;
                    local_c80 = (undefined1  [8])0x0;
                    afStack_c78[0] = 0.0;
                    afStack_c78[1] = 0.0;
                    uStack_c70 = 0;
                    afStack_c68[0] = 0.0;
                    pAStack_c60 = (Allocator *)0x0;
                    iStack_c58 = 0;
                    fStack_c54 = 0.0;
                    fStack_c50 = 0.0;
                    iStack_c4c = 0;
                    iStack_c48 = 0;
                    Mat::create((Mat *)local_c80,iVar328,4,opt->workspace_allocator);
                    if ((local_c80 == (undefined1  [8])0x0) || ((long)iStack_c48 * local_c40 == 0))
                    {
                      piVar267 = (int *)CONCAT44(afStack_c78[1],afStack_c78[0]);
                      if (piVar267 != (int *)0x0) {
                        LOCK();
                        *piVar267 = *piVar267 + -1;
                        UNLOCK();
                        if (*piVar267 == 0) {
                          if (pAStack_c60 == (Allocator *)0x0) {
LAB_00185fad:
                            free((void *)local_c80);
                          }
                          else {
                            (*pAStack_c60->_vptr_Allocator[3])();
                          }
                        }
                      }
                    }
                    else {
                      iVar328 = 0;
                      if (iVar260 < 1) {
                        iVar260 = iVar328;
                      }
                      for (; iVar260 != iVar328; iVar328 = iVar328 + 1) {
                        iVar297 = (int)uVar268;
                        iVar343 = (iVar328 / iVar297) * uVar291;
                        iVar263 = (int)((long)iVar328 % (long)iVar297) * iVar261;
                        uVar330 = (int)local_d00 - iVar343;
                        if ((int)uVar291 < (int)uVar330) {
                          uVar330 = uVar291;
                        }
                        iVar319 = (int)local_dd0 - iVar263;
                        if (iVar261 < iVar319) {
                          iVar319 = iVar261;
                        }
                        conv3x3s1_winograd63_transform_input_tile
                                  (&local_d70,(Mat *)local_c80,iVar343,uVar330,iVar263,iVar319,
                                   iVar297);
                        local_ec0.elemsize = CONCAT71(uStack_e4f,local_e50);
                        local_ec0.cstep = (long)(int)fStack_e30 * (long)(int)fStack_e34;
                        local_ec0.data =
                             (void *)((long)local_e60 +
                                     ((long)iVar328 % (long)iVar297 & 0xffffffffU) *
                                     local_ec0.elemsize * local_ec0.cstep +
                                     (long)(iVar328 / iVar297) * local_e20 * local_ec0.elemsize);
                        local_ec0.refcount._0_4_ = 0;
                        local_ec0.refcount._4_4_ = 0;
                        local_ec0.elempack = (int)local_e48;
                        local_ec0.allocator = local_e40;
                        local_ec0.dims = 2;
                        local_ec0.w = (int)fStack_e34;
                        local_ec0.h = (int)fStack_e30;
                        local_ec0.d = 1;
                        local_ec0.c = 1;
                        transpose_pack_B_tile
                                  ((Mat *)local_c80,&local_ec0,0x40,uVar330,iVar319,
                                   (int)local_ec0.cstep);
                      }
                      piVar267 = (int *)CONCAT44(afStack_c78[1],afStack_c78[0]);
                      if (piVar267 != (int *)0x0) {
                        LOCK();
                        *piVar267 = *piVar267 + -1;
                        UNLOCK();
                        if (*piVar267 == 0) {
                          if (pAStack_c60 == (Allocator *)0x0) {
LAB_00186089:
                            free((void *)local_c80);
                          }
                          else {
                            (*pAStack_c60->_vptr_Allocator[3])();
                          }
                        }
                      }
LAB_00186091:
                      local_ec0.cstep = 0;
                      local_ec0.data = (void *)0x0;
                      local_ec0.refcount._0_4_ = 0;
                      local_ec0.refcount._4_4_ = 0;
                      local_ec0.elemsize = 0;
                      local_ec0.elempack = 0;
                      local_ec0.allocator = (Allocator *)0x0;
                      local_ec0.dims = 0;
                      local_ec0.w = 0;
                      local_ec0.h = 0;
                      local_ec0.d = 0;
                      local_ec0.c = 0;
                      Mat::create(&local_ec0,local_f20 * local_f1c * 0x40,1,iVar342,4,
                                  opt->workspace_allocator);
                      iVar263 = -100;
                      if ((local_ec0.data != (void *)0x0) &&
                         ((long)local_ec0.c * local_ec0.cstep != 0)) {
                        if (local_d08 < 1) {
                          local_d08 = 0;
                        }
                        iVar260 = 0;
                        while (iVar342 = local_f1c, iVar263 = 0, iVar260 != local_d08) {
                          local_ce4 = iVar260;
                          iVar260 = get_omp_thread_num();
                          local_dc8.data =
                               (void *)((long)iVar260 * local_ec0.cstep * local_ec0.elemsize +
                                       (long)local_ec0.data);
                          local_dc8.refcount = (int *)0x0;
                          local_dc8.elemsize = local_ec0.elemsize;
                          local_dc8.elempack = local_ec0.elempack;
                          local_dc8.allocator = local_ec0.allocator;
                          local_dc8.w = local_ec0.w;
                          local_dc8.h = local_ec0.h;
                          local_dc8.c = local_ec0.d;
                          local_dc8.d = 1;
                          local_dc8.dims = local_ec0.dims + -1;
                          local_dc8.cstep =
                               (local_ec0.elemsize * (long)local_ec0.h * (long)local_ec0.w + 0xf &
                               0xfffffffffffffff0) / local_ec0.elemsize;
                          if (local_ec0.dims == 4) {
                            local_dc8.cstep = (long)local_ec0.h * (long)local_ec0.w;
                          }
                          uVar291 = iVar342 * local_ce4;
                          local_d80 = (ulong)uVar291;
                          local_cd8 = (int)local_c88 - uVar291;
                          if (iVar342 < local_cd8) {
                            local_cd8 = iVar342;
                          }
                          local_e00 = (ulong)(int)uVar291;
                          local_de8 = (void *)(long)local_cd8;
                          uVar291 = 0;
                          auVar399 = vbroadcastss_avx512f(ZEXT416(0x42000000));
                          auVar395 = vbroadcastss_avx512f(ZEXT416(0x40000000));
                          auVar397 = vbroadcastss_avx512f(ZEXT416(0x41800000));
                          auVar396 = vbroadcastss_avx512f(ZEXT416(0x40800000));
                          auVar394 = vbroadcastss_avx512f(ZEXT416(0x41000000));
                          while( true ) {
                            iVar342 = local_ec4;
                            iVar260 = local_f1c;
                            uVar330 = (int)local_d00 - uVar291;
                            if (uVar330 == 0 || (int)local_d00 < (int)uVar291) break;
                            uVar278 = (ulong)local_f20;
                            if ((int)local_f20 < (int)uVar330) {
                              uVar330 = local_f20;
                            }
                            local_e70 = (ulong)uVar330;
                            iVar261 = 0;
                            uVar281 = local_dd0 & 0xffffffff;
                            local_e10 = (ulong)uVar291;
                            while( true ) {
                              iVar297 = (int)uVar281;
                              auVar360 = SUB6416(ZEXT464(0x42000000),0);
                              iVar263 = (int)local_e70;
                              iVar343 = (int)local_d80;
                              iVar328 = (int)local_e10;
                              if ((int)local_dd0 <= iVar261) break;
                              iVar319 = iVar297;
                              if (iVar342 < iVar297) {
                                iVar319 = iVar342;
                              }
                              fStack_c54 = (float)(this->weight_winograd63_data).w;
                              fStack_c50 = (float)(this->weight_winograd63_data).h;
                              uStack_c70 = (this->weight_winograd63_data).elemsize;
                              afStack_c68[0] = (float)(this->weight_winograd63_data).elempack;
                              pAStack_c60 = (this->weight_winograd63_data).allocator;
                              local_c40 = (long)(int)fStack_c50 * (long)(int)fStack_c54;
                              local_c80 = (undefined1  [8])
                                          ((long)(this->weight_winograd63_data).data +
                                          uStack_c70 * local_c40 * (long)(iVar261 / iVar342) +
                                          (long)(int)((long)((ulong)(uint)(iVar343 >> 0x1f) << 0x20
                                                            | local_d80 & 0xffffffff) /
                                                     (long)iVar260) *
                                          (this->weight_winograd63_data).cstep * uStack_c70);
                              afStack_c78[0] = 0.0;
                              afStack_c78[1] = 0.0;
                              local_cd0.dims = 2;
                              iStack_c4c = 1;
                              iStack_c48 = 1;
                              local_cd0.elemsize = CONCAT71(uStack_e4f,local_e50);
                              local_cd0.cstep = (long)(int)fStack_e30 * (long)(int)fStack_e34;
                              local_cd0.data =
                                   (void *)((long)local_e60 +
                                           local_cd0.cstep * local_cd0.elemsize *
                                           (long)(iVar261 / iVar342) +
                                           (long)(int)((long)((ulong)(uint)(iVar328 >> 0x1f) << 0x20
                                                             | local_e10 & 0xffffffff) /
                                                      (long)(int)uVar278) * local_e20 *
                                           local_cd0.elemsize);
                              local_cd0.refcount = (int *)0x0;
                              local_cd0.elempack = (int)local_e48;
                              local_cd0.allocator = local_e40;
                              local_cd0.w = (int)fStack_e34;
                              local_cd0.h = (int)fStack_e30;
                              local_cd0.d = 1;
                              local_cd0.c = 1;
                              iStack_c58 = local_cd0.dims;
                              gemm_transB_packed_tile
                                        ((Mat *)local_c80,&local_cd0,&local_dc8,0x40,local_cd8,
                                         iVar263,iVar261,iVar319);
                              auVar394 = vbroadcastss_avx512f(ZEXT416(0x41000000));
                              auVar396 = vbroadcastss_avx512f(ZEXT416(0x40800000));
                              auVar397 = vbroadcastss_avx512f(ZEXT416(0x41800000));
                              auVar395 = vbroadcastss_avx512f(ZEXT416(0x40000000));
                              auVar399 = vbroadcastss_avx512f(ZEXT416(0x42000000));
                              iVar261 = iVar261 + iVar342;
                              uVar281 = (ulong)(uint)-(iVar342 - iVar297);
                            }
                            iVar260 = top_blob->w;
                            local_d78 = (long)top_blob->h;
                            iVar342 = top_blob->elempack;
                            iVar297 = (int)top_blob->cstep * iVar342;
                            iVar261 = (iVar260 + 5) / 6;
                            local_f10 = CONCAT44(local_f10._4_4_,iVar261);
                            iVar319 = iVar263 * 0x40;
                            local_d04 = iVar263 * 0x80;
                            lVar296 = (long)iVar297;
                            lVar271 = (long)(iVar297 * 2);
                            lVar272 = (long)(iVar297 * 3);
                            lVar273 = (long)(iVar297 * 4);
                            lVar274 = (long)(iVar297 * 5);
                            lVar275 = (long)(iVar297 * 6);
                            lVar276 = (long)(iVar297 * 7);
                            lVar277 = (long)(iVar297 * 8);
                            lVar295 = (long)(iVar297 * 9);
                            lVar279 = (long)(iVar297 * 10);
                            lVar280 = (long)(iVar297 * 0xb);
                            local_f08 = (long)(iVar297 * 0xc);
                            lVar299 = (long)(iVar297 * 0xd);
                            lVar300 = (long)(iVar297 * 0xe);
                            lVar282 = (long)(iVar297 * 0xf);
                            lVar284 = (long)(iVar342 * iVar260);
                            local_e08 = 0;
                            if (0 < iVar263) {
                              local_e08 = local_e70 & 0xffffffff;
                            }
                            local_ce0 = (long)(iVar263 * 0x70) * 4;
                            local_cd4 = iVar263 * 0x400;
                            local_de0 = (long)local_d04 * 4;
                            local_cf8 = (long)(iVar263 * 0x60) * 4;
                            local_cf0 = (long)(iVar263 * 0x50) * 4;
                            local_d18 = CONCAT44(local_d18._4_4_,iVar319);
                            local_df0 = (void *)((long)iVar319 * 4);
                            local_d28 = (long)(iVar263 * 0x30) * 4;
                            local_e18 = (long)(iVar263 << 5) * 4;
                            local_f00 = (long)(iVar263 << 4) * 4;
                            local_e68 = (this->super_Convolution).bias_data.data;
                            local_d10 = (void *)((long)local_e68 + local_e00 * 4);
                            auVar695._8_4_ = 0x42000000;
                            auVar695._0_8_ = 0x4200000042000000;
                            auVar695._12_4_ = 0x42000000;
                            auVar695._16_4_ = 0x42000000;
                            auVar695._20_4_ = 0x42000000;
                            auVar695._24_4_ = 0x42000000;
                            auVar695._28_4_ = 0x42000000;
                            auVar718._8_4_ = 0x40000000;
                            auVar718._0_8_ = 0x4000000040000000;
                            auVar718._12_4_ = 0x40000000;
                            auVar718._16_4_ = 0x40000000;
                            auVar718._20_4_ = 0x40000000;
                            auVar718._24_4_ = 0x40000000;
                            auVar718._28_4_ = 0x40000000;
                            auVar736._8_4_ = 0x41800000;
                            auVar736._0_8_ = 0x4180000041800000;
                            auVar736._12_4_ = 0x41800000;
                            auVar736._16_4_ = 0x41800000;
                            auVar736._20_4_ = 0x41800000;
                            auVar736._24_4_ = 0x41800000;
                            auVar736._28_4_ = 0x41800000;
                            auVar751._8_4_ = 0x40800000;
                            auVar751._0_8_ = 0x4080000040800000;
                            auVar751._12_4_ = 0x40800000;
                            auVar751._16_4_ = 0x40800000;
                            auVar751._20_4_ = 0x40800000;
                            auVar751._24_4_ = 0x40800000;
                            auVar751._28_4_ = 0x40800000;
                            auVar760._8_4_ = 0x41000000;
                            auVar760._0_8_ = 0x4100000041000000;
                            auVar760._12_4_ = 0x41000000;
                            auVar760._16_4_ = 0x41000000;
                            auVar760._20_4_ = 0x41000000;
                            auVar760._24_4_ = 0x41000000;
                            auVar760._28_4_ = 0x41000000;
                            auVar421 = vbroadcastss_avx512vl(ZEXT416(0x42000000));
                            auVar364 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
                            auVar363 = vbroadcastss_avx512vl(ZEXT416(0x41800000));
                            auVar362 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
                            auVar361 = vbroadcastss_avx512vl(ZEXT416(0x41000000));
                            uVar278 = 0;
                            pvVar348 = (void *)0x0;
                            while (pvVar345 = pvVar348, uVar281 = uVar278,
                                  (long)((ulong)pvVar345 | 0xf) < (long)local_de8) {
                              if (local_e68 == (void *)0x0) {
                                auVar398 = ZEXT1664((undefined1  [16])0x0);
                              }
                              else {
                                auVar398 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                                              ((long)local_d10 + (long)pvVar345 * 4)
                                                            );
                              }
                              lVar287 = (long)(int)uVar281;
                              local_df8 = lVar287 * 4;
                              iVar297 = iVar343 + (int)pvVar345;
                              local_d20 = CONCAT44(local_d20._4_4_,iVar297);
                              lVar285 = 0;
                              for (uVar278 = 0; lVar286 = lVar285, uVar278 != local_e08;
                                  uVar278 = uVar278 + 1) {
                                lVar285 = (long)local_dc8.data + lVar286;
                                for (lVar303 = -0x200; lVar303 != 0; lVar303 = lVar303 + 0x40) {
                                  auVar761 = *(undefined1 (*) [64])
                                              (lVar285 + local_f00 + lVar287 * 4);
                                  auVar762 = *(undefined1 (*) [64])
                                              (lVar285 + local_e18 + lVar287 * 4);
                                  auVar763 = *(undefined1 (*) [64])
                                              (lVar285 + local_d28 + lVar287 * 4);
                                  auVar764 = *(undefined1 (*) [64])
                                              ((long)local_df0 + lVar285 + lVar287 * 4);
                                  auVar400 = *(undefined1 (*) [64])
                                              (lVar285 + local_cf0 + lVar287 * 4);
                                  auVar403 = *(undefined1 (*) [64])
                                              (lVar285 + local_cf8 + lVar287 * 4);
                                  auVar404 = vaddps_avx512f(auVar762,auVar761);
                                  auVar761 = vsubps_avx512f(auVar761,auVar762);
                                  auVar762 = vaddps_avx512f(auVar764,auVar763);
                                  auVar763 = vsubps_avx512f(auVar763,auVar764);
                                  auVar764 = vaddps_avx512f(auVar403,auVar400);
                                  auVar400 = vsubps_avx512f(auVar400,auVar403);
                                  auVar403 = vaddps_avx512f(auVar404,*(undefined1 (*) [64])
                                                                      (lVar285 + local_df8));
                                  auVar405 = vfmadd213ps_avx512f(auVar399,auVar764,auVar762);
                                  auVar403 = vaddps_avx512f(auVar403,auVar405);
                                  auVar405 = vfmadd213ps_avx512f(auVar395,auVar763,auVar761);
                                  auVar405 = vfmadd231ps_avx512f(auVar405,auVar400,auVar397);
                                  auVar406 = vfmadd213ps_avx512f(auVar396,auVar762,auVar404);
                                  auVar406 = vfmadd231ps_avx512f(auVar406,auVar764,auVar394);
                                  auVar401 = vfmadd213ps_avx512f(auVar394,auVar763,auVar761);
                                  auVar401 = vfmadd231ps_avx512f(auVar401,auVar400,auVar396);
                                  auVar762 = vfmadd213ps_avx512f(auVar762,auVar397,auVar404);
                                  auVar762 = vfmadd231ps_avx512f(auVar762,auVar395,auVar764);
                                  auVar761 = vaddps_avx512f(auVar761,*(undefined1 (*) [64])
                                                                      (lVar285 +
                                                                      local_ce0 + lVar287 * 4));
                                  auVar763 = vfmadd213ps_avx512f(auVar763,auVar399,auVar400);
                                  auVar761 = vaddps_avx512f(auVar761,auVar763);
                                  *(undefined1 (*) [64])(auStack_a80 + lVar303) = auVar403;
                                  *(undefined1 (*) [64])(auStack_880 + lVar303) = auVar405;
                                  *(undefined1 (*) [64])(auStack_680 + lVar303) = auVar406;
                                  *(undefined1 (*) [64])(auStack_480 + lVar303) = auVar401;
                                  *(undefined1 (*) [64])(auStack_280 + lVar303) = auVar762;
                                  *(undefined1 (*) [64])(auStack_80 + lVar303) = auVar761;
                                  lVar285 = lVar285 + local_de0;
                                }
                                iVar337 = iVar328 + (int)uVar278;
                                lVar285 = (long)((iVar337 / iVar261) * 6);
                                iVar265 = (iVar337 % iVar261) * 6;
                                pauVar266 = (undefined1 (*) [64])
                                            ((long)top_blob->data +
                                            (long)(iVar265 * iVar342) * 4 +
                                            (long)top_blob->w * top_blob->elemsize * lVar285 +
                                            (long)(iVar297 / iVar342) * top_blob->cstep *
                                            top_blob->elemsize);
                                iVar337 = iVar265 + 1;
                                iVar315 = iVar265 + 2;
                                iVar320 = iVar265 + 3;
                                iVar264 = iVar265 + 4;
                                iVar265 = iVar265 + 5;
                                pauVar302 = &local_ac0;
                                for (lVar303 = 0; lVar303 != 6; lVar303 = lVar303 + 1) {
                                  if (lVar303 < local_d78 - lVar285) {
                                    auVar761 = vaddps_avx512f(pauVar302[-5],pauVar302[-6]);
                                    auVar762 = vsubps_avx512f(pauVar302[-6],pauVar302[-5]);
                                    auVar763 = vaddps_avx512f(pauVar302[-3],pauVar302[-4]);
                                    auVar764 = vsubps_avx512f(pauVar302[-4],pauVar302[-3]);
                                    auVar400 = vaddps_avx512f(pauVar302[-1],pauVar302[-2]);
                                    auVar403 = vsubps_avx512f(pauVar302[-2],pauVar302[-1]);
                                    auVar404 = vaddps_avx512f(auVar398,pauVar302[-7]);
                                    auVar405 = vfmadd213ps_avx512f(auVar399,auVar400,auVar763);
                                    auVar404 = vaddps_avx512f(auVar404,auVar761);
                                    auVar404 = vaddps_avx512f(auVar404,auVar405);
                                    auVar405 = vfmadd213ps_avx512f(auVar395,auVar764,auVar762);
                                    auVar405 = vfmadd231ps_avx512f(auVar405,auVar403,auVar397);
                                    auVar405 = vaddps_avx512f(auVar405,auVar398);
                                    auVar406 = vfmadd213ps_avx512f(auVar396,auVar763,auVar761);
                                    auVar406 = vfmadd231ps_avx512f(auVar406,auVar400,auVar394);
                                    auVar406 = vaddps_avx512f(auVar406,auVar398);
                                    auVar401 = vfmadd213ps_avx512f(auVar394,auVar764,auVar762);
                                    auVar401 = vfmadd231ps_avx512f(auVar401,auVar403,auVar396);
                                    auVar401 = vaddps_avx512f(auVar401,auVar398);
                                    auVar761 = vfmadd213ps_avx512f(auVar763,auVar397,auVar761);
                                    auVar761 = vfmadd231ps_avx512f(auVar761,auVar395,auVar400);
                                    auVar761 = vaddps_avx512f(auVar761,auVar398);
                                    auVar763 = vfmadd213ps_avx512f(auVar764,auVar399,auVar403);
                                    auVar762 = vaddps_avx512f(auVar762,auVar398);
                                    auVar762 = vaddps_avx512f(auVar762,*pauVar302);
                                    auVar762 = vaddps_avx512f(auVar762,auVar763);
                                    auVar368 = auVar404._0_16_;
                                    auVar369 = auVar405._0_16_;
                                    auVar367 = auVar406._0_16_;
                                    auVar366 = auVar401._0_16_;
                                    auVar370 = auVar761._0_16_;
                                    auVar365 = auVar762._0_16_;
                                    if (iVar342 == 1) {
                                      *(int *)*pauVar266 = auVar404._0_4_;
                                      uVar407 = vextractps_avx(auVar368,1);
                                      *(undefined4 *)(*pauVar266 + lVar296 * 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar368,2);
                                      *(undefined4 *)(*pauVar266 + lVar271 * 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar368,3);
                                      *(undefined4 *)(*pauVar266 + lVar272 * 4) = uVar407;
                                      auVar368 = auVar404._16_16_;
                                      *(int *)(*pauVar266 + lVar273 * 4) = auVar404._16_4_;
                                      uVar407 = vextractps_avx(auVar368,1);
                                      *(undefined4 *)(*pauVar266 + lVar274 * 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar368,2);
                                      *(undefined4 *)(*pauVar266 + lVar275 * 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar368,3);
                                      *(undefined4 *)(*pauVar266 + lVar276 * 4) = uVar407;
                                      auVar368 = vextracti32x4_avx512f(auVar404,2);
                                      *(int *)(*pauVar266 + lVar277 * 4) = auVar368._0_4_;
                                      uVar407 = vextractps_avx(auVar368,1);
                                      *(undefined4 *)(*pauVar266 + lVar295 * 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar368,2);
                                      *(undefined4 *)(*pauVar266 + lVar279 * 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar368,3);
                                      *(undefined4 *)(*pauVar266 + lVar280 * 4) = uVar407;
                                      auVar368 = vextracti32x4_avx512f(auVar404,3);
                                      *(int *)(*pauVar266 + local_f08 * 4) = auVar368._0_4_;
                                      uVar407 = vextractps_avx(auVar368,1);
                                      *(undefined4 *)(*pauVar266 + lVar299 * 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar368,2);
                                      *(undefined4 *)(*pauVar266 + lVar300 * 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar368,3);
                                      *(undefined4 *)(*pauVar266 + lVar282 * 4) = uVar407;
                                      if (iVar337 < iVar260) {
                                        *(int *)(*pauVar266 + 4) = auVar405._0_4_;
                                        uVar407 = vextractps_avx(auVar369,1);
                                        *(undefined4 *)(*pauVar266 + lVar296 * 4 + 4) = uVar407;
                                        uVar407 = vextractps_avx(auVar369,2);
                                        *(undefined4 *)(*pauVar266 + lVar271 * 4 + 4) = uVar407;
                                        uVar407 = vextractps_avx(auVar369,3);
                                        *(undefined4 *)(*pauVar266 + lVar272 * 4 + 4) = uVar407;
                                        auVar369 = auVar405._16_16_;
                                        *(int *)(*pauVar266 + lVar273 * 4 + 4) = auVar405._16_4_;
                                        uVar407 = vextractps_avx(auVar369,1);
                                        *(undefined4 *)(*pauVar266 + lVar274 * 4 + 4) = uVar407;
                                        uVar407 = vextractps_avx(auVar369,2);
                                        *(undefined4 *)(*pauVar266 + lVar275 * 4 + 4) = uVar407;
                                        uVar407 = vextractps_avx(auVar369,3);
                                        *(undefined4 *)(*pauVar266 + lVar276 * 4 + 4) = uVar407;
                                        auVar369 = vextracti32x4_avx512f(auVar405,2);
                                        *(int *)(*pauVar266 + lVar277 * 4 + 4) = auVar369._0_4_;
                                        uVar407 = vextractps_avx(auVar369,1);
                                        *(undefined4 *)(*pauVar266 + lVar295 * 4 + 4) = uVar407;
                                        uVar407 = vextractps_avx(auVar369,2);
                                        *(undefined4 *)(*pauVar266 + lVar279 * 4 + 4) = uVar407;
                                        uVar407 = vextractps_avx(auVar369,3);
                                        *(undefined4 *)(*pauVar266 + lVar280 * 4 + 4) = uVar407;
                                        auVar369 = vextracti32x4_avx512f(auVar405,3);
                                        *(int *)(*pauVar266 + local_f08 * 4 + 4) = auVar369._0_4_;
                                        uVar407 = vextractps_avx(auVar369,1);
                                        *(undefined4 *)(*pauVar266 + lVar299 * 4 + 4) = uVar407;
                                        uVar407 = vextractps_avx(auVar369,2);
                                        *(undefined4 *)(*pauVar266 + lVar300 * 4 + 4) = uVar407;
                                        uVar407 = vextractps_avx(auVar369,3);
                                        *(undefined4 *)(*pauVar266 + lVar282 * 4 + 4) = uVar407;
                                      }
                                      if (iVar315 < iVar260) {
                                        *(int *)(*pauVar266 + 8) = auVar406._0_4_;
                                        uVar407 = vextractps_avx(auVar367,1);
                                        *(undefined4 *)(*pauVar266 + lVar296 * 4 + 8) = uVar407;
                                        uVar407 = vextractps_avx(auVar367,2);
                                        *(undefined4 *)(*pauVar266 + lVar271 * 4 + 8) = uVar407;
                                        uVar407 = vextractps_avx(auVar367,3);
                                        *(undefined4 *)(*pauVar266 + lVar272 * 4 + 8) = uVar407;
                                        auVar367 = auVar406._16_16_;
                                        *(int *)(*pauVar266 + lVar273 * 4 + 8) = auVar406._16_4_;
                                        uVar407 = vextractps_avx(auVar367,1);
                                        *(undefined4 *)(*pauVar266 + lVar274 * 4 + 8) = uVar407;
                                        uVar407 = vextractps_avx(auVar367,2);
                                        *(undefined4 *)(*pauVar266 + lVar275 * 4 + 8) = uVar407;
                                        uVar407 = vextractps_avx(auVar367,3);
                                        *(undefined4 *)(*pauVar266 + lVar276 * 4 + 8) = uVar407;
                                        auVar367 = vextracti32x4_avx512f(auVar406,2);
                                        *(int *)(*pauVar266 + lVar277 * 4 + 8) = auVar367._0_4_;
                                        uVar407 = vextractps_avx(auVar367,1);
                                        *(undefined4 *)(*pauVar266 + lVar295 * 4 + 8) = uVar407;
                                        uVar407 = vextractps_avx(auVar367,2);
                                        *(undefined4 *)(*pauVar266 + lVar279 * 4 + 8) = uVar407;
                                        uVar407 = vextractps_avx(auVar367,3);
                                        *(undefined4 *)(*pauVar266 + lVar280 * 4 + 8) = uVar407;
                                        auVar367 = vextracti32x4_avx512f(auVar406,3);
                                        *(int *)(*pauVar266 + local_f08 * 4 + 8) = auVar367._0_4_;
                                        uVar407 = vextractps_avx(auVar367,1);
                                        *(undefined4 *)(*pauVar266 + lVar299 * 4 + 8) = uVar407;
                                        uVar407 = vextractps_avx(auVar367,2);
                                        *(undefined4 *)(*pauVar266 + lVar300 * 4 + 8) = uVar407;
                                        uVar407 = vextractps_avx(auVar367,3);
                                        *(undefined4 *)(*pauVar266 + lVar282 * 4 + 8) = uVar407;
                                      }
                                      if (iVar320 < iVar260) {
                                        *(int *)(*pauVar266 + 0xc) = auVar401._0_4_;
                                        uVar407 = vextractps_avx(auVar366,1);
                                        *(undefined4 *)(*pauVar266 + lVar296 * 4 + 0xc) = uVar407;
                                        uVar407 = vextractps_avx(auVar366,2);
                                        *(undefined4 *)(*pauVar266 + lVar271 * 4 + 0xc) = uVar407;
                                        uVar407 = vextractps_avx(auVar366,3);
                                        *(undefined4 *)(*pauVar266 + lVar272 * 4 + 0xc) = uVar407;
                                        auVar366 = auVar401._16_16_;
                                        *(int *)(*pauVar266 + lVar273 * 4 + 0xc) = auVar401._16_4_;
                                        uVar407 = vextractps_avx(auVar366,1);
                                        *(undefined4 *)(*pauVar266 + lVar274 * 4 + 0xc) = uVar407;
                                        uVar407 = vextractps_avx(auVar366,2);
                                        *(undefined4 *)(*pauVar266 + lVar275 * 4 + 0xc) = uVar407;
                                        uVar407 = vextractps_avx(auVar366,3);
                                        *(undefined4 *)(*pauVar266 + lVar276 * 4 + 0xc) = uVar407;
                                        auVar366 = vextracti32x4_avx512f(auVar401,2);
                                        *(int *)(*pauVar266 + lVar277 * 4 + 0xc) = auVar366._0_4_;
                                        uVar407 = vextractps_avx(auVar366,1);
                                        *(undefined4 *)(*pauVar266 + lVar295 * 4 + 0xc) = uVar407;
                                        uVar407 = vextractps_avx(auVar366,2);
                                        *(undefined4 *)(*pauVar266 + lVar279 * 4 + 0xc) = uVar407;
                                        uVar407 = vextractps_avx(auVar366,3);
                                        *(undefined4 *)(*pauVar266 + lVar280 * 4 + 0xc) = uVar407;
                                        auVar366 = vextracti32x4_avx512f(auVar401,3);
                                        *(int *)(*pauVar266 + local_f08 * 4 + 0xc) = auVar366._0_4_;
                                        uVar407 = vextractps_avx(auVar366,1);
                                        *(undefined4 *)(*pauVar266 + lVar299 * 4 + 0xc) = uVar407;
                                        uVar407 = vextractps_avx(auVar366,2);
                                        *(undefined4 *)(*pauVar266 + lVar300 * 4 + 0xc) = uVar407;
                                        uVar407 = vextractps_avx(auVar366,3);
                                        *(undefined4 *)(*pauVar266 + lVar282 * 4 + 0xc) = uVar407;
                                      }
                                      if (iVar264 < iVar260) {
                                        *(int *)(*pauVar266 + 0x10) = auVar761._0_4_;
                                        uVar407 = vextractps_avx(auVar370,1);
                                        *(undefined4 *)(*pauVar266 + lVar296 * 4 + 0x10) = uVar407;
                                        uVar407 = vextractps_avx(auVar370,2);
                                        *(undefined4 *)(*pauVar266 + lVar271 * 4 + 0x10) = uVar407;
                                        uVar407 = vextractps_avx(auVar370,3);
                                        *(undefined4 *)(*pauVar266 + lVar272 * 4 + 0x10) = uVar407;
                                        auVar370 = auVar761._16_16_;
                                        *(int *)(*pauVar266 + lVar273 * 4 + 0x10) = auVar761._16_4_;
                                        uVar407 = vextractps_avx(auVar370,1);
                                        *(undefined4 *)(*pauVar266 + lVar274 * 4 + 0x10) = uVar407;
                                        uVar407 = vextractps_avx(auVar370,2);
                                        *(undefined4 *)(*pauVar266 + lVar275 * 4 + 0x10) = uVar407;
                                        uVar407 = vextractps_avx(auVar370,3);
                                        *(undefined4 *)(*pauVar266 + lVar276 * 4 + 0x10) = uVar407;
                                        auVar370 = vextracti32x4_avx512f(auVar761,2);
                                        *(int *)(*pauVar266 + lVar277 * 4 + 0x10) = auVar370._0_4_;
                                        uVar407 = vextractps_avx(auVar370,1);
                                        *(undefined4 *)(*pauVar266 + lVar295 * 4 + 0x10) = uVar407;
                                        uVar407 = vextractps_avx(auVar370,2);
                                        *(undefined4 *)(*pauVar266 + lVar279 * 4 + 0x10) = uVar407;
                                        uVar407 = vextractps_avx(auVar370,3);
                                        *(undefined4 *)(*pauVar266 + lVar280 * 4 + 0x10) = uVar407;
                                        auVar370 = vextracti32x4_avx512f(auVar761,3);
                                        *(int *)(*pauVar266 + local_f08 * 4 + 0x10) = auVar370._0_4_
                                        ;
                                        uVar407 = vextractps_avx(auVar370,1);
                                        *(undefined4 *)(*pauVar266 + lVar299 * 4 + 0x10) = uVar407;
                                        uVar407 = vextractps_avx(auVar370,2);
                                        *(undefined4 *)(*pauVar266 + lVar300 * 4 + 0x10) = uVar407;
                                        uVar407 = vextractps_avx(auVar370,3);
                                        *(undefined4 *)(*pauVar266 + lVar282 * 4 + 0x10) = uVar407;
                                      }
                                      if (iVar265 < iVar260) {
                                        *(int *)(*pauVar266 + 0x14) = auVar762._0_4_;
                                        uVar407 = vextractps_avx(auVar365,1);
                                        *(undefined4 *)(*pauVar266 + lVar296 * 4 + 0x14) = uVar407;
                                        uVar407 = vextractps_avx(auVar365,2);
                                        *(undefined4 *)(*pauVar266 + lVar271 * 4 + 0x14) = uVar407;
                                        uVar407 = vextractps_avx(auVar365,3);
                                        *(undefined4 *)(*pauVar266 + lVar272 * 4 + 0x14) = uVar407;
                                        auVar365 = auVar762._16_16_;
                                        *(int *)(*pauVar266 + lVar273 * 4 + 0x14) = auVar762._16_4_;
                                        uVar407 = vextractps_avx(auVar365,1);
                                        *(undefined4 *)(*pauVar266 + lVar274 * 4 + 0x14) = uVar407;
                                        uVar407 = vextractps_avx(auVar365,2);
                                        *(undefined4 *)(*pauVar266 + lVar275 * 4 + 0x14) = uVar407;
                                        uVar407 = vextractps_avx(auVar365,3);
                                        *(undefined4 *)(*pauVar266 + lVar276 * 4 + 0x14) = uVar407;
                                        auVar365 = vextracti32x4_avx512f(auVar762,2);
                                        *(int *)(*pauVar266 + lVar277 * 4 + 0x14) = auVar365._0_4_;
                                        uVar407 = vextractps_avx(auVar365,1);
                                        *(undefined4 *)(*pauVar266 + lVar295 * 4 + 0x14) = uVar407;
                                        uVar407 = vextractps_avx(auVar365,2);
                                        *(undefined4 *)(*pauVar266 + lVar279 * 4 + 0x14) = uVar407;
                                        uVar407 = vextractps_avx(auVar365,3);
                                        *(undefined4 *)(*pauVar266 + lVar280 * 4 + 0x14) = uVar407;
                                        auVar365 = vextracti32x4_avx512f(auVar762,3);
                                        *(int *)(*pauVar266 + local_f08 * 4 + 0x14) = auVar365._0_4_
                                        ;
                                        uVar407 = vextractps_avx(auVar365,1);
                                        *(undefined4 *)(*pauVar266 + lVar299 * 4 + 0x14) = uVar407;
                                        uVar407 = vextractps_avx(auVar365,2);
                                        *(undefined4 *)(*pauVar266 + lVar300 * 4 + 0x14) = uVar407;
                                        uVar407 = vextractps_avx(auVar365,3);
                                        *(undefined4 *)(*pauVar266 + lVar282 * 4 + 0x14) = uVar407;
                                      }
                                    }
                                    else if (iVar342 == 4) {
                                      *(undefined1 (*) [16])*pauVar266 = auVar368;
                                      auVar368 = vextractf32x4_avx512f(auVar404,1);
                                      *(undefined1 (*) [16])(*pauVar266 + lVar296 * 4) = auVar368;
                                      auVar368 = vextractf32x4_avx512f(auVar404,2);
                                      *(undefined1 (*) [16])(*pauVar266 + lVar271 * 4) = auVar368;
                                      auVar368 = vextractf32x4_avx512f(auVar404,3);
                                      *(undefined1 (*) [16])(*pauVar266 + lVar272 * 4) = auVar368;
                                      if (iVar337 < iVar260) {
                                        *(undefined1 (*) [16])(*pauVar266 + 0x10) = auVar369;
                                        auVar369 = vextractf32x4_avx512f(auVar405,1);
                                        *(undefined1 (*) [16])(*pauVar266 + lVar296 * 4 + 8) =
                                             auVar369;
                                        auVar369 = vextractf32x4_avx512f(auVar405,2);
                                        *(undefined1 (*) [16])(*pauVar266 + lVar271 * 4 + 8) =
                                             auVar369;
                                        auVar369 = vextractf32x4_avx512f(auVar405,3);
                                        *(undefined1 (*) [16])(*pauVar266 + lVar272 * 4 + 8) =
                                             auVar369;
                                      }
                                      if (iVar315 < iVar260) {
                                        *(undefined1 (*) [16])(*pauVar266 + 0x20) = auVar367;
                                        auVar367 = vextractf32x4_avx512f(auVar406,1);
                                        *(undefined1 (*) [16])(*pauVar266 + lVar296 * 4 + 0x10) =
                                             auVar367;
                                        auVar367 = vextractf32x4_avx512f(auVar406,2);
                                        *(undefined1 (*) [16])(*pauVar266 + lVar271 * 4 + 0x10) =
                                             auVar367;
                                        auVar367 = vextractf32x4_avx512f(auVar406,3);
                                        *(undefined1 (*) [16])(*pauVar266 + lVar272 * 4 + 0x10) =
                                             auVar367;
                                      }
                                      if (iVar320 < iVar260) {
                                        *(undefined1 (*) [16])(*pauVar266 + 0x30) = auVar366;
                                        auVar366 = vextractf32x4_avx512f(auVar401,1);
                                        *(undefined1 (*) [16])(*pauVar266 + lVar296 * 4 + 0x18) =
                                             auVar366;
                                        auVar366 = vextractf32x4_avx512f(auVar401,2);
                                        *(undefined1 (*) [16])(*pauVar266 + lVar271 * 4 + 0x18) =
                                             auVar366;
                                        auVar366 = vextractf32x4_avx512f(auVar401,3);
                                        *(undefined1 (*) [16])(*pauVar266 + lVar272 * 4 + 0x18) =
                                             auVar366;
                                      }
                                      if (iVar264 < iVar260) {
                                        *(undefined1 (*) [16])pauVar266[1] = auVar370;
                                        auVar370 = vextractf32x4_avx512f(auVar761,1);
                                        *(undefined1 (*) [16])(*pauVar266 + lVar296 * 4 + 0x20) =
                                             auVar370;
                                        auVar370 = vextractf32x4_avx512f(auVar761,2);
                                        *(undefined1 (*) [16])(*pauVar266 + lVar271 * 4 + 0x20) =
                                             auVar370;
                                        auVar370 = vextractf32x4_avx512f(auVar761,3);
                                        *(undefined1 (*) [16])(*pauVar266 + lVar272 * 4 + 0x20) =
                                             auVar370;
                                      }
                                      if (iVar265 < iVar260) {
                                        *(undefined1 (*) [16])(pauVar266[1] + 0x10) = auVar365;
                                        auVar365 = vextractf32x4_avx512f(auVar762,1);
                                        *(undefined1 (*) [16])(*pauVar266 + lVar296 * 4 + 0x28) =
                                             auVar365;
                                        auVar365 = vextractf32x4_avx512f(auVar762,2);
                                        *(undefined1 (*) [16])(*pauVar266 + lVar271 * 4 + 0x28) =
                                             auVar365;
                                        auVar365 = vextractf32x4_avx512f(auVar762,3);
                                        *(undefined1 (*) [16])(*pauVar266 + lVar272 * 4 + 0x28) =
                                             auVar365;
                                      }
                                    }
                                    else if (iVar342 == 8) {
                                      *(undefined1 (*) [32])*pauVar266 = auVar404._0_32_;
                                      auVar393 = vextractf64x4_avx512f(auVar404,1);
                                      *(undefined1 (*) [32])(*pauVar266 + lVar296 * 4) = auVar393;
                                      if (iVar337 < iVar260) {
                                        *(undefined1 (*) [32])(*pauVar266 + 0x20) = auVar405._0_32_;
                                        auVar393 = vextractf64x4_avx512f(auVar405,1);
                                        *(undefined1 (*) [32])(*pauVar266 + lVar296 * 4 + 0x10) =
                                             auVar393;
                                      }
                                      if (iVar315 < iVar260) {
                                        *(undefined1 (*) [32])pauVar266[1] = auVar406._0_32_;
                                        auVar393 = vextractf64x4_avx512f(auVar406,1);
                                        *(undefined1 (*) [32])(*pauVar266 + lVar296 * 4 + 0x20) =
                                             auVar393;
                                      }
                                      if (iVar320 < iVar260) {
                                        *(undefined1 (*) [32])(pauVar266[1] + 0x20) =
                                             auVar401._0_32_;
                                        auVar393 = vextractf64x4_avx512f(auVar401,1);
                                        *(undefined1 (*) [32])(*pauVar266 + lVar296 * 4 + 0x30) =
                                             auVar393;
                                      }
                                      if (iVar264 < iVar260) {
                                        *(undefined1 (*) [32])pauVar266[2] = auVar761._0_32_;
                                        auVar393 = vextractf64x4_avx512f(auVar761,1);
                                        *(undefined1 (*) [32])(pauVar266[1] + lVar296 * 4) =
                                             auVar393;
                                      }
                                      if (iVar265 < iVar260) {
                                        *(undefined1 (*) [32])(pauVar266[2] + 0x20) =
                                             auVar762._0_32_;
                                        auVar393 = vextractf64x4_avx512f(auVar762,1);
                                        *(undefined1 (*) [32])(pauVar266[1] + lVar296 * 4 + 0x10) =
                                             auVar393;
                                      }
                                    }
                                    else if (iVar342 == 0x10) {
                                      *pauVar266 = auVar404;
                                      if (iVar337 < iVar260) {
                                        pauVar266[1] = auVar405;
                                      }
                                      if (iVar315 < iVar260) {
                                        pauVar266[2] = auVar406;
                                      }
                                      if (iVar320 < iVar260) {
                                        pauVar266[3] = auVar401;
                                      }
                                      if (iVar264 < iVar260) {
                                        pauVar266[4] = auVar761;
                                      }
                                      if (iVar265 < iVar260) {
                                        pauVar266[5] = auVar762;
                                      }
                                    }
                                    pauVar266 = (undefined1 (*) [64])(*pauVar266 + lVar284 * 4);
                                  }
                                  pauVar302 = pauVar302 + 8;
                                }
                                lVar285 = lVar286 + 0x40;
                                local_dd8 = lVar286;
                              }
                              uVar278 = (ulong)(uint)((int)uVar281 + local_cd4);
                              local_ee0 = uVar281;
                              local_ed8 = pvVar345;
                              pvVar348 = (void *)((long)pvVar345 + 0x10);
                            }
                            local_ee8 = (long)(iVar263 * 8);
                            local_dd8 = CONCAT44(local_dd8._4_4_,iVar263 * 0x200);
                            local_ed0 = (long)(iVar263 * 0x18) * 4;
                            local_f18 = local_ee8 * 4;
                            while (pvVar348 = pvVar345, uVar278 = uVar281,
                                  (long)((ulong)pvVar348 | 7) < (long)local_de8) {
                              if (local_e68 == (void *)0x0) {
                                auVar393 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                              }
                              else {
                                auVar393 = *(undefined1 (*) [32])
                                            ((long)local_d10 + (long)pvVar348 * 4);
                              }
                              lVar277 = (long)(int)uVar278;
                              iVar297 = iVar343 + (int)pvVar348;
                              local_f08 = CONCAT44(local_f08._4_4_,iVar297);
                              lVar295 = 0;
                              for (uVar281 = 0; uVar281 != local_e08; uVar281 = uVar281 + 1) {
                                lVar279 = (long)local_dc8.data + lVar295;
                                for (lVar280 = -0x100; lVar280 != 0; lVar280 = lVar280 + 0x20) {
                                  auVar376 = *(undefined1 (*) [32])
                                              (lVar279 + local_f18 + lVar277 * 4);
                                  auVar14 = *(undefined1 (*) [32])
                                             (lVar279 + local_f00 + lVar277 * 4);
                                  auVar15 = *(undefined1 (*) [32])
                                             (lVar279 + local_ed0 + lVar277 * 4);
                                  auVar387 = *(undefined1 (*) [32])
                                              (lVar279 + local_e18 + lVar277 * 4);
                                  auVar16 = *(undefined1 (*) [32])
                                             (lVar279 + (long)(iVar263 * 0x28) * 4 + lVar277 * 4);
                                  auVar17 = *(undefined1 (*) [32])
                                             (lVar279 + local_d28 + lVar277 * 4);
                                  auVar606._0_4_ = auVar14._0_4_ + auVar376._0_4_;
                                  auVar606._4_4_ = auVar14._4_4_ + auVar376._4_4_;
                                  auVar606._8_4_ = auVar14._8_4_ + auVar376._8_4_;
                                  auVar606._12_4_ = auVar14._12_4_ + auVar376._12_4_;
                                  auVar606._16_4_ = auVar14._16_4_ + auVar376._16_4_;
                                  auVar606._20_4_ = auVar14._20_4_ + auVar376._20_4_;
                                  auVar606._24_4_ = auVar14._24_4_ + auVar376._24_4_;
                                  auVar606._28_4_ = auVar14._28_4_ + auVar376._28_4_;
                                  auVar376 = vsubps_avx(auVar376,auVar14);
                                  auVar473._0_4_ = auVar387._0_4_ + auVar15._0_4_;
                                  auVar473._4_4_ = auVar387._4_4_ + auVar15._4_4_;
                                  auVar473._8_4_ = auVar387._8_4_ + auVar15._8_4_;
                                  auVar473._12_4_ = auVar387._12_4_ + auVar15._12_4_;
                                  auVar473._16_4_ = auVar387._16_4_ + auVar15._16_4_;
                                  auVar473._20_4_ = auVar387._20_4_ + auVar15._20_4_;
                                  auVar473._24_4_ = auVar387._24_4_ + auVar15._24_4_;
                                  auVar473._28_4_ = auVar387._28_4_ + auVar15._28_4_;
                                  auVar14 = vsubps_avx(auVar15,auVar387);
                                  auVar532._0_4_ = auVar17._0_4_ + auVar16._0_4_;
                                  auVar532._4_4_ = auVar17._4_4_ + auVar16._4_4_;
                                  auVar532._8_4_ = auVar17._8_4_ + auVar16._8_4_;
                                  auVar532._12_4_ = auVar17._12_4_ + auVar16._12_4_;
                                  auVar532._16_4_ = auVar17._16_4_ + auVar16._16_4_;
                                  auVar532._20_4_ = auVar17._20_4_ + auVar16._20_4_;
                                  auVar532._24_4_ = auVar17._24_4_ + auVar16._24_4_;
                                  auVar532._28_4_ = auVar17._28_4_ + auVar16._28_4_;
                                  auVar15 = vsubps_avx(auVar16,auVar17);
                                  pfVar311 = (float *)(lVar279 + lVar277 * 4);
                                  auVar365 = vfmadd213ps_fma(auVar695,auVar532,auVar473);
                                  auVar584._0_4_ = auVar365._0_4_ + auVar606._0_4_ + *pfVar311;
                                  auVar584._4_4_ = auVar365._4_4_ + auVar606._4_4_ + pfVar311[1];
                                  auVar584._8_4_ = auVar365._8_4_ + auVar606._8_4_ + pfVar311[2];
                                  auVar584._12_4_ = auVar365._12_4_ + auVar606._12_4_ + pfVar311[3];
                                  auVar584._16_4_ = auVar606._16_4_ + pfVar311[4] + 0.0;
                                  auVar584._20_4_ = auVar606._20_4_ + pfVar311[5] + 0.0;
                                  auVar584._24_4_ = auVar606._24_4_ + pfVar311[6] + 0.0;
                                  auVar584._28_4_ = auVar606._28_4_ + pfVar311[7] + 0.0;
                                  auVar365 = vfmadd213ps_fma(auVar718,auVar14,auVar376);
                                  auVar370 = vfmadd231ps_fma(ZEXT1632(auVar365),auVar15,auVar736);
                                  auVar365 = vfmadd213ps_fma(auVar751,auVar473,auVar606);
                                  auVar366 = vfmadd231ps_fma(ZEXT1632(auVar365),auVar532,auVar760);
                                  auVar365 = vfmadd213ps_fma(auVar760,auVar14,auVar376);
                                  auVar367 = vfmadd231ps_fma(ZEXT1632(auVar365),auVar15,auVar751);
                                  auVar365 = vfmadd213ps_fma(auVar473,auVar736,auVar606);
                                  auVar369 = vfmadd231ps_fma(ZEXT1632(auVar365),auVar718,auVar532);
                                  pfVar311 = (float *)(lVar279 +
                                                      (long)(iVar263 * 0x38) * 4 + lVar277 * 4);
                                  auVar365 = vfmadd213ps_fma(auVar14,auVar695,auVar15);
                                  auVar439._0_4_ = auVar376._0_4_ + *pfVar311 + auVar365._0_4_;
                                  auVar439._4_4_ = auVar376._4_4_ + pfVar311[1] + auVar365._4_4_;
                                  auVar439._8_4_ = auVar376._8_4_ + pfVar311[2] + auVar365._8_4_;
                                  auVar439._12_4_ = auVar376._12_4_ + pfVar311[3] + auVar365._12_4_;
                                  auVar439._16_4_ = auVar376._16_4_ + pfVar311[4] + 0.0;
                                  auVar439._20_4_ = auVar376._20_4_ + pfVar311[5] + 0.0;
                                  auVar439._24_4_ = auVar376._24_4_ + pfVar311[6] + 0.0;
                                  auVar439._28_4_ = auVar376._28_4_ + pfVar311[7] + 0.0;
                                  *(undefined1 (*) [32])((long)local_b80 + lVar280) = auVar584;
                                  *(undefined1 (*) [32])(auStack_a80 + lVar280) = ZEXT1632(auVar370)
                                  ;
                                  *(undefined1 (*) [32])(auStack_980 + lVar280) = ZEXT1632(auVar366)
                                  ;
                                  *(undefined1 (*) [32])(auStack_880 + lVar280) = ZEXT1632(auVar367)
                                  ;
                                  *(undefined1 (*) [32])(auStack_780 + lVar280) = ZEXT1632(auVar369)
                                  ;
                                  *(undefined1 (*) [32])(auStack_680 + lVar280) = auVar439;
                                  lVar279 = lVar279 + (long)local_df0;
                                }
                                iVar337 = iVar328 + (int)uVar281;
                                lVar280 = (long)((iVar337 / iVar261) * 6);
                                iVar265 = (iVar337 % iVar261) * 6;
                                pauVar306 = (undefined1 (*) [32])
                                            ((long)top_blob->data +
                                            (long)(iVar265 * iVar342) * 4 +
                                            (long)top_blob->w * top_blob->elemsize * lVar280 +
                                            (long)(iVar297 / iVar342) * top_blob->cstep *
                                            top_blob->elemsize);
                                iVar337 = iVar265 + 1;
                                iVar315 = iVar265 + 2;
                                iVar320 = iVar265 + 3;
                                iVar264 = iVar265 + 4;
                                iVar265 = iVar265 + 5;
                                pfVar311 = afStack_ba0;
                                for (lVar279 = 0; lVar279 != 6; lVar279 = lVar279 + 1) {
                                  if (lVar279 < local_d78 - lVar280) {
                                    auVar376 = *(undefined1 (*) [32])(pfVar311 + -0x30);
                                    auVar14 = *(undefined1 (*) [32])(pfVar311 + -0x28);
                                    auVar15 = *(undefined1 (*) [32])(pfVar311 + -0x20);
                                    auVar387 = *(undefined1 (*) [32])(pfVar311 + -0x18);
                                    auVar16 = *(undefined1 (*) [32])(pfVar311 + -0x10);
                                    auVar17 = *(undefined1 (*) [32])(pfVar311 + -8);
                                    auVar607._0_4_ = auVar14._0_4_ + auVar376._0_4_;
                                    auVar607._4_4_ = auVar14._4_4_ + auVar376._4_4_;
                                    auVar607._8_4_ = auVar14._8_4_ + auVar376._8_4_;
                                    auVar607._12_4_ = auVar14._12_4_ + auVar376._12_4_;
                                    auVar607._16_4_ = auVar14._16_4_ + auVar376._16_4_;
                                    auVar607._20_4_ = auVar14._20_4_ + auVar376._20_4_;
                                    auVar607._24_4_ = auVar14._24_4_ + auVar376._24_4_;
                                    auVar607._28_4_ = auVar14._28_4_ + auVar376._28_4_;
                                    auVar376 = vsubps_avx(auVar376,auVar14);
                                    auVar474._0_4_ = auVar387._0_4_ + auVar15._0_4_;
                                    auVar474._4_4_ = auVar387._4_4_ + auVar15._4_4_;
                                    auVar474._8_4_ = auVar387._8_4_ + auVar15._8_4_;
                                    auVar474._12_4_ = auVar387._12_4_ + auVar15._12_4_;
                                    auVar474._16_4_ = auVar387._16_4_ + auVar15._16_4_;
                                    auVar474._20_4_ = auVar387._20_4_ + auVar15._20_4_;
                                    auVar474._24_4_ = auVar387._24_4_ + auVar15._24_4_;
                                    auVar474._28_4_ = auVar387._28_4_ + auVar15._28_4_;
                                    auVar14 = vsubps_avx(auVar15,auVar387);
                                    auVar648._0_4_ = auVar17._0_4_ + auVar16._0_4_;
                                    auVar648._4_4_ = auVar17._4_4_ + auVar16._4_4_;
                                    auVar648._8_4_ = auVar17._8_4_ + auVar16._8_4_;
                                    auVar648._12_4_ = auVar17._12_4_ + auVar16._12_4_;
                                    auVar648._16_4_ = auVar17._16_4_ + auVar16._16_4_;
                                    auVar648._20_4_ = auVar17._20_4_ + auVar16._20_4_;
                                    auVar648._24_4_ = auVar17._24_4_ + auVar16._24_4_;
                                    auVar648._28_4_ = auVar17._28_4_ + auVar16._28_4_;
                                    auVar15 = vsubps_avx(auVar16,auVar17);
                                    fVar534 = auVar393._0_4_;
                                    fVar552 = auVar393._4_4_;
                                    fVar553 = auVar393._8_4_;
                                    fVar554 = auVar393._12_4_;
                                    fVar555 = auVar393._16_4_;
                                    fVar556 = auVar393._20_4_;
                                    fVar557 = auVar393._24_4_;
                                    fVar558 = auVar393._28_4_;
                                    auVar365 = vfmadd213ps_fma(auVar695,auVar648,auVar474);
                                    auVar562._0_4_ =
                                         fVar534 + pfVar311[-0x38] + auVar607._0_4_ + auVar365._0_4_
                                    ;
                                    auVar562._4_4_ =
                                         fVar552 + pfVar311[-0x37] + auVar607._4_4_ + auVar365._4_4_
                                    ;
                                    auVar562._8_4_ =
                                         fVar553 + pfVar311[-0x36] + auVar607._8_4_ + auVar365._8_4_
                                    ;
                                    auVar562._12_4_ =
                                         fVar554 + pfVar311[-0x35] + auVar607._12_4_ +
                                         auVar365._12_4_;
                                    auVar585._16_4_ =
                                         fVar555 + pfVar311[-0x34] + auVar607._16_4_ + 0.0;
                                    auVar585._0_16_ = auVar562;
                                    auVar585._20_4_ =
                                         fVar556 + pfVar311[-0x33] + auVar607._20_4_ + 0.0;
                                    auVar585._24_4_ =
                                         fVar557 + pfVar311[-0x32] + auVar607._24_4_ + 0.0;
                                    auVar585._28_4_ =
                                         fVar558 + pfVar311[-0x31] + auVar607._28_4_ + 0.0;
                                    auVar365 = vfmadd213ps_fma(auVar718,auVar14,auVar376);
                                    auVar365 = vfmadd231ps_fma(ZEXT1632(auVar365),auVar15,auVar736);
                                    auVar537._0_4_ = auVar365._0_4_ + fVar534;
                                    auVar537._4_4_ = auVar365._4_4_ + fVar552;
                                    auVar537._8_4_ = auVar365._8_4_ + fVar553;
                                    auVar537._12_4_ = auVar365._12_4_ + fVar554;
                                    auVar551._16_4_ = fVar555 + 0.0;
                                    auVar551._0_16_ = auVar537;
                                    auVar551._20_4_ = fVar556 + 0.0;
                                    auVar551._24_4_ = fVar557 + 0.0;
                                    auVar551._28_4_ = fVar558 + 0.0;
                                    auVar365 = vfmadd213ps_fma(auVar751,auVar474,auVar607);
                                    auVar365 = vfmadd231ps_fma(ZEXT1632(auVar365),auVar648,auVar760)
                                    ;
                                    auVar508._0_4_ = auVar365._0_4_ + fVar534;
                                    auVar508._4_4_ = auVar365._4_4_ + fVar552;
                                    auVar508._8_4_ = auVar365._8_4_ + fVar553;
                                    auVar508._12_4_ = auVar365._12_4_ + fVar554;
                                    auVar533._16_4_ = fVar555 + 0.0;
                                    auVar533._0_16_ = auVar508;
                                    auVar533._20_4_ = fVar556 + 0.0;
                                    auVar533._24_4_ = fVar557 + 0.0;
                                    auVar533._28_4_ = fVar558 + 0.0;
                                    auVar365 = vfmadd213ps_fma(auVar760,auVar14,auVar376);
                                    auVar365 = vfmadd231ps_fma(ZEXT1632(auVar365),auVar15,auVar751);
                                    auVar482._0_4_ = auVar365._0_4_ + fVar534;
                                    auVar482._4_4_ = auVar365._4_4_ + fVar552;
                                    auVar482._8_4_ = auVar365._8_4_ + fVar553;
                                    auVar482._12_4_ = auVar365._12_4_ + fVar554;
                                    auVar504._16_4_ = fVar555 + 0.0;
                                    auVar504._0_16_ = auVar482;
                                    auVar504._20_4_ = fVar556 + 0.0;
                                    auVar504._24_4_ = fVar557 + 0.0;
                                    auVar504._28_4_ = fVar558 + 0.0;
                                    auVar365 = vfmadd213ps_fma(auVar474,auVar736,auVar607);
                                    auVar365 = vfmadd231ps_fma(ZEXT1632(auVar365),auVar718,auVar648)
                                    ;
                                    auVar447._0_4_ = auVar365._0_4_ + fVar534;
                                    auVar447._4_4_ = auVar365._4_4_ + fVar552;
                                    auVar447._8_4_ = auVar365._8_4_ + fVar553;
                                    auVar447._12_4_ = auVar365._12_4_ + fVar554;
                                    auVar475._16_4_ = fVar555 + 0.0;
                                    auVar475._0_16_ = auVar447;
                                    auVar475._20_4_ = fVar556 + 0.0;
                                    auVar475._24_4_ = fVar557 + 0.0;
                                    auVar475._28_4_ = fVar558 + 0.0;
                                    auVar365 = vfmadd213ps_fma(auVar14,auVar695,auVar15);
                                    auVar426._0_4_ =
                                         auVar365._0_4_ + auVar376._0_4_ + fVar534 + *pfVar311;
                                    auVar426._4_4_ =
                                         auVar365._4_4_ + auVar376._4_4_ + fVar552 + pfVar311[1];
                                    auVar426._8_4_ =
                                         auVar365._8_4_ + auVar376._8_4_ + fVar553 + pfVar311[2];
                                    auVar426._12_4_ =
                                         auVar365._12_4_ + auVar376._12_4_ + fVar554 + pfVar311[3];
                                    auVar440._16_4_ = auVar376._16_4_ + fVar555 + pfVar311[4] + 0.0;
                                    auVar440._0_16_ = auVar426;
                                    auVar440._20_4_ = auVar376._20_4_ + fVar556 + pfVar311[5] + 0.0;
                                    auVar440._24_4_ = auVar376._24_4_ + fVar557 + pfVar311[6] + 0.0;
                                    auVar440._28_4_ = auVar376._28_4_ + fVar558 + pfVar311[7] + 0.0;
                                    auVar368 = auVar585._16_16_;
                                    auVar369 = auVar551._16_16_;
                                    auVar367 = auVar533._16_16_;
                                    auVar366 = auVar504._16_16_;
                                    auVar370 = auVar475._16_16_;
                                    auVar365 = auVar440._16_16_;
                                    if (iVar342 == 1) {
                                      *(float *)*pauVar306 = auVar562._0_4_;
                                      uVar407 = vextractps_avx(auVar562,1);
                                      *(undefined4 *)(*pauVar306 + lVar296 * 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar562,2);
                                      *(undefined4 *)(*pauVar306 + lVar271 * 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar562,3);
                                      *(undefined4 *)(*pauVar306 + lVar272 * 4) = uVar407;
                                      *(float *)(*pauVar306 + lVar273 * 4) = auVar585._16_4_;
                                      uVar407 = vextractps_avx(auVar368,1);
                                      *(undefined4 *)(*pauVar306 + lVar274 * 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar368,2);
                                      *(undefined4 *)(*pauVar306 + lVar275 * 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar368,3);
                                      *(undefined4 *)(*pauVar306 + lVar276 * 4) = uVar407;
                                      if (iVar337 < iVar260) {
                                        *(float *)(*pauVar306 + 4) = auVar537._0_4_;
                                        uVar407 = vextractps_avx(auVar537,1);
                                        *(undefined4 *)(*pauVar306 + lVar296 * 4 + 4) = uVar407;
                                        uVar407 = vextractps_avx(auVar537,2);
                                        *(undefined4 *)(*pauVar306 + lVar271 * 4 + 4) = uVar407;
                                        uVar407 = vextractps_avx(auVar537,3);
                                        *(undefined4 *)(*pauVar306 + lVar272 * 4 + 4) = uVar407;
                                        *(float *)(*pauVar306 + lVar273 * 4 + 4) = auVar551._16_4_;
                                        uVar407 = vextractps_avx(auVar369,1);
                                        *(undefined4 *)(*pauVar306 + lVar274 * 4 + 4) = uVar407;
                                        uVar407 = vextractps_avx(auVar369,2);
                                        *(undefined4 *)(*pauVar306 + lVar275 * 4 + 4) = uVar407;
                                        uVar407 = vextractps_avx(auVar369,3);
                                        *(undefined4 *)(*pauVar306 + lVar276 * 4 + 4) = uVar407;
                                      }
                                      if (iVar315 < iVar260) {
                                        *(float *)(*pauVar306 + 8) = auVar508._0_4_;
                                        uVar407 = vextractps_avx(auVar508,1);
                                        *(undefined4 *)(*pauVar306 + lVar296 * 4 + 8) = uVar407;
                                        uVar407 = vextractps_avx(auVar508,2);
                                        *(undefined4 *)(*pauVar306 + lVar271 * 4 + 8) = uVar407;
                                        uVar407 = vextractps_avx(auVar508,3);
                                        *(undefined4 *)(*pauVar306 + lVar272 * 4 + 8) = uVar407;
                                        *(float *)(*pauVar306 + lVar273 * 4 + 8) = auVar533._16_4_;
                                        uVar407 = vextractps_avx(auVar367,1);
                                        *(undefined4 *)(*pauVar306 + lVar274 * 4 + 8) = uVar407;
                                        uVar407 = vextractps_avx(auVar367,2);
                                        *(undefined4 *)(*pauVar306 + lVar275 * 4 + 8) = uVar407;
                                        uVar407 = vextractps_avx(auVar367,3);
                                        *(undefined4 *)(*pauVar306 + lVar276 * 4 + 8) = uVar407;
                                      }
                                      if (iVar320 < iVar260) {
                                        *(float *)(*pauVar306 + 0xc) = auVar482._0_4_;
                                        uVar407 = vextractps_avx(auVar482,1);
                                        *(undefined4 *)(*pauVar306 + lVar296 * 4 + 0xc) = uVar407;
                                        uVar407 = vextractps_avx(auVar482,2);
                                        *(undefined4 *)(*pauVar306 + lVar271 * 4 + 0xc) = uVar407;
                                        uVar407 = vextractps_avx(auVar482,3);
                                        *(undefined4 *)(*pauVar306 + lVar272 * 4 + 0xc) = uVar407;
                                        *(float *)(*pauVar306 + lVar273 * 4 + 0xc) = auVar504._16_4_
                                        ;
                                        uVar407 = vextractps_avx(auVar366,1);
                                        *(undefined4 *)(*pauVar306 + lVar274 * 4 + 0xc) = uVar407;
                                        uVar407 = vextractps_avx(auVar366,2);
                                        *(undefined4 *)(*pauVar306 + lVar275 * 4 + 0xc) = uVar407;
                                        uVar407 = vextractps_avx(auVar366,3);
                                        *(undefined4 *)(*pauVar306 + lVar276 * 4 + 0xc) = uVar407;
                                      }
                                      if (iVar264 < iVar260) {
                                        *(float *)(*pauVar306 + 0x10) = auVar447._0_4_;
                                        uVar407 = vextractps_avx(auVar447,1);
                                        *(undefined4 *)(*pauVar306 + lVar296 * 4 + 0x10) = uVar407;
                                        uVar407 = vextractps_avx(auVar447,2);
                                        *(undefined4 *)(*pauVar306 + lVar271 * 4 + 0x10) = uVar407;
                                        uVar407 = vextractps_avx(auVar447,3);
                                        *(undefined4 *)(*pauVar306 + lVar272 * 4 + 0x10) = uVar407;
                                        *(float *)(*pauVar306 + lVar273 * 4 + 0x10) =
                                             auVar475._16_4_;
                                        uVar407 = vextractps_avx(auVar370,1);
                                        *(undefined4 *)(*pauVar306 + lVar274 * 4 + 0x10) = uVar407;
                                        uVar407 = vextractps_avx(auVar370,2);
                                        *(undefined4 *)(*pauVar306 + lVar275 * 4 + 0x10) = uVar407;
                                        uVar407 = vextractps_avx(auVar370,3);
                                        *(undefined4 *)(*pauVar306 + lVar276 * 4 + 0x10) = uVar407;
                                      }
                                      if (iVar265 < iVar260) {
                                        *(float *)(*pauVar306 + 0x14) = auVar426._0_4_;
                                        uVar407 = vextractps_avx(auVar426,1);
                                        *(undefined4 *)(*pauVar306 + lVar296 * 4 + 0x14) = uVar407;
                                        uVar407 = vextractps_avx(auVar426,2);
                                        *(undefined4 *)(*pauVar306 + lVar271 * 4 + 0x14) = uVar407;
                                        uVar407 = vextractps_avx(auVar426,3);
                                        *(undefined4 *)(*pauVar306 + lVar272 * 4 + 0x14) = uVar407;
                                        *(float *)(*pauVar306 + lVar273 * 4 + 0x14) =
                                             auVar440._16_4_;
                                        uVar407 = vextractps_avx(auVar365,1);
                                        *(undefined4 *)(*pauVar306 + lVar274 * 4 + 0x14) = uVar407;
                                        uVar407 = vextractps_avx(auVar365,2);
                                        *(undefined4 *)(*pauVar306 + lVar275 * 4 + 0x14) = uVar407;
                                        uVar407 = vextractps_avx(auVar365,3);
                                        *(undefined4 *)(*pauVar306 + lVar276 * 4 + 0x14) = uVar407;
                                      }
                                    }
                                    else if (iVar342 == 4) {
                                      *(undefined1 (*) [16])*pauVar306 = auVar562;
                                      *(undefined1 (*) [16])(*pauVar306 + lVar296 * 4) = auVar368;
                                      if (iVar337 < iVar260) {
                                        *(undefined1 (*) [16])(*pauVar306 + 0x10) = auVar537;
                                        *(undefined1 (*) [16])(*pauVar306 + lVar296 * 4 + 0x10) =
                                             auVar369;
                                      }
                                      if (iVar315 < iVar260) {
                                        *(undefined1 (*) [16])pauVar306[1] = auVar508;
                                        *(undefined1 (*) [16])(pauVar306[1] + lVar296 * 4) =
                                             auVar367;
                                      }
                                      if (iVar320 < iVar260) {
                                        *(undefined1 (*) [16])(pauVar306[1] + 0x10) = auVar482;
                                        *(undefined1 (*) [16])(pauVar306[1] + lVar296 * 4 + 0x10) =
                                             auVar366;
                                      }
                                      if (iVar264 < iVar260) {
                                        *(undefined1 (*) [16])pauVar306[2] = auVar447;
                                        *(undefined1 (*) [16])(pauVar306[2] + lVar296 * 4) =
                                             auVar370;
                                      }
                                      if (iVar265 < iVar260) {
                                        *(undefined1 (*) [16])(pauVar306[2] + 0x10) = auVar426;
                                        *(undefined1 (*) [16])(pauVar306[2] + lVar296 * 4 + 0x10) =
                                             auVar365;
                                      }
                                    }
                                    else if (iVar342 == 8) {
                                      *pauVar306 = auVar585;
                                      if (iVar337 < iVar260) {
                                        pauVar306[1] = auVar551;
                                      }
                                      if (iVar315 < iVar260) {
                                        pauVar306[2] = auVar533;
                                      }
                                      if (iVar320 < iVar260) {
                                        pauVar306[3] = auVar504;
                                      }
                                      if (iVar264 < iVar260) {
                                        pauVar306[4] = auVar475;
                                      }
                                      if (iVar265 < iVar260) {
                                        pauVar306[5] = auVar440;
                                      }
                                    }
                                    pauVar306 = (undefined1 (*) [32])(*pauVar306 + lVar284 * 4);
                                  }
                                  pfVar311 = pfVar311 + 0x40;
                                }
                                lVar295 = lVar295 + 0x20;
                              }
                              uVar281 = (ulong)(uint)((int)uVar278 + iVar263 * 0x200);
                              local_ee0 = uVar278;
                              local_ed8 = pvVar348;
                              pvVar345 = (void *)((long)pvVar348 + 8);
                            }
                            lVar273 = (long)(iVar263 * 4);
                            local_ef8 = (long)(iVar263 * 0x1c) * 4;
                            local_f08 = CONCAT44(local_f08._4_4_,iVar263 * 0x100);
                            local_ef0 = (long)(iVar263 * 0xc) * 4;
                            while (pvVar345 = pvVar348, uVar281 = uVar278,
                                  (long)((ulong)pvVar345 | 3) < (long)local_de8) {
                              if (local_e68 == (void *)0x0) {
                                auVar365 = (undefined1  [16])0x0;
                              }
                              else {
                                auVar365 = *(undefined1 (*) [16])
                                            ((long)local_d10 + (long)pvVar345 * 4);
                              }
                              lVar274 = (long)(int)uVar281;
                              lVar275 = 0;
                              for (uVar278 = 0; uVar278 != local_e08; uVar278 = uVar278 + 1) {
                                lVar277 = (long)local_dc8.data + lVar275;
                                for (lVar276 = -0x80; lVar276 != 0; lVar276 = lVar276 + 0x10) {
                                  auVar370 = *(undefined1 (*) [16])
                                              (lVar277 + lVar273 * 4 + lVar274 * 4);
                                  auVar366 = *(undefined1 (*) [16])
                                              (lVar277 + local_f18 + lVar274 * 4);
                                  auVar367 = *(undefined1 (*) [16])
                                              (lVar277 + local_ef0 + lVar274 * 4);
                                  auVar369 = *(undefined1 (*) [16])
                                              (lVar277 + local_f00 + lVar274 * 4);
                                  auVar368 = *(undefined1 (*) [16])
                                              (lVar277 + (long)(iVar263 * 0x14) * 4 + lVar274 * 4);
                                  auVar371 = *(undefined1 (*) [16])
                                              (lVar277 + local_ed0 + lVar274 * 4);
                                  auVar587._0_4_ = auVar366._0_4_ + auVar370._0_4_;
                                  auVar587._4_4_ = auVar366._4_4_ + auVar370._4_4_;
                                  auVar587._8_4_ = auVar366._8_4_ + auVar370._8_4_;
                                  auVar587._12_4_ = auVar366._12_4_ + auVar370._12_4_;
                                  auVar370 = vsubps_avx(auVar370,auVar366);
                                  auVar448._0_4_ = auVar369._0_4_ + auVar367._0_4_;
                                  auVar448._4_4_ = auVar369._4_4_ + auVar367._4_4_;
                                  auVar448._8_4_ = auVar369._8_4_ + auVar367._8_4_;
                                  auVar448._12_4_ = auVar369._12_4_ + auVar367._12_4_;
                                  auVar366 = vsubps_avx(auVar367,auVar369);
                                  auVar509._0_4_ = auVar371._0_4_ + auVar368._0_4_;
                                  auVar509._4_4_ = auVar371._4_4_ + auVar368._4_4_;
                                  auVar509._8_4_ = auVar371._8_4_ + auVar368._8_4_;
                                  auVar509._12_4_ = auVar371._12_4_ + auVar368._12_4_;
                                  auVar367 = vsubps_avx(auVar368,auVar371);
                                  pfVar311 = (float *)(lVar277 + lVar274 * 4);
                                  auVar369 = vfmadd213ps_fma(auVar421,auVar509,auVar448);
                                  auVar563._0_4_ = auVar369._0_4_ + auVar587._0_4_ + *pfVar311;
                                  auVar563._4_4_ = auVar369._4_4_ + auVar587._4_4_ + pfVar311[1];
                                  auVar563._8_4_ = auVar369._8_4_ + auVar587._8_4_ + pfVar311[2];
                                  auVar563._12_4_ = auVar369._12_4_ + auVar587._12_4_ + pfVar311[3];
                                  auVar369 = vfmadd213ps_fma(auVar364,auVar366,auVar370);
                                  auVar368 = vfmadd231ps_avx512vl(auVar369,auVar367,auVar363);
                                  auVar369 = vfmadd213ps_fma(auVar362,auVar448,auVar587);
                                  auVar371 = vfmadd231ps_avx512vl(auVar369,auVar509,auVar361);
                                  auVar369 = vfmadd213ps_fma(auVar361,auVar366,auVar370);
                                  auVar369 = vfmadd231ps_avx512vl(auVar369,auVar367,auVar362);
                                  auVar372 = vfmadd213ps_avx512vl(auVar448,auVar363,auVar587);
                                  auVar372 = vfmadd231ps_avx512vl(auVar372,auVar364,auVar509);
                                  pfVar311 = (float *)(lVar277 + local_ef8 + lVar274 * 4);
                                  auVar366 = vfmadd213ps_avx512vl(auVar366,auVar421,auVar367);
                                  auVar427._0_4_ = auVar370._0_4_ + *pfVar311 + auVar366._0_4_;
                                  auVar427._4_4_ = auVar370._4_4_ + pfVar311[1] + auVar366._4_4_;
                                  auVar427._8_4_ = auVar370._8_4_ + pfVar311[2] + auVar366._8_4_;
                                  auVar427._12_4_ = auVar370._12_4_ + pfVar311[3] + auVar366._12_4_;
                                  *(undefined1 (*) [16])((long)local_c00 + lVar276) = auVar563;
                                  *(undefined1 (*) [16])((long)local_b80 + lVar276) = auVar368;
                                  *(undefined1 (*) [16])((long)local_b00 + lVar276) = auVar371;
                                  *(undefined1 (*) [16])(auStack_a80 + lVar276) = auVar369;
                                  *(undefined1 (*) [16])(auStack_a00 + lVar276) = auVar372;
                                  *(undefined1 (*) [16])(auStack_980 + lVar276) = auVar427;
                                  lVar277 = lVar277 + local_e18;
                                }
                                iVar297 = iVar328 + (int)uVar278;
                                lVar276 = (long)((iVar297 / iVar261) * 6);
                                iVar297 = (iVar297 % iVar261) * 6;
                                pauVar270 = (undefined1 (*) [16])
                                            ((long)top_blob->data +
                                            (long)(iVar297 * iVar342) * 4 +
                                            (long)top_blob->w * top_blob->elemsize * lVar276 +
                                            (long)((iVar343 + (int)pvVar345) / iVar342) *
                                            top_blob->cstep * top_blob->elemsize);
                                pfVar311 = afStack_c20 + 4;
                                for (lVar277 = 0; lVar277 != 6; lVar277 = lVar277 + 1) {
                                  if (lVar277 < local_d78 - lVar276) {
                                    auVar370 = *(undefined1 (*) [16])(pfVar311 + -0x18);
                                    auVar366 = *(undefined1 (*) [16])(pfVar311 + -0x14);
                                    auVar367 = *(undefined1 (*) [16])(pfVar311 + -0x10);
                                    auVar369 = *(undefined1 (*) [16])(pfVar311 + -0xc);
                                    auVar368 = *(undefined1 (*) [16])(pfVar311 + -8);
                                    auVar371 = *(undefined1 (*) [16])(pfVar311 + -4);
                                    auVar588._0_4_ = auVar366._0_4_ + auVar370._0_4_;
                                    auVar588._4_4_ = auVar366._4_4_ + auVar370._4_4_;
                                    auVar588._8_4_ = auVar366._8_4_ + auVar370._8_4_;
                                    auVar588._12_4_ = auVar366._12_4_ + auVar370._12_4_;
                                    auVar370 = vsubps_avx(auVar370,auVar366);
                                    auVar449._0_4_ = auVar369._0_4_ + auVar367._0_4_;
                                    auVar449._4_4_ = auVar369._4_4_ + auVar367._4_4_;
                                    auVar449._8_4_ = auVar369._8_4_ + auVar367._8_4_;
                                    auVar449._12_4_ = auVar369._12_4_ + auVar367._12_4_;
                                    auVar366 = vsubps_avx(auVar367,auVar369);
                                    auVar633._0_4_ = auVar371._0_4_ + auVar368._0_4_;
                                    auVar633._4_4_ = auVar371._4_4_ + auVar368._4_4_;
                                    auVar633._8_4_ = auVar371._8_4_ + auVar368._8_4_;
                                    auVar633._12_4_ = auVar371._12_4_ + auVar368._12_4_;
                                    auVar367 = vsubps_avx(auVar368,auVar371);
                                    fVar534 = auVar365._0_4_;
                                    fVar552 = auVar365._4_4_;
                                    fVar553 = auVar365._8_4_;
                                    fVar554 = auVar365._12_4_;
                                    auVar369 = vfmadd213ps_fma(auVar421,auVar633,auVar449);
                                    auVar564._0_4_ =
                                         fVar534 + pfVar311[-0x1c] + auVar588._0_4_ + auVar369._0_4_
                                    ;
                                    auVar564._4_4_ =
                                         fVar552 + pfVar311[-0x1b] + auVar588._4_4_ + auVar369._4_4_
                                    ;
                                    auVar564._8_4_ =
                                         fVar553 + pfVar311[-0x1a] + auVar588._8_4_ + auVar369._8_4_
                                    ;
                                    auVar564._12_4_ =
                                         fVar554 + pfVar311[-0x19] + auVar588._12_4_ +
                                         auVar369._12_4_;
                                    auVar369 = vfmadd213ps_fma(auVar364,auVar366,auVar370);
                                    auVar369 = vfmadd231ps_avx512vl(auVar369,auVar367,auVar363);
                                    auVar538._0_4_ = auVar369._0_4_ + fVar534;
                                    auVar538._4_4_ = auVar369._4_4_ + fVar552;
                                    auVar538._8_4_ = auVar369._8_4_ + fVar553;
                                    auVar538._12_4_ = auVar369._12_4_ + fVar554;
                                    auVar369 = vfmadd213ps_fma(auVar362,auVar449,auVar588);
                                    auVar369 = vfmadd231ps_avx512vl(auVar369,auVar633,auVar361);
                                    auVar510._0_4_ = auVar369._0_4_ + fVar534;
                                    auVar510._4_4_ = auVar369._4_4_ + fVar552;
                                    auVar510._8_4_ = auVar369._8_4_ + fVar553;
                                    auVar510._12_4_ = auVar369._12_4_ + fVar554;
                                    auVar369 = vfmadd213ps_fma(auVar361,auVar366,auVar370);
                                    auVar369 = vfmadd231ps_avx512vl(auVar369,auVar367,auVar362);
                                    auVar483._0_4_ = auVar369._0_4_ + fVar534;
                                    auVar483._4_4_ = auVar369._4_4_ + fVar552;
                                    auVar483._8_4_ = auVar369._8_4_ + fVar553;
                                    auVar483._12_4_ = auVar369._12_4_ + fVar554;
                                    auVar369 = vfmadd213ps_avx512vl(auVar449,auVar363,auVar588);
                                    auVar369 = vfmadd231ps_avx512vl(auVar369,auVar364,auVar633);
                                    auVar450._0_4_ = auVar369._0_4_ + fVar534;
                                    auVar450._4_4_ = auVar369._4_4_ + fVar552;
                                    auVar450._8_4_ = auVar369._8_4_ + fVar553;
                                    auVar450._12_4_ = auVar369._12_4_ + fVar554;
                                    auVar366 = vfmadd213ps_avx512vl(auVar366,auVar421,auVar367);
                                    auVar428._0_4_ =
                                         auVar366._0_4_ + auVar370._0_4_ + fVar534 + *pfVar311;
                                    auVar428._4_4_ =
                                         auVar366._4_4_ + auVar370._4_4_ + fVar552 + pfVar311[1];
                                    auVar428._8_4_ =
                                         auVar366._8_4_ + auVar370._8_4_ + fVar553 + pfVar311[2];
                                    auVar428._12_4_ =
                                         auVar366._12_4_ + auVar370._12_4_ + fVar554 + pfVar311[3];
                                    if (iVar342 == 1) {
                                      *(float *)*pauVar270 = auVar564._0_4_;
                                      uVar407 = vextractps_avx(auVar564,1);
                                      *(undefined4 *)(*pauVar270 + lVar296 * 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar564,2);
                                      *(undefined4 *)(*pauVar270 + lVar271 * 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar564,3);
                                      *(undefined4 *)(*pauVar270 + lVar272 * 4) = uVar407;
                                      if (iVar297 + 1 < iVar260) {
                                        *(float *)(*pauVar270 + 4) = auVar538._0_4_;
                                        uVar407 = vextractps_avx(auVar538,1);
                                        *(undefined4 *)(*pauVar270 + lVar296 * 4 + 4) = uVar407;
                                        uVar407 = vextractps_avx(auVar538,2);
                                        *(undefined4 *)(*pauVar270 + lVar271 * 4 + 4) = uVar407;
                                        uVar407 = vextractps_avx(auVar538,3);
                                        *(undefined4 *)(*pauVar270 + lVar272 * 4 + 4) = uVar407;
                                      }
                                      if (iVar297 + 2 < iVar260) {
                                        *(float *)(*pauVar270 + 8) = auVar510._0_4_;
                                        uVar407 = vextractps_avx(auVar510,1);
                                        *(undefined4 *)(*pauVar270 + lVar296 * 4 + 8) = uVar407;
                                        uVar407 = vextractps_avx(auVar510,2);
                                        *(undefined4 *)(*pauVar270 + lVar271 * 4 + 8) = uVar407;
                                        uVar407 = vextractps_avx(auVar510,3);
                                        *(undefined4 *)(*pauVar270 + lVar272 * 4 + 8) = uVar407;
                                      }
                                      if (iVar297 + 3 < iVar260) {
                                        *(float *)(*pauVar270 + 0xc) = auVar483._0_4_;
                                        uVar407 = vextractps_avx(auVar483,1);
                                        *(undefined4 *)(*pauVar270 + lVar296 * 4 + 0xc) = uVar407;
                                        uVar407 = vextractps_avx(auVar483,2);
                                        *(undefined4 *)(*pauVar270 + lVar271 * 4 + 0xc) = uVar407;
                                        uVar407 = vextractps_avx(auVar483,3);
                                        *(undefined4 *)(*pauVar270 + lVar272 * 4 + 0xc) = uVar407;
                                      }
                                      if (iVar297 + 4 < iVar260) {
                                        *(float *)pauVar270[1] = auVar450._0_4_;
                                        uVar407 = vextractps_avx(auVar450,1);
                                        *(undefined4 *)(pauVar270[1] + lVar296 * 4) = uVar407;
                                        uVar407 = vextractps_avx(auVar450,2);
                                        *(undefined4 *)(pauVar270[1] + lVar271 * 4) = uVar407;
                                        uVar407 = vextractps_avx(auVar450,3);
                                        *(undefined4 *)(pauVar270[1] + lVar272 * 4) = uVar407;
                                      }
                                      if (iVar297 + 5 < iVar260) {
                                        *(float *)(pauVar270[1] + 4) = auVar428._0_4_;
                                        uVar407 = vextractps_avx(auVar428,1);
                                        *(undefined4 *)(pauVar270[1] + lVar296 * 4 + 4) = uVar407;
                                        uVar407 = vextractps_avx(auVar428,2);
                                        *(undefined4 *)(pauVar270[1] + lVar271 * 4 + 4) = uVar407;
                                        uVar407 = vextractps_avx(auVar428,3);
                                        *(undefined4 *)(pauVar270[1] + lVar272 * 4 + 4) = uVar407;
                                      }
                                    }
                                    else if (iVar342 == 4) {
                                      *pauVar270 = auVar564;
                                      if (iVar297 + 1 < iVar260) {
                                        pauVar270[1] = auVar538;
                                      }
                                      if (iVar297 + 2 < iVar260) {
                                        pauVar270[2] = auVar510;
                                      }
                                      if (iVar297 + 3 < iVar260) {
                                        pauVar270[3] = auVar483;
                                      }
                                      if (iVar297 + 4 < iVar260) {
                                        pauVar270[4] = auVar450;
                                      }
                                      if (iVar297 + 5 < iVar260) {
                                        pauVar270[5] = auVar428;
                                      }
                                    }
                                    pauVar270 = (undefined1 (*) [16])(*pauVar270 + lVar284 * 4);
                                  }
                                  pfVar311 = pfVar311 + 0x20;
                                }
                                lVar275 = lVar275 + 0x10;
                              }
                              uVar278 = (ulong)(uint)((int)uVar281 + iVar263 * 0x100);
                              local_ee0 = uVar281;
                              local_ed8 = pvVar345;
                              pvVar348 = (void *)((long)pvVar345 + 4);
                            }
                            while( true ) {
                              pvVar348 = pvVar345;
                              uVar278 = uVar281;
                              auVar365 = ZEXT416(0x40800000);
                              if ((long)local_de8 <= (long)((ulong)pvVar348 | 1)) break;
                              lVar271 = (long)pvVar348 + local_e00;
                              if (local_e68 == (void *)0x0) {
                                auVar370 = (undefined1  [16])0x0;
                                auVar366 = ZEXT816(0) << 0x40;
                              }
                              else {
                                auVar370 = ZEXT416(*(uint *)((long)local_e68 + lVar271 * 4));
                                auVar366 = ZEXT416(*(uint *)((long)local_e68 + lVar271 * 4 + 4));
                              }
                              local_ee0._0_4_ = (int)uVar278;
                              iVar342 = top_blob->w;
                              sVar765 = top_blob->cstep;
                              sVar18 = top_blob->elemsize;
                              pvVar345 = top_blob->data;
                              puVar310 = (undefined8 *)
                                         ((long)(int)local_ee0 * 4 + (long)local_dc8.data);
                              for (uVar281 = 0; uVar281 != local_e08; uVar281 = uVar281 + 1) {
                                puVar283 = puVar310;
                                for (lVar272 = -8; lVar272 != 0; lVar272 = lVar272 + 1) {
                                  uVar318 = *(ulong *)((long)puVar283 + (long)(iVar263 * 2) * 4);
                                  auVar451._8_8_ = 0;
                                  auVar451._0_8_ = uVar318;
                                  uVar268 = *(ulong *)((long)puVar283 + lVar273 * 4);
                                  auVar484._8_8_ = 0;
                                  auVar484._0_8_ = uVar268;
                                  auVar511._0_4_ = (float)uVar268 + (float)uVar318;
                                  auVar511._4_4_ =
                                       (float)(uVar268 >> 0x20) + (float)(uVar318 >> 0x20);
                                  auVar511._8_8_ = 0;
                                  uVar318 = *(ulong *)((long)puVar283 + (long)(iVar263 * 6) * 4);
                                  auVar539._8_8_ = 0;
                                  auVar539._0_8_ = uVar318;
                                  uVar268 = *(ulong *)((long)puVar283 + local_ee8 * 4);
                                  auVar565._8_8_ = 0;
                                  auVar565._0_8_ = uVar268;
                                  auVar589._0_4_ = (float)uVar268 + (float)uVar318;
                                  auVar589._4_4_ =
                                       (float)(uVar268 >> 0x20) + (float)(uVar318 >> 0x20);
                                  auVar589._8_8_ = 0;
                                  uVar318 = *(ulong *)((long)puVar283 + (long)(iVar263 * 10) * 4);
                                  auVar609._8_8_ = 0;
                                  auVar609._0_8_ = uVar318;
                                  uVar268 = *(ulong *)((long)puVar283 + (long)(iVar263 * 0xc) * 4);
                                  auVar634._8_8_ = 0;
                                  auVar634._0_8_ = uVar268;
                                  auVar658._0_4_ = (float)uVar268 + (float)uVar318;
                                  auVar658._4_4_ =
                                       (float)(uVar268 >> 0x20) + (float)(uVar318 >> 0x20);
                                  auVar658._8_8_ = 0;
                                  auVar705._0_4_ = auVar589._0_4_ + auVar511._0_4_;
                                  auVar705._4_4_ = auVar589._4_4_ + auVar511._4_4_;
                                  auVar705._8_8_ = 0;
                                  auVar367 = vfmadd231ps_avx512vl(auVar705,auVar658,auVar421);
                                  auVar681._0_4_ = auVar367._0_4_ + (float)*puVar283;
                                  auVar681._4_4_ =
                                       auVar367._4_4_ + (float)((ulong)*puVar283 >> 0x20);
                                  auVar681._8_4_ = auVar367._8_4_ + 0.0;
                                  auVar681._12_4_ = auVar367._12_4_ + 0.0;
                                  uVar408 = vmovlps_avx(auVar681);
                                  *(undefined8 *)(afStack_c38 + (lVar272 + -1) * 2) = uVar408;
                                  auVar367 = vsubps_avx(auVar451,auVar484);
                                  auVar369 = vsubps_avx(auVar539,auVar565);
                                  auVar368 = vsubps_avx(auVar609,auVar634);
                                  auVar371 = vfmadd213ps_fma(auVar364,auVar369,auVar367);
                                  auVar371 = vfmadd231ps_avx512vl(auVar371,auVar368,auVar363);
                                  uVar408 = vmovlps_avx(auVar371);
                                  *(undefined8 *)(local_c00 + lVar272 * 2) = uVar408;
                                  auVar371 = vfmadd213ps_fma(auVar362,auVar589,auVar511);
                                  auVar371 = vfmadd231ps_avx512vl(auVar371,auVar658,auVar361);
                                  uVar408 = vmovlps_avx(auVar371);
                                  *(undefined8 *)(local_bc0 + lVar272 * 2) = uVar408;
                                  auVar371 = vfmadd213ps_fma(auVar361,auVar369,auVar367);
                                  auVar371 = vfmadd231ps_avx512vl(auVar371,auVar368,auVar362);
                                  uVar408 = vmovlps_avx(auVar371);
                                  local_b80[lVar272] = uVar408;
                                  auVar371 = vfmadd213ps_avx512vl(auVar589,auVar363,auVar511);
                                  auVar371 = vfmadd231ps_avx512vl(auVar371,auVar364,auVar658);
                                  uVar408 = vmovlps_avx(auVar371);
                                  local_b40[lVar272] = uVar408;
                                  uVar408 = *(undefined8 *)
                                             ((long)puVar283 + (long)(iVar263 * 0xe) * 4);
                                  auVar367 = vfmadd213ps_avx512vl(auVar369,auVar421,auVar367);
                                  auVar452._0_4_ = auVar367._0_4_ + auVar368._0_4_ + (float)uVar408;
                                  auVar452._4_4_ =
                                       auVar367._4_4_ +
                                       auVar368._4_4_ + (float)((ulong)uVar408 >> 0x20);
                                  auVar452._8_4_ = auVar367._8_4_ + auVar368._8_4_ + 0.0;
                                  auVar452._12_4_ = auVar367._12_4_ + auVar368._12_4_ + 0.0;
                                  uVar408 = vmovlps_avx(auVar452);
                                  local_b00[lVar272] = uVar408;
                                  puVar283 = (undefined8 *)((long)puVar283 + local_f00);
                                }
                                iVar343 = (int)uVar281 + iVar328;
                                lVar272 = (long)((iVar343 / iVar261) * 6);
                                iVar343 = (iVar343 % iVar261) * 6;
                                puVar293 = (undefined4 *)
                                           ((long)pvVar345 +
                                           (long)iVar343 * 4 +
                                           (long)iVar342 * sVar18 * lVar272 +
                                           lVar271 * sVar765 * sVar18);
                                pfVar311 = &fStack_c44;
                                for (lVar274 = 0; lVar274 != 6; lVar274 = lVar274 + 1) {
                                  if (lVar274 < local_d78 - lVar272) {
                                    auVar367 = vsubss_avx512f(ZEXT416((uint)pfVar311[-0xd]),
                                                              ZEXT416((uint)pfVar311[-0xb]));
                                    auVar369 = vsubss_avx512f(ZEXT416((uint)pfVar311[-0xc]),
                                                              ZEXT416((uint)pfVar311[-10]));
                                    fVar553 = pfVar311[-7] + pfVar311[-9];
                                    fVar554 = pfVar311[-6] + pfVar311[-8];
                                    fVar558 = pfVar311[-9] - pfVar311[-7];
                                    fVar1 = pfVar311[-8] - pfVar311[-6];
                                    fVar555 = pfVar311[-3] + pfVar311[-5];
                                    auVar368 = vaddss_avx512f(ZEXT416((uint)pfVar311[-2]),
                                                              ZEXT416((uint)pfVar311[-4]));
                                    fVar20 = pfVar311[-5] - pfVar311[-3];
                                    fVar556 = pfVar311[-0xb] + pfVar311[-0xd] + auVar370._0_4_;
                                    auVar371 = vsubss_avx512f(ZEXT416((uint)pfVar311[-4]),
                                                              ZEXT416((uint)pfVar311[-2]));
                                    auVar372 = vaddss_avx512f(ZEXT416((uint)(fVar556 +
                                                                            pfVar311[-0xf])),
                                                              ZEXT416((uint)fVar553));
                                    auVar372 = vfmadd231ss_avx512f(auVar372,ZEXT416((uint)fVar555),
                                                                   auVar360);
                                    fVar557 = pfVar311[-10] + pfVar311[-0xc] + auVar366._0_4_;
                                    auVar373 = vaddss_avx512f(ZEXT416((uint)(fVar557 +
                                                                            pfVar311[-0xe])),
                                                              ZEXT416((uint)fVar554));
                                    auVar374 = vaddss_avx512f(auVar367,auVar370);
                                    auVar375 = vaddss_avx512f(auVar369,auVar366);
                                    auVar367 = vfmadd213ss_fma(auVar360,ZEXT416((uint)fVar558),
                                                               auVar374);
                                    fVar534 = pfVar311[-1];
                                    auVar369 = vfmadd213ss_fma(auVar360,ZEXT416((uint)fVar1),
                                                               auVar375);
                                    fVar552 = *pfVar311;
                                    auVar373 = vfmadd231ss_avx512f(auVar373,auVar368,auVar360);
                                    *puVar293 = auVar372._0_4_;
                                    puVar293[lVar296] = auVar373._0_4_;
                                    if (iVar343 + 1 < iVar260) {
                                      auVar372 = vfmadd213ss_avx512f(ZEXT416(0x40000000),
                                                                     ZEXT416((uint)fVar1),auVar375);
                                      auVar372 = vfmadd231ss_avx512f(auVar372,auVar371,
                                                                     ZEXT416(0x41800000));
                                      auVar373 = vfmadd213ss_avx512f(ZEXT416(0x40000000),
                                                                     ZEXT416((uint)fVar558),auVar374
                                                                    );
                                      auVar373 = vfmadd231ss_avx512f(auVar373,ZEXT416((uint)fVar20),
                                                                     ZEXT416(0x41800000));
                                      puVar293[1] = auVar373._0_4_;
                                      puVar293[lVar296 + 1] = auVar372._0_4_;
                                    }
                                    if (iVar343 + 2 < iVar260) {
                                      auVar372 = vfmadd213ss_avx512f(ZEXT416(0x40800000),
                                                                     ZEXT416((uint)fVar553),
                                                                     ZEXT416((uint)fVar556));
                                      auVar372 = vfmadd231ss_avx512f(auVar372,ZEXT416((uint)fVar555)
                                                                     ,ZEXT416(0x41000000));
                                      auVar373 = vfmadd213ss_avx512f(ZEXT416(0x40800000),
                                                                     ZEXT416((uint)fVar554),
                                                                     ZEXT416((uint)fVar557));
                                      auVar373 = vfmadd231ss_avx512f(auVar373,auVar368,
                                                                     ZEXT416(0x41000000));
                                      puVar293[2] = auVar372._0_4_;
                                      puVar293[lVar296 + 2] = auVar373._0_4_;
                                    }
                                    if (iVar343 + 3 < iVar260) {
                                      auVar372 = vfmadd213ss_avx512f(ZEXT416((uint)fVar558),
                                                                     ZEXT416(0x41000000),auVar374);
                                      auVar372 = vfmadd213ss_avx512f(ZEXT416((uint)fVar20),auVar365,
                                                                     auVar372);
                                      auVar373 = vfmadd213ss_avx512f(ZEXT416((uint)fVar1),
                                                                     ZEXT416(0x41000000),auVar375);
                                      auVar373 = vfmadd213ss_avx512f(auVar371,auVar365,auVar373);
                                      puVar293[3] = auVar372._0_4_;
                                      puVar293[lVar296 + 3] = auVar373._0_4_;
                                    }
                                    if (iVar343 + 4 < iVar260) {
                                      auVar372 = vfmadd213ss_avx512f(ZEXT416((uint)fVar553),
                                                                     ZEXT416(0x41800000),
                                                                     ZEXT416((uint)fVar556));
                                      auVar372 = vfmadd213ss_fma(ZEXT416((uint)fVar555),
                                                                 SUB6416(ZEXT464(0x40000000),0),
                                                                 auVar372);
                                      auVar373 = vfmadd213ss_avx512f(ZEXT416((uint)fVar554),
                                                                     ZEXT416(0x41800000),
                                                                     ZEXT416((uint)fVar557));
                                      auVar368 = vfmadd213ss_fma(auVar368,SUB6416(ZEXT464(0x40000000
                                                                                         ),0),
                                                                 auVar373);
                                      puVar293[4] = auVar372._0_4_;
                                      puVar293[lVar296 + 4] = auVar368._0_4_;
                                    }
                                    if (iVar343 + 5 < iVar260) {
                                      puVar293[5] = fVar20 + auVar367._0_4_ + fVar534;
                                      puVar293[lVar296 + 5] =
                                           auVar369._0_4_ + auVar371._0_4_ + fVar552;
                                    }
                                    puVar293 = puVar293 + iVar260;
                                  }
                                  pfVar311 = pfVar311 + 0x10;
                                }
                                puVar310 = puVar310 + 1;
                              }
                              uVar281 = (ulong)(uint)((int)local_ee0 + local_d04);
                              pvVar345 = (void *)((long)pvVar348 + 2);
                              local_ee0 = uVar278;
                              local_ed8 = pvVar348;
                            }
                            while (pvVar345 = pvVar348, uVar281 = uVar278,
                                  (long)pvVar345 < (long)local_de8) {
                              if (local_e68 == (void *)0x0) {
                                fVar534 = 0.0;
                              }
                              else {
                                fVar534 = *(float *)((long)local_e68 +
                                                    ((long)pvVar345 + local_e00) * 4);
                              }
                              iVar343 = (int)uVar281;
                              iVar342 = top_blob->w;
                              sVar765 = top_blob->cstep;
                              sVar18 = top_blob->elemsize;
                              pvVar348 = top_blob->data;
                              pfVar311 = (float *)((long)iVar343 * 4 + (long)local_dc8.data);
                              for (uVar278 = 0; uVar278 != local_e08; uVar278 = uVar278 + 1) {
                                lVar271 = -8;
                                pfVar288 = pfVar311;
                                while( true ) {
                                  auVar363 = SUB6416(ZEXT464(0x41800000),0);
                                  auVar421 = SUB6416(ZEXT464(0x40000000),0);
                                  auVar364 = SUB6416(ZEXT464(0x41000000),0);
                                  if (lVar271 == 0) break;
                                  fVar552 = pfVar288[iVar263 * 2] + pfVar288[iVar263];
                                  fVar555 = pfVar288[iVar263] - pfVar288[iVar263 * 2];
                                  fVar553 = pfVar288[lVar273] + pfVar288[iVar263 * 3];
                                  fVar556 = pfVar288[iVar263 * 3] - pfVar288[lVar273];
                                  fVar554 = pfVar288[iVar263 * 6] + pfVar288[iVar263 * 5];
                                  fVar557 = pfVar288[iVar263 * 5] - pfVar288[iVar263 * 6];
                                  auVar362 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar553 + fVar552 +
                                                                               *pfVar288)),
                                                                 ZEXT416((uint)fVar554),auVar360);
                                  *(int *)((long)&pAStack_c60 + lVar271 * 4) = auVar362._0_4_;
                                  auVar362 = vfmadd213ss_fma(auVar421,ZEXT416((uint)fVar556),
                                                             ZEXT416((uint)fVar555));
                                  auVar362 = vfmadd231ss_avx512f(auVar362,ZEXT416((uint)fVar557),
                                                                 auVar363);
                                  afStack_c38[lVar271 + -2] = auVar362._0_4_;
                                  auVar362 = vfmadd213ss_fma(auVar365,ZEXT416((uint)fVar553),
                                                             ZEXT416((uint)fVar552));
                                  auVar362 = vfmadd231ss_avx512f(auVar362,ZEXT416((uint)fVar554),
                                                                 auVar364);
                                  afStack_c20[lVar271] = auVar362._0_4_;
                                  auVar364 = vfmadd213ss_fma(auVar364,ZEXT416((uint)fVar556),
                                                             ZEXT416((uint)fVar555));
                                  auVar364 = vfmadd231ss_avx512f(auVar364,ZEXT416((uint)fVar557),
                                                                 auVar365);
                                  local_c00[lVar271] = auVar364._0_4_;
                                  auVar364 = vfmadd213ss_avx512f(ZEXT416((uint)fVar553),auVar363,
                                                                 ZEXT416((uint)fVar552));
                                  auVar421 = vfmadd231ss_fma(auVar364,auVar421,
                                                             ZEXT416((uint)fVar554));
                                  afStack_be0[lVar271] = auVar421._0_4_;
                                  auVar421 = vfmadd213ss_avx512f(ZEXT416((uint)fVar556),auVar360,
                                                                 ZEXT416((uint)fVar555));
                                  local_bc0[lVar271] =
                                       auVar421._0_4_ + fVar557 + pfVar288[iVar263 * 7];
                                  lVar271 = lVar271 + 1;
                                  pfVar288 = pfVar288 + local_ee8;
                                }
                                iVar297 = (int)uVar278 + iVar328;
                                lVar271 = (long)((iVar297 / iVar261) * 6);
                                iVar297 = (iVar297 % iVar261) * 6;
                                puVar293 = (undefined4 *)
                                           ((long)pvVar348 +
                                           (long)iVar297 * 4 +
                                           (long)iVar342 * sVar18 * lVar271 +
                                           ((long)pvVar345 + local_e00) * sVar765 * sVar18);
                                pfVar288 = afStack_c68 + 1;
                                for (lVar272 = 0; lVar272 != 6; lVar272 = lVar272 + 1) {
                                  if (lVar272 < local_d78 - lVar271) {
                                    fVar553 = pfVar288[-3] + pfVar288[-4];
                                    fVar557 = pfVar288[-4] - pfVar288[-3];
                                    fVar554 = pfVar288[-1] + pfVar288[-2];
                                    fVar558 = pfVar288[-2] - pfVar288[-1];
                                    fVar555 = pfVar288[-6] + fVar534 + pfVar288[-5];
                                    auVar370 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar555 + pfVar288
                                                  [-7] + fVar553)),ZEXT416((uint)fVar554),auVar360);
                                    fVar556 = (pfVar288[-6] - pfVar288[-5]) + fVar534;
                                    auVar362 = vfmadd231ss_avx512f(ZEXT416((uint)fVar555),
                                                                   ZEXT416((uint)fVar553),auVar363);
                                    auVar361 = vfmadd231ss_fma(auVar362,ZEXT416((uint)fVar554),
                                                               auVar421);
                                    auVar362 = vfmadd213ss_fma(auVar360,ZEXT416((uint)fVar557),
                                                               ZEXT416((uint)fVar556));
                                    fVar552 = *pfVar288;
                                    *puVar293 = auVar370._0_4_;
                                    if (iVar297 + 1 < iVar260) {
                                      auVar370 = vfmadd231ss_fma(ZEXT416((uint)fVar556),
                                                                 ZEXT416((uint)fVar557),auVar421);
                                      auVar370 = vfmadd231ss_avx512f(auVar370,ZEXT416((uint)fVar558)
                                                                     ,auVar363);
                                      puVar293[1] = auVar370._0_4_;
                                    }
                                    if (iVar297 + 2 < iVar260) {
                                      auVar370 = vfmadd213ss_avx512f(ZEXT416((uint)fVar553),auVar365
                                                                     ,ZEXT416((uint)fVar555));
                                      auVar370 = vfmadd213ss_avx512f(ZEXT416((uint)fVar554),auVar364
                                                                     ,auVar370);
                                      puVar293[2] = auVar370._0_4_;
                                    }
                                    if (iVar297 + 3 < iVar260) {
                                      auVar370 = vfmadd213ss_avx512f(ZEXT416((uint)fVar557),auVar364
                                                                     ,ZEXT416((uint)fVar556));
                                      auVar370 = vfmadd231ss_avx512f(auVar370,ZEXT416((uint)fVar558)
                                                                     ,auVar365);
                                      puVar293[3] = auVar370._0_4_;
                                    }
                                    if (iVar297 + 4 < iVar260) {
                                      puVar293[4] = auVar361._0_4_;
                                    }
                                    if (iVar297 + 5 < iVar260) {
                                      puVar293[5] = auVar362._0_4_ + fVar552 + fVar558;
                                    }
                                    puVar293 = puVar293 + iVar260;
                                  }
                                  pfVar288 = pfVar288 + 8;
                                }
                                pfVar311 = pfVar311 + 1;
                              }
                              uVar278 = (ulong)(uint)(iVar343 + iVar319);
                              local_ee0 = uVar281;
                              local_ed8 = pvVar345;
                              pvVar348 = (void *)((long)pvVar345 + 1);
                            }
                            uVar291 = iVar328 + local_f20;
                          }
                          if (local_dc8.refcount != (int *)0x0) {
                            LOCK();
                            *local_dc8.refcount = *local_dc8.refcount + -1;
                            UNLOCK();
                            if (*local_dc8.refcount == 0) {
                              if (local_dc8.allocator == (Allocator *)0x0) {
                                free(local_dc8.data);
                              }
                              else {
                                (*(local_dc8.allocator)->_vptr_Allocator[3])();
                              }
                            }
                          }
                          iVar260 = local_ce4 + 1;
                        }
                      }
                      piVar267 = (int *)CONCAT44(local_ec0.refcount._4_4_,local_ec0.refcount._0_4_);
                      if (piVar267 != (int *)0x0) {
                        LOCK();
                        *piVar267 = *piVar267 + -1;
                        UNLOCK();
                        if (*piVar267 == 0) {
                          if (local_ec0.allocator == (Allocator *)0x0) {
                            free(local_ec0.data);
                          }
                          else {
                            (*(local_ec0.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                    }
                  }
                }
                piVar267 = (int *)CONCAT44(uStack_e54,fStack_e58);
                if (piVar267 != (int *)0x0) {
                  LOCK();
                  *piVar267 = *piVar267 + -1;
                  UNLOCK();
                  if (*piVar267 == 0) {
                    if (local_e40 == (Allocator *)0x0) goto LAB_00185ff0;
                    (*local_e40->_vptr_Allocator[3])();
                  }
                }
                goto LAB_00185ffe;
              }
            }
            else {
              uVar2 = top_blob->w;
              uVar5 = top_blob->h;
              auVar409._4_4_ = uVar5;
              auVar409._0_4_ = uVar2;
              auVar360 = vpcmpeqd_avx(auVar360,auVar360);
              auVar409._8_8_ = 0;
              auVar360 = vpsubd_avx(auVar409,auVar360);
              auVar421 = vpsrld_avx(auVar360,0x1f);
              auVar360 = vpaddd_avx(auVar360,auVar421);
              auVar421 = vpsrad_avx(auVar360,1);
              auVar360 = vpshufd_avx(auVar421,0x55);
              auVar360 = vpmulld_avx(auVar360,auVar421);
              uVar330 = top_blob->elempack * top_blob->c;
              uVar278 = (ulong)uVar330;
              iVar261 = auVar360._0_4_;
              uVar318 = CONCAT44(uVar407,iVar261);
              uVar336 = local_d70.elempack * local_d70.c;
              uVar281 = (ulong)uVar336;
              get_optimal_tile_mnk
                        (uVar330,iVar261,uVar336,&local_f1c,(int *)&local_f20,&local_ec4,iVar342);
              iVar260 = local_ec4;
              uVar291 = local_f20;
              local_dd0 = (long)(int)(uVar330 + local_f1c + -1) / (long)local_f1c & 0xffffffff;
              iVar261 = (int)(iVar261 + local_f20 + -1) / (int)local_f20;
              iVar328 = (int)(local_ec4 + uVar336 + -1) / local_ec4;
              local_e20 = 0;
              iVar343 = local_ec4 * local_f20;
              local_e60 = (undefined1  [8])0x0;
              fStack_e58 = 0.0;
              uStack_e54 = 0;
              local_e50 = 0;
              uStack_e4f = 0;
              local_e48 = 0.0;
              local_e40 = (Allocator *)0x0;
              iStack_e38 = 0;
              fStack_e34 = 0.0;
              fStack_e30 = 0.0;
              iStack_e2c = 0;
              iStack_e28 = 0;
              Mat::create((Mat *)local_e60,iVar343,0x10,iVar328,iVar261,4,opt->workspace_allocator);
              iVar263 = -100;
              local_e70 = uVar318;
              local_de0 = uVar281;
              local_d18 = uVar278;
              if ((local_e60 != (undefined1  [8])0x0) && ((long)iStack_e28 * local_e20 != 0)) {
                iVar261 = iVar261 * iVar328;
                iVar343 = iVar343 * 0x10;
                if ((iVar342 < 2) || (iVar342 <= iVar261)) {
                  local_c40 = 0;
                  local_c80 = (undefined1  [8])0x0;
                  afStack_c78[0] = 0.0;
                  afStack_c78[1] = 0.0;
                  uStack_c70 = 0;
                  afStack_c68[0] = 0.0;
                  pAStack_c60 = (Allocator *)0x0;
                  iStack_c58 = 0;
                  fStack_c54 = 0.0;
                  fStack_c50 = 0.0;
                  iStack_c4c = 0;
                  iStack_c48 = 0;
                  Mat::create((Mat *)local_c80,iVar343,1,iVar342,4,opt->workspace_allocator);
                  if ((local_c80 != (undefined1  [8])0x0) && ((long)iStack_c48 * local_c40 != 0)) {
                    iVar343 = 0;
                    if (iVar261 < 1) {
                      iVar261 = 0;
                    }
                    for (; iVar261 != iVar343; iVar343 = iVar343 + 1) {
                      iVar263 = iVar343 / iVar328;
                      uVar336 = iVar343 % iVar328;
                      iVar297 = iVar263 * uVar291;
                      iVar319 = uVar336 * iVar260;
                      uVar330 = (int)local_e70 - iVar297;
                      if ((int)uVar291 < (int)uVar330) {
                        uVar330 = uVar291;
                      }
                      iVar337 = (int)local_de0 - iVar319;
                      if (iVar260 < iVar337) {
                        iVar337 = iVar260;
                      }
                      iVar315 = get_omp_thread_num();
                      local_ec0.data =
                           (void *)((long)iVar315 * local_c40 * uStack_c70 + (long)local_c80);
                      local_ec0.refcount._0_4_ = 0;
                      local_ec0.refcount._4_4_ = 0;
                      local_ec0.elemsize = uStack_c70;
                      local_ec0.elempack = (int)afStack_c68[0];
                      local_ec0.allocator = pAStack_c60;
                      local_ec0.w = (int)fStack_c54;
                      local_ec0.h = (int)fStack_c50;
                      local_ec0.d = 1;
                      local_ec0.c = iStack_c4c;
                      local_ec0.dims = iStack_c58 + -1;
                      local_ec0.cstep =
                           (uStack_c70 * (long)(int)fStack_c50 * (long)(int)fStack_c54 + 0xf &
                           0xfffffffffffffff0) / uStack_c70;
                      if (iStack_c58 == 4) {
                        local_ec0.cstep = (long)(int)fStack_c50 * (long)(int)fStack_c54;
                      }
                      conv3x3s1_winograd23_transform_input_tile
                                (&local_d70,&local_ec0,iVar297,uVar330,iVar319,iVar337,iVar343);
                      local_dc8.elemsize = CONCAT71(uStack_e4f,local_e50);
                      local_dc8.cstep = (long)(int)fStack_e30 * (long)(int)fStack_e34;
                      local_dc8.data =
                           (void *)((long)local_e60 +
                                   uVar336 * local_dc8.elemsize * local_dc8.cstep +
                                   (long)iVar263 * local_e20 * local_dc8.elemsize);
                      local_dc8.refcount = (int *)0x0;
                      local_dc8.elempack = (int)local_e48;
                      local_dc8.allocator = local_e40;
                      local_dc8.dims = 2;
                      local_dc8.w = (int)fStack_e34;
                      local_dc8.h = (int)fStack_e30;
                      local_dc8.d = 1;
                      local_dc8.c = 1;
                      transpose_pack_B_tile
                                (&local_ec0,&local_dc8,0x10,uVar330,iVar337,(int)local_dc8.cstep);
                    }
                    piVar267 = (int *)CONCAT44(afStack_c78[1],afStack_c78[0]);
                    if (piVar267 != (int *)0x0) {
                      LOCK();
                      *piVar267 = *piVar267 + -1;
                      UNLOCK();
                      if (*piVar267 == 0) {
                        if (pAStack_c60 == (Allocator *)0x0) goto LAB_001824a0;
                        (*pAStack_c60->_vptr_Allocator[3])();
                      }
                    }
                    goto LAB_001824a8;
                  }
                  piVar267 = (int *)CONCAT44(afStack_c78[1],afStack_c78[0]);
                  if (piVar267 != (int *)0x0) {
                    LOCK();
                    *piVar267 = *piVar267 + -1;
                    UNLOCK();
                    if (*piVar267 == 0) {
                      if (pAStack_c60 == (Allocator *)0x0) goto LAB_001817b2;
                      (*pAStack_c60->_vptr_Allocator[3])();
                    }
                  }
                }
                else {
                  local_c40 = 0;
                  local_c80 = (undefined1  [8])0x0;
                  afStack_c78[0] = 0.0;
                  afStack_c78[1] = 0.0;
                  uStack_c70 = 0;
                  afStack_c68[0] = 0.0;
                  pAStack_c60 = (Allocator *)0x0;
                  iStack_c58 = 0;
                  fStack_c54 = 0.0;
                  fStack_c50 = 0.0;
                  iStack_c4c = 0;
                  iStack_c48 = 0;
                  Mat::create((Mat *)local_c80,iVar343,4,opt->workspace_allocator);
                  if ((local_c80 == (undefined1  [8])0x0) || ((long)iStack_c48 * local_c40 == 0)) {
                    piVar267 = (int *)CONCAT44(afStack_c78[1],afStack_c78[0]);
                    if (piVar267 != (int *)0x0) {
                      LOCK();
                      *piVar267 = *piVar267 + -1;
                      UNLOCK();
                      if (*piVar267 == 0) {
                        if (pAStack_c60 == (Allocator *)0x0) {
LAB_001817b2:
                          free((void *)local_c80);
                        }
                        else {
                          (*pAStack_c60->_vptr_Allocator[3])();
                        }
                      }
                    }
                  }
                  else {
                    iVar343 = 0;
                    if (iVar261 < 1) {
                      iVar261 = 0;
                      iVar343 = 0;
                    }
                    for (; iVar261 != iVar343; iVar343 = iVar343 + 1) {
                      lVar271 = (long)iVar343;
                      iVar263 = iVar343 / iVar328;
                      iVar297 = iVar263 * uVar291;
                      iVar319 = (int)(lVar271 % (long)iVar328) * iVar260;
                      uVar330 = (int)local_e70 - iVar297;
                      if ((int)uVar291 < (int)uVar330) {
                        uVar330 = uVar291;
                      }
                      iVar337 = (int)local_de0 - iVar319;
                      if (iVar260 < iVar337) {
                        iVar337 = iVar260;
                      }
                      conv3x3s1_winograd23_transform_input_tile
                                (&local_d70,(Mat *)local_c80,iVar297,uVar330,iVar319,iVar337,iVar343
                                );
                      local_ec0.elemsize = CONCAT71(uStack_e4f,local_e50);
                      local_ec0.cstep = (long)(int)fStack_e30 * (long)(int)fStack_e34;
                      local_ec0.data =
                           (void *)((long)local_e60 +
                                   (lVar271 % (long)iVar328 & 0xffffffffU) * local_ec0.elemsize *
                                   local_ec0.cstep + (long)iVar263 * local_e20 * local_ec0.elemsize)
                      ;
                      local_ec0.refcount._0_4_ = 0;
                      local_ec0.refcount._4_4_ = 0;
                      local_ec0.elempack = (int)local_e48;
                      local_ec0.allocator = local_e40;
                      local_ec0.dims = 2;
                      local_ec0.w = (int)fStack_e34;
                      local_ec0.h = (int)fStack_e30;
                      local_ec0.d = 1;
                      local_ec0.c = 1;
                      transpose_pack_B_tile
                                ((Mat *)local_c80,&local_ec0,0x10,uVar330,iVar337,
                                 (int)local_ec0.cstep);
                    }
                    piVar267 = (int *)CONCAT44(afStack_c78[1],afStack_c78[0]);
                    if (piVar267 != (int *)0x0) {
                      LOCK();
                      *piVar267 = *piVar267 + -1;
                      UNLOCK();
                      if (*piVar267 == 0) {
                        if (pAStack_c60 == (Allocator *)0x0) {
LAB_001824a0:
                          free((void *)local_c80);
                        }
                        else {
                          (*pAStack_c60->_vptr_Allocator[3])();
                        }
                      }
                    }
LAB_001824a8:
                    local_ec0.cstep = 0;
                    local_ec0.data = (void *)0x0;
                    local_ec0.refcount._0_4_ = 0;
                    local_ec0.refcount._4_4_ = 0;
                    local_ec0.elemsize = 0;
                    local_ec0.elempack = 0;
                    local_ec0.allocator = (Allocator *)0x0;
                    local_ec0.dims = 0;
                    local_ec0.w = 0;
                    local_ec0.h = 0;
                    local_ec0.d = 0;
                    local_ec0.c = 0;
                    Mat::create(&local_ec0,local_f20 * local_f1c * 0x10,1,iVar342,4,
                                opt->workspace_allocator);
                    iVar263 = -100;
                    if ((local_ec0.data != (void *)0x0) &&
                       ((long)local_ec0.c * local_ec0.cstep != 0)) {
                      iVar260 = (int)local_dd0;
                      local_dd0 = local_dd0 & 0xffffffff;
                      if (iVar260 < 1) {
                        local_dd0 = 0;
                      }
                      uVar278 = 0;
                      while (iVar260 = local_f1c, iVar263 = 0, uVar278 != local_dd0) {
                        local_d28 = uVar278;
                        iVar342 = get_omp_thread_num();
                        local_dc8.data =
                             (void *)((long)iVar342 * local_ec0.cstep * local_ec0.elemsize +
                                     (long)local_ec0.data);
                        local_dc8.refcount = (int *)0x0;
                        local_dc8.elemsize = local_ec0.elemsize;
                        local_dc8.elempack = local_ec0.elempack;
                        local_dc8.allocator = local_ec0.allocator;
                        local_dc8.w = local_ec0.w;
                        local_dc8.h = local_ec0.h;
                        local_dc8.c = local_ec0.d;
                        local_dc8.d = 1;
                        local_dc8.dims = local_ec0.dims + -1;
                        local_dc8.cstep =
                             (local_ec0.elemsize * (long)local_ec0.h * (long)local_ec0.w + 0xf &
                             0xfffffffffffffff0) / local_ec0.elemsize;
                        if (local_ec0.dims == 4) {
                          local_dc8.cstep = (long)local_ec0.h * (long)local_ec0.w;
                        }
                        uVar291 = iVar260 * (int)local_d28;
                        local_f00 = (ulong)uVar291;
                        iVar342 = (int)local_d18 - uVar291;
                        if (iVar260 < iVar342) {
                          iVar342 = iVar260;
                        }
                        local_e18 = (long)(int)uVar291;
                        local_d10 = (void *)CONCAT44(local_d10._4_4_,iVar342);
                        local_dd8 = (long)iVar342;
                        for (iVar260 = 0; iVar342 = local_ec4, uVar291 = (int)local_e70 - iVar260,
                            uVar291 != 0 && iVar260 <= (int)local_e70;
                            iVar260 = (int)local_d20 + iVar260) {
                          local_d20 = CONCAT44(local_d20._4_4_,local_f20);
                          if ((int)local_f20 < (int)uVar291) {
                            uVar291 = local_f20;
                          }
                          local_df8 = (ulong)uVar291;
                          iVar261 = 0;
                          uVar278 = local_de0 & 0xffffffff;
                          while( true ) {
                            iVar343 = (int)uVar278;
                            iVar328 = (int)local_df8;
                            if ((int)local_de0 <= iVar261) break;
                            iVar263 = iVar343;
                            if (iVar342 < iVar343) {
                              iVar263 = iVar342;
                            }
                            fStack_c54 = (float)(this->weight_winograd23_data).w;
                            fStack_c50 = (float)(this->weight_winograd23_data).h;
                            uStack_c70 = (this->weight_winograd23_data).elemsize;
                            afStack_c68[0] = (float)(this->weight_winograd23_data).elempack;
                            pAStack_c60 = (this->weight_winograd23_data).allocator;
                            local_c40 = (long)(int)fStack_c50 * (long)(int)fStack_c54;
                            local_c80 = (undefined1  [8])
                                        ((long)(this->weight_winograd23_data).data +
                                        uStack_c70 * local_c40 * (long)(iVar261 / iVar342) +
                                        (this->weight_winograd23_data).cstep * local_d28 *
                                        uStack_c70);
                            afStack_c78[0] = 0.0;
                            afStack_c78[1] = 0.0;
                            local_cd0.dims = 2;
                            iStack_c4c = 1;
                            iStack_c48 = 1;
                            local_cd0.elemsize = CONCAT71(uStack_e4f,local_e50);
                            local_cd0.cstep = (long)(int)fStack_e30 * (long)(int)fStack_e34;
                            local_cd0.data =
                                 (void *)((long)local_e60 +
                                         local_cd0.cstep * local_cd0.elemsize *
                                         (long)(iVar261 / iVar342) +
                                         (long)(iVar260 / (int)local_d20) * local_e20 *
                                         local_cd0.elemsize);
                            local_cd0.refcount = (int *)0x0;
                            local_cd0.elempack = (int)local_e48;
                            local_cd0.allocator = local_e40;
                            local_cd0.w = (int)fStack_e34;
                            local_cd0.h = (int)fStack_e30;
                            local_cd0.d = 1;
                            local_cd0.c = 1;
                            iStack_c58 = local_cd0.dims;
                            gemm_transB_packed_tile
                                      ((Mat *)local_c80,&local_cd0,&local_dc8,0x10,(int)local_d10,
                                       iVar328,iVar261,iVar263);
                            iVar261 = iVar261 + iVar342;
                            uVar278 = (ulong)(uint)-(iVar342 - iVar343);
                          }
                          iVar342 = top_blob->w;
                          iVar261 = top_blob->elempack;
                          iVar343 = top_blob->h;
                          iVar319 = (int)top_blob->cstep * iVar261;
                          iVar297 = (iVar342 + 1) / 2;
                          iVar337 = iVar328 * 0x10;
                          iVar315 = iVar328 * 0x20;
                          iVar320 = iVar328 * 0x40;
                          lVar295 = (long)iVar319;
                          lVar271 = (long)(iVar319 * 2);
                          lVar272 = (long)(iVar319 * 3);
                          lVar273 = (long)(iVar319 * 4);
                          lVar274 = (long)(iVar319 * 5);
                          lVar275 = (long)(iVar319 * 6);
                          lVar276 = (long)(iVar319 * 7);
                          local_f18 = (long)(iVar319 * 0xd);
                          local_ef8 = (long)(iVar319 * 0xe);
                          local_f08 = (long)(iVar319 * 0xf);
                          lVar277 = (long)(iVar261 * iVar342);
                          iVar263 = 0;
                          uVar278 = 0;
                          if (0 < iVar328) {
                            uVar278 = local_df8 & 0xffffffff;
                          }
                          local_d80 = (long)(iVar328 * 0x30) * 4;
                          local_e00 = CONCAT44(local_e00._4_4_,iVar328 * 0x100);
                          local_e68 = (void *)CONCAT44(local_e68._4_4_,iVar320);
                          local_de8 = (void *)CONCAT44(local_de8._4_4_,iVar315);
                          local_e10 = (long)iVar315 * 4;
                          local_ee0 = CONCAT44(local_ee0._4_4_,iVar337);
                          local_ee8 = (long)iVar337 * 4;
                          local_ed8 = (this->super_Convolution).bias_data.data;
                          local_df0 = (void *)((long)local_ed8 + local_e18 * 4);
                          for (uVar281 = 0; iVar264 = (int)local_f00,
                              (long)(uVar281 | 0xf) < local_dd8; uVar281 = uVar281 + 0x10) {
                            if (local_ed8 == (void *)0x0) {
                              auVar394 = ZEXT1664((undefined1  [16])0x0);
                            }
                            else {
                              auVar394 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                                            ((long)local_df0 + uVar281 * 4));
                            }
                            lVar279 = (long)iVar263;
                            iVar264 = iVar264 + (int)uVar281;
                            local_d78 = CONCAT44(local_d78._4_4_,iVar264);
                            uVar318 = 0;
                            uVar268 = 0;
                            while (uVar321 = uVar268, uVar317 = uVar318, uVar321 != uVar278) {
                              lVar280 = (long)local_dc8.data + uVar317;
                              for (lVar299 = -0x100; lVar299 != 0; lVar299 = lVar299 + 0x40) {
                                auVar396 = *(undefined1 (*) [64])(lVar280 + local_ee8 + lVar279 * 4)
                                ;
                                auVar397 = *(undefined1 (*) [64])(lVar280 + local_e10 + lVar279 * 4)
                                ;
                                auVar395 = vaddps_avx512f(auVar396,*(undefined1 (*) [64])
                                                                    (lVar280 + lVar279 * 4));
                                auVar395 = vaddps_avx512f(auVar395,auVar397);
                                auVar396 = vsubps_avx512f(auVar396,auVar397);
                                auVar396 = vaddps_avx512f(auVar396,*(undefined1 (*) [64])
                                                                    (lVar280 +
                                                                    local_d80 + lVar279 * 4));
                                *(undefined1 (*) [64])((long)local_b80 + lVar299) = auVar395;
                                *(undefined1 (*) [64])(auStack_a80 + lVar299) = auVar396;
                                lVar280 = lVar280 + (long)iVar320 * 4;
                              }
                              iVar265 = iVar260 + (int)uVar321;
                              uVar318 = (long)iVar265 % (long)iVar297;
                              local_e08 = uVar318 & 0xffffffff;
                              uVar291 = (iVar265 / iVar297) * 2;
                              iVar265 = (int)uVar318;
                              pauVar266 = (undefined1 (*) [64])
                                          ((long)top_blob->data +
                                          (long)(iVar265 * 2 * iVar261) * 4 +
                                          (long)top_blob->w * top_blob->elemsize *
                                          (long)(int)uVar291 +
                                          (long)(iVar264 / iVar261) * top_blob->cstep *
                                          top_blob->elemsize);
                              iVar265 = iVar265 * 2 + 1;
                              pauVar302 = (undefined1 (*) [64])local_bc0;
                              for (lVar280 = 0; lVar280 != 2; lVar280 = lVar280 + 1) {
                                if ((int)(uVar291 | (uint)lVar280) < iVar343) {
                                  auVar396 = vaddps_avx512f(auVar394,pauVar302[-2]);
                                  auVar397 = vaddps_avx512f(auVar396,pauVar302[-3]);
                                  auVar397 = vaddps_avx512f(auVar397,pauVar302[-1]);
                                  auVar396 = vsubps_avx512f(auVar396,pauVar302[-1]);
                                  auVar396 = vaddps_avx512f(auVar396,*pauVar302);
                                  auVar360 = auVar396._0_16_;
                                  auVar421 = auVar397._0_16_;
                                  if (iVar261 == 1) {
                                    *(int *)*pauVar266 = auVar397._0_4_;
                                    uVar407 = vextractps_avx(auVar421,1);
                                    *(undefined4 *)(*pauVar266 + lVar295 * 4) = uVar407;
                                    uVar407 = vextractps_avx(auVar421,2);
                                    *(undefined4 *)(*pauVar266 + lVar271 * 4) = uVar407;
                                    uVar407 = vextractps_avx(auVar421,3);
                                    *(undefined4 *)(*pauVar266 + lVar272 * 4) = uVar407;
                                    auVar421 = auVar397._16_16_;
                                    *(int *)(*pauVar266 + lVar273 * 4) = auVar397._16_4_;
                                    uVar407 = vextractps_avx(auVar421,1);
                                    *(undefined4 *)(*pauVar266 + lVar274 * 4) = uVar407;
                                    uVar407 = vextractps_avx(auVar421,2);
                                    *(undefined4 *)(*pauVar266 + lVar275 * 4) = uVar407;
                                    uVar407 = vextractps_avx(auVar421,3);
                                    *(undefined4 *)(*pauVar266 + lVar276 * 4) = uVar407;
                                    auVar421 = vextracti32x4_avx512f(auVar397,2);
                                    *(int *)(*pauVar266 + (long)(iVar319 * 8) * 4) = auVar421._0_4_;
                                    uVar407 = vextractps_avx(auVar421,1);
                                    *(undefined4 *)(*pauVar266 + (long)(iVar319 * 9) * 4) = uVar407;
                                    uVar407 = vextractps_avx(auVar421,2);
                                    *(undefined4 *)(*pauVar266 + (long)(iVar319 * 10) * 4) = uVar407
                                    ;
                                    uVar407 = vextractps_avx(auVar421,3);
                                    *(undefined4 *)(*pauVar266 + (long)(iVar319 * 0xb) * 4) =
                                         uVar407;
                                    auVar421 = vextracti32x4_avx512f(auVar397,3);
                                    *(int *)(*pauVar266 + (long)(iVar319 * 0xc) * 4) =
                                         auVar421._0_4_;
                                    uVar407 = vextractps_avx(auVar421,1);
                                    *(undefined4 *)(*pauVar266 + local_f18 * 4) = uVar407;
                                    uVar407 = vextractps_avx(auVar421,2);
                                    *(undefined4 *)(*pauVar266 + local_ef8 * 4) = uVar407;
                                    uVar407 = vextractps_avx(auVar421,3);
                                    *(undefined4 *)(*pauVar266 + local_f08 * 4) = uVar407;
                                    if (iVar265 < iVar342) {
                                      *(int *)(*pauVar266 + 4) = auVar396._0_4_;
                                      uVar407 = vextractps_avx(auVar360,1);
                                      *(undefined4 *)(*pauVar266 + lVar295 * 4 + 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar360,2);
                                      *(undefined4 *)(*pauVar266 + lVar271 * 4 + 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar360,3);
                                      *(undefined4 *)(*pauVar266 + lVar272 * 4 + 4) = uVar407;
                                      auVar360 = auVar396._16_16_;
                                      *(int *)(*pauVar266 + lVar273 * 4 + 4) = auVar396._16_4_;
                                      uVar407 = vextractps_avx(auVar360,1);
                                      *(undefined4 *)(*pauVar266 + lVar274 * 4 + 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar360,2);
                                      *(undefined4 *)(*pauVar266 + lVar275 * 4 + 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar360,3);
                                      *(undefined4 *)(*pauVar266 + lVar276 * 4 + 4) = uVar407;
                                      auVar360 = vextracti32x4_avx512f(auVar396,2);
                                      *(int *)(*pauVar266 + (long)(iVar319 * 8) * 4 + 4) =
                                           auVar360._0_4_;
                                      uVar407 = vextractps_avx(auVar360,1);
                                      *(undefined4 *)(*pauVar266 + (long)(iVar319 * 9) * 4 + 4) =
                                           uVar407;
                                      uVar407 = vextractps_avx(auVar360,2);
                                      *(undefined4 *)(*pauVar266 + (long)(iVar319 * 10) * 4 + 4) =
                                           uVar407;
                                      uVar407 = vextractps_avx(auVar360,3);
                                      *(undefined4 *)(*pauVar266 + (long)(iVar319 * 0xb) * 4 + 4) =
                                           uVar407;
                                      auVar360 = vextracti32x4_avx512f(auVar396,3);
                                      *(int *)(*pauVar266 + (long)(iVar319 * 0xc) * 4 + 4) =
                                           auVar360._0_4_;
                                      uVar407 = vextractps_avx(auVar360,1);
                                      *(undefined4 *)(*pauVar266 + local_f18 * 4 + 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar360,2);
                                      *(undefined4 *)(*pauVar266 + local_ef8 * 4 + 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar360,3);
                                      *(undefined4 *)(*pauVar266 + local_f08 * 4 + 4) = uVar407;
                                    }
                                  }
                                  else if (iVar261 == 4) {
                                    *(undefined1 (*) [16])*pauVar266 = auVar421;
                                    auVar421 = vextractf32x4_avx512f(auVar397,1);
                                    *(undefined1 (*) [16])(*pauVar266 + lVar295 * 4) = auVar421;
                                    auVar421 = vextractf32x4_avx512f(auVar397,2);
                                    *(undefined1 (*) [16])(*pauVar266 + lVar271 * 4) = auVar421;
                                    auVar421 = vextractf32x4_avx512f(auVar397,3);
                                    *(undefined1 (*) [16])(*pauVar266 + lVar272 * 4) = auVar421;
                                    if (iVar265 < iVar342) {
                                      *(undefined1 (*) [16])(*pauVar266 + 0x10) = auVar360;
                                      auVar360 = vextractf32x4_avx512f(auVar396,1);
                                      *(undefined1 (*) [16])(*pauVar266 + lVar295 * 4 + 8) =
                                           auVar360;
                                      auVar360 = vextractf32x4_avx512f(auVar396,2);
                                      *(undefined1 (*) [16])(*pauVar266 + lVar271 * 4 + 8) =
                                           auVar360;
                                      auVar360 = vextractf32x4_avx512f(auVar396,3);
                                      *(undefined1 (*) [16])(*pauVar266 + lVar272 * 4 + 8) =
                                           auVar360;
                                    }
                                  }
                                  else if (iVar261 == 8) {
                                    *(undefined1 (*) [32])*pauVar266 = auVar397._0_32_;
                                    auVar393 = vextractf64x4_avx512f(auVar397,1);
                                    *(undefined1 (*) [32])(*pauVar266 + lVar295 * 4) = auVar393;
                                    if (iVar265 < iVar342) {
                                      *(undefined1 (*) [32])(*pauVar266 + 0x20) = auVar396._0_32_;
                                      auVar393 = vextractf64x4_avx512f(auVar396,1);
                                      *(undefined1 (*) [32])(*pauVar266 + lVar295 * 4 + 0x10) =
                                           auVar393;
                                    }
                                  }
                                  else if ((iVar261 == 0x10) &&
                                          (*pauVar266 = auVar397, iVar265 < iVar342)) {
                                    pauVar266[1] = auVar396;
                                  }
                                  pauVar266 = (undefined1 (*) [64])(*pauVar266 + lVar277 * 4);
                                }
                                pauVar302 = pauVar302 + 4;
                              }
                              uVar318 = uVar317 + 0x40;
                              local_ef0 = uVar321;
                              local_ed0 = uVar317;
                              uVar268 = uVar321 + 1;
                            }
                            iVar263 = iVar263 + iVar328 * 0x100;
                          }
                          lVar279 = (long)(iVar328 * 8) * 4;
                          for (; (long)(uVar281 | 7) < local_dd8; uVar281 = uVar281 + 8) {
                            if (local_ed8 == (void *)0x0) {
                              auVar393 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                            }
                            else {
                              auVar393 = *(undefined1 (*) [32])((long)local_df0 + uVar281 * 4);
                            }
                            lVar280 = (long)iVar263;
                            lVar299 = 0;
                            for (uVar318 = 0; uVar318 != uVar278; uVar318 = uVar318 + 1) {
                              lVar282 = (long)local_dc8.data + lVar299;
                              for (lVar300 = -0x80; lVar300 != 0; lVar300 = lVar300 + 0x20) {
                                auVar376 = *(undefined1 (*) [32])(lVar282 + lVar279 + lVar280 * 4);
                                auVar14 = *(undefined1 (*) [32])(lVar282 + local_ee8 + lVar280 * 4);
                                pfVar311 = (float *)(lVar282 + lVar280 * 4);
                                auVar502._0_4_ = auVar376._0_4_ + *pfVar311 + auVar14._0_4_;
                                auVar502._4_4_ = auVar376._4_4_ + pfVar311[1] + auVar14._4_4_;
                                auVar502._8_4_ = auVar376._8_4_ + pfVar311[2] + auVar14._8_4_;
                                auVar502._12_4_ = auVar376._12_4_ + pfVar311[3] + auVar14._12_4_;
                                auVar502._16_4_ = auVar376._16_4_ + pfVar311[4] + auVar14._16_4_;
                                auVar502._20_4_ = auVar376._20_4_ + pfVar311[5] + auVar14._20_4_;
                                auVar502._24_4_ = auVar376._24_4_ + pfVar311[6] + auVar14._24_4_;
                                auVar502._28_4_ = auVar376._28_4_ + pfVar311[7] + auVar14._28_4_;
                                auVar376 = vsubps_avx(auVar376,auVar14);
                                pfVar311 = (float *)(lVar282 +
                                                    (long)(iVar328 * 0x18) * 4 + lVar280 * 4);
                                auVar435._0_4_ = auVar376._0_4_ + *pfVar311;
                                auVar435._4_4_ = auVar376._4_4_ + pfVar311[1];
                                auVar435._8_4_ = auVar376._8_4_ + pfVar311[2];
                                auVar435._12_4_ = auVar376._12_4_ + pfVar311[3];
                                auVar435._16_4_ = auVar376._16_4_ + pfVar311[4];
                                auVar435._20_4_ = auVar376._20_4_ + pfVar311[5];
                                auVar435._24_4_ = auVar376._24_4_ + pfVar311[6];
                                auVar435._28_4_ = auVar376._28_4_ + pfVar311[7];
                                *(undefined1 (*) [32])((long)local_c00 + lVar300) = auVar502;
                                *(undefined1 (*) [32])((long)local_b80 + lVar300) = auVar435;
                                lVar282 = lVar282 + local_e10;
                              }
                              iVar265 = iVar260 + (int)uVar318;
                              iVar319 = iVar265 % iVar297;
                              uVar291 = (iVar265 / iVar297) * 2;
                              pauVar306 = (undefined1 (*) [32])
                                          ((long)top_blob->data +
                                          (long)(iVar319 * 2 * iVar261) * 4 +
                                          (long)top_blob->w * top_blob->elemsize *
                                          (long)(int)uVar291 +
                                          (long)((iVar264 + (int)uVar281) / iVar261) *
                                          top_blob->cstep * top_blob->elemsize);
                              iVar319 = iVar319 * 2 + 1;
                              pfVar311 = afStack_c20;
                              for (lVar300 = 0; lVar300 != 2; lVar300 = lVar300 + 1) {
                                if ((int)(uVar291 | (uint)lVar300) < iVar343) {
                                  auVar436._0_4_ = auVar393._0_4_ + pfVar311[-0x10];
                                  auVar436._4_4_ = auVar393._4_4_ + pfVar311[-0xf];
                                  auVar436._8_4_ = auVar393._8_4_ + pfVar311[-0xe];
                                  auVar436._12_4_ = auVar393._12_4_ + pfVar311[-0xd];
                                  auVar436._16_4_ = auVar393._16_4_ + pfVar311[-0xc];
                                  auVar436._20_4_ = auVar393._20_4_ + pfVar311[-0xb];
                                  auVar436._24_4_ = auVar393._24_4_ + pfVar311[-10];
                                  auVar436._28_4_ = auVar393._28_4_ + pfVar311[-9];
                                  auVar376 = *(undefined1 (*) [32])(pfVar311 + -8);
                                  auVar441._0_4_ = auVar436._0_4_ + pfVar311[-0x18] + auVar376._0_4_
                                  ;
                                  auVar441._4_4_ = auVar436._4_4_ + pfVar311[-0x17] + auVar376._4_4_
                                  ;
                                  auVar441._8_4_ = auVar436._8_4_ + pfVar311[-0x16] + auVar376._8_4_
                                  ;
                                  auVar441._12_4_ =
                                       auVar436._12_4_ + pfVar311[-0x15] + auVar376._12_4_;
                                  auVar471._16_4_ =
                                       auVar436._16_4_ + pfVar311[-0x14] + auVar376._16_4_;
                                  auVar471._0_16_ = auVar441;
                                  auVar471._20_4_ =
                                       auVar436._20_4_ + pfVar311[-0x13] + auVar376._20_4_;
                                  auVar471._24_4_ =
                                       auVar436._24_4_ + pfVar311[-0x12] + auVar376._24_4_;
                                  auVar471._28_4_ =
                                       auVar436._28_4_ + pfVar311[-0x11] + auVar376._28_4_;
                                  auVar376 = vsubps_avx(auVar436,auVar376);
                                  auVar422._0_4_ = auVar376._0_4_ + *pfVar311;
                                  auVar422._4_4_ = auVar376._4_4_ + pfVar311[1];
                                  auVar422._8_4_ = auVar376._8_4_ + pfVar311[2];
                                  auVar422._12_4_ = auVar376._12_4_ + pfVar311[3];
                                  auVar437._16_4_ = auVar376._16_4_ + pfVar311[4];
                                  auVar437._0_16_ = auVar422;
                                  auVar437._20_4_ = auVar376._20_4_ + pfVar311[5];
                                  auVar437._24_4_ = auVar376._24_4_ + pfVar311[6];
                                  auVar437._28_4_ = auVar376._28_4_ + pfVar311[7];
                                  auVar421 = auVar471._16_16_;
                                  auVar360 = auVar437._16_16_;
                                  if (iVar261 == 1) {
                                    *(float *)*pauVar306 = auVar441._0_4_;
                                    uVar407 = vextractps_avx(auVar441,1);
                                    *(undefined4 *)(*pauVar306 + lVar295 * 4) = uVar407;
                                    uVar407 = vextractps_avx(auVar441,2);
                                    *(undefined4 *)(*pauVar306 + lVar271 * 4) = uVar407;
                                    uVar407 = vextractps_avx(auVar441,3);
                                    *(undefined4 *)(*pauVar306 + lVar272 * 4) = uVar407;
                                    *(float *)(*pauVar306 + lVar273 * 4) = auVar471._16_4_;
                                    uVar407 = vextractps_avx(auVar421,1);
                                    *(undefined4 *)(*pauVar306 + lVar274 * 4) = uVar407;
                                    uVar407 = vextractps_avx(auVar421,2);
                                    *(undefined4 *)(*pauVar306 + lVar275 * 4) = uVar407;
                                    uVar407 = vextractps_avx(auVar421,3);
                                    *(undefined4 *)(*pauVar306 + lVar276 * 4) = uVar407;
                                    if (iVar319 < iVar342) {
                                      *(float *)(*pauVar306 + 4) = auVar422._0_4_;
                                      uVar407 = vextractps_avx(auVar422,1);
                                      *(undefined4 *)(*pauVar306 + lVar295 * 4 + 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar422,2);
                                      *(undefined4 *)(*pauVar306 + lVar271 * 4 + 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar422,3);
                                      *(undefined4 *)(*pauVar306 + lVar272 * 4 + 4) = uVar407;
                                      *(float *)(*pauVar306 + lVar273 * 4 + 4) = auVar437._16_4_;
                                      uVar407 = vextractps_avx(auVar360,1);
                                      *(undefined4 *)(*pauVar306 + lVar274 * 4 + 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar360,2);
                                      *(undefined4 *)(*pauVar306 + lVar275 * 4 + 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar360,3);
                                      *(undefined4 *)(*pauVar306 + lVar276 * 4 + 4) = uVar407;
                                    }
                                  }
                                  else if (iVar261 == 4) {
                                    *(undefined1 (*) [16])*pauVar306 = auVar441;
                                    *(undefined1 (*) [16])(*pauVar306 + lVar295 * 4) = auVar421;
                                    if (iVar319 < iVar342) {
                                      *(undefined1 (*) [16])(*pauVar306 + 0x10) = auVar422;
                                      *(undefined1 (*) [16])(*pauVar306 + lVar295 * 4 + 0x10) =
                                           auVar360;
                                    }
                                  }
                                  else if ((iVar261 == 8) &&
                                          (*pauVar306 = auVar471, iVar319 < iVar342)) {
                                    pauVar306[1] = auVar437;
                                  }
                                  pauVar306 = (undefined1 (*) [32])(*pauVar306 + lVar277 * 4);
                                }
                                pfVar311 = pfVar311 + 0x20;
                              }
                              lVar299 = lVar299 + 0x20;
                            }
                            iVar263 = iVar263 + iVar328 * 0x80;
                          }
                          lVar273 = (long)(iVar328 * 4);
                          for (; (long)(uVar281 | 3) < local_dd8; uVar281 = uVar281 + 4) {
                            if (local_ed8 == (void *)0x0) {
                              auVar360 = (undefined1  [16])0x0;
                            }
                            else {
                              auVar360 = *(undefined1 (*) [16])((long)local_df0 + uVar281 * 4);
                            }
                            lVar274 = (long)iVar263;
                            lVar275 = 0;
                            for (uVar318 = 0; uVar318 != uVar278; uVar318 = uVar318 + 1) {
                              lVar280 = (long)local_dc8.data + lVar275;
                              for (lVar276 = -0x40; lVar276 != 0; lVar276 = lVar276 + 0x10) {
                                auVar421 = *(undefined1 (*) [16])
                                            (lVar280 + lVar273 * 4 + lVar274 * 4);
                                auVar364 = *(undefined1 (*) [16])(lVar280 + lVar279 + lVar274 * 4);
                                pfVar311 = (float *)(lVar280 + lVar274 * 4);
                                auVar476._0_4_ = auVar421._0_4_ + *pfVar311 + auVar364._0_4_;
                                auVar476._4_4_ = auVar421._4_4_ + pfVar311[1] + auVar364._4_4_;
                                auVar476._8_4_ = auVar421._8_4_ + pfVar311[2] + auVar364._8_4_;
                                auVar476._12_4_ = auVar421._12_4_ + pfVar311[3] + auVar364._12_4_;
                                auVar421 = vsubps_avx(auVar421,auVar364);
                                pfVar311 = (float *)(lVar280 +
                                                    (long)(iVar328 * 0xc) * 4 + lVar274 * 4);
                                auVar423._0_4_ = auVar421._0_4_ + *pfVar311;
                                auVar423._4_4_ = auVar421._4_4_ + pfVar311[1];
                                auVar423._8_4_ = auVar421._8_4_ + pfVar311[2];
                                auVar423._12_4_ = auVar421._12_4_ + pfVar311[3];
                                *(undefined1 (*) [16])((long)&local_c40 + lVar276) = auVar476;
                                *(undefined1 (*) [16])((long)local_c00 + lVar276) = auVar423;
                                lVar280 = lVar280 + local_ee8;
                              }
                              iVar265 = iVar260 + (int)uVar318;
                              iVar319 = iVar265 % iVar297;
                              uVar291 = (iVar265 / iVar297) * 2;
                              pauVar270 = (undefined1 (*) [16])
                                          ((long)top_blob->data +
                                          (long)(iVar319 * 2 * iVar261) * 4 +
                                          (long)top_blob->w * top_blob->elemsize *
                                          (long)(int)uVar291 +
                                          (long)((iVar264 + (int)uVar281) / iVar261) *
                                          top_blob->cstep * top_blob->elemsize);
                              iVar319 = iVar319 * 2 + 1;
                              pfVar311 = &fStack_c50;
                              for (lVar276 = 0; lVar276 != 2; lVar276 = lVar276 + 1) {
                                if ((int)(uVar291 | (uint)lVar276) < iVar343) {
                                  auVar424._0_4_ = auVar360._0_4_ + pfVar311[-8];
                                  auVar424._4_4_ = auVar360._4_4_ + pfVar311[-7];
                                  auVar424._8_4_ = auVar360._8_4_ + pfVar311[-6];
                                  auVar424._12_4_ = auVar360._12_4_ + pfVar311[-5];
                                  auVar421 = *(undefined1 (*) [16])(pfVar311 + -4);
                                  auVar442._0_4_ = auVar424._0_4_ + pfVar311[-0xc] + auVar421._0_4_;
                                  auVar442._4_4_ = auVar424._4_4_ + pfVar311[-0xb] + auVar421._4_4_;
                                  auVar442._8_4_ = auVar424._8_4_ + pfVar311[-10] + auVar421._8_4_;
                                  auVar442._12_4_ = auVar424._12_4_ + pfVar311[-9] + auVar421._12_4_
                                  ;
                                  auVar421 = vsubps_avx(auVar424,auVar421);
                                  auVar425._0_4_ = auVar421._0_4_ + *pfVar311;
                                  auVar425._4_4_ = auVar421._4_4_ + pfVar311[1];
                                  auVar425._8_4_ = auVar421._8_4_ + pfVar311[2];
                                  auVar425._12_4_ = auVar421._12_4_ + pfVar311[3];
                                  if (iVar261 == 1) {
                                    *(float *)*pauVar270 = auVar442._0_4_;
                                    uVar407 = vextractps_avx(auVar442,1);
                                    *(undefined4 *)(*pauVar270 + lVar295 * 4) = uVar407;
                                    uVar407 = vextractps_avx(auVar442,2);
                                    *(undefined4 *)(*pauVar270 + lVar271 * 4) = uVar407;
                                    uVar407 = vextractps_avx(auVar442,3);
                                    *(undefined4 *)(*pauVar270 + lVar272 * 4) = uVar407;
                                    if (iVar319 < iVar342) {
                                      *(float *)(*pauVar270 + 4) = auVar425._0_4_;
                                      uVar407 = vextractps_avx(auVar425,1);
                                      *(undefined4 *)(*pauVar270 + lVar295 * 4 + 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar425,2);
                                      *(undefined4 *)(*pauVar270 + lVar271 * 4 + 4) = uVar407;
                                      uVar407 = vextractps_avx(auVar425,3);
                                      *(undefined4 *)(*pauVar270 + lVar272 * 4 + 4) = uVar407;
                                    }
                                  }
                                  else if ((iVar261 == 4) &&
                                          (*pauVar270 = auVar442, iVar319 < iVar342)) {
                                    pauVar270[1] = auVar425;
                                  }
                                  pauVar270 = (undefined1 (*) [16])(*pauVar270 + lVar277 * 4);
                                }
                                pfVar311 = pfVar311 + 0x10;
                              }
                              lVar275 = lVar275 + 0x10;
                            }
                            iVar263 = iVar263 + iVar320;
                          }
                          local_f10 = uVar281;
                          while (uVar318 = uVar281, (long)(uVar318 | 1) < local_dd8) {
                            lVar271 = uVar318 + local_e18;
                            if (local_ed8 == (void *)0x0) {
                              fVar534 = 0.0;
                              fVar552 = 0.0;
                            }
                            else {
                              fVar534 = *(float *)((long)local_ed8 + lVar271 * 4);
                              fVar552 = *(float *)((long)local_ed8 + lVar271 * 4 + 4);
                            }
                            iVar261 = top_blob->w;
                            sVar765 = top_blob->cstep;
                            sVar18 = top_blob->elemsize;
                            pvVar348 = top_blob->data;
                            puVar310 = (undefined8 *)((long)iVar263 * 4 + (long)local_dc8.data);
                            for (uVar281 = 0; uVar281 != uVar278; uVar281 = uVar281 + 1) {
                              puVar283 = puVar310;
                              for (lVar272 = -4; lVar272 != 0; lVar272 = lVar272 + 1) {
                                uVar268 = *(ulong *)((long)puVar283 + (long)(iVar328 * 2) * 4);
                                auVar477._8_8_ = 0;
                                auVar477._0_8_ = uVar268;
                                uVar317 = *(ulong *)((long)puVar283 + lVar273 * 4);
                                auVar505._8_8_ = 0;
                                auVar505._0_8_ = uVar317;
                                auVar443._0_4_ = (float)uVar268 + (float)*puVar283 + (float)uVar317;
                                auVar443._4_4_ =
                                     (float)(uVar268 >> 0x20) + (float)((ulong)*puVar283 >> 0x20) +
                                     (float)(uVar317 >> 0x20);
                                auVar443._8_8_ = 0;
                                pAVar4 = (Allocator *)vmovlps_avx(auVar443);
                                (&pAStack_c60)[lVar272] = pAVar4;
                                auVar360 = vsubps_avx(auVar477,auVar505);
                                uVar408 = *(undefined8 *)((long)puVar283 + (long)(iVar328 * 6) * 4);
                                auVar444._0_4_ = auVar360._0_4_ + (float)uVar408;
                                auVar444._4_4_ = auVar360._4_4_ + (float)((ulong)uVar408 >> 0x20);
                                auVar444._8_4_ = auVar360._8_4_ + 0.0;
                                auVar444._12_4_ = auVar360._12_4_ + 0.0;
                                uVar408 = vmovlps_avx(auVar444);
                                *(undefined8 *)(afStack_c38 + (lVar272 + -1) * 2) = uVar408;
                                puVar283 = (undefined8 *)((long)puVar283 + lVar279);
                              }
                              iVar320 = iVar260 + (int)uVar281;
                              iVar319 = iVar320 % iVar297;
                              uVar291 = (iVar320 / iVar297) * 2;
                              pfVar311 = (float *)((long)pvVar348 +
                                                  (long)(iVar319 * 2) * 4 +
                                                  (long)(int)uVar291 * (long)iVar261 * sVar18 +
                                                  lVar271 * sVar765 * sVar18);
                              pfVar288 = afStack_c68 + 1;
                              for (lVar272 = 0; lVar272 != 2; lVar272 = lVar272 + 1) {
                                if ((int)(uVar291 | (uint)lVar272) < iVar343) {
                                  fVar553 = pfVar288[-3];
                                  fVar554 = pfVar288[-2];
                                  fVar555 = pfVar288[-1];
                                  fVar556 = pfVar288[-5];
                                  fVar557 = *pfVar288;
                                  fVar558 = pfVar288[-4];
                                  fVar1 = pfVar288[-6];
                                  *pfVar311 = fVar534 + fVar556 + pfVar288[-7] + fVar553;
                                  pfVar311[lVar295] = fVar552 + fVar558 + fVar1 + fVar554;
                                  if (iVar319 * 2 + 1 < iVar342) {
                                    pfVar311[1] = ((fVar534 + fVar556) - fVar553) + fVar555;
                                    pfVar311[lVar295 + 1] =
                                         ((fVar552 + fVar558) - fVar554) + fVar557;
                                  }
                                  pfVar311 = pfVar311 + iVar342;
                                }
                                pfVar288 = pfVar288 + 8;
                              }
                              puVar310 = puVar310 + 1;
                            }
                            iVar263 = iVar263 + iVar315;
                            local_f10 = uVar318;
                            uVar281 = uVar318 + 2;
                          }
                          while (uVar281 = uVar318, (long)uVar281 < local_dd8) {
                            if (local_ed8 == (void *)0x0) {
                              fVar534 = 0.0;
                            }
                            else {
                              fVar534 = *(float *)((long)local_ed8 + (uVar281 + local_e18) * 4);
                            }
                            iVar261 = top_blob->w;
                            sVar765 = top_blob->cstep;
                            sVar18 = top_blob->elemsize;
                            pvVar348 = top_blob->data;
                            pfVar311 = (float *)((long)iVar263 * 4 + (long)local_dc8.data);
                            for (uVar318 = 0; uVar318 != uVar278; uVar318 = uVar318 + 1) {
                              pfVar288 = pfVar311;
                              for (lVar271 = -4; lVar271 != 0; lVar271 = lVar271 + 1) {
                                fVar552 = pfVar288[iVar328];
                                fVar553 = pfVar288[iVar328 * 2];
                                *(float *)((long)&uStack_c70 + lVar271 * 4) =
                                     fVar552 + *pfVar288 + fVar553;
                                *(float *)((long)&pAStack_c60 + lVar271 * 4) =
                                     (fVar552 - fVar553) + pfVar288[iVar328 * 3];
                                pfVar288 = pfVar288 + lVar273;
                              }
                              iVar315 = iVar260 + (int)uVar318;
                              iVar319 = iVar315 % iVar297;
                              uVar291 = (iVar315 / iVar297) * 2;
                              pfVar288 = (float *)((long)pvVar348 +
                                                  (long)(iVar319 * 2) * 4 +
                                                  (long)(int)uVar291 * (long)iVar261 * sVar18 +
                                                  (uVar281 + local_e18) * sVar765 * sVar18);
                              pfVar334 = afStack_c78 + 1;
                              for (lVar271 = 0; lVar271 != 2; lVar271 = lVar271 + 1) {
                                if ((int)(uVar291 | (uint)lVar271) < iVar343) {
                                  fVar552 = pfVar334[-1];
                                  fVar553 = pfVar334[-2];
                                  fVar554 = *pfVar334;
                                  *pfVar288 = fVar534 + fVar553 + pfVar334[-3] + fVar552;
                                  if (iVar319 * 2 + 1 < iVar342) {
                                    pfVar288[1] = ((fVar534 + fVar553) - fVar552) + fVar554;
                                  }
                                  pfVar288 = pfVar288 + iVar342;
                                }
                                pfVar334 = pfVar334 + 4;
                              }
                              pfVar311 = pfVar311 + 1;
                            }
                            iVar263 = iVar263 + iVar337;
                            local_f10 = uVar281;
                            uVar318 = uVar281 + 1;
                          }
                        }
                        if (local_dc8.refcount != (int *)0x0) {
                          LOCK();
                          *local_dc8.refcount = *local_dc8.refcount + -1;
                          UNLOCK();
                          if (*local_dc8.refcount == 0) {
                            if (local_dc8.allocator == (Allocator *)0x0) {
                              free(local_dc8.data);
                            }
                            else {
                              (*(local_dc8.allocator)->_vptr_Allocator[3])();
                            }
                          }
                        }
                        uVar278 = local_d28 + 1;
                      }
                    }
                    piVar267 = (int *)CONCAT44(local_ec0.refcount._4_4_,local_ec0.refcount._0_4_);
                    if (piVar267 != (int *)0x0) {
                      LOCK();
                      *piVar267 = *piVar267 + -1;
                      UNLOCK();
                      if (*piVar267 == 0) {
                        if (local_ec0.allocator == (Allocator *)0x0) {
                          free(local_ec0.data);
                        }
                        else {
                          (*(local_ec0.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                  }
                }
              }
              piVar267 = (int *)CONCAT44(uStack_e54,fStack_e58);
              if (piVar267 != (int *)0x0) {
                LOCK();
                *piVar267 = *piVar267 + -1;
                UNLOCK();
                if (*piVar267 == 0) {
                  if (local_e40 == (Allocator *)0x0) {
LAB_00185ff0:
                    free((void *)local_e60);
                  }
                  else {
                    (*local_e40->_vptr_Allocator[3])();
                  }
                }
              }
LAB_00185ffe:
              if (iVar263 != 0) goto LAB_0018602d;
            }
            pLVar19 = this->activation;
            iVar263 = 0;
            if (pLVar19 != (Layer *)0x0) {
              (*pLVar19->_vptr_Layer[9])(pLVar19,top_blob,opt);
              iVar263 = 0;
            }
          }
          else {
            iVar342 = get_cpu_level2_cache_size();
            iVar260 = (this->super_Convolution).num_output;
            uVar291 = (this->super_Convolution).kernel_w;
            uVar336 = (this->super_Convolution).kernel_h;
            dilation_w = (this->super_Convolution).dilation_w;
            dilation_h = (this->super_Convolution).dilation_h;
            uVar338 = (this->super_Convolution).stride_w;
            stride_h = (this->super_Convolution).stride_h;
            if (((opt->use_sgemm_convolution == true) &&
                (iVar342 < (int)(uVar338 * stride_h *
                                 uVar336 * dilation_w * dilation_h * iVar260 * uVar291 * iVar261 * 8
                                ) || (0x10 < iVar261 || 0x10 < iVar260))) ||
               (uVar336 == 1 && uVar291 == 1)) {
              iVar260 = this->nT;
              iVar342 = iVar260;
              if (iVar260 == 0) {
                iVar342 = opt->num_threads;
              }
              if (opt->num_threads != iVar260 && iVar260 != 0) {
                fprintf(_stderr,
                        "opt.num_threads %d changed, convolution gemm will use load-time value %d");
                fputc(10,_stderr);
                uVar291 = (this->super_Convolution).kernel_w;
                uVar336 = (this->super_Convolution).kernel_h;
                dilation_w = (this->super_Convolution).dilation_w;
                dilation_h = (this->super_Convolution).dilation_h;
                uVar338 = (this->super_Convolution).stride_w;
                stride_h = (this->super_Convolution).stride_h;
              }
              iVar263 = convolution_im2col_gemm
                                  (&local_d70,top_blob,&this->weight_sgemm_data,
                                   &(this->super_Convolution).bias_data,uVar291,uVar336,dilation_w,
                                   dilation_h,uVar338,stride_h,iVar342,opt);
              if (iVar263 == 0) {
                pLVar19 = this->activation;
                iVar263 = 0;
                if (pLVar19 != (Layer *)0x0) {
                  (*pLVar19->_vptr_Layer[9])(pLVar19,top_blob,opt);
                  iVar263 = 0;
                }
              }
              goto LAB_0018602d;
            }
            iVar260 = (int)opt_00;
            uVar289 = uVar291 ^ 3;
            uVar262 = uVar336 ^ 3;
            uVar290 = dilation_w ^ 1;
            uVar314 = dilation_h ^ 1;
            uVar254 = dilation_w ^ 1;
            uVar255 = dilation_h ^ 1;
            uVar339 = uVar338 ^ 1;
            uVar331 = stride_h ^ 1;
            if ((((iVar260 == 0x10 && (uVar330 ^ 1) == 0) && (uVar262 == 0 && uVar289 == 0)) &&
                ((uVar290 == 0 && uVar314 == 0) && uVar339 == 0)) && uVar331 == 0) {
              iVar260 = top_blob->w;
              uVar291 = top_blob->h;
              pvVar348 = (this->super_Convolution).bias_data.data;
              uVar278 = top_blob->elemsize;
              lVar271 = top_blob->cstep * uVar278;
              sVar765 = (this->weight_data_tm).elemsize;
              sVar18 = (this->weight_data_tm).cstep;
              iVar342 = 0;
              if (0 < iVar260) {
                iVar342 = iVar260;
              }
              uVar281 = 0;
              if (0 < (int)uVar291) {
                uVar281 = (ulong)uVar291;
              }
              pvVar345 = (this->weight_data_tm).data;
              uVar318 = (ulong)(uint)local_d70.c;
              if (local_d70.c < 1) {
                uVar318 = 0;
              }
              iVar261 = top_blob->d;
              uVar268 = (ulong)(uint)top_blob->c;
              if (top_blob->c < 1) {
                uVar268 = 0;
              }
              pvVar347 = top_blob->data;
              iVar328 = top_blob->dims;
              local_f18 = CONCAT44(local_f18._4_4_,iVar328);
              pvVar313 = pvVar347;
              for (uVar317 = 0; uVar317 != uVar268; uVar317 = uVar317 + 1) {
                iVar343 = (int)((uVar278 * (long)(int)uVar291 * (long)iVar260 + 0xf &
                                0xfffffffffffffff0) / uVar278);
                if (iVar328 == 4) {
                  iVar343 = (int)((long)(int)uVar291 * (long)iVar260);
                }
                if (pvVar348 == (void *)0x0) {
                  uVar407 = 0;
                }
                else {
                  uVar407 = *(undefined4 *)((long)pvVar348 + uVar317 * 4);
                }
                iVar343 = iVar343 * iVar261;
                if (iVar343 < 1) {
                  iVar343 = 0;
                }
                for (lVar272 = 0; iVar343 != (int)lVar272; lVar272 = lVar272 + 1) {
                  *(undefined4 *)((long)pvVar313 + lVar272 * 4) = uVar407;
                }
                pauVar266 = (undefined1 (*) [64])(sVar765 * sVar18 * uVar317 + (long)pvVar345);
                lVar272 = local_d70.cstep * local_d70.elemsize;
                lVar273 = (long)local_d70.w * local_d70.elemsize;
                pvVar312 = (void *)((long)local_d70.data + lVar273 * 2);
                pvVar344 = (void *)((long)local_d70.data + lVar273);
                pvVar305 = local_d70.data;
                for (uVar321 = 0; uVar321 != uVar318; uVar321 = uVar321 + 1) {
                  auVar394 = *pauVar266;
                  auVar396 = pauVar266[1];
                  auVar397 = pauVar266[2];
                  auVar395 = pauVar266[3];
                  auVar399 = pauVar266[4];
                  auVar398 = pauVar266[5];
                  auVar761 = pauVar266[6];
                  auVar762 = pauVar266[7];
                  auVar763 = pauVar266[8];
                  uVar324 = 0;
                  pvVar292 = pvVar344;
                  pfVar311 = (float *)(lVar271 * uVar317 + (long)pvVar347);
                  pvVar304 = pvVar305;
                  pvVar316 = pvVar312;
                  while (uVar324 != uVar281) {
                    uVar324 = uVar324 + 1;
                    lVar274 = 0;
                    iVar343 = iVar342;
                    while (bVar349 = iVar343 != 0, iVar343 = iVar343 + -1, bVar349) {
                      auVar764 = vmulps_avx512f(auVar394,*(undefined1 (*) [64])
                                                          ((long)pvVar304 + lVar274));
                      auVar764 = vfmadd231ps_avx512f(auVar764,auVar395,
                                                     *(undefined1 (*) [64])
                                                      ((long)pvVar292 + lVar274));
                      auVar764 = vfmadd231ps_avx512f(auVar764,auVar761,
                                                     *(undefined1 (*) [64])
                                                      ((long)pvVar316 + lVar274));
                      auVar764 = vfmadd231ps_avx512f(auVar764,auVar396,
                                                     *(undefined1 (*) [64])
                                                      ((long)pvVar304 + lVar274 + 0x40));
                      auVar764 = vfmadd231ps_avx512f(auVar764,auVar399,
                                                     *(undefined1 (*) [64])
                                                      ((long)pvVar292 + lVar274 + 0x40));
                      auVar764 = vfmadd231ps_avx512f(auVar764,auVar762,
                                                     *(undefined1 (*) [64])
                                                      ((long)pvVar316 + lVar274 + 0x40));
                      auVar764 = vfmadd231ps_avx512f(auVar764,auVar397,
                                                     *(undefined1 (*) [64])
                                                      ((long)pvVar304 + lVar274 + 0x80));
                      auVar764 = vfmadd231ps_avx512f(auVar764,auVar398,
                                                     *(undefined1 (*) [64])
                                                      ((long)pvVar292 + lVar274 + 0x80));
                      auVar764 = vfmadd231ps_avx512f(auVar764,auVar763,
                                                     *(undefined1 (*) [64])
                                                      ((long)pvVar316 + lVar274 + 0x80));
                      auVar393 = vextractf64x4_avx512f(auVar764,1);
                      fVar534 = auVar764._4_4_ + auVar393._4_4_;
                      auVar362._0_4_ =
                           auVar764._0_4_ + auVar393._0_4_ + auVar764._16_4_ + auVar393._16_4_;
                      auVar362._4_4_ = fVar534 + fVar534;
                      auVar362._8_4_ =
                           auVar764._8_4_ + auVar393._8_4_ + auVar764._24_4_ + auVar393._24_4_;
                      auVar362._12_4_ =
                           auVar764._12_4_ + auVar393._12_4_ + auVar764._28_4_ + auVar393._28_4_;
                      auVar360 = vshufpd_avx(auVar362,auVar362,1);
                      auVar361._0_4_ = auVar360._0_4_ + auVar362._0_4_;
                      auVar361._4_4_ = auVar360._4_4_ + auVar362._4_4_;
                      auVar361._8_4_ = auVar360._8_4_ + auVar362._8_4_;
                      auVar361._12_4_ = auVar360._12_4_ + auVar362._12_4_;
                      auVar360 = vmovshdup_avx(auVar361);
                      *pfVar311 = auVar360._0_4_ + *pfVar311 + auVar361._0_4_;
                      pfVar311 = pfVar311 + 1;
                      lVar274 = lVar274 + 0x40;
                    }
                    pvVar316 = (void *)((long)pvVar316 + lVar273);
                    pvVar292 = (void *)((long)pvVar292 + lVar273);
                    pvVar304 = (void *)((long)pvVar304 + lVar273);
                  }
                  pauVar266 = pauVar266 + 9;
                  pvVar312 = (void *)((long)pvVar312 + lVar272);
                  pvVar344 = (void *)((long)pvVar344 + lVar272);
                  pvVar305 = (void *)((long)pvVar305 + lVar272);
                }
                pvVar313 = (void *)((long)pvVar313 + lVar271);
              }
LAB_00184042:
              pLVar19 = this->activation;
              if (pLVar19 != (Layer *)0x0) {
                (*pLVar19->_vptr_Layer[9])(pLVar19,top_blob,opt);
              }
            }
            else {
              if ((iVar260 == 8) && (uVar330 == 8)) {
                if ((((uVar262 == 0 && uVar289 == 0) && (uVar290 == 0 && uVar314 == 0)) &&
                    uVar339 == 0) && uVar331 == 0) {
                  iVar260 = top_blob->w;
                  iVar342 = top_blob->h;
                  if (top_blob->h < 1) {
                    iVar342 = 0;
                  }
                  pvVar348 = (this->super_Convolution).bias_data.data;
                  uVar278 = (ulong)(uint)local_d70.c;
                  if (local_d70.c < 1) {
                    uVar278 = 0;
                  }
                  uVar281 = (ulong)(uint)top_blob->c;
                  if (top_blob->c < 1) {
                    uVar281 = 0;
                  }
                  for (uVar318 = 0; uVar318 != uVar281; uVar318 = uVar318 + 1) {
                    uVar321 = (long)top_blob->h * (long)top_blob->w;
                    uVar268 = top_blob->elemsize;
                    uVar317 = (uVar268 * uVar321 + 0xf & 0xfffffffffffffff0) / uVar268;
                    if (top_blob->dims == 4) {
                      uVar317 = uVar321;
                    }
                    if (pvVar348 == (void *)0x0) {
                      auVar393 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                    }
                    else {
                      auVar393 = *(undefined1 (*) [32])((long)pvVar348 + uVar318 * 0x20);
                    }
                    pauVar325 = (undefined1 (*) [32])
                                (top_blob->cstep * uVar318 * uVar268 + (long)top_blob->data);
                    iVar261 = (int)uVar317 * top_blob->d;
                    pauVar306 = pauVar325;
                    if (iVar261 < 1) {
                      iVar261 = 0;
                    }
                    while (bVar349 = iVar261 != 0, iVar261 = iVar261 + -1, bVar349) {
                      *pauVar306 = auVar393;
                      pauVar306 = pauVar306 + 1;
                    }
                    for (uVar268 = 0; uVar268 != uVar278; uVar268 = uVar268 + 1) {
                      pvVar313 = (void *)(local_d70.cstep * uVar268 * local_d70.elemsize +
                                         (long)local_d70.data);
                      pvVar345 = (void *)((long)pvVar313 + (long)local_d70.w * local_d70.elemsize);
                      pvVar347 = (void *)((long)pvVar313 +
                                         (long)local_d70.w * local_d70.elemsize * 2);
                      sVar765 = (this->weight_data_tm).elemsize;
                      pauVar332 = (undefined1 (*) [32])
                                  ((long)(this->weight_data_tm).data +
                                  (long)(this->weight_data_tm).w * uVar268 * sVar765 +
                                  (this->weight_data_tm).cstep * uVar318 * sVar765);
                      pauVar306 = pauVar325;
                      for (iVar261 = 0; iVar261 != iVar342; iVar261 = iVar261 + 1) {
                        lVar271 = 0;
                        for (iVar328 = 0; iVar328 + 1 < iVar260; iVar328 = iVar328 + 2) {
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271);
                          auVar410._4_4_ = uVar407;
                          auVar410._0_4_ = uVar407;
                          auVar410._8_4_ = uVar407;
                          auVar410._12_4_ = uVar407;
                          auVar410._16_4_ = uVar407;
                          auVar410._20_4_ = uVar407;
                          auVar410._24_4_ = uVar407;
                          auVar410._28_4_ = uVar407;
                          auVar360 = vfmadd213ps_fma(auVar410,*pauVar332,
                                                     *(undefined1 (*) [32])
                                                      ((long)*pauVar306 + lVar271));
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 8);
                          auVar86._4_4_ = uVar407;
                          auVar86._0_4_ = uVar407;
                          auVar86._8_4_ = uVar407;
                          auVar86._12_4_ = uVar407;
                          auVar86._16_4_ = uVar407;
                          auVar86._20_4_ = uVar407;
                          auVar86._24_4_ = uVar407;
                          auVar86._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),pauVar332[2],auVar86);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x10);
                          auVar87._4_4_ = uVar407;
                          auVar87._0_4_ = uVar407;
                          auVar87._8_4_ = uVar407;
                          auVar87._12_4_ = uVar407;
                          auVar87._16_4_ = uVar407;
                          auVar87._20_4_ = uVar407;
                          auVar87._24_4_ = uVar407;
                          auVar87._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,pauVar332[4],auVar87);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x18);
                          auVar88._4_4_ = uVar407;
                          auVar88._0_4_ = uVar407;
                          auVar88._8_4_ = uVar407;
                          auVar88._12_4_ = uVar407;
                          auVar88._16_4_ = uVar407;
                          auVar88._20_4_ = uVar407;
                          auVar88._24_4_ = uVar407;
                          auVar88._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,pauVar332[6],auVar88);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x20);
                          auVar610._4_4_ = uVar407;
                          auVar610._0_4_ = uVar407;
                          auVar610._8_4_ = uVar407;
                          auVar610._12_4_ = uVar407;
                          auVar610._16_4_ = uVar407;
                          auVar610._20_4_ = uVar407;
                          auVar610._24_4_ = uVar407;
                          auVar610._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x28);
                          auVar590._4_4_ = uVar407;
                          auVar590._0_4_ = uVar407;
                          auVar590._8_4_ = uVar407;
                          auVar590._12_4_ = uVar407;
                          auVar590._16_4_ = uVar407;
                          auVar590._20_4_ = uVar407;
                          auVar590._24_4_ = uVar407;
                          auVar590._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x30);
                          auVar566._4_4_ = uVar407;
                          auVar566._0_4_ = uVar407;
                          auVar566._8_4_ = uVar407;
                          auVar566._12_4_ = uVar407;
                          auVar566._16_4_ = uVar407;
                          auVar566._20_4_ = uVar407;
                          auVar566._24_4_ = uVar407;
                          auVar566._28_4_ = uVar407;
                          auVar360 = vfmadd213ps_fma(*pauVar332,auVar610,
                                                     *(undefined1 (*) [32])(pauVar306[1] + lVar271))
                          ;
                          auVar421 = vfmadd231ps_fma(auVar393,auVar610,pauVar332[8]);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x38);
                          auVar611._4_4_ = uVar407;
                          auVar611._0_4_ = uVar407;
                          auVar611._8_4_ = uVar407;
                          auVar611._12_4_ = uVar407;
                          auVar611._16_4_ = uVar407;
                          auVar611._20_4_ = uVar407;
                          auVar611._24_4_ = uVar407;
                          auVar611._28_4_ = uVar407;
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar590,pauVar332[2]);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),auVar590,pauVar332[10]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar566,pauVar332[4]);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),auVar566,pauVar332[0xc]);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x40);
                          auVar567._4_4_ = uVar407;
                          auVar567._0_4_ = uVar407;
                          auVar567._8_4_ = uVar407;
                          auVar567._12_4_ = uVar407;
                          auVar567._16_4_ = uVar407;
                          auVar567._20_4_ = uVar407;
                          auVar567._24_4_ = uVar407;
                          auVar567._28_4_ = uVar407;
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),auVar611,pauVar332[0xe]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar611,pauVar332[6]);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x48);
                          auVar453._4_4_ = uVar407;
                          auVar453._0_4_ = uVar407;
                          auVar453._8_4_ = uVar407;
                          auVar453._12_4_ = uVar407;
                          auVar453._16_4_ = uVar407;
                          auVar453._20_4_ = uVar407;
                          auVar453._24_4_ = uVar407;
                          auVar453._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x50);
                          auVar612._4_4_ = uVar407;
                          auVar612._0_4_ = uVar407;
                          auVar612._8_4_ = uVar407;
                          auVar612._12_4_ = uVar407;
                          auVar612._16_4_ = uVar407;
                          auVar612._20_4_ = uVar407;
                          auVar612._24_4_ = uVar407;
                          auVar612._28_4_ = uVar407;
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar567,pauVar332[8]);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),auVar567,pauVar332[0x10]);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x58);
                          auVar568._4_4_ = uVar407;
                          auVar568._0_4_ = uVar407;
                          auVar568._8_4_ = uVar407;
                          auVar568._12_4_ = uVar407;
                          auVar568._16_4_ = uVar407;
                          auVar568._20_4_ = uVar407;
                          auVar568._24_4_ = uVar407;
                          auVar568._28_4_ = uVar407;
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar453,pauVar332[10]);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),auVar453,pauVar332[0x12]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar612,pauVar332[0xc]);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),auVar612,pauVar332[0x14]);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),auVar568,pauVar332[0x16]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar568,pauVar332[0xe]);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x60);
                          auVar89._4_4_ = uVar407;
                          auVar89._0_4_ = uVar407;
                          auVar89._8_4_ = uVar407;
                          auVar89._12_4_ = uVar407;
                          auVar89._16_4_ = uVar407;
                          auVar89._20_4_ = uVar407;
                          auVar89._24_4_ = uVar407;
                          auVar89._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl
                                               (ZEXT1632(auVar360),pauVar332[0x10],auVar89);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271);
                          auVar90._4_4_ = uVar407;
                          auVar90._0_4_ = uVar407;
                          auVar90._8_4_ = uVar407;
                          auVar90._12_4_ = uVar407;
                          auVar90._16_4_ = uVar407;
                          auVar90._20_4_ = uVar407;
                          auVar90._24_4_ = uVar407;
                          auVar90._28_4_ = uVar407;
                          auVar376 = vfmadd231ps_avx512vl
                                               (ZEXT1632(auVar421),pauVar332[0x18],auVar90);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 8);
                          auVar91._4_4_ = uVar407;
                          auVar91._0_4_ = uVar407;
                          auVar91._8_4_ = uVar407;
                          auVar91._12_4_ = uVar407;
                          auVar91._16_4_ = uVar407;
                          auVar91._20_4_ = uVar407;
                          auVar91._24_4_ = uVar407;
                          auVar91._28_4_ = uVar407;
                          auVar376 = vfmadd231ps_avx512vl(auVar376,pauVar332[0x1a],auVar91);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x10);
                          auVar92._4_4_ = uVar407;
                          auVar92._0_4_ = uVar407;
                          auVar92._8_4_ = uVar407;
                          auVar92._12_4_ = uVar407;
                          auVar92._16_4_ = uVar407;
                          auVar92._20_4_ = uVar407;
                          auVar92._24_4_ = uVar407;
                          auVar92._28_4_ = uVar407;
                          auVar376 = vfmadd231ps_avx512vl(auVar376,pauVar332[0x1c],auVar92);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x18);
                          auVar93._4_4_ = uVar407;
                          auVar93._0_4_ = uVar407;
                          auVar93._8_4_ = uVar407;
                          auVar93._12_4_ = uVar407;
                          auVar93._16_4_ = uVar407;
                          auVar93._20_4_ = uVar407;
                          auVar93._24_4_ = uVar407;
                          auVar93._28_4_ = uVar407;
                          auVar376 = vfmadd231ps_avx512vl(auVar376,pauVar332[0x1e],auVar93);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x68);
                          auVar94._4_4_ = uVar407;
                          auVar94._0_4_ = uVar407;
                          auVar94._8_4_ = uVar407;
                          auVar94._12_4_ = uVar407;
                          auVar94._16_4_ = uVar407;
                          auVar94._20_4_ = uVar407;
                          auVar94._24_4_ = uVar407;
                          auVar94._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,pauVar332[0x12],auVar94);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x20);
                          auVar512._4_4_ = uVar407;
                          auVar512._0_4_ = uVar407;
                          auVar512._8_4_ = uVar407;
                          auVar512._12_4_ = uVar407;
                          auVar512._16_4_ = uVar407;
                          auVar512._20_4_ = uVar407;
                          auVar512._24_4_ = uVar407;
                          auVar512._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x70);
                          auVar95._4_4_ = uVar407;
                          auVar95._0_4_ = uVar407;
                          auVar95._8_4_ = uVar407;
                          auVar95._12_4_ = uVar407;
                          auVar95._16_4_ = uVar407;
                          auVar95._20_4_ = uVar407;
                          auVar95._24_4_ = uVar407;
                          auVar95._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,pauVar332[0x14],auVar95);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x28);
                          auVar454._4_4_ = uVar407;
                          auVar454._0_4_ = uVar407;
                          auVar454._8_4_ = uVar407;
                          auVar454._12_4_ = uVar407;
                          auVar454._16_4_ = uVar407;
                          auVar454._20_4_ = uVar407;
                          auVar454._24_4_ = uVar407;
                          auVar454._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x78);
                          auVar96._4_4_ = uVar407;
                          auVar96._0_4_ = uVar407;
                          auVar96._8_4_ = uVar407;
                          auVar96._12_4_ = uVar407;
                          auVar96._16_4_ = uVar407;
                          auVar96._20_4_ = uVar407;
                          auVar96._24_4_ = uVar407;
                          auVar96._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,pauVar332[0x16],auVar96);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x30);
                          auVar591._4_4_ = uVar407;
                          auVar591._0_4_ = uVar407;
                          auVar591._8_4_ = uVar407;
                          auVar591._12_4_ = uVar407;
                          auVar591._16_4_ = uVar407;
                          auVar591._20_4_ = uVar407;
                          auVar591._24_4_ = uVar407;
                          auVar591._28_4_ = uVar407;
                          auVar360 = vfmadd231ps_fma(auVar393,auVar512,pauVar332[0x18]);
                          auVar421 = vfmadd231ps_fma(auVar376,auVar512,pauVar332[0x20]);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x38);
                          auVar513._4_4_ = uVar407;
                          auVar513._0_4_ = uVar407;
                          auVar513._8_4_ = uVar407;
                          auVar513._12_4_ = uVar407;
                          auVar513._16_4_ = uVar407;
                          auVar513._20_4_ = uVar407;
                          auVar513._24_4_ = uVar407;
                          auVar513._28_4_ = uVar407;
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar454,pauVar332[0x1a]);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),auVar454,pauVar332[0x22]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar591,pauVar332[0x1c]);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),auVar591,pauVar332[0x24]);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x40);
                          auVar592._4_4_ = uVar407;
                          auVar592._0_4_ = uVar407;
                          auVar592._8_4_ = uVar407;
                          auVar592._12_4_ = uVar407;
                          auVar592._16_4_ = uVar407;
                          auVar592._20_4_ = uVar407;
                          auVar592._24_4_ = uVar407;
                          auVar592._28_4_ = uVar407;
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),auVar513,pauVar332[0x26]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar513,pauVar332[0x1e]);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x48);
                          auVar514._4_4_ = uVar407;
                          auVar514._0_4_ = uVar407;
                          auVar514._8_4_ = uVar407;
                          auVar514._12_4_ = uVar407;
                          auVar514._16_4_ = uVar407;
                          auVar514._20_4_ = uVar407;
                          auVar514._24_4_ = uVar407;
                          auVar514._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x50);
                          auVar569._4_4_ = uVar407;
                          auVar569._0_4_ = uVar407;
                          auVar569._8_4_ = uVar407;
                          auVar569._12_4_ = uVar407;
                          auVar569._16_4_ = uVar407;
                          auVar569._20_4_ = uVar407;
                          auVar569._24_4_ = uVar407;
                          auVar569._28_4_ = uVar407;
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar592,pauVar332[0x20]);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),auVar592,pauVar332[0x28]);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x58);
                          auVar593._4_4_ = uVar407;
                          auVar593._0_4_ = uVar407;
                          auVar593._8_4_ = uVar407;
                          auVar593._12_4_ = uVar407;
                          auVar593._16_4_ = uVar407;
                          auVar593._20_4_ = uVar407;
                          auVar593._24_4_ = uVar407;
                          auVar593._28_4_ = uVar407;
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar514,pauVar332[0x22]);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),auVar514,pauVar332[0x2a]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar569,pauVar332[0x24]);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),auVar569,pauVar332[0x2c]);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),auVar593,pauVar332[0x2e]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar593,pauVar332[0x26]);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x60);
                          auVar97._4_4_ = uVar407;
                          auVar97._0_4_ = uVar407;
                          auVar97._8_4_ = uVar407;
                          auVar97._12_4_ = uVar407;
                          auVar97._16_4_ = uVar407;
                          auVar97._20_4_ = uVar407;
                          auVar97._24_4_ = uVar407;
                          auVar97._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl
                                               (ZEXT1632(auVar360),pauVar332[0x28],auVar97);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271);
                          auVar98._4_4_ = uVar407;
                          auVar98._0_4_ = uVar407;
                          auVar98._8_4_ = uVar407;
                          auVar98._12_4_ = uVar407;
                          auVar98._16_4_ = uVar407;
                          auVar98._20_4_ = uVar407;
                          auVar98._24_4_ = uVar407;
                          auVar98._28_4_ = uVar407;
                          auVar376 = vfmadd231ps_avx512vl
                                               (ZEXT1632(auVar421),pauVar332[0x30],auVar98);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 8);
                          auVar99._4_4_ = uVar407;
                          auVar99._0_4_ = uVar407;
                          auVar99._8_4_ = uVar407;
                          auVar99._12_4_ = uVar407;
                          auVar99._16_4_ = uVar407;
                          auVar99._20_4_ = uVar407;
                          auVar99._24_4_ = uVar407;
                          auVar99._28_4_ = uVar407;
                          auVar376 = vfmadd231ps_avx512vl(auVar376,pauVar332[0x32],auVar99);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x10);
                          auVar100._4_4_ = uVar407;
                          auVar100._0_4_ = uVar407;
                          auVar100._8_4_ = uVar407;
                          auVar100._12_4_ = uVar407;
                          auVar100._16_4_ = uVar407;
                          auVar100._20_4_ = uVar407;
                          auVar100._24_4_ = uVar407;
                          auVar100._28_4_ = uVar407;
                          auVar376 = vfmadd231ps_avx512vl(auVar376,pauVar332[0x34],auVar100);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x18);
                          auVar101._4_4_ = uVar407;
                          auVar101._0_4_ = uVar407;
                          auVar101._8_4_ = uVar407;
                          auVar101._12_4_ = uVar407;
                          auVar101._16_4_ = uVar407;
                          auVar101._20_4_ = uVar407;
                          auVar101._24_4_ = uVar407;
                          auVar101._28_4_ = uVar407;
                          auVar376 = vfmadd231ps_avx512vl(auVar376,pauVar332[0x36],auVar101);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x68);
                          auVar102._4_4_ = uVar407;
                          auVar102._0_4_ = uVar407;
                          auVar102._8_4_ = uVar407;
                          auVar102._12_4_ = uVar407;
                          auVar102._16_4_ = uVar407;
                          auVar102._20_4_ = uVar407;
                          auVar102._24_4_ = uVar407;
                          auVar102._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,pauVar332[0x2a],auVar102);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x20);
                          auVar485._4_4_ = uVar407;
                          auVar485._0_4_ = uVar407;
                          auVar485._8_4_ = uVar407;
                          auVar485._12_4_ = uVar407;
                          auVar485._16_4_ = uVar407;
                          auVar485._20_4_ = uVar407;
                          auVar485._24_4_ = uVar407;
                          auVar485._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x70);
                          auVar103._4_4_ = uVar407;
                          auVar103._0_4_ = uVar407;
                          auVar103._8_4_ = uVar407;
                          auVar103._12_4_ = uVar407;
                          auVar103._16_4_ = uVar407;
                          auVar103._20_4_ = uVar407;
                          auVar103._24_4_ = uVar407;
                          auVar103._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,pauVar332[0x2c],auVar103);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x28);
                          auVar515._4_4_ = uVar407;
                          auVar515._0_4_ = uVar407;
                          auVar515._8_4_ = uVar407;
                          auVar515._12_4_ = uVar407;
                          auVar515._16_4_ = uVar407;
                          auVar515._20_4_ = uVar407;
                          auVar515._24_4_ = uVar407;
                          auVar515._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x78);
                          auVar104._4_4_ = uVar407;
                          auVar104._0_4_ = uVar407;
                          auVar104._8_4_ = uVar407;
                          auVar104._12_4_ = uVar407;
                          auVar104._16_4_ = uVar407;
                          auVar104._20_4_ = uVar407;
                          auVar104._24_4_ = uVar407;
                          auVar104._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,pauVar332[0x2e],auVar104);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x30);
                          auVar455._4_4_ = uVar407;
                          auVar455._0_4_ = uVar407;
                          auVar455._8_4_ = uVar407;
                          auVar455._12_4_ = uVar407;
                          auVar455._16_4_ = uVar407;
                          auVar455._20_4_ = uVar407;
                          auVar455._24_4_ = uVar407;
                          auVar455._28_4_ = uVar407;
                          auVar360 = vfmadd231ps_fma(auVar393,auVar485,pauVar332[0x30]);
                          auVar421 = vfmadd231ps_fma(auVar376,auVar485,pauVar332[0x38]);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x38);
                          auVar486._4_4_ = uVar407;
                          auVar486._0_4_ = uVar407;
                          auVar486._8_4_ = uVar407;
                          auVar486._12_4_ = uVar407;
                          auVar486._16_4_ = uVar407;
                          auVar486._20_4_ = uVar407;
                          auVar486._24_4_ = uVar407;
                          auVar486._28_4_ = uVar407;
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar515,pauVar332[0x32]);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),auVar515,pauVar332[0x3a]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar455,pauVar332[0x34]);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),auVar455,pauVar332[0x3c]);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x40);
                          auVar456._4_4_ = uVar407;
                          auVar456._0_4_ = uVar407;
                          auVar456._8_4_ = uVar407;
                          auVar456._12_4_ = uVar407;
                          auVar456._16_4_ = uVar407;
                          auVar456._20_4_ = uVar407;
                          auVar456._24_4_ = uVar407;
                          auVar456._28_4_ = uVar407;
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),auVar486,pauVar332[0x3e]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar486,pauVar332[0x36]);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x48);
                          auVar487._4_4_ = uVar407;
                          auVar487._0_4_ = uVar407;
                          auVar487._8_4_ = uVar407;
                          auVar487._12_4_ = uVar407;
                          auVar487._16_4_ = uVar407;
                          auVar487._20_4_ = uVar407;
                          auVar487._24_4_ = uVar407;
                          auVar487._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x50);
                          auVar613._4_4_ = uVar407;
                          auVar613._0_4_ = uVar407;
                          auVar613._8_4_ = uVar407;
                          auVar613._12_4_ = uVar407;
                          auVar613._16_4_ = uVar407;
                          auVar613._20_4_ = uVar407;
                          auVar613._24_4_ = uVar407;
                          auVar613._28_4_ = uVar407;
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar456,pauVar332[0x38]);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),auVar456,pauVar332[0x40]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar487,pauVar332[0x3a]);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),auVar487,pauVar332[0x42]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar613,pauVar332[0x3c]);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),auVar613,pauVar332[0x44]);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x58);
                          auVar540._4_4_ = uVar407;
                          auVar540._0_4_ = uVar407;
                          auVar540._8_4_ = uVar407;
                          auVar540._12_4_ = uVar407;
                          auVar540._16_4_ = uVar407;
                          auVar540._20_4_ = uVar407;
                          auVar540._24_4_ = uVar407;
                          auVar540._28_4_ = uVar407;
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar540,pauVar332[0x3e]);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),auVar540,pauVar332[0x46]);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x60);
                          auVar105._4_4_ = uVar407;
                          auVar105._0_4_ = uVar407;
                          auVar105._8_4_ = uVar407;
                          auVar105._12_4_ = uVar407;
                          auVar105._16_4_ = uVar407;
                          auVar105._20_4_ = uVar407;
                          auVar105._24_4_ = uVar407;
                          auVar105._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl
                                               (ZEXT1632(auVar360),pauVar332[0x40],auVar105);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x68);
                          auVar106._4_4_ = uVar407;
                          auVar106._0_4_ = uVar407;
                          auVar106._8_4_ = uVar407;
                          auVar106._12_4_ = uVar407;
                          auVar106._16_4_ = uVar407;
                          auVar106._20_4_ = uVar407;
                          auVar106._24_4_ = uVar407;
                          auVar106._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,pauVar332[0x42],auVar106);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 4);
                          auVar107._4_4_ = uVar407;
                          auVar107._0_4_ = uVar407;
                          auVar107._8_4_ = uVar407;
                          auVar107._12_4_ = uVar407;
                          auVar107._16_4_ = uVar407;
                          auVar107._20_4_ = uVar407;
                          auVar107._24_4_ = uVar407;
                          auVar107._28_4_ = uVar407;
                          auVar376 = vfmadd231ps_avx512vl(ZEXT1632(auVar421),pauVar332[1],auVar107);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0xc);
                          auVar108._4_4_ = uVar407;
                          auVar108._0_4_ = uVar407;
                          auVar108._8_4_ = uVar407;
                          auVar108._12_4_ = uVar407;
                          auVar108._16_4_ = uVar407;
                          auVar108._20_4_ = uVar407;
                          auVar108._24_4_ = uVar407;
                          auVar108._28_4_ = uVar407;
                          auVar376 = vfmadd231ps_avx512vl(auVar376,pauVar332[3],auVar108);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x14);
                          auVar109._4_4_ = uVar407;
                          auVar109._0_4_ = uVar407;
                          auVar109._8_4_ = uVar407;
                          auVar109._12_4_ = uVar407;
                          auVar109._16_4_ = uVar407;
                          auVar109._20_4_ = uVar407;
                          auVar109._24_4_ = uVar407;
                          auVar109._28_4_ = uVar407;
                          auVar376 = vfmadd231ps_avx512vl(auVar376,pauVar332[5],auVar109);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x1c);
                          auVar110._4_4_ = uVar407;
                          auVar110._0_4_ = uVar407;
                          auVar110._8_4_ = uVar407;
                          auVar110._12_4_ = uVar407;
                          auVar110._16_4_ = uVar407;
                          auVar110._20_4_ = uVar407;
                          auVar110._24_4_ = uVar407;
                          auVar110._28_4_ = uVar407;
                          auVar376 = vfmadd231ps_avx512vl(auVar376,pauVar332[7],auVar110);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x70);
                          auVar111._4_4_ = uVar407;
                          auVar111._0_4_ = uVar407;
                          auVar111._8_4_ = uVar407;
                          auVar111._12_4_ = uVar407;
                          auVar111._16_4_ = uVar407;
                          auVar111._20_4_ = uVar407;
                          auVar111._24_4_ = uVar407;
                          auVar111._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,pauVar332[0x44],auVar111);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x24);
                          auVar516._4_4_ = uVar407;
                          auVar516._0_4_ = uVar407;
                          auVar516._8_4_ = uVar407;
                          auVar516._12_4_ = uVar407;
                          auVar516._16_4_ = uVar407;
                          auVar516._20_4_ = uVar407;
                          auVar516._24_4_ = uVar407;
                          auVar516._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x78);
                          auVar112._4_4_ = uVar407;
                          auVar112._0_4_ = uVar407;
                          auVar112._8_4_ = uVar407;
                          auVar112._12_4_ = uVar407;
                          auVar112._16_4_ = uVar407;
                          auVar112._20_4_ = uVar407;
                          auVar112._24_4_ = uVar407;
                          auVar112._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,pauVar332[0x46],auVar112);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x2c);
                          auVar594._4_4_ = uVar407;
                          auVar594._0_4_ = uVar407;
                          auVar594._8_4_ = uVar407;
                          auVar594._12_4_ = uVar407;
                          auVar594._16_4_ = uVar407;
                          auVar594._20_4_ = uVar407;
                          auVar594._24_4_ = uVar407;
                          auVar594._28_4_ = uVar407;
                          auVar360 = vfmadd231ps_fma(auVar393,auVar516,pauVar332[1]);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x34);
                          auVar488._4_4_ = uVar407;
                          auVar488._0_4_ = uVar407;
                          auVar488._8_4_ = uVar407;
                          auVar488._12_4_ = uVar407;
                          auVar488._16_4_ = uVar407;
                          auVar488._20_4_ = uVar407;
                          auVar488._24_4_ = uVar407;
                          auVar488._28_4_ = uVar407;
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar594,pauVar332[3]);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x3c);
                          auVar541._4_4_ = uVar407;
                          auVar541._0_4_ = uVar407;
                          auVar541._8_4_ = uVar407;
                          auVar541._12_4_ = uVar407;
                          auVar541._16_4_ = uVar407;
                          auVar541._20_4_ = uVar407;
                          auVar541._24_4_ = uVar407;
                          auVar541._28_4_ = uVar407;
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar488,pauVar332[5]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar541,pauVar332[7]);
                          auVar421 = vfmadd231ps_fma(auVar376,pauVar332[9],auVar516);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),pauVar332[0xb],auVar594);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),pauVar332[0xd],auVar488);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),pauVar332[0xf],auVar541);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x44);
                          auVar489._4_4_ = uVar407;
                          auVar489._0_4_ = uVar407;
                          auVar489._8_4_ = uVar407;
                          auVar489._12_4_ = uVar407;
                          auVar489._16_4_ = uVar407;
                          auVar489._20_4_ = uVar407;
                          auVar489._24_4_ = uVar407;
                          auVar489._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x4c);
                          auVar542._4_4_ = uVar407;
                          auVar542._0_4_ = uVar407;
                          auVar542._8_4_ = uVar407;
                          auVar542._12_4_ = uVar407;
                          auVar542._16_4_ = uVar407;
                          auVar542._20_4_ = uVar407;
                          auVar542._24_4_ = uVar407;
                          auVar542._28_4_ = uVar407;
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar489,pauVar332[9]);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x54);
                          auVar457._4_4_ = uVar407;
                          auVar457._0_4_ = uVar407;
                          auVar457._8_4_ = uVar407;
                          auVar457._12_4_ = uVar407;
                          auVar457._16_4_ = uVar407;
                          auVar457._20_4_ = uVar407;
                          auVar457._24_4_ = uVar407;
                          auVar457._28_4_ = uVar407;
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar542,pauVar332[0xb]);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x5c);
                          auVar570._4_4_ = uVar407;
                          auVar570._0_4_ = uVar407;
                          auVar570._8_4_ = uVar407;
                          auVar570._12_4_ = uVar407;
                          auVar570._16_4_ = uVar407;
                          auVar570._20_4_ = uVar407;
                          auVar570._24_4_ = uVar407;
                          auVar570._28_4_ = uVar407;
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar457,pauVar332[0xd]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar570,pauVar332[0xf]);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),pauVar332[0x11],auVar489);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),pauVar332[0x13],auVar542);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),pauVar332[0x15],auVar457);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),pauVar332[0x17],auVar570);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 100);
                          auVar113._4_4_ = uVar407;
                          auVar113._0_4_ = uVar407;
                          auVar113._8_4_ = uVar407;
                          auVar113._12_4_ = uVar407;
                          auVar113._16_4_ = uVar407;
                          auVar113._20_4_ = uVar407;
                          auVar113._24_4_ = uVar407;
                          auVar113._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl
                                               (ZEXT1632(auVar360),pauVar332[0x11],auVar113);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x6c);
                          auVar114._4_4_ = uVar407;
                          auVar114._0_4_ = uVar407;
                          auVar114._8_4_ = uVar407;
                          auVar114._12_4_ = uVar407;
                          auVar114._16_4_ = uVar407;
                          auVar114._20_4_ = uVar407;
                          auVar114._24_4_ = uVar407;
                          auVar114._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,pauVar332[0x13],auVar114);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x74);
                          auVar115._4_4_ = uVar407;
                          auVar115._0_4_ = uVar407;
                          auVar115._8_4_ = uVar407;
                          auVar115._12_4_ = uVar407;
                          auVar115._16_4_ = uVar407;
                          auVar115._20_4_ = uVar407;
                          auVar115._24_4_ = uVar407;
                          auVar115._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,pauVar332[0x15],auVar115);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x7c);
                          auVar116._4_4_ = uVar407;
                          auVar116._0_4_ = uVar407;
                          auVar116._8_4_ = uVar407;
                          auVar116._12_4_ = uVar407;
                          auVar116._16_4_ = uVar407;
                          auVar116._20_4_ = uVar407;
                          auVar116._24_4_ = uVar407;
                          auVar116._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,pauVar332[0x17],auVar116);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 4);
                          auVar117._4_4_ = uVar407;
                          auVar117._0_4_ = uVar407;
                          auVar117._8_4_ = uVar407;
                          auVar117._12_4_ = uVar407;
                          auVar117._16_4_ = uVar407;
                          auVar117._20_4_ = uVar407;
                          auVar117._24_4_ = uVar407;
                          auVar117._28_4_ = uVar407;
                          auVar376 = vfmadd231ps_avx512vl
                                               (ZEXT1632(auVar421),pauVar332[0x19],auVar117);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0xc);
                          auVar118._4_4_ = uVar407;
                          auVar118._0_4_ = uVar407;
                          auVar118._8_4_ = uVar407;
                          auVar118._12_4_ = uVar407;
                          auVar118._16_4_ = uVar407;
                          auVar118._20_4_ = uVar407;
                          auVar118._24_4_ = uVar407;
                          auVar118._28_4_ = uVar407;
                          auVar376 = vfmadd231ps_avx512vl(auVar376,pauVar332[0x1b],auVar118);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x14);
                          auVar119._4_4_ = uVar407;
                          auVar119._0_4_ = uVar407;
                          auVar119._8_4_ = uVar407;
                          auVar119._12_4_ = uVar407;
                          auVar119._16_4_ = uVar407;
                          auVar119._20_4_ = uVar407;
                          auVar119._24_4_ = uVar407;
                          auVar119._28_4_ = uVar407;
                          auVar376 = vfmadd231ps_avx512vl(auVar376,pauVar332[0x1d],auVar119);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x1c);
                          auVar120._4_4_ = uVar407;
                          auVar120._0_4_ = uVar407;
                          auVar120._8_4_ = uVar407;
                          auVar120._12_4_ = uVar407;
                          auVar120._16_4_ = uVar407;
                          auVar120._20_4_ = uVar407;
                          auVar120._24_4_ = uVar407;
                          auVar120._28_4_ = uVar407;
                          auVar376 = vfmadd231ps_avx512vl(auVar376,pauVar332[0x1f],auVar120);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x24);
                          auVar571._4_4_ = uVar407;
                          auVar571._0_4_ = uVar407;
                          auVar571._8_4_ = uVar407;
                          auVar571._12_4_ = uVar407;
                          auVar571._16_4_ = uVar407;
                          auVar571._20_4_ = uVar407;
                          auVar571._24_4_ = uVar407;
                          auVar571._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x2c);
                          auVar595._4_4_ = uVar407;
                          auVar595._0_4_ = uVar407;
                          auVar595._8_4_ = uVar407;
                          auVar595._12_4_ = uVar407;
                          auVar595._16_4_ = uVar407;
                          auVar595._20_4_ = uVar407;
                          auVar595._24_4_ = uVar407;
                          auVar595._28_4_ = uVar407;
                          auVar360 = vfmadd231ps_fma(auVar393,auVar571,pauVar332[0x19]);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x34);
                          auVar458._4_4_ = uVar407;
                          auVar458._0_4_ = uVar407;
                          auVar458._8_4_ = uVar407;
                          auVar458._12_4_ = uVar407;
                          auVar458._16_4_ = uVar407;
                          auVar458._20_4_ = uVar407;
                          auVar458._24_4_ = uVar407;
                          auVar458._28_4_ = uVar407;
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar595,pauVar332[0x1b]);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x3c);
                          auVar490._4_4_ = uVar407;
                          auVar490._0_4_ = uVar407;
                          auVar490._8_4_ = uVar407;
                          auVar490._12_4_ = uVar407;
                          auVar490._16_4_ = uVar407;
                          auVar490._20_4_ = uVar407;
                          auVar490._24_4_ = uVar407;
                          auVar490._28_4_ = uVar407;
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar458,pauVar332[0x1d]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar490,pauVar332[0x1f]);
                          auVar421 = vfmadd231ps_fma(auVar376,pauVar332[0x21],auVar571);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),pauVar332[0x23],auVar595);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),pauVar332[0x25],auVar458);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),pauVar332[0x27],auVar490);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x44);
                          auVar459._4_4_ = uVar407;
                          auVar459._0_4_ = uVar407;
                          auVar459._8_4_ = uVar407;
                          auVar459._12_4_ = uVar407;
                          auVar459._16_4_ = uVar407;
                          auVar459._20_4_ = uVar407;
                          auVar459._24_4_ = uVar407;
                          auVar459._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x4c);
                          auVar491._4_4_ = uVar407;
                          auVar491._0_4_ = uVar407;
                          auVar491._8_4_ = uVar407;
                          auVar491._12_4_ = uVar407;
                          auVar491._16_4_ = uVar407;
                          auVar491._20_4_ = uVar407;
                          auVar491._24_4_ = uVar407;
                          auVar491._28_4_ = uVar407;
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar459,pauVar332[0x21]);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x54);
                          auVar517._4_4_ = uVar407;
                          auVar517._0_4_ = uVar407;
                          auVar517._8_4_ = uVar407;
                          auVar517._12_4_ = uVar407;
                          auVar517._16_4_ = uVar407;
                          auVar517._20_4_ = uVar407;
                          auVar517._24_4_ = uVar407;
                          auVar517._28_4_ = uVar407;
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar491,pauVar332[0x23]);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x5c);
                          auVar543._4_4_ = uVar407;
                          auVar543._0_4_ = uVar407;
                          auVar543._8_4_ = uVar407;
                          auVar543._12_4_ = uVar407;
                          auVar543._16_4_ = uVar407;
                          auVar543._20_4_ = uVar407;
                          auVar543._24_4_ = uVar407;
                          auVar543._28_4_ = uVar407;
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar517,pauVar332[0x25]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar543,pauVar332[0x27]);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),pauVar332[0x29],auVar459);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),pauVar332[0x2b],auVar491);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),pauVar332[0x2d],auVar517);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),pauVar332[0x2f],auVar543);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 100);
                          auVar121._4_4_ = uVar407;
                          auVar121._0_4_ = uVar407;
                          auVar121._8_4_ = uVar407;
                          auVar121._12_4_ = uVar407;
                          auVar121._16_4_ = uVar407;
                          auVar121._20_4_ = uVar407;
                          auVar121._24_4_ = uVar407;
                          auVar121._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl
                                               (ZEXT1632(auVar360),pauVar332[0x29],auVar121);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x6c);
                          auVar122._4_4_ = uVar407;
                          auVar122._0_4_ = uVar407;
                          auVar122._8_4_ = uVar407;
                          auVar122._12_4_ = uVar407;
                          auVar122._16_4_ = uVar407;
                          auVar122._20_4_ = uVar407;
                          auVar122._24_4_ = uVar407;
                          auVar122._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,pauVar332[0x2b],auVar122);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x74);
                          auVar123._4_4_ = uVar407;
                          auVar123._0_4_ = uVar407;
                          auVar123._8_4_ = uVar407;
                          auVar123._12_4_ = uVar407;
                          auVar123._16_4_ = uVar407;
                          auVar123._20_4_ = uVar407;
                          auVar123._24_4_ = uVar407;
                          auVar123._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,pauVar332[0x2d],auVar123);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x7c);
                          auVar124._4_4_ = uVar407;
                          auVar124._0_4_ = uVar407;
                          auVar124._8_4_ = uVar407;
                          auVar124._12_4_ = uVar407;
                          auVar124._16_4_ = uVar407;
                          auVar124._20_4_ = uVar407;
                          auVar124._24_4_ = uVar407;
                          auVar124._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,pauVar332[0x2f],auVar124);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 4);
                          auVar125._4_4_ = uVar407;
                          auVar125._0_4_ = uVar407;
                          auVar125._8_4_ = uVar407;
                          auVar125._12_4_ = uVar407;
                          auVar125._16_4_ = uVar407;
                          auVar125._20_4_ = uVar407;
                          auVar125._24_4_ = uVar407;
                          auVar125._28_4_ = uVar407;
                          auVar376 = vfmadd231ps_avx512vl
                                               (ZEXT1632(auVar421),pauVar332[0x31],auVar125);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0xc);
                          auVar126._4_4_ = uVar407;
                          auVar126._0_4_ = uVar407;
                          auVar126._8_4_ = uVar407;
                          auVar126._12_4_ = uVar407;
                          auVar126._16_4_ = uVar407;
                          auVar126._20_4_ = uVar407;
                          auVar126._24_4_ = uVar407;
                          auVar126._28_4_ = uVar407;
                          auVar376 = vfmadd231ps_avx512vl(auVar376,pauVar332[0x33],auVar126);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x14);
                          auVar127._4_4_ = uVar407;
                          auVar127._0_4_ = uVar407;
                          auVar127._8_4_ = uVar407;
                          auVar127._12_4_ = uVar407;
                          auVar127._16_4_ = uVar407;
                          auVar127._20_4_ = uVar407;
                          auVar127._24_4_ = uVar407;
                          auVar127._28_4_ = uVar407;
                          auVar376 = vfmadd231ps_avx512vl(auVar376,pauVar332[0x35],auVar127);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x1c);
                          auVar128._4_4_ = uVar407;
                          auVar128._0_4_ = uVar407;
                          auVar128._8_4_ = uVar407;
                          auVar128._12_4_ = uVar407;
                          auVar128._16_4_ = uVar407;
                          auVar128._20_4_ = uVar407;
                          auVar128._24_4_ = uVar407;
                          auVar128._28_4_ = uVar407;
                          auVar376 = vfmadd231ps_avx512vl(auVar376,pauVar332[0x37],auVar128);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x24);
                          auVar572._4_4_ = uVar407;
                          auVar572._0_4_ = uVar407;
                          auVar572._8_4_ = uVar407;
                          auVar572._12_4_ = uVar407;
                          auVar572._16_4_ = uVar407;
                          auVar572._20_4_ = uVar407;
                          auVar572._24_4_ = uVar407;
                          auVar572._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x2c);
                          auVar596._4_4_ = uVar407;
                          auVar596._0_4_ = uVar407;
                          auVar596._8_4_ = uVar407;
                          auVar596._12_4_ = uVar407;
                          auVar596._16_4_ = uVar407;
                          auVar596._20_4_ = uVar407;
                          auVar596._24_4_ = uVar407;
                          auVar596._28_4_ = uVar407;
                          auVar360 = vfmadd231ps_fma(auVar393,auVar572,pauVar332[0x31]);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x34);
                          auVar460._4_4_ = uVar407;
                          auVar460._0_4_ = uVar407;
                          auVar460._8_4_ = uVar407;
                          auVar460._12_4_ = uVar407;
                          auVar460._16_4_ = uVar407;
                          auVar460._20_4_ = uVar407;
                          auVar460._24_4_ = uVar407;
                          auVar460._28_4_ = uVar407;
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar596,pauVar332[0x33]);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x3c);
                          auVar492._4_4_ = uVar407;
                          auVar492._0_4_ = uVar407;
                          auVar492._8_4_ = uVar407;
                          auVar492._12_4_ = uVar407;
                          auVar492._16_4_ = uVar407;
                          auVar492._20_4_ = uVar407;
                          auVar492._24_4_ = uVar407;
                          auVar492._28_4_ = uVar407;
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar460,pauVar332[0x35]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar492,pauVar332[0x37]);
                          auVar421 = vfmadd231ps_fma(auVar376,pauVar332[0x39],auVar572);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),pauVar332[0x3b],auVar596);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),pauVar332[0x3d],auVar460);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),pauVar332[0x3f],auVar492);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x44);
                          auVar461._4_4_ = uVar407;
                          auVar461._0_4_ = uVar407;
                          auVar461._8_4_ = uVar407;
                          auVar461._12_4_ = uVar407;
                          auVar461._16_4_ = uVar407;
                          auVar461._20_4_ = uVar407;
                          auVar461._24_4_ = uVar407;
                          auVar461._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x4c);
                          auVar493._4_4_ = uVar407;
                          auVar493._0_4_ = uVar407;
                          auVar493._8_4_ = uVar407;
                          auVar493._12_4_ = uVar407;
                          auVar493._16_4_ = uVar407;
                          auVar493._20_4_ = uVar407;
                          auVar493._24_4_ = uVar407;
                          auVar493._28_4_ = uVar407;
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar461,pauVar332[0x39]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar493,pauVar332[0x3b]);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x54);
                          auVar518._4_4_ = uVar407;
                          auVar518._0_4_ = uVar407;
                          auVar518._8_4_ = uVar407;
                          auVar518._12_4_ = uVar407;
                          auVar518._16_4_ = uVar407;
                          auVar518._20_4_ = uVar407;
                          auVar518._24_4_ = uVar407;
                          auVar518._28_4_ = uVar407;
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar518,pauVar332[0x3d]);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x5c);
                          auVar544._4_4_ = uVar407;
                          auVar544._0_4_ = uVar407;
                          auVar544._8_4_ = uVar407;
                          auVar544._12_4_ = uVar407;
                          auVar544._16_4_ = uVar407;
                          auVar544._20_4_ = uVar407;
                          auVar544._24_4_ = uVar407;
                          auVar544._28_4_ = uVar407;
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar544,pauVar332[0x3f]);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),pauVar332[0x41],auVar461);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),pauVar332[0x43],auVar493);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),pauVar332[0x45],auVar518);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),pauVar332[0x47],auVar544);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 100);
                          auVar129._4_4_ = uVar407;
                          auVar129._0_4_ = uVar407;
                          auVar129._8_4_ = uVar407;
                          auVar129._12_4_ = uVar407;
                          auVar129._16_4_ = uVar407;
                          auVar129._20_4_ = uVar407;
                          auVar129._24_4_ = uVar407;
                          auVar129._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl
                                               (ZEXT1632(auVar360),pauVar332[0x41],auVar129);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x6c);
                          auVar130._4_4_ = uVar407;
                          auVar130._0_4_ = uVar407;
                          auVar130._8_4_ = uVar407;
                          auVar130._12_4_ = uVar407;
                          auVar130._16_4_ = uVar407;
                          auVar130._20_4_ = uVar407;
                          auVar130._24_4_ = uVar407;
                          auVar130._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,pauVar332[0x43],auVar130);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x74);
                          auVar131._4_4_ = uVar407;
                          auVar131._0_4_ = uVar407;
                          auVar131._8_4_ = uVar407;
                          auVar131._12_4_ = uVar407;
                          auVar131._16_4_ = uVar407;
                          auVar131._20_4_ = uVar407;
                          auVar131._24_4_ = uVar407;
                          auVar131._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,pauVar332[0x45],auVar131);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x7c);
                          auVar132._4_4_ = uVar407;
                          auVar132._0_4_ = uVar407;
                          auVar132._8_4_ = uVar407;
                          auVar132._12_4_ = uVar407;
                          auVar132._16_4_ = uVar407;
                          auVar132._20_4_ = uVar407;
                          auVar132._24_4_ = uVar407;
                          auVar132._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,pauVar332[0x47],auVar132);
                          *(undefined1 (*) [32])((long)*pauVar306 + lVar271) = ZEXT1632(auVar421);
                          *(undefined1 (*) [32])(pauVar306[1] + lVar271) = auVar393;
                          lVar271 = lVar271 + 0x40;
                        }
                        for (; iVar328 < iVar260; iVar328 = iVar328 + 1) {
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271);
                          auVar519._4_4_ = uVar407;
                          auVar519._0_4_ = uVar407;
                          auVar519._8_4_ = uVar407;
                          auVar519._12_4_ = uVar407;
                          auVar519._16_4_ = uVar407;
                          auVar519._20_4_ = uVar407;
                          auVar519._24_4_ = uVar407;
                          auVar519._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 8);
                          auVar545._4_4_ = uVar407;
                          auVar545._0_4_ = uVar407;
                          auVar545._8_4_ = uVar407;
                          auVar545._12_4_ = uVar407;
                          auVar545._16_4_ = uVar407;
                          auVar545._20_4_ = uVar407;
                          auVar545._24_4_ = uVar407;
                          auVar545._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0xc);
                          auVar411._4_4_ = uVar407;
                          auVar411._0_4_ = uVar407;
                          auVar411._8_4_ = uVar407;
                          auVar411._12_4_ = uVar407;
                          auVar411._16_4_ = uVar407;
                          auVar411._20_4_ = uVar407;
                          auVar411._24_4_ = uVar407;
                          auVar411._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x10);
                          auVar573._4_4_ = uVar407;
                          auVar573._0_4_ = uVar407;
                          auVar573._8_4_ = uVar407;
                          auVar573._12_4_ = uVar407;
                          auVar573._16_4_ = uVar407;
                          auVar573._20_4_ = uVar407;
                          auVar573._24_4_ = uVar407;
                          auVar573._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x14);
                          auVar429._4_4_ = uVar407;
                          auVar429._0_4_ = uVar407;
                          auVar429._8_4_ = uVar407;
                          auVar429._12_4_ = uVar407;
                          auVar429._16_4_ = uVar407;
                          auVar429._20_4_ = uVar407;
                          auVar429._24_4_ = uVar407;
                          auVar429._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x18);
                          auVar597._4_4_ = uVar407;
                          auVar597._0_4_ = uVar407;
                          auVar597._8_4_ = uVar407;
                          auVar597._12_4_ = uVar407;
                          auVar597._16_4_ = uVar407;
                          auVar597._20_4_ = uVar407;
                          auVar597._24_4_ = uVar407;
                          auVar597._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x1c);
                          auVar462._4_4_ = uVar407;
                          auVar462._0_4_ = uVar407;
                          auVar462._8_4_ = uVar407;
                          auVar462._12_4_ = uVar407;
                          auVar462._16_4_ = uVar407;
                          auVar462._20_4_ = uVar407;
                          auVar462._24_4_ = uVar407;
                          auVar462._28_4_ = uVar407;
                          auVar360 = vfmadd213ps_fma(*pauVar332,auVar519,
                                                     *(undefined1 (*) [32])
                                                      ((long)*pauVar306 + lVar271));
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar545,pauVar332[2]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar573,pauVar332[4]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar597,pauVar332[6]);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x20);
                          auVar520._4_4_ = uVar407;
                          auVar520._0_4_ = uVar407;
                          auVar520._8_4_ = uVar407;
                          auVar520._12_4_ = uVar407;
                          auVar520._16_4_ = uVar407;
                          auVar520._20_4_ = uVar407;
                          auVar520._24_4_ = uVar407;
                          auVar520._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x28);
                          auVar546._4_4_ = uVar407;
                          auVar546._0_4_ = uVar407;
                          auVar546._8_4_ = uVar407;
                          auVar546._12_4_ = uVar407;
                          auVar546._16_4_ = uVar407;
                          auVar546._20_4_ = uVar407;
                          auVar546._24_4_ = uVar407;
                          auVar546._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x30);
                          auVar574._4_4_ = uVar407;
                          auVar574._0_4_ = uVar407;
                          auVar574._8_4_ = uVar407;
                          auVar574._12_4_ = uVar407;
                          auVar574._16_4_ = uVar407;
                          auVar574._20_4_ = uVar407;
                          auVar574._24_4_ = uVar407;
                          auVar574._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x38);
                          auVar598._4_4_ = uVar407;
                          auVar598._0_4_ = uVar407;
                          auVar598._8_4_ = uVar407;
                          auVar598._12_4_ = uVar407;
                          auVar598._16_4_ = uVar407;
                          auVar598._20_4_ = uVar407;
                          auVar598._24_4_ = uVar407;
                          auVar598._28_4_ = uVar407;
                          auVar360 = vfmadd132ps_fma(auVar520,ZEXT1632(auVar360),pauVar332[8]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar546,pauVar332[10]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar574,pauVar332[0xc]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar598,pauVar332[0xe]);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x40);
                          auVar547._4_4_ = uVar407;
                          auVar547._0_4_ = uVar407;
                          auVar547._8_4_ = uVar407;
                          auVar547._12_4_ = uVar407;
                          auVar547._16_4_ = uVar407;
                          auVar547._20_4_ = uVar407;
                          auVar547._24_4_ = uVar407;
                          auVar547._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x48);
                          auVar575._4_4_ = uVar407;
                          auVar575._0_4_ = uVar407;
                          auVar575._8_4_ = uVar407;
                          auVar575._12_4_ = uVar407;
                          auVar575._16_4_ = uVar407;
                          auVar575._20_4_ = uVar407;
                          auVar575._24_4_ = uVar407;
                          auVar575._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x50);
                          auVar599._4_4_ = uVar407;
                          auVar599._0_4_ = uVar407;
                          auVar599._8_4_ = uVar407;
                          auVar599._12_4_ = uVar407;
                          auVar599._16_4_ = uVar407;
                          auVar599._20_4_ = uVar407;
                          auVar599._24_4_ = uVar407;
                          auVar599._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x58);
                          auVar614._4_4_ = uVar407;
                          auVar614._0_4_ = uVar407;
                          auVar614._8_4_ = uVar407;
                          auVar614._12_4_ = uVar407;
                          auVar614._16_4_ = uVar407;
                          auVar614._20_4_ = uVar407;
                          auVar614._24_4_ = uVar407;
                          auVar614._28_4_ = uVar407;
                          auVar360 = vfmadd132ps_fma(auVar547,ZEXT1632(auVar360),pauVar332[0x10]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar575,pauVar332[0x12]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar599,pauVar332[0x14]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar614,pauVar332[0x16]);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271);
                          auVar521._4_4_ = uVar407;
                          auVar521._0_4_ = uVar407;
                          auVar521._8_4_ = uVar407;
                          auVar521._12_4_ = uVar407;
                          auVar521._16_4_ = uVar407;
                          auVar521._20_4_ = uVar407;
                          auVar521._24_4_ = uVar407;
                          auVar521._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 8);
                          auVar576._4_4_ = uVar407;
                          auVar576._0_4_ = uVar407;
                          auVar576._8_4_ = uVar407;
                          auVar576._12_4_ = uVar407;
                          auVar576._16_4_ = uVar407;
                          auVar576._20_4_ = uVar407;
                          auVar576._24_4_ = uVar407;
                          auVar576._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x10);
                          auVar600._4_4_ = uVar407;
                          auVar600._0_4_ = uVar407;
                          auVar600._8_4_ = uVar407;
                          auVar600._12_4_ = uVar407;
                          auVar600._16_4_ = uVar407;
                          auVar600._20_4_ = uVar407;
                          auVar600._24_4_ = uVar407;
                          auVar600._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x18);
                          auVar615._4_4_ = uVar407;
                          auVar615._0_4_ = uVar407;
                          auVar615._8_4_ = uVar407;
                          auVar615._12_4_ = uVar407;
                          auVar615._16_4_ = uVar407;
                          auVar615._20_4_ = uVar407;
                          auVar615._24_4_ = uVar407;
                          auVar615._28_4_ = uVar407;
                          auVar360 = vfmadd132ps_fma(auVar521,ZEXT1632(auVar360),pauVar332[0x18]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar576,pauVar332[0x1a]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar600,pauVar332[0x1c]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar615,pauVar332[0x1e]);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x20);
                          auVar548._4_4_ = uVar407;
                          auVar548._0_4_ = uVar407;
                          auVar548._8_4_ = uVar407;
                          auVar548._12_4_ = uVar407;
                          auVar548._16_4_ = uVar407;
                          auVar548._20_4_ = uVar407;
                          auVar548._24_4_ = uVar407;
                          auVar548._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x28);
                          auVar577._4_4_ = uVar407;
                          auVar577._0_4_ = uVar407;
                          auVar577._8_4_ = uVar407;
                          auVar577._12_4_ = uVar407;
                          auVar577._16_4_ = uVar407;
                          auVar577._20_4_ = uVar407;
                          auVar577._24_4_ = uVar407;
                          auVar577._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x30);
                          auVar601._4_4_ = uVar407;
                          auVar601._0_4_ = uVar407;
                          auVar601._8_4_ = uVar407;
                          auVar601._12_4_ = uVar407;
                          auVar601._16_4_ = uVar407;
                          auVar601._20_4_ = uVar407;
                          auVar601._24_4_ = uVar407;
                          auVar601._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x38);
                          auVar616._4_4_ = uVar407;
                          auVar616._0_4_ = uVar407;
                          auVar616._8_4_ = uVar407;
                          auVar616._12_4_ = uVar407;
                          auVar616._16_4_ = uVar407;
                          auVar616._20_4_ = uVar407;
                          auVar616._24_4_ = uVar407;
                          auVar616._28_4_ = uVar407;
                          auVar360 = vfmadd132ps_fma(auVar548,ZEXT1632(auVar360),pauVar332[0x20]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar577,pauVar332[0x22]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar601,pauVar332[0x24]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar616,pauVar332[0x26]);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x40);
                          auVar522._4_4_ = uVar407;
                          auVar522._0_4_ = uVar407;
                          auVar522._8_4_ = uVar407;
                          auVar522._12_4_ = uVar407;
                          auVar522._16_4_ = uVar407;
                          auVar522._20_4_ = uVar407;
                          auVar522._24_4_ = uVar407;
                          auVar522._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x48);
                          auVar578._4_4_ = uVar407;
                          auVar578._0_4_ = uVar407;
                          auVar578._8_4_ = uVar407;
                          auVar578._12_4_ = uVar407;
                          auVar578._16_4_ = uVar407;
                          auVar578._20_4_ = uVar407;
                          auVar578._24_4_ = uVar407;
                          auVar578._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x50);
                          auVar602._4_4_ = uVar407;
                          auVar602._0_4_ = uVar407;
                          auVar602._8_4_ = uVar407;
                          auVar602._12_4_ = uVar407;
                          auVar602._16_4_ = uVar407;
                          auVar602._20_4_ = uVar407;
                          auVar602._24_4_ = uVar407;
                          auVar602._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x58);
                          auVar617._4_4_ = uVar407;
                          auVar617._0_4_ = uVar407;
                          auVar617._8_4_ = uVar407;
                          auVar617._12_4_ = uVar407;
                          auVar617._16_4_ = uVar407;
                          auVar617._20_4_ = uVar407;
                          auVar617._24_4_ = uVar407;
                          auVar617._28_4_ = uVar407;
                          auVar360 = vfmadd132ps_fma(auVar522,ZEXT1632(auVar360),pauVar332[0x28]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar578,pauVar332[0x2a]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar602,pauVar332[0x2c]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar617,pauVar332[0x2e]);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271);
                          auVar549._4_4_ = uVar407;
                          auVar549._0_4_ = uVar407;
                          auVar549._8_4_ = uVar407;
                          auVar549._12_4_ = uVar407;
                          auVar549._16_4_ = uVar407;
                          auVar549._20_4_ = uVar407;
                          auVar549._24_4_ = uVar407;
                          auVar549._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 8);
                          auVar579._4_4_ = uVar407;
                          auVar579._0_4_ = uVar407;
                          auVar579._8_4_ = uVar407;
                          auVar579._12_4_ = uVar407;
                          auVar579._16_4_ = uVar407;
                          auVar579._20_4_ = uVar407;
                          auVar579._24_4_ = uVar407;
                          auVar579._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x10);
                          auVar603._4_4_ = uVar407;
                          auVar603._0_4_ = uVar407;
                          auVar603._8_4_ = uVar407;
                          auVar603._12_4_ = uVar407;
                          auVar603._16_4_ = uVar407;
                          auVar603._20_4_ = uVar407;
                          auVar603._24_4_ = uVar407;
                          auVar603._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x18);
                          auVar618._4_4_ = uVar407;
                          auVar618._0_4_ = uVar407;
                          auVar618._8_4_ = uVar407;
                          auVar618._12_4_ = uVar407;
                          auVar618._16_4_ = uVar407;
                          auVar618._20_4_ = uVar407;
                          auVar618._24_4_ = uVar407;
                          auVar618._28_4_ = uVar407;
                          auVar360 = vfmadd132ps_fma(auVar549,ZEXT1632(auVar360),pauVar332[0x30]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar579,pauVar332[0x32]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar603,pauVar332[0x34]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar618,pauVar332[0x36]);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x20);
                          auVar523._4_4_ = uVar407;
                          auVar523._0_4_ = uVar407;
                          auVar523._8_4_ = uVar407;
                          auVar523._12_4_ = uVar407;
                          auVar523._16_4_ = uVar407;
                          auVar523._20_4_ = uVar407;
                          auVar523._24_4_ = uVar407;
                          auVar523._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x28);
                          auVar580._4_4_ = uVar407;
                          auVar580._0_4_ = uVar407;
                          auVar580._8_4_ = uVar407;
                          auVar580._12_4_ = uVar407;
                          auVar580._16_4_ = uVar407;
                          auVar580._20_4_ = uVar407;
                          auVar580._24_4_ = uVar407;
                          auVar580._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x30);
                          auVar604._4_4_ = uVar407;
                          auVar604._0_4_ = uVar407;
                          auVar604._8_4_ = uVar407;
                          auVar604._12_4_ = uVar407;
                          auVar604._16_4_ = uVar407;
                          auVar604._20_4_ = uVar407;
                          auVar604._24_4_ = uVar407;
                          auVar604._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x38);
                          auVar619._4_4_ = uVar407;
                          auVar619._0_4_ = uVar407;
                          auVar619._8_4_ = uVar407;
                          auVar619._12_4_ = uVar407;
                          auVar619._16_4_ = uVar407;
                          auVar619._20_4_ = uVar407;
                          auVar619._24_4_ = uVar407;
                          auVar619._28_4_ = uVar407;
                          auVar360 = vfmadd132ps_fma(auVar523,ZEXT1632(auVar360),pauVar332[0x38]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar580,pauVar332[0x3a]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar604,pauVar332[0x3c]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar619,pauVar332[0x3e]);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x40);
                          auVar550._4_4_ = uVar407;
                          auVar550._0_4_ = uVar407;
                          auVar550._8_4_ = uVar407;
                          auVar550._12_4_ = uVar407;
                          auVar550._16_4_ = uVar407;
                          auVar550._20_4_ = uVar407;
                          auVar550._24_4_ = uVar407;
                          auVar550._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x48);
                          auVar581._4_4_ = uVar407;
                          auVar581._0_4_ = uVar407;
                          auVar581._8_4_ = uVar407;
                          auVar581._12_4_ = uVar407;
                          auVar581._16_4_ = uVar407;
                          auVar581._20_4_ = uVar407;
                          auVar581._24_4_ = uVar407;
                          auVar581._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x50);
                          auVar605._4_4_ = uVar407;
                          auVar605._0_4_ = uVar407;
                          auVar605._8_4_ = uVar407;
                          auVar605._12_4_ = uVar407;
                          auVar605._16_4_ = uVar407;
                          auVar605._20_4_ = uVar407;
                          auVar605._24_4_ = uVar407;
                          auVar605._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x58);
                          auVar620._4_4_ = uVar407;
                          auVar620._0_4_ = uVar407;
                          auVar620._8_4_ = uVar407;
                          auVar620._12_4_ = uVar407;
                          auVar620._16_4_ = uVar407;
                          auVar620._20_4_ = uVar407;
                          auVar620._24_4_ = uVar407;
                          auVar620._28_4_ = uVar407;
                          auVar360 = vfmadd132ps_fma(auVar550,ZEXT1632(auVar360),pauVar332[0x40]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar581,pauVar332[0x42]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar605,pauVar332[0x44]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar620,pauVar332[0x46]);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 4);
                          auVar133._4_4_ = uVar407;
                          auVar133._0_4_ = uVar407;
                          auVar133._8_4_ = uVar407;
                          auVar133._12_4_ = uVar407;
                          auVar133._16_4_ = uVar407;
                          auVar133._20_4_ = uVar407;
                          auVar133._24_4_ = uVar407;
                          auVar133._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),pauVar332[1],auVar133);
                          auVar360 = vfmadd231ps_fma(auVar393,auVar411,pauVar332[3]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar429,pauVar332[5]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar462,pauVar332[7]);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x24);
                          auVar412._4_4_ = uVar407;
                          auVar412._0_4_ = uVar407;
                          auVar412._8_4_ = uVar407;
                          auVar412._12_4_ = uVar407;
                          auVar412._16_4_ = uVar407;
                          auVar412._20_4_ = uVar407;
                          auVar412._24_4_ = uVar407;
                          auVar412._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x2c);
                          auVar430._4_4_ = uVar407;
                          auVar430._0_4_ = uVar407;
                          auVar430._8_4_ = uVar407;
                          auVar430._12_4_ = uVar407;
                          auVar430._16_4_ = uVar407;
                          auVar430._20_4_ = uVar407;
                          auVar430._24_4_ = uVar407;
                          auVar430._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x34);
                          auVar463._4_4_ = uVar407;
                          auVar463._0_4_ = uVar407;
                          auVar463._8_4_ = uVar407;
                          auVar463._12_4_ = uVar407;
                          auVar463._16_4_ = uVar407;
                          auVar463._20_4_ = uVar407;
                          auVar463._24_4_ = uVar407;
                          auVar463._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x3c);
                          auVar494._4_4_ = uVar407;
                          auVar494._0_4_ = uVar407;
                          auVar494._8_4_ = uVar407;
                          auVar494._12_4_ = uVar407;
                          auVar494._16_4_ = uVar407;
                          auVar494._20_4_ = uVar407;
                          auVar494._24_4_ = uVar407;
                          auVar494._28_4_ = uVar407;
                          auVar360 = vfmadd132ps_fma(auVar412,ZEXT1632(auVar360),pauVar332[9]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar430,pauVar332[0xb]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar463,pauVar332[0xd]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar494,pauVar332[0xf]);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x44);
                          auVar431._4_4_ = uVar407;
                          auVar431._0_4_ = uVar407;
                          auVar431._8_4_ = uVar407;
                          auVar431._12_4_ = uVar407;
                          auVar431._16_4_ = uVar407;
                          auVar431._20_4_ = uVar407;
                          auVar431._24_4_ = uVar407;
                          auVar431._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x4c);
                          auVar464._4_4_ = uVar407;
                          auVar464._0_4_ = uVar407;
                          auVar464._8_4_ = uVar407;
                          auVar464._12_4_ = uVar407;
                          auVar464._16_4_ = uVar407;
                          auVar464._20_4_ = uVar407;
                          auVar464._24_4_ = uVar407;
                          auVar464._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x54);
                          auVar495._4_4_ = uVar407;
                          auVar495._0_4_ = uVar407;
                          auVar495._8_4_ = uVar407;
                          auVar495._12_4_ = uVar407;
                          auVar495._16_4_ = uVar407;
                          auVar495._20_4_ = uVar407;
                          auVar495._24_4_ = uVar407;
                          auVar495._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x5c);
                          auVar524._4_4_ = uVar407;
                          auVar524._0_4_ = uVar407;
                          auVar524._8_4_ = uVar407;
                          auVar524._12_4_ = uVar407;
                          auVar524._16_4_ = uVar407;
                          auVar524._20_4_ = uVar407;
                          auVar524._24_4_ = uVar407;
                          auVar524._28_4_ = uVar407;
                          auVar360 = vfmadd132ps_fma(auVar431,ZEXT1632(auVar360),pauVar332[0x11]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar464,pauVar332[0x13]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar495,pauVar332[0x15]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar524,pauVar332[0x17]);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 4);
                          auVar413._4_4_ = uVar407;
                          auVar413._0_4_ = uVar407;
                          auVar413._8_4_ = uVar407;
                          auVar413._12_4_ = uVar407;
                          auVar413._16_4_ = uVar407;
                          auVar413._20_4_ = uVar407;
                          auVar413._24_4_ = uVar407;
                          auVar413._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0xc);
                          auVar465._4_4_ = uVar407;
                          auVar465._0_4_ = uVar407;
                          auVar465._8_4_ = uVar407;
                          auVar465._12_4_ = uVar407;
                          auVar465._16_4_ = uVar407;
                          auVar465._20_4_ = uVar407;
                          auVar465._24_4_ = uVar407;
                          auVar465._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x14);
                          auVar496._4_4_ = uVar407;
                          auVar496._0_4_ = uVar407;
                          auVar496._8_4_ = uVar407;
                          auVar496._12_4_ = uVar407;
                          auVar496._16_4_ = uVar407;
                          auVar496._20_4_ = uVar407;
                          auVar496._24_4_ = uVar407;
                          auVar496._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x1c);
                          auVar525._4_4_ = uVar407;
                          auVar525._0_4_ = uVar407;
                          auVar525._8_4_ = uVar407;
                          auVar525._12_4_ = uVar407;
                          auVar525._16_4_ = uVar407;
                          auVar525._20_4_ = uVar407;
                          auVar525._24_4_ = uVar407;
                          auVar525._28_4_ = uVar407;
                          auVar360 = vfmadd132ps_fma(auVar413,ZEXT1632(auVar360),pauVar332[0x19]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar465,pauVar332[0x1b]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar496,pauVar332[0x1d]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar525,pauVar332[0x1f]);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x24);
                          auVar432._4_4_ = uVar407;
                          auVar432._0_4_ = uVar407;
                          auVar432._8_4_ = uVar407;
                          auVar432._12_4_ = uVar407;
                          auVar432._16_4_ = uVar407;
                          auVar432._20_4_ = uVar407;
                          auVar432._24_4_ = uVar407;
                          auVar432._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x2c);
                          auVar466._4_4_ = uVar407;
                          auVar466._0_4_ = uVar407;
                          auVar466._8_4_ = uVar407;
                          auVar466._12_4_ = uVar407;
                          auVar466._16_4_ = uVar407;
                          auVar466._20_4_ = uVar407;
                          auVar466._24_4_ = uVar407;
                          auVar466._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x34);
                          auVar497._4_4_ = uVar407;
                          auVar497._0_4_ = uVar407;
                          auVar497._8_4_ = uVar407;
                          auVar497._12_4_ = uVar407;
                          auVar497._16_4_ = uVar407;
                          auVar497._20_4_ = uVar407;
                          auVar497._24_4_ = uVar407;
                          auVar497._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x3c);
                          auVar526._4_4_ = uVar407;
                          auVar526._0_4_ = uVar407;
                          auVar526._8_4_ = uVar407;
                          auVar526._12_4_ = uVar407;
                          auVar526._16_4_ = uVar407;
                          auVar526._20_4_ = uVar407;
                          auVar526._24_4_ = uVar407;
                          auVar526._28_4_ = uVar407;
                          auVar360 = vfmadd132ps_fma(auVar432,ZEXT1632(auVar360),pauVar332[0x21]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar466,pauVar332[0x23]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar497,pauVar332[0x25]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar526,pauVar332[0x27]);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x44);
                          auVar414._4_4_ = uVar407;
                          auVar414._0_4_ = uVar407;
                          auVar414._8_4_ = uVar407;
                          auVar414._12_4_ = uVar407;
                          auVar414._16_4_ = uVar407;
                          auVar414._20_4_ = uVar407;
                          auVar414._24_4_ = uVar407;
                          auVar414._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x4c);
                          auVar467._4_4_ = uVar407;
                          auVar467._0_4_ = uVar407;
                          auVar467._8_4_ = uVar407;
                          auVar467._12_4_ = uVar407;
                          auVar467._16_4_ = uVar407;
                          auVar467._20_4_ = uVar407;
                          auVar467._24_4_ = uVar407;
                          auVar467._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x54);
                          auVar498._4_4_ = uVar407;
                          auVar498._0_4_ = uVar407;
                          auVar498._8_4_ = uVar407;
                          auVar498._12_4_ = uVar407;
                          auVar498._16_4_ = uVar407;
                          auVar498._20_4_ = uVar407;
                          auVar498._24_4_ = uVar407;
                          auVar498._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x5c);
                          auVar527._4_4_ = uVar407;
                          auVar527._0_4_ = uVar407;
                          auVar527._8_4_ = uVar407;
                          auVar527._12_4_ = uVar407;
                          auVar527._16_4_ = uVar407;
                          auVar527._20_4_ = uVar407;
                          auVar527._24_4_ = uVar407;
                          auVar527._28_4_ = uVar407;
                          auVar360 = vfmadd132ps_fma(auVar414,ZEXT1632(auVar360),pauVar332[0x29]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar467,pauVar332[0x2b]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar498,pauVar332[0x2d]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar527,pauVar332[0x2f]);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 4);
                          auVar433._4_4_ = uVar407;
                          auVar433._0_4_ = uVar407;
                          auVar433._8_4_ = uVar407;
                          auVar433._12_4_ = uVar407;
                          auVar433._16_4_ = uVar407;
                          auVar433._20_4_ = uVar407;
                          auVar433._24_4_ = uVar407;
                          auVar433._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0xc);
                          auVar468._4_4_ = uVar407;
                          auVar468._0_4_ = uVar407;
                          auVar468._8_4_ = uVar407;
                          auVar468._12_4_ = uVar407;
                          auVar468._16_4_ = uVar407;
                          auVar468._20_4_ = uVar407;
                          auVar468._24_4_ = uVar407;
                          auVar468._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x14);
                          auVar499._4_4_ = uVar407;
                          auVar499._0_4_ = uVar407;
                          auVar499._8_4_ = uVar407;
                          auVar499._12_4_ = uVar407;
                          auVar499._16_4_ = uVar407;
                          auVar499._20_4_ = uVar407;
                          auVar499._24_4_ = uVar407;
                          auVar499._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x1c);
                          auVar528._4_4_ = uVar407;
                          auVar528._0_4_ = uVar407;
                          auVar528._8_4_ = uVar407;
                          auVar528._12_4_ = uVar407;
                          auVar528._16_4_ = uVar407;
                          auVar528._20_4_ = uVar407;
                          auVar528._24_4_ = uVar407;
                          auVar528._28_4_ = uVar407;
                          auVar360 = vfmadd132ps_fma(auVar433,ZEXT1632(auVar360),pauVar332[0x31]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar468,pauVar332[0x33]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar499,pauVar332[0x35]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar528,pauVar332[0x37]);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x24);
                          auVar415._4_4_ = uVar407;
                          auVar415._0_4_ = uVar407;
                          auVar415._8_4_ = uVar407;
                          auVar415._12_4_ = uVar407;
                          auVar415._16_4_ = uVar407;
                          auVar415._20_4_ = uVar407;
                          auVar415._24_4_ = uVar407;
                          auVar415._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x2c);
                          auVar469._4_4_ = uVar407;
                          auVar469._0_4_ = uVar407;
                          auVar469._8_4_ = uVar407;
                          auVar469._12_4_ = uVar407;
                          auVar469._16_4_ = uVar407;
                          auVar469._20_4_ = uVar407;
                          auVar469._24_4_ = uVar407;
                          auVar469._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x34);
                          auVar500._4_4_ = uVar407;
                          auVar500._0_4_ = uVar407;
                          auVar500._8_4_ = uVar407;
                          auVar500._12_4_ = uVar407;
                          auVar500._16_4_ = uVar407;
                          auVar500._20_4_ = uVar407;
                          auVar500._24_4_ = uVar407;
                          auVar500._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x3c);
                          auVar529._4_4_ = uVar407;
                          auVar529._0_4_ = uVar407;
                          auVar529._8_4_ = uVar407;
                          auVar529._12_4_ = uVar407;
                          auVar529._16_4_ = uVar407;
                          auVar529._20_4_ = uVar407;
                          auVar529._24_4_ = uVar407;
                          auVar529._28_4_ = uVar407;
                          auVar360 = vfmadd132ps_fma(auVar415,ZEXT1632(auVar360),pauVar332[0x39]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar469,pauVar332[0x3b]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar500,pauVar332[0x3d]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar529,pauVar332[0x3f]);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x44);
                          auVar434._4_4_ = uVar407;
                          auVar434._0_4_ = uVar407;
                          auVar434._8_4_ = uVar407;
                          auVar434._12_4_ = uVar407;
                          auVar434._16_4_ = uVar407;
                          auVar434._20_4_ = uVar407;
                          auVar434._24_4_ = uVar407;
                          auVar434._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x4c);
                          auVar470._4_4_ = uVar407;
                          auVar470._0_4_ = uVar407;
                          auVar470._8_4_ = uVar407;
                          auVar470._12_4_ = uVar407;
                          auVar470._16_4_ = uVar407;
                          auVar470._20_4_ = uVar407;
                          auVar470._24_4_ = uVar407;
                          auVar470._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x54);
                          auVar501._4_4_ = uVar407;
                          auVar501._0_4_ = uVar407;
                          auVar501._8_4_ = uVar407;
                          auVar501._12_4_ = uVar407;
                          auVar501._16_4_ = uVar407;
                          auVar501._20_4_ = uVar407;
                          auVar501._24_4_ = uVar407;
                          auVar501._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x5c);
                          auVar530._4_4_ = uVar407;
                          auVar530._0_4_ = uVar407;
                          auVar530._8_4_ = uVar407;
                          auVar530._12_4_ = uVar407;
                          auVar530._16_4_ = uVar407;
                          auVar530._20_4_ = uVar407;
                          auVar530._24_4_ = uVar407;
                          auVar530._28_4_ = uVar407;
                          auVar360 = vfmadd132ps_fma(auVar434,ZEXT1632(auVar360),pauVar332[0x41]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar470,pauVar332[0x43]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar501,pauVar332[0x45]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar530,pauVar332[0x47]);
                          *(undefined1 (*) [32])((long)*pauVar306 + lVar271) = ZEXT1632(auVar360);
                          lVar271 = lVar271 + 0x20;
                        }
                        pvVar313 = (void *)((long)pvVar313 + lVar271 + 0x40);
                        pvVar345 = (void *)((long)pvVar345 + lVar271 + 0x40);
                        pvVar347 = (void *)((long)pvVar347 + lVar271 + 0x40);
                        pauVar306 = (undefined1 (*) [32])((long)*pauVar306 + lVar271);
                      }
                    }
                  }
                }
                else {
                  bVar349 = false;
                  if ((((uVar336 != 2 || uVar291 != 2) || (uVar290 != 0 || uVar314 != 0)) ||
                      uVar339 != 0) || uVar331 != 0) goto LAB_001800c6;
                  iVar260 = top_blob->w;
                  uVar291 = top_blob->h;
                  if (top_blob->h < 1) {
                    uVar291 = 0;
                  }
                  pvVar348 = (this->super_Convolution).bias_data.data;
                  uVar330 = local_d70.c;
                  if (local_d70.c < 1) {
                    uVar330 = 0;
                  }
                  uVar336 = top_blob->c;
                  if (top_blob->c < 1) {
                    uVar336 = 0;
                  }
                  for (uVar278 = 0; uVar278 != uVar336; uVar278 = uVar278 + 1) {
                    uVar268 = (long)top_blob->h * (long)top_blob->w;
                    uVar281 = top_blob->elemsize;
                    uVar318 = (uVar281 * uVar268 + 0xf & 0xfffffffffffffff0) / uVar281;
                    if (top_blob->dims == 4) {
                      uVar318 = uVar268;
                    }
                    if (pvVar348 == (void *)0x0) {
                      auVar393 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                    }
                    else {
                      auVar393 = *(undefined1 (*) [32])((long)pvVar348 + uVar278 * 0x20);
                    }
                    pauVar325 = (undefined1 (*) [32])
                                (top_blob->cstep * uVar278 * uVar281 + (long)top_blob->data);
                    iVar342 = (int)uVar318 * top_blob->d;
                    pauVar306 = pauVar325;
                    if (iVar342 < 1) {
                      iVar342 = 0;
                    }
                    while (bVar349 = iVar342 != 0, iVar342 = iVar342 + -1, bVar349) {
                      *pauVar306 = auVar393;
                      pauVar306 = pauVar306 + 1;
                    }
                    for (uVar281 = 0; uVar281 != uVar330; uVar281 = uVar281 + 1) {
                      puVar293 = (undefined4 *)
                                 (local_d70.cstep * uVar281 * local_d70.elemsize +
                                 (long)local_d70.data);
                      sVar765 = (this->weight_data_tm).elemsize;
                      lVar272 = (this->weight_data_tm).cstep * uVar278 * sVar765;
                      pvVar345 = (this->weight_data_tm).data;
                      lVar271 = (long)(this->weight_data_tm).w * uVar281 * sVar765;
                      pauVar306 = pauVar325;
                      puVar335 = (undefined4 *)
                                 ((long)local_d70.w * local_d70.elemsize + (long)puVar293);
                      for (uVar338 = 0; uVar338 != uVar291; uVar338 = uVar338 + 1) {
                        puVar341 = puVar335 + 8;
                        puVar294 = puVar293;
                        puVar293 = puVar293 + 8;
                        for (iVar342 = 0; iVar342 + 1 < iVar260; iVar342 = iVar342 + 2) {
                          uVar407 = *puVar294;
                          auVar416._4_4_ = uVar407;
                          auVar416._0_4_ = uVar407;
                          auVar416._8_4_ = uVar407;
                          auVar416._12_4_ = uVar407;
                          auVar416._16_4_ = uVar407;
                          auVar416._20_4_ = uVar407;
                          auVar416._24_4_ = uVar407;
                          auVar416._28_4_ = uVar407;
                          auVar393 = *(undefined1 (*) [32])((long)pvVar345 + lVar271 + lVar272);
                          auVar376 = *(undefined1 (*) [32])
                                      ((long)pvVar345 + lVar271 + lVar272 + 0x20);
                          auVar14 = *(undefined1 (*) [32])
                                     ((long)pvVar345 + lVar271 + lVar272 + 0x40);
                          auVar15 = *(undefined1 (*) [32])
                                     ((long)pvVar345 + lVar271 + lVar272 + 0x60);
                          auVar360 = vfmadd213ps_fma(auVar416,auVar393,*pauVar306);
                          uVar407 = puVar294[1];
                          auVar387._4_4_ = uVar407;
                          auVar387._0_4_ = uVar407;
                          auVar387._8_4_ = uVar407;
                          auVar387._12_4_ = uVar407;
                          auVar387._16_4_ = uVar407;
                          auVar387._20_4_ = uVar407;
                          auVar387._24_4_ = uVar407;
                          auVar387._28_4_ = uVar407;
                          auVar387 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar376,auVar387);
                          uVar407 = puVar294[2];
                          auVar16._4_4_ = uVar407;
                          auVar16._0_4_ = uVar407;
                          auVar16._8_4_ = uVar407;
                          auVar16._12_4_ = uVar407;
                          auVar16._16_4_ = uVar407;
                          auVar16._20_4_ = uVar407;
                          auVar16._24_4_ = uVar407;
                          auVar16._28_4_ = uVar407;
                          auVar387 = vfmadd231ps_avx512vl(auVar387,auVar14,auVar16);
                          uVar407 = puVar294[3];
                          auVar17._4_4_ = uVar407;
                          auVar17._0_4_ = uVar407;
                          auVar17._8_4_ = uVar407;
                          auVar17._12_4_ = uVar407;
                          auVar17._16_4_ = uVar407;
                          auVar17._20_4_ = uVar407;
                          auVar17._24_4_ = uVar407;
                          auVar17._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar387,auVar15,auVar17);
                          auVar387 = *(undefined1 (*) [32])
                                      ((long)pvVar345 + lVar271 + lVar272 + 0x80);
                          auVar16 = *(undefined1 (*) [32])
                                     ((long)pvVar345 + lVar271 + lVar272 + 0xa0);
                          auVar17 = *(undefined1 (*) [32])
                                     ((long)pvVar345 + lVar271 + lVar272 + 0xc0);
                          auVar13 = *(undefined1 (*) [32])
                                     ((long)pvVar345 + lVar271 + lVar272 + 0xe0);
                          uVar407 = puVar294[4];
                          auVar389._4_4_ = uVar407;
                          auVar389._0_4_ = uVar407;
                          auVar389._8_4_ = uVar407;
                          auVar389._12_4_ = uVar407;
                          auVar389._16_4_ = uVar407;
                          auVar389._20_4_ = uVar407;
                          auVar389._24_4_ = uVar407;
                          auVar389._28_4_ = uVar407;
                          auVar389 = vfmadd231ps_avx512vl(auVar388,auVar387,auVar389);
                          uVar407 = puVar294[5];
                          auVar388._4_4_ = uVar407;
                          auVar388._0_4_ = uVar407;
                          auVar388._8_4_ = uVar407;
                          auVar388._12_4_ = uVar407;
                          auVar388._16_4_ = uVar407;
                          auVar388._20_4_ = uVar407;
                          auVar388._24_4_ = uVar407;
                          auVar388._28_4_ = uVar407;
                          auVar389 = vfmadd231ps_avx512vl(auVar389,auVar16,auVar388);
                          uVar407 = puVar294[6];
                          auVar390._4_4_ = uVar407;
                          auVar390._0_4_ = uVar407;
                          auVar390._8_4_ = uVar407;
                          auVar390._12_4_ = uVar407;
                          auVar390._16_4_ = uVar407;
                          auVar390._20_4_ = uVar407;
                          auVar390._24_4_ = uVar407;
                          auVar390._28_4_ = uVar407;
                          auVar389 = vfmadd231ps_avx512vl(auVar389,auVar17,auVar390);
                          uVar407 = puVar294[7];
                          auVar391._4_4_ = uVar407;
                          auVar391._0_4_ = uVar407;
                          auVar391._8_4_ = uVar407;
                          auVar391._12_4_ = uVar407;
                          auVar391._16_4_ = uVar407;
                          auVar391._20_4_ = uVar407;
                          auVar391._24_4_ = uVar407;
                          auVar391._28_4_ = uVar407;
                          auVar389 = vfmadd231ps_avx512vl(auVar389,auVar13,auVar391);
                          uVar407 = puVar294[8];
                          auVar635._4_4_ = uVar407;
                          auVar635._0_4_ = uVar407;
                          auVar635._8_4_ = uVar407;
                          auVar635._12_4_ = uVar407;
                          auVar635._16_4_ = uVar407;
                          auVar635._20_4_ = uVar407;
                          auVar635._24_4_ = uVar407;
                          auVar635._28_4_ = uVar407;
                          uVar407 = puVar294[9];
                          auVar659._4_4_ = uVar407;
                          auVar659._0_4_ = uVar407;
                          auVar659._8_4_ = uVar407;
                          auVar659._12_4_ = uVar407;
                          auVar659._16_4_ = uVar407;
                          auVar659._20_4_ = uVar407;
                          auVar659._24_4_ = uVar407;
                          auVar659._28_4_ = uVar407;
                          uVar407 = puVar294[10];
                          auVar682._4_4_ = uVar407;
                          auVar682._0_4_ = uVar407;
                          auVar682._8_4_ = uVar407;
                          auVar682._12_4_ = uVar407;
                          auVar682._16_4_ = uVar407;
                          auVar682._20_4_ = uVar407;
                          auVar682._24_4_ = uVar407;
                          auVar682._28_4_ = uVar407;
                          uVar407 = puVar294[0xb];
                          auVar706._4_4_ = uVar407;
                          auVar706._0_4_ = uVar407;
                          auVar706._8_4_ = uVar407;
                          auVar706._12_4_ = uVar407;
                          auVar706._16_4_ = uVar407;
                          auVar706._20_4_ = uVar407;
                          auVar706._24_4_ = uVar407;
                          auVar706._28_4_ = uVar407;
                          uVar407 = puVar294[0xc];
                          auVar726._4_4_ = uVar407;
                          auVar726._0_4_ = uVar407;
                          auVar726._8_4_ = uVar407;
                          auVar726._12_4_ = uVar407;
                          auVar726._16_4_ = uVar407;
                          auVar726._20_4_ = uVar407;
                          auVar726._24_4_ = uVar407;
                          auVar726._28_4_ = uVar407;
                          uVar407 = puVar294[0xd];
                          auVar743._4_4_ = uVar407;
                          auVar743._0_4_ = uVar407;
                          auVar743._8_4_ = uVar407;
                          auVar743._12_4_ = uVar407;
                          auVar743._16_4_ = uVar407;
                          auVar743._20_4_ = uVar407;
                          auVar743._24_4_ = uVar407;
                          auVar743._28_4_ = uVar407;
                          uVar407 = puVar294[0xe];
                          auVar755._4_4_ = uVar407;
                          auVar755._0_4_ = uVar407;
                          auVar755._8_4_ = uVar407;
                          auVar755._12_4_ = uVar407;
                          auVar755._16_4_ = uVar407;
                          auVar755._20_4_ = uVar407;
                          auVar755._24_4_ = uVar407;
                          auVar755._28_4_ = uVar407;
                          auVar388 = vbroadcastss_avx512vl(ZEXT416((uint)puVar294[0xf]));
                          auVar360 = vfmadd213ps_fma(auVar393,auVar635,pauVar306[1]);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar659,auVar376);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar682,auVar14);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar706,auVar15);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar726,auVar387);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar743,auVar16);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar755,auVar17);
                          auVar390 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar388,auVar13);
                          auVar393 = *(undefined1 (*) [32])
                                      ((long)pvVar345 + lVar271 + lVar272 + 0x100);
                          auVar376 = *(undefined1 (*) [32])
                                      ((long)pvVar345 + lVar271 + lVar272 + 0x120);
                          auVar14 = *(undefined1 (*) [32])
                                     ((long)pvVar345 + lVar271 + lVar272 + 0x140);
                          auVar15 = *(undefined1 (*) [32])
                                     ((long)pvVar345 + lVar271 + lVar272 + 0x160);
                          auVar360 = vfmadd231ps_fma(auVar389,auVar393,auVar635);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar376,auVar659);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar14,auVar682);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar15,auVar706);
                          auVar387 = *(undefined1 (*) [32])
                                      ((long)pvVar345 + lVar271 + lVar272 + 0x180);
                          auVar16 = *(undefined1 (*) [32])
                                     ((long)pvVar345 + lVar271 + lVar272 + 0x1a0);
                          auVar17 = *(undefined1 (*) [32])
                                     ((long)pvVar345 + lVar271 + lVar272 + 0x1c0);
                          auVar13 = *(undefined1 (*) [32])
                                     ((long)pvVar345 + lVar271 + lVar272 + 0x1e0);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar387,auVar726);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar16,auVar743);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar17,auVar755);
                          auVar389 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar13,auVar388);
                          uVar407 = puVar294[0x10];
                          auVar392._4_4_ = uVar407;
                          auVar392._0_4_ = uVar407;
                          auVar392._8_4_ = uVar407;
                          auVar392._12_4_ = uVar407;
                          auVar392._16_4_ = uVar407;
                          auVar392._20_4_ = uVar407;
                          auVar392._24_4_ = uVar407;
                          auVar392._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar390,auVar393,auVar392);
                          uVar407 = puVar294[0x11];
                          auVar393._4_4_ = uVar407;
                          auVar393._0_4_ = uVar407;
                          auVar393._8_4_ = uVar407;
                          auVar393._12_4_ = uVar407;
                          auVar393._16_4_ = uVar407;
                          auVar393._20_4_ = uVar407;
                          auVar393._24_4_ = uVar407;
                          auVar393._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar388,auVar376,auVar393);
                          uVar407 = puVar294[0x12];
                          auVar376._4_4_ = uVar407;
                          auVar376._0_4_ = uVar407;
                          auVar376._8_4_ = uVar407;
                          auVar376._12_4_ = uVar407;
                          auVar376._16_4_ = uVar407;
                          auVar376._20_4_ = uVar407;
                          auVar376._24_4_ = uVar407;
                          auVar376._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,auVar14,auVar376);
                          uVar407 = puVar294[0x13];
                          auVar14._4_4_ = uVar407;
                          auVar14._0_4_ = uVar407;
                          auVar14._8_4_ = uVar407;
                          auVar14._12_4_ = uVar407;
                          auVar14._16_4_ = uVar407;
                          auVar14._20_4_ = uVar407;
                          auVar14._24_4_ = uVar407;
                          auVar14._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,auVar15,auVar14);
                          uVar407 = puVar294[0x14];
                          auVar15._4_4_ = uVar407;
                          auVar15._0_4_ = uVar407;
                          auVar15._8_4_ = uVar407;
                          auVar15._12_4_ = uVar407;
                          auVar15._16_4_ = uVar407;
                          auVar15._20_4_ = uVar407;
                          auVar15._24_4_ = uVar407;
                          auVar15._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,auVar387,auVar15);
                          uVar407 = puVar294[0x15];
                          auVar8._4_4_ = uVar407;
                          auVar8._0_4_ = uVar407;
                          auVar8._8_4_ = uVar407;
                          auVar8._12_4_ = uVar407;
                          auVar8._16_4_ = uVar407;
                          auVar8._20_4_ = uVar407;
                          auVar8._24_4_ = uVar407;
                          auVar8._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,auVar16,auVar8);
                          uVar407 = puVar294[0x16];
                          auVar9._4_4_ = uVar407;
                          auVar9._0_4_ = uVar407;
                          auVar9._8_4_ = uVar407;
                          auVar9._12_4_ = uVar407;
                          auVar9._16_4_ = uVar407;
                          auVar9._20_4_ = uVar407;
                          auVar9._24_4_ = uVar407;
                          auVar9._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,auVar17,auVar9);
                          uVar407 = puVar294[0x17];
                          auVar10._4_4_ = uVar407;
                          auVar10._0_4_ = uVar407;
                          auVar10._8_4_ = uVar407;
                          auVar10._12_4_ = uVar407;
                          auVar10._16_4_ = uVar407;
                          auVar10._20_4_ = uVar407;
                          auVar10._24_4_ = uVar407;
                          auVar10._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar393,auVar13,auVar10);
                          auVar393 = *(undefined1 (*) [32])
                                      ((long)pvVar345 + lVar271 + lVar272 + 0x200);
                          auVar376 = *(undefined1 (*) [32])
                                      ((long)pvVar345 + lVar271 + lVar272 + 0x220);
                          auVar14 = *(undefined1 (*) [32])
                                     ((long)pvVar345 + lVar271 + lVar272 + 0x240);
                          auVar15 = *(undefined1 (*) [32])
                                     ((long)pvVar345 + lVar271 + lVar272 + 0x260);
                          uVar407 = *puVar335;
                          auVar13._4_4_ = uVar407;
                          auVar13._0_4_ = uVar407;
                          auVar13._8_4_ = uVar407;
                          auVar13._12_4_ = uVar407;
                          auVar13._16_4_ = uVar407;
                          auVar13._20_4_ = uVar407;
                          auVar13._24_4_ = uVar407;
                          auVar13._28_4_ = uVar407;
                          auVar387 = vfmadd231ps_avx512vl(auVar389,auVar393,auVar13);
                          uVar407 = puVar335[1];
                          auVar11._4_4_ = uVar407;
                          auVar11._0_4_ = uVar407;
                          auVar11._8_4_ = uVar407;
                          auVar11._12_4_ = uVar407;
                          auVar11._16_4_ = uVar407;
                          auVar11._20_4_ = uVar407;
                          auVar11._24_4_ = uVar407;
                          auVar11._28_4_ = uVar407;
                          auVar387 = vfmadd231ps_avx512vl(auVar387,auVar376,auVar11);
                          uVar407 = puVar335[2];
                          auVar12._4_4_ = uVar407;
                          auVar12._0_4_ = uVar407;
                          auVar12._8_4_ = uVar407;
                          auVar12._12_4_ = uVar407;
                          auVar12._16_4_ = uVar407;
                          auVar12._20_4_ = uVar407;
                          auVar12._24_4_ = uVar407;
                          auVar12._28_4_ = uVar407;
                          auVar387 = vfmadd231ps_avx512vl(auVar387,auVar14,auVar12);
                          uVar407 = puVar335[3];
                          auVar377._4_4_ = uVar407;
                          auVar377._0_4_ = uVar407;
                          auVar377._8_4_ = uVar407;
                          auVar377._12_4_ = uVar407;
                          auVar377._16_4_ = uVar407;
                          auVar377._20_4_ = uVar407;
                          auVar377._24_4_ = uVar407;
                          auVar377._28_4_ = uVar407;
                          auVar389 = vfmadd231ps_avx512vl(auVar387,auVar15,auVar377);
                          auVar387 = *(undefined1 (*) [32])
                                      ((long)pvVar345 + lVar271 + lVar272 + 0x280);
                          auVar16 = *(undefined1 (*) [32])
                                     ((long)pvVar345 + lVar271 + lVar272 + 0x2a0);
                          auVar17 = *(undefined1 (*) [32])
                                     ((long)pvVar345 + lVar271 + lVar272 + 0x2c0);
                          auVar13 = *(undefined1 (*) [32])
                                     ((long)pvVar345 + lVar271 + lVar272 + 0x2e0);
                          uVar407 = puVar335[4];
                          auVar378._4_4_ = uVar407;
                          auVar378._0_4_ = uVar407;
                          auVar378._8_4_ = uVar407;
                          auVar378._12_4_ = uVar407;
                          auVar378._16_4_ = uVar407;
                          auVar378._20_4_ = uVar407;
                          auVar378._24_4_ = uVar407;
                          auVar378._28_4_ = uVar407;
                          auVar389 = vfmadd231ps_avx512vl(auVar389,auVar387,auVar378);
                          uVar407 = puVar335[5];
                          auVar379._4_4_ = uVar407;
                          auVar379._0_4_ = uVar407;
                          auVar379._8_4_ = uVar407;
                          auVar379._12_4_ = uVar407;
                          auVar379._16_4_ = uVar407;
                          auVar379._20_4_ = uVar407;
                          auVar379._24_4_ = uVar407;
                          auVar379._28_4_ = uVar407;
                          auVar389 = vfmadd231ps_avx512vl(auVar389,auVar16,auVar379);
                          uVar407 = puVar335[6];
                          auVar380._4_4_ = uVar407;
                          auVar380._0_4_ = uVar407;
                          auVar380._8_4_ = uVar407;
                          auVar380._12_4_ = uVar407;
                          auVar380._16_4_ = uVar407;
                          auVar380._20_4_ = uVar407;
                          auVar380._24_4_ = uVar407;
                          auVar380._28_4_ = uVar407;
                          auVar389 = vfmadd231ps_avx512vl(auVar389,auVar17,auVar380);
                          uVar407 = puVar335[7];
                          auVar381._4_4_ = uVar407;
                          auVar381._0_4_ = uVar407;
                          auVar381._8_4_ = uVar407;
                          auVar381._12_4_ = uVar407;
                          auVar381._16_4_ = uVar407;
                          auVar381._20_4_ = uVar407;
                          auVar381._24_4_ = uVar407;
                          auVar381._28_4_ = uVar407;
                          auVar389 = vfmadd231ps_avx512vl(auVar389,auVar13,auVar381);
                          uVar407 = puVar335[8];
                          auVar660._4_4_ = uVar407;
                          auVar660._0_4_ = uVar407;
                          auVar660._8_4_ = uVar407;
                          auVar660._12_4_ = uVar407;
                          auVar660._16_4_ = uVar407;
                          auVar660._20_4_ = uVar407;
                          auVar660._24_4_ = uVar407;
                          auVar660._28_4_ = uVar407;
                          uVar407 = puVar335[9];
                          auVar683._4_4_ = uVar407;
                          auVar683._0_4_ = uVar407;
                          auVar683._8_4_ = uVar407;
                          auVar683._12_4_ = uVar407;
                          auVar683._16_4_ = uVar407;
                          auVar683._20_4_ = uVar407;
                          auVar683._24_4_ = uVar407;
                          auVar683._28_4_ = uVar407;
                          uVar407 = puVar335[10];
                          auVar707._4_4_ = uVar407;
                          auVar707._0_4_ = uVar407;
                          auVar707._8_4_ = uVar407;
                          auVar707._12_4_ = uVar407;
                          auVar707._16_4_ = uVar407;
                          auVar707._20_4_ = uVar407;
                          auVar707._24_4_ = uVar407;
                          auVar707._28_4_ = uVar407;
                          uVar407 = puVar335[0xb];
                          auVar727._4_4_ = uVar407;
                          auVar727._0_4_ = uVar407;
                          auVar727._8_4_ = uVar407;
                          auVar727._12_4_ = uVar407;
                          auVar727._16_4_ = uVar407;
                          auVar727._20_4_ = uVar407;
                          auVar727._24_4_ = uVar407;
                          auVar727._28_4_ = uVar407;
                          uVar407 = puVar335[0xc];
                          auVar744._4_4_ = uVar407;
                          auVar744._0_4_ = uVar407;
                          auVar744._8_4_ = uVar407;
                          auVar744._12_4_ = uVar407;
                          auVar744._16_4_ = uVar407;
                          auVar744._20_4_ = uVar407;
                          auVar744._24_4_ = uVar407;
                          auVar744._28_4_ = uVar407;
                          uVar407 = puVar335[0xd];
                          auVar756._4_4_ = uVar407;
                          auVar756._0_4_ = uVar407;
                          auVar756._8_4_ = uVar407;
                          auVar756._12_4_ = uVar407;
                          auVar756._16_4_ = uVar407;
                          auVar756._20_4_ = uVar407;
                          auVar756._24_4_ = uVar407;
                          auVar756._28_4_ = uVar407;
                          auVar390 = vbroadcastss_avx512vl(ZEXT416((uint)puVar335[0xe]));
                          puVar294 = puVar294 + 0x10;
                          auVar391 = vbroadcastss_avx512vl(ZEXT416((uint)puVar335[0xf]));
                          auVar360 = vfmadd231ps_fma(auVar388,auVar660,auVar393);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar683,auVar376);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar707,auVar14);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar727,auVar15);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar744,auVar387);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar756,auVar16);
                          auVar393 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar390,auVar17);
                          auVar388 = vfmadd231ps_avx512vl(auVar393,auVar391,auVar13);
                          auVar393 = *(undefined1 (*) [32])
                                      ((long)pvVar345 + lVar271 + lVar272 + 0x300);
                          auVar376 = *(undefined1 (*) [32])
                                      ((long)pvVar345 + lVar271 + lVar272 + 800);
                          auVar14 = *(undefined1 (*) [32])
                                     ((long)pvVar345 + lVar271 + lVar272 + 0x340);
                          auVar15 = *(undefined1 (*) [32])
                                     ((long)pvVar345 + lVar271 + lVar272 + 0x360);
                          auVar360 = vfmadd231ps_fma(auVar389,auVar393,auVar660);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar376,auVar683);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar14,auVar707);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar15,auVar727);
                          auVar387 = *(undefined1 (*) [32])
                                      ((long)pvVar345 + lVar271 + lVar272 + 0x380);
                          auVar16 = *(undefined1 (*) [32])
                                     ((long)pvVar345 + lVar271 + lVar272 + 0x3a0);
                          auVar17 = *(undefined1 (*) [32])
                                     ((long)pvVar345 + lVar271 + lVar272 + 0x3c0);
                          auVar13 = *(undefined1 (*) [32])
                                     ((long)pvVar345 + lVar271 + lVar272 + 0x3e0);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar387,auVar744);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar16,auVar756);
                          auVar389 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar17,auVar390);
                          uVar407 = puVar335[0x10];
                          auVar382._4_4_ = uVar407;
                          auVar382._0_4_ = uVar407;
                          auVar382._8_4_ = uVar407;
                          auVar382._12_4_ = uVar407;
                          auVar382._16_4_ = uVar407;
                          auVar382._20_4_ = uVar407;
                          auVar382._24_4_ = uVar407;
                          auVar382._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar388,auVar393,auVar382);
                          uVar407 = puVar335[0x11];
                          auVar383._4_4_ = uVar407;
                          auVar383._0_4_ = uVar407;
                          auVar383._8_4_ = uVar407;
                          auVar383._12_4_ = uVar407;
                          auVar383._16_4_ = uVar407;
                          auVar383._20_4_ = uVar407;
                          auVar383._24_4_ = uVar407;
                          auVar383._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,auVar376,auVar383);
                          uVar407 = puVar335[0x12];
                          auVar384._4_4_ = uVar407;
                          auVar384._0_4_ = uVar407;
                          auVar384._8_4_ = uVar407;
                          auVar384._12_4_ = uVar407;
                          auVar384._16_4_ = uVar407;
                          auVar384._20_4_ = uVar407;
                          auVar384._24_4_ = uVar407;
                          auVar384._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,auVar14,auVar384);
                          uVar407 = puVar335[0x13];
                          auVar385._4_4_ = uVar407;
                          auVar385._0_4_ = uVar407;
                          auVar385._8_4_ = uVar407;
                          auVar385._12_4_ = uVar407;
                          auVar385._16_4_ = uVar407;
                          auVar385._20_4_ = uVar407;
                          auVar385._24_4_ = uVar407;
                          auVar385._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,auVar15,auVar385);
                          uVar407 = puVar335[0x14];
                          auVar386._4_4_ = uVar407;
                          auVar386._0_4_ = uVar407;
                          auVar386._8_4_ = uVar407;
                          auVar386._12_4_ = uVar407;
                          auVar386._16_4_ = uVar407;
                          auVar386._20_4_ = uVar407;
                          auVar386._24_4_ = uVar407;
                          auVar386._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,auVar387,auVar386);
                          uVar407 = puVar335[0x15];
                          auVar134._4_4_ = uVar407;
                          auVar134._0_4_ = uVar407;
                          auVar134._8_4_ = uVar407;
                          auVar134._12_4_ = uVar407;
                          auVar134._16_4_ = uVar407;
                          auVar134._20_4_ = uVar407;
                          auVar134._24_4_ = uVar407;
                          auVar134._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,auVar16,auVar134);
                          uVar407 = puVar335[0x16];
                          auVar135._4_4_ = uVar407;
                          auVar135._0_4_ = uVar407;
                          auVar135._8_4_ = uVar407;
                          auVar135._12_4_ = uVar407;
                          auVar135._16_4_ = uVar407;
                          auVar135._20_4_ = uVar407;
                          auVar135._24_4_ = uVar407;
                          auVar135._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,auVar17,auVar135);
                          auVar376 = vfmadd231ps_avx512vl(auVar389,auVar13,auVar391);
                          uVar407 = puVar335[0x17];
                          auVar136._4_4_ = uVar407;
                          auVar136._0_4_ = uVar407;
                          auVar136._8_4_ = uVar407;
                          auVar136._12_4_ = uVar407;
                          auVar136._16_4_ = uVar407;
                          auVar136._20_4_ = uVar407;
                          auVar136._24_4_ = uVar407;
                          auVar136._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl(auVar393,auVar13,auVar136);
                          puVar335 = puVar335 + 0x10;
                          *pauVar306 = auVar376;
                          pauVar306[1] = auVar393;
                          pauVar306 = pauVar306 + 2;
                          puVar293 = puVar293 + 0x10;
                          puVar341 = puVar341 + 0x10;
                        }
                        for (; iVar342 < iVar260; iVar342 = iVar342 + 1) {
                          uVar407 = puVar293[-8];
                          auVar417._4_4_ = uVar407;
                          auVar417._0_4_ = uVar407;
                          auVar417._8_4_ = uVar407;
                          auVar417._12_4_ = uVar407;
                          auVar417._16_4_ = uVar407;
                          auVar417._20_4_ = uVar407;
                          auVar417._24_4_ = uVar407;
                          auVar417._28_4_ = uVar407;
                          auVar360 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                                      ((long)pvVar345 + lVar271 + lVar272),auVar417,
                                                     *pauVar306);
                          uVar407 = puVar293[-7];
                          auVar137._4_4_ = uVar407;
                          auVar137._0_4_ = uVar407;
                          auVar137._8_4_ = uVar407;
                          auVar137._12_4_ = uVar407;
                          auVar137._16_4_ = uVar407;
                          auVar137._20_4_ = uVar407;
                          auVar137._24_4_ = uVar407;
                          auVar137._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl
                                               (ZEXT1632(auVar360),
                                                *(undefined1 (*) [32])
                                                 ((long)pvVar345 + lVar271 + lVar272 + 0x20),
                                                auVar137);
                          uVar407 = puVar293[-6];
                          auVar138._4_4_ = uVar407;
                          auVar138._0_4_ = uVar407;
                          auVar138._8_4_ = uVar407;
                          auVar138._12_4_ = uVar407;
                          auVar138._16_4_ = uVar407;
                          auVar138._20_4_ = uVar407;
                          auVar138._24_4_ = uVar407;
                          auVar138._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl
                                               (auVar393,*(undefined1 (*) [32])
                                                          ((long)pvVar345 + lVar271 + lVar272 + 0x40
                                                          ),auVar138);
                          uVar407 = puVar293[-5];
                          auVar139._4_4_ = uVar407;
                          auVar139._0_4_ = uVar407;
                          auVar139._8_4_ = uVar407;
                          auVar139._12_4_ = uVar407;
                          auVar139._16_4_ = uVar407;
                          auVar139._20_4_ = uVar407;
                          auVar139._24_4_ = uVar407;
                          auVar139._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl
                                               (auVar393,*(undefined1 (*) [32])
                                                          ((long)pvVar345 + lVar271 + lVar272 + 0x60
                                                          ),auVar139);
                          uVar407 = puVar293[-4];
                          auVar140._4_4_ = uVar407;
                          auVar140._0_4_ = uVar407;
                          auVar140._8_4_ = uVar407;
                          auVar140._12_4_ = uVar407;
                          auVar140._16_4_ = uVar407;
                          auVar140._20_4_ = uVar407;
                          auVar140._24_4_ = uVar407;
                          auVar140._28_4_ = uVar407;
                          auVar393 = vfmadd132ps_avx512vl
                                               (*(undefined1 (*) [32])
                                                 ((long)pvVar345 + lVar271 + lVar272 + 0x80),
                                                auVar393,auVar140);
                          uVar407 = puVar293[-3];
                          auVar141._4_4_ = uVar407;
                          auVar141._0_4_ = uVar407;
                          auVar141._8_4_ = uVar407;
                          auVar141._12_4_ = uVar407;
                          auVar141._16_4_ = uVar407;
                          auVar141._20_4_ = uVar407;
                          auVar141._24_4_ = uVar407;
                          auVar141._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl
                                               (auVar393,*(undefined1 (*) [32])
                                                          ((long)pvVar345 + lVar271 + lVar272 + 0xa0
                                                          ),auVar141);
                          uVar407 = puVar293[-2];
                          auVar142._4_4_ = uVar407;
                          auVar142._0_4_ = uVar407;
                          auVar142._8_4_ = uVar407;
                          auVar142._12_4_ = uVar407;
                          auVar142._16_4_ = uVar407;
                          auVar142._20_4_ = uVar407;
                          auVar142._24_4_ = uVar407;
                          auVar142._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl
                                               (auVar393,*(undefined1 (*) [32])
                                                          ((long)pvVar345 + lVar271 + lVar272 + 0xc0
                                                          ),auVar142);
                          uVar407 = puVar293[-1];
                          auVar143._4_4_ = uVar407;
                          auVar143._0_4_ = uVar407;
                          auVar143._8_4_ = uVar407;
                          auVar143._12_4_ = uVar407;
                          auVar143._16_4_ = uVar407;
                          auVar143._20_4_ = uVar407;
                          auVar143._24_4_ = uVar407;
                          auVar143._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl
                                               (auVar393,*(undefined1 (*) [32])
                                                          ((long)pvVar345 + lVar271 + lVar272 + 0xe0
                                                          ),auVar143);
                          uVar407 = *puVar293;
                          auVar144._4_4_ = uVar407;
                          auVar144._0_4_ = uVar407;
                          auVar144._8_4_ = uVar407;
                          auVar144._12_4_ = uVar407;
                          auVar144._16_4_ = uVar407;
                          auVar144._20_4_ = uVar407;
                          auVar144._24_4_ = uVar407;
                          auVar144._28_4_ = uVar407;
                          auVar393 = vfmadd132ps_avx512vl
                                               (*(undefined1 (*) [32])
                                                 ((long)pvVar345 + lVar271 + lVar272 + 0x100),
                                                auVar393,auVar144);
                          uVar407 = puVar293[1];
                          auVar145._4_4_ = uVar407;
                          auVar145._0_4_ = uVar407;
                          auVar145._8_4_ = uVar407;
                          auVar145._12_4_ = uVar407;
                          auVar145._16_4_ = uVar407;
                          auVar145._20_4_ = uVar407;
                          auVar145._24_4_ = uVar407;
                          auVar145._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl
                                               (auVar393,*(undefined1 (*) [32])
                                                          ((long)pvVar345 +
                                                          lVar271 + lVar272 + 0x120),auVar145);
                          uVar407 = puVar293[2];
                          auVar146._4_4_ = uVar407;
                          auVar146._0_4_ = uVar407;
                          auVar146._8_4_ = uVar407;
                          auVar146._12_4_ = uVar407;
                          auVar146._16_4_ = uVar407;
                          auVar146._20_4_ = uVar407;
                          auVar146._24_4_ = uVar407;
                          auVar146._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl
                                               (auVar393,*(undefined1 (*) [32])
                                                          ((long)pvVar345 +
                                                          lVar271 + lVar272 + 0x140),auVar146);
                          uVar407 = puVar293[3];
                          auVar147._4_4_ = uVar407;
                          auVar147._0_4_ = uVar407;
                          auVar147._8_4_ = uVar407;
                          auVar147._12_4_ = uVar407;
                          auVar147._16_4_ = uVar407;
                          auVar147._20_4_ = uVar407;
                          auVar147._24_4_ = uVar407;
                          auVar147._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl
                                               (auVar393,*(undefined1 (*) [32])
                                                          ((long)pvVar345 +
                                                          lVar271 + lVar272 + 0x160),auVar147);
                          uVar407 = puVar293[4];
                          auVar148._4_4_ = uVar407;
                          auVar148._0_4_ = uVar407;
                          auVar148._8_4_ = uVar407;
                          auVar148._12_4_ = uVar407;
                          auVar148._16_4_ = uVar407;
                          auVar148._20_4_ = uVar407;
                          auVar148._24_4_ = uVar407;
                          auVar148._28_4_ = uVar407;
                          auVar393 = vfmadd132ps_avx512vl
                                               (*(undefined1 (*) [32])
                                                 ((long)pvVar345 + lVar271 + lVar272 + 0x180),
                                                auVar393,auVar148);
                          uVar407 = puVar293[5];
                          auVar149._4_4_ = uVar407;
                          auVar149._0_4_ = uVar407;
                          auVar149._8_4_ = uVar407;
                          auVar149._12_4_ = uVar407;
                          auVar149._16_4_ = uVar407;
                          auVar149._20_4_ = uVar407;
                          auVar149._24_4_ = uVar407;
                          auVar149._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl
                                               (auVar393,*(undefined1 (*) [32])
                                                          ((long)pvVar345 +
                                                          lVar271 + lVar272 + 0x1a0),auVar149);
                          uVar407 = puVar293[6];
                          auVar150._4_4_ = uVar407;
                          auVar150._0_4_ = uVar407;
                          auVar150._8_4_ = uVar407;
                          auVar150._12_4_ = uVar407;
                          auVar150._16_4_ = uVar407;
                          auVar150._20_4_ = uVar407;
                          auVar150._24_4_ = uVar407;
                          auVar150._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl
                                               (auVar393,*(undefined1 (*) [32])
                                                          ((long)pvVar345 +
                                                          lVar271 + lVar272 + 0x1c0),auVar150);
                          uVar407 = puVar293[7];
                          auVar151._4_4_ = uVar407;
                          auVar151._0_4_ = uVar407;
                          auVar151._8_4_ = uVar407;
                          auVar151._12_4_ = uVar407;
                          auVar151._16_4_ = uVar407;
                          auVar151._20_4_ = uVar407;
                          auVar151._24_4_ = uVar407;
                          auVar151._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl
                                               (auVar393,*(undefined1 (*) [32])
                                                          ((long)pvVar345 +
                                                          lVar271 + lVar272 + 0x1e0),auVar151);
                          uVar407 = puVar341[-8];
                          auVar152._4_4_ = uVar407;
                          auVar152._0_4_ = uVar407;
                          auVar152._8_4_ = uVar407;
                          auVar152._12_4_ = uVar407;
                          auVar152._16_4_ = uVar407;
                          auVar152._20_4_ = uVar407;
                          auVar152._24_4_ = uVar407;
                          auVar152._28_4_ = uVar407;
                          auVar393 = vfmadd132ps_avx512vl
                                               (*(undefined1 (*) [32])
                                                 ((long)pvVar345 + lVar271 + lVar272 + 0x200),
                                                auVar393,auVar152);
                          uVar407 = puVar341[-7];
                          auVar153._4_4_ = uVar407;
                          auVar153._0_4_ = uVar407;
                          auVar153._8_4_ = uVar407;
                          auVar153._12_4_ = uVar407;
                          auVar153._16_4_ = uVar407;
                          auVar153._20_4_ = uVar407;
                          auVar153._24_4_ = uVar407;
                          auVar153._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl
                                               (auVar393,*(undefined1 (*) [32])
                                                          ((long)pvVar345 +
                                                          lVar271 + lVar272 + 0x220),auVar153);
                          uVar407 = puVar341[-6];
                          auVar154._4_4_ = uVar407;
                          auVar154._0_4_ = uVar407;
                          auVar154._8_4_ = uVar407;
                          auVar154._12_4_ = uVar407;
                          auVar154._16_4_ = uVar407;
                          auVar154._20_4_ = uVar407;
                          auVar154._24_4_ = uVar407;
                          auVar154._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl
                                               (auVar393,*(undefined1 (*) [32])
                                                          ((long)pvVar345 +
                                                          lVar271 + lVar272 + 0x240),auVar154);
                          uVar407 = puVar341[-5];
                          auVar155._4_4_ = uVar407;
                          auVar155._0_4_ = uVar407;
                          auVar155._8_4_ = uVar407;
                          auVar155._12_4_ = uVar407;
                          auVar155._16_4_ = uVar407;
                          auVar155._20_4_ = uVar407;
                          auVar155._24_4_ = uVar407;
                          auVar155._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl
                                               (auVar393,*(undefined1 (*) [32])
                                                          ((long)pvVar345 +
                                                          lVar271 + lVar272 + 0x260),auVar155);
                          uVar407 = puVar341[-4];
                          auVar156._4_4_ = uVar407;
                          auVar156._0_4_ = uVar407;
                          auVar156._8_4_ = uVar407;
                          auVar156._12_4_ = uVar407;
                          auVar156._16_4_ = uVar407;
                          auVar156._20_4_ = uVar407;
                          auVar156._24_4_ = uVar407;
                          auVar156._28_4_ = uVar407;
                          auVar393 = vfmadd132ps_avx512vl
                                               (*(undefined1 (*) [32])
                                                 ((long)pvVar345 + lVar271 + lVar272 + 0x280),
                                                auVar393,auVar156);
                          uVar407 = puVar341[-3];
                          auVar157._4_4_ = uVar407;
                          auVar157._0_4_ = uVar407;
                          auVar157._8_4_ = uVar407;
                          auVar157._12_4_ = uVar407;
                          auVar157._16_4_ = uVar407;
                          auVar157._20_4_ = uVar407;
                          auVar157._24_4_ = uVar407;
                          auVar157._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl
                                               (auVar393,*(undefined1 (*) [32])
                                                          ((long)pvVar345 +
                                                          lVar271 + lVar272 + 0x2a0),auVar157);
                          uVar407 = puVar341[-2];
                          auVar158._4_4_ = uVar407;
                          auVar158._0_4_ = uVar407;
                          auVar158._8_4_ = uVar407;
                          auVar158._12_4_ = uVar407;
                          auVar158._16_4_ = uVar407;
                          auVar158._20_4_ = uVar407;
                          auVar158._24_4_ = uVar407;
                          auVar158._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl
                                               (auVar393,*(undefined1 (*) [32])
                                                          ((long)pvVar345 +
                                                          lVar271 + lVar272 + 0x2c0),auVar158);
                          uVar407 = puVar341[-1];
                          auVar159._4_4_ = uVar407;
                          auVar159._0_4_ = uVar407;
                          auVar159._8_4_ = uVar407;
                          auVar159._12_4_ = uVar407;
                          auVar159._16_4_ = uVar407;
                          auVar159._20_4_ = uVar407;
                          auVar159._24_4_ = uVar407;
                          auVar159._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl
                                               (auVar393,*(undefined1 (*) [32])
                                                          ((long)pvVar345 +
                                                          lVar271 + lVar272 + 0x2e0),auVar159);
                          uVar407 = *puVar341;
                          auVar160._4_4_ = uVar407;
                          auVar160._0_4_ = uVar407;
                          auVar160._8_4_ = uVar407;
                          auVar160._12_4_ = uVar407;
                          auVar160._16_4_ = uVar407;
                          auVar160._20_4_ = uVar407;
                          auVar160._24_4_ = uVar407;
                          auVar160._28_4_ = uVar407;
                          auVar393 = vfmadd132ps_avx512vl
                                               (*(undefined1 (*) [32])
                                                 ((long)pvVar345 + lVar271 + lVar272 + 0x300),
                                                auVar393,auVar160);
                          uVar407 = puVar341[1];
                          auVar161._4_4_ = uVar407;
                          auVar161._0_4_ = uVar407;
                          auVar161._8_4_ = uVar407;
                          auVar161._12_4_ = uVar407;
                          auVar161._16_4_ = uVar407;
                          auVar161._20_4_ = uVar407;
                          auVar161._24_4_ = uVar407;
                          auVar161._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl
                                               (auVar393,*(undefined1 (*) [32])
                                                          ((long)pvVar345 + lVar271 + lVar272 + 800)
                                                ,auVar161);
                          uVar407 = puVar341[2];
                          auVar162._4_4_ = uVar407;
                          auVar162._0_4_ = uVar407;
                          auVar162._8_4_ = uVar407;
                          auVar162._12_4_ = uVar407;
                          auVar162._16_4_ = uVar407;
                          auVar162._20_4_ = uVar407;
                          auVar162._24_4_ = uVar407;
                          auVar162._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl
                                               (auVar393,*(undefined1 (*) [32])
                                                          ((long)pvVar345 +
                                                          lVar271 + lVar272 + 0x340),auVar162);
                          uVar407 = puVar341[3];
                          auVar163._4_4_ = uVar407;
                          auVar163._0_4_ = uVar407;
                          auVar163._8_4_ = uVar407;
                          auVar163._12_4_ = uVar407;
                          auVar163._16_4_ = uVar407;
                          auVar163._20_4_ = uVar407;
                          auVar163._24_4_ = uVar407;
                          auVar163._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl
                                               (auVar393,*(undefined1 (*) [32])
                                                          ((long)pvVar345 +
                                                          lVar271 + lVar272 + 0x360),auVar163);
                          uVar407 = puVar341[4];
                          auVar164._4_4_ = uVar407;
                          auVar164._0_4_ = uVar407;
                          auVar164._8_4_ = uVar407;
                          auVar164._12_4_ = uVar407;
                          auVar164._16_4_ = uVar407;
                          auVar164._20_4_ = uVar407;
                          auVar164._24_4_ = uVar407;
                          auVar164._28_4_ = uVar407;
                          auVar393 = vfmadd132ps_avx512vl
                                               (*(undefined1 (*) [32])
                                                 ((long)pvVar345 + lVar271 + lVar272 + 0x380),
                                                auVar393,auVar164);
                          uVar407 = puVar341[5];
                          auVar165._4_4_ = uVar407;
                          auVar165._0_4_ = uVar407;
                          auVar165._8_4_ = uVar407;
                          auVar165._12_4_ = uVar407;
                          auVar165._16_4_ = uVar407;
                          auVar165._20_4_ = uVar407;
                          auVar165._24_4_ = uVar407;
                          auVar165._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl
                                               (auVar393,*(undefined1 (*) [32])
                                                          ((long)pvVar345 +
                                                          lVar271 + lVar272 + 0x3a0),auVar165);
                          uVar407 = puVar341[6];
                          auVar166._4_4_ = uVar407;
                          auVar166._0_4_ = uVar407;
                          auVar166._8_4_ = uVar407;
                          auVar166._12_4_ = uVar407;
                          auVar166._16_4_ = uVar407;
                          auVar166._20_4_ = uVar407;
                          auVar166._24_4_ = uVar407;
                          auVar166._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl
                                               (auVar393,*(undefined1 (*) [32])
                                                          ((long)pvVar345 +
                                                          lVar271 + lVar272 + 0x3c0),auVar166);
                          uVar407 = puVar341[7];
                          auVar167._4_4_ = uVar407;
                          auVar167._0_4_ = uVar407;
                          auVar167._8_4_ = uVar407;
                          auVar167._12_4_ = uVar407;
                          auVar167._16_4_ = uVar407;
                          auVar167._20_4_ = uVar407;
                          auVar167._24_4_ = uVar407;
                          auVar167._28_4_ = uVar407;
                          auVar393 = vfmadd231ps_avx512vl
                                               (auVar393,*(undefined1 (*) [32])
                                                          ((long)pvVar345 +
                                                          lVar271 + lVar272 + 0x3e0),auVar167);
                          *pauVar306 = auVar393;
                          pauVar306 = pauVar306 + 1;
                          puVar293 = puVar293 + 8;
                          puVar341 = puVar341 + 8;
                        }
                        puVar335 = puVar341;
                      }
                    }
                  }
                }
                goto LAB_00184042;
              }
              bVar349 = iVar260 == 1;
              if ((bVar349) && (uVar330 == 8)) {
                bVar258 = uVar262 != 0 || uVar289 != 0;
                if ((uVar338 != 1 || stride_h != 1) || ((bVar258 || uVar254 != 0) || uVar255 != 0))
                {
                  bVar349 = true;
                  if (((bVar258 || uVar254 != 0) || uVar255 != 0) || (stride_h != 2 || uVar338 != 2)
                     ) goto LAB_001800c6;
                  iVar260 = top_blob->w;
                  iVar342 = top_blob->h;
                  iVar261 = top_blob->c;
                  pvVar348 = (this->super_Convolution).bias_data.data;
                  if (iVar342 < 1) {
                    iVar342 = 0;
                  }
                  uVar278 = (ulong)(uint)local_d70.c;
                  if (local_d70.c < 1) {
                    uVar278 = 0;
                  }
                  uVar291 = iVar261 >> 1;
                  if (iVar261 >> 1 < 1) {
                    uVar291 = 0;
                  }
                  lVar271 = (long)((local_d70.w - iVar260) * 2) * 4;
                  for (uVar281 = 0; uVar281 != uVar291; uVar281 = uVar281 + 1) {
                    uVar317 = (long)top_blob->h * (long)top_blob->w;
                    uVar318 = top_blob->elemsize;
                    uVar268 = (uVar318 * uVar317 + 0xf & 0xfffffffffffffff0) / uVar318;
                    if (top_blob->dims == 4) {
                      uVar268 = uVar317;
                    }
                    lVar272 = uVar281 * 2 + 1;
                    if (pvVar348 == (void *)0x0) {
                      auVar393 = ZEXT1632(ZEXT816(0) << 0x40);
                      uVar408 = 0;
                      uVar418 = 0;
                      uVar419 = 0;
                      uVar420 = 0;
                    }
                    else {
                      auVar393 = *(undefined1 (*) [32])((long)pvVar348 + uVar281 * 0x40);
                      puVar310 = (undefined8 *)((long)pvVar348 + lVar272 * 0x20);
                      uVar408 = *puVar310;
                      uVar418 = puVar310[1];
                      uVar419 = puVar310[2];
                      uVar420 = puVar310[3];
                    }
                    lVar273 = uVar318 * top_blob->cstep;
                    pauVar332 = (undefined1 (*) [32])(lVar273 * uVar281 * 2 + (long)top_blob->data);
                    pauVar325 = (undefined1 (*) [32])(lVar273 * lVar272 + (long)top_blob->data);
                    iVar343 = (int)uVar268 * top_blob->d;
                    pauVar306 = pauVar332;
                    iVar328 = iVar343;
                    if (iVar343 < 1) {
                      iVar343 = 0;
                      iVar328 = iVar343;
                    }
                    while (bVar349 = iVar343 != 0, iVar343 = iVar343 + -1, pauVar322 = pauVar325,
                          bVar349) {
                      *pauVar306 = auVar393;
                      pauVar306 = pauVar306 + 1;
                    }
                    while (bVar349 = iVar328 != 0, iVar328 = iVar328 + -1, bVar349) {
                      *(undefined8 *)*pauVar322 = uVar408;
                      *(undefined8 *)(*pauVar322 + 8) = uVar418;
                      *(undefined8 *)(*pauVar322 + 0x10) = uVar419;
                      *(undefined8 *)(*pauVar322 + 0x18) = uVar420;
                      pauVar322 = pauVar322 + 1;
                    }
                    pvVar345 = (this->weight_data_tm).data;
                    lVar273 = (this->weight_data_tm).elemsize * (this->weight_data_tm).cstep;
                    pauVar322 = (undefined1 (*) [32])(uVar281 * 2 * lVar273 + (long)pvVar345);
                    pauVar306 = (undefined1 (*) [32])(lVar273 * lVar272 + (long)pvVar345);
                    for (uVar318 = 0; uVar318 != uVar278; uVar318 = uVar318 + 1) {
                      pvVar345 = (void *)(local_d70.cstep * uVar318 * local_d70.elemsize +
                                         (long)local_d70.data);
                      auVar393 = *pauVar322;
                      auVar376 = pauVar322[1];
                      auVar14 = pauVar322[2];
                      auVar15 = pauVar322[3];
                      auVar387 = pauVar322[4];
                      auVar16 = pauVar322[5];
                      auVar17 = pauVar322[6];
                      auVar13 = pauVar322[7];
                      auVar389 = pauVar322[8];
                      auVar388 = *pauVar306;
                      auVar390 = pauVar306[1];
                      auVar391 = pauVar306[2];
                      auVar392 = pauVar306[3];
                      auVar8 = pauVar306[4];
                      auVar9 = pauVar306[5];
                      auVar10 = pauVar306[6];
                      auVar11 = pauVar306[7];
                      auVar12 = pauVar306[8];
                      pauVar269 = pauVar325;
                      pauVar298 = pauVar332;
                      pvVar347 = (void *)((long)pvVar345 + (long)local_d70.w * local_d70.elemsize);
                      pvVar313 = (void *)((long)pvVar345 +
                                         (long)local_d70.w * local_d70.elemsize * 2);
                      for (iVar328 = 0; iVar328 != iVar342; iVar328 = iVar328 + 1) {
                        pvVar312 = (void *)((long)pvVar345 + lVar271);
                        pvVar344 = (void *)(lVar271 + (long)pvVar347);
                        pvVar305 = (void *)(lVar271 + (long)pvVar313);
                        lVar272 = 0;
                        pauVar323 = pauVar298;
                        pauVar329 = pauVar269;
                        for (iVar343 = 0; iVar343 + 7 < iVar260; iVar343 = iVar343 + 8) {
                          auVar377 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272)));
                          auVar378 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 4)));
                          auVar379 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 8)));
                          auVar380 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272)));
                          auVar381 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 4)));
                          auVar382 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 8)));
                          auVar383 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272)));
                          auVar384 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 4)));
                          auVar385 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 8)));
                          auVar386 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [32])(*pauVar298 + lVar272 * 4),
                                                auVar377,auVar393);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar378,auVar376);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar379,auVar14);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar380,auVar15);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar381,auVar387);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar382,auVar16);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar383,auVar17);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar384,auVar13);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar385,auVar389);
                          auVar377 = vfmadd213ps_avx512vl
                                               (auVar377,auVar388,
                                                *(undefined1 (*) [32])(*pauVar269 + lVar272 * 4));
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar390,auVar378);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar379,auVar391);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar392,auVar380);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar8,auVar381);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar382,auVar9);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar10,auVar383);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar11,auVar384);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar385,auVar12);
                          *(undefined1 (*) [32])(*pauVar298 + lVar272 * 4) = auVar386;
                          *(undefined1 (*) [32])(*pauVar269 + lVar272 * 4) = auVar377;
                          auVar377 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 0xc)));
                          auVar378 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 0xc)));
                          auVar380 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 0xc)));
                          auVar381 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 0x10)))
                          ;
                          auVar383 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 0x10)))
                          ;
                          auVar384 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 0x10)))
                          ;
                          auVar386 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [32])(pauVar298[1] + lVar272 * 4),
                                                auVar379,auVar393);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar377,auVar376);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar381,auVar14);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar382,auVar15);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar378,auVar387);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar383,auVar16);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar385,auVar17);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar380,auVar13);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar384,auVar389);
                          auVar379 = vfmadd213ps_avx512vl
                                               (auVar379,auVar388,
                                                *(undefined1 (*) [32])(pauVar269[1] + lVar272 * 4));
                          auVar377 = vfmadd231ps_avx512vl(auVar379,auVar390,auVar377);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar381,auVar391);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar392,auVar382);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar8,auVar378);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar383,auVar9);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar10,auVar385);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar11,auVar380);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar384,auVar12);
                          *(undefined1 (*) [32])(pauVar298[1] + lVar272 * 4) = auVar386;
                          *(undefined1 (*) [32])(pauVar269[1] + lVar272 * 4) = auVar377;
                          auVar377 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 0x14)))
                          ;
                          auVar378 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 0x14)))
                          ;
                          auVar379 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 0x14)))
                          ;
                          auVar380 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 0x18)))
                          ;
                          auVar382 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 0x18)))
                          ;
                          auVar385 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 0x18)))
                          ;
                          auVar386 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [32])(pauVar298[2] + lVar272 * 4),
                                                auVar381,auVar393);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar377,auVar376);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar380,auVar14);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar383,auVar15);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar378,auVar387);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar382,auVar16);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar384,auVar17);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar379,auVar13);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar385,auVar389);
                          auVar381 = vfmadd213ps_avx512vl
                                               (auVar381,auVar388,
                                                *(undefined1 (*) [32])(pauVar269[2] + lVar272 * 4));
                          auVar377 = vfmadd231ps_avx512vl(auVar381,auVar390,auVar377);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar380,auVar391);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar392,auVar383);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar8,auVar378);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar382,auVar9);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar10,auVar384);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar11,auVar379);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar385,auVar12);
                          *(undefined1 (*) [32])(pauVar298[2] + lVar272 * 4) = auVar386;
                          *(undefined1 (*) [32])(pauVar269[2] + lVar272 * 4) = auVar377;
                          auVar377 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 0x1c)))
                          ;
                          auVar378 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 0x1c)))
                          ;
                          auVar379 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 0x1c)))
                          ;
                          auVar381 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 0x20)))
                          ;
                          auVar383 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 0x20)))
                          ;
                          auVar384 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 0x20)))
                          ;
                          auVar386 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [32])(pauVar298[3] + lVar272 * 4),
                                                auVar380,auVar393);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar377,auVar376);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar381,auVar14);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar382,auVar15);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar378,auVar387);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar383,auVar16);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar385,auVar17);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar379,auVar13);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar384,auVar389);
                          auVar380 = vfmadd213ps_avx512vl
                                               (auVar380,auVar388,
                                                *(undefined1 (*) [32])(pauVar269[3] + lVar272 * 4));
                          auVar377 = vfmadd231ps_avx512vl(auVar380,auVar390,auVar377);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar381,auVar391);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar392,auVar382);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar8,auVar378);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar383,auVar9);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar10,auVar385);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar11,auVar379);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar384,auVar12);
                          *(undefined1 (*) [32])(pauVar298[3] + lVar272 * 4) = auVar386;
                          *(undefined1 (*) [32])(pauVar269[3] + lVar272 * 4) = auVar377;
                          auVar377 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 0x24)))
                          ;
                          auVar378 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 0x24)))
                          ;
                          auVar379 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 0x24)))
                          ;
                          auVar380 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 0x28)))
                          ;
                          auVar382 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 0x28)))
                          ;
                          auVar385 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 0x28)))
                          ;
                          auVar386 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [32])(pauVar298[4] + lVar272 * 4),
                                                auVar381,auVar393);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar377,auVar376);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar380,auVar14);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar383,auVar15);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar378,auVar387);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar382,auVar16);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar384,auVar17);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar379,auVar13);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar385,auVar389);
                          auVar381 = vfmadd213ps_avx512vl
                                               (auVar381,auVar388,
                                                *(undefined1 (*) [32])(pauVar269[4] + lVar272 * 4));
                          auVar377 = vfmadd231ps_avx512vl(auVar381,auVar390,auVar377);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar380,auVar391);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar392,auVar383);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar8,auVar378);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar382,auVar9);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar10,auVar384);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar11,auVar379);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar385,auVar12);
                          *(undefined1 (*) [32])(pauVar298[4] + lVar272 * 4) = auVar386;
                          *(undefined1 (*) [32])(pauVar269[4] + lVar272 * 4) = auVar377;
                          auVar377 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 0x2c)))
                          ;
                          auVar378 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 0x2c)))
                          ;
                          auVar379 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 0x2c)))
                          ;
                          auVar381 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 0x30)))
                          ;
                          auVar383 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 0x30)))
                          ;
                          auVar384 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 0x30)))
                          ;
                          auVar386 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [32])(pauVar298[5] + lVar272 * 4),
                                                auVar380,auVar393);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar377,auVar376);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar381,auVar14);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar382,auVar15);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar378,auVar387);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar383,auVar16);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar385,auVar17);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar379,auVar13);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar384,auVar389);
                          auVar380 = vfmadd213ps_avx512vl
                                               (auVar380,auVar388,
                                                *(undefined1 (*) [32])(pauVar269[5] + lVar272 * 4));
                          auVar377 = vfmadd231ps_avx512vl(auVar380,auVar390,auVar377);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar381,auVar391);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar392,auVar382);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar8,auVar378);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar383,auVar9);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar10,auVar385);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar11,auVar379);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar384,auVar12);
                          *(undefined1 (*) [32])(pauVar298[5] + lVar272 * 4) = auVar386;
                          *(undefined1 (*) [32])(pauVar269[5] + lVar272 * 4) = auVar377;
                          auVar377 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 0x34)))
                          ;
                          auVar378 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 0x34)))
                          ;
                          auVar379 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 0x34)))
                          ;
                          auVar380 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 0x38)))
                          ;
                          auVar382 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 0x38)))
                          ;
                          auVar385 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 0x38)))
                          ;
                          auVar386 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [32])(pauVar298[6] + lVar272 * 4),
                                                auVar381,auVar393);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar377,auVar376);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar380,auVar14);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar383,auVar15);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar378,auVar387);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar382,auVar16);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar384,auVar17);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar379,auVar13);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar385,auVar389);
                          auVar381 = vfmadd213ps_avx512vl
                                               (auVar381,auVar388,
                                                *(undefined1 (*) [32])(pauVar269[6] + lVar272 * 4));
                          auVar377 = vfmadd231ps_avx512vl(auVar381,auVar390,auVar377);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar380,auVar391);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar392,auVar383);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar8,auVar378);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar382,auVar9);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar10,auVar384);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar11,auVar379);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar385,auVar12);
                          *(undefined1 (*) [32])(pauVar298[6] + lVar272 * 4) = auVar386;
                          *(undefined1 (*) [32])(pauVar269[6] + lVar272 * 4) = auVar377;
                          auVar377 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 0x3c)))
                          ;
                          auVar378 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 0x3c)))
                          ;
                          auVar379 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 0x3c)))
                          ;
                          auVar381 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 0x40)))
                          ;
                          auVar383 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 0x40)))
                          ;
                          auVar384 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 0x40)))
                          ;
                          auVar386 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [32])(pauVar298[7] + lVar272 * 4),
                                                auVar380,auVar393);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar377,auVar376);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar381,auVar14);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar382,auVar15);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar378,auVar387);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar383,auVar16);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar385,auVar17);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar379,auVar13);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar384,auVar389);
                          auVar380 = vfmadd213ps_avx512vl
                                               (auVar380,auVar388,
                                                *(undefined1 (*) [32])(pauVar269[7] + lVar272 * 4));
                          auVar377 = vfmadd231ps_avx512vl(auVar380,auVar390,auVar377);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar391,auVar381);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar392,auVar382);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar8,auVar378);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar9,auVar383);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar10,auVar385);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar11,auVar379);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar12,auVar384);
                          *(undefined1 (*) [32])(pauVar298[7] + lVar272 * 4) = auVar386;
                          *(undefined1 (*) [32])(pauVar269[7] + lVar272 * 4) = auVar377;
                          pauVar323 = pauVar323 + 8;
                          pauVar329 = pauVar329 + 8;
                          lVar272 = lVar272 + 0x40;
                          pvVar312 = (void *)((long)pvVar312 + 0x40);
                          pvVar344 = (void *)((long)pvVar344 + 0x40);
                          pvVar305 = (void *)((long)pvVar305 + 0x40);
                        }
                        for (; iVar343 + 3 < iVar260; iVar343 = iVar343 + 4) {
                          auVar377 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272)));
                          auVar378 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 4)));
                          auVar379 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 8)));
                          auVar380 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272)));
                          auVar381 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 4)));
                          auVar382 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 8)));
                          auVar383 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272)));
                          auVar384 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 4)));
                          auVar385 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 8)));
                          auVar386 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [32])(*pauVar298 + lVar272 * 4),
                                                auVar377,auVar393);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar378,auVar376);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar379,auVar14);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar380,auVar15);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar381,auVar387);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar382,auVar16);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar383,auVar17);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar384,auVar13);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar385,auVar389);
                          auVar377 = vfmadd213ps_avx512vl
                                               (auVar377,auVar388,
                                                *(undefined1 (*) [32])(*pauVar269 + lVar272 * 4));
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar390,auVar378);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar379,auVar391);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar392,auVar380);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar8,auVar381);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar382,auVar9);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar10,auVar383);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar11,auVar384);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar385,auVar12);
                          *(undefined1 (*) [32])(*pauVar298 + lVar272 * 4) = auVar386;
                          *(undefined1 (*) [32])(*pauVar269 + lVar272 * 4) = auVar377;
                          auVar377 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 0xc)));
                          auVar378 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 0xc)));
                          auVar380 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 0xc)));
                          auVar381 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 0x10)))
                          ;
                          auVar383 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 0x10)))
                          ;
                          auVar384 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 0x10)))
                          ;
                          auVar386 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [32])(pauVar298[1] + lVar272 * 4),
                                                auVar379,auVar393);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar377,auVar376);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar381,auVar14);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar382,auVar15);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar378,auVar387);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar383,auVar16);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar385,auVar17);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar380,auVar13);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar384,auVar389);
                          auVar379 = vfmadd213ps_avx512vl
                                               (auVar379,auVar388,
                                                *(undefined1 (*) [32])(pauVar269[1] + lVar272 * 4));
                          auVar377 = vfmadd231ps_avx512vl(auVar379,auVar390,auVar377);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar381,auVar391);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar392,auVar382);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar8,auVar378);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar383,auVar9);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar10,auVar385);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar11,auVar380);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar384,auVar12);
                          *(undefined1 (*) [32])(pauVar298[1] + lVar272 * 4) = auVar386;
                          *(undefined1 (*) [32])(pauVar269[1] + lVar272 * 4) = auVar377;
                          auVar377 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 0x14)))
                          ;
                          auVar378 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 0x14)))
                          ;
                          auVar379 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 0x14)))
                          ;
                          auVar380 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 0x18)))
                          ;
                          auVar382 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 0x18)))
                          ;
                          auVar385 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 0x18)))
                          ;
                          auVar386 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [32])(pauVar298[2] + lVar272 * 4),
                                                auVar381,auVar393);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar377,auVar376);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar380,auVar14);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar383,auVar15);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar378,auVar387);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar382,auVar16);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar384,auVar17);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar379,auVar13);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar385,auVar389);
                          auVar381 = vfmadd213ps_avx512vl
                                               (auVar381,auVar388,
                                                *(undefined1 (*) [32])(pauVar269[2] + lVar272 * 4));
                          auVar377 = vfmadd231ps_avx512vl(auVar381,auVar390,auVar377);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar380,auVar391);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar392,auVar383);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar8,auVar378);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar382,auVar9);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar10,auVar384);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar11,auVar379);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar385,auVar12);
                          *(undefined1 (*) [32])(pauVar298[2] + lVar272 * 4) = auVar386;
                          *(undefined1 (*) [32])(pauVar269[2] + lVar272 * 4) = auVar377;
                          auVar377 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 0x1c)))
                          ;
                          auVar378 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 0x1c)))
                          ;
                          auVar379 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 0x1c)))
                          ;
                          auVar381 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 0x20)))
                          ;
                          auVar383 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 0x20)))
                          ;
                          auVar384 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 0x20)))
                          ;
                          auVar386 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [32])(pauVar298[3] + lVar272 * 4),
                                                auVar380,auVar393);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar377,auVar376);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar381,auVar14);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar382,auVar15);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar378,auVar387);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar383,auVar16);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar385,auVar17);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar379,auVar13);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar384,auVar389);
                          auVar380 = vfmadd213ps_avx512vl
                                               (auVar380,auVar388,
                                                *(undefined1 (*) [32])(pauVar269[3] + lVar272 * 4));
                          auVar377 = vfmadd231ps_avx512vl(auVar380,auVar390,auVar377);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar391,auVar381);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar392,auVar382);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar8,auVar378);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar9,auVar383);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar10,auVar385);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar11,auVar379);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar12,auVar384);
                          *(undefined1 (*) [32])(pauVar298[3] + lVar272 * 4) = auVar386;
                          *(undefined1 (*) [32])(pauVar269[3] + lVar272 * 4) = auVar377;
                          pauVar323 = pauVar323 + 4;
                          pauVar329 = pauVar329 + 4;
                          lVar272 = lVar272 + 0x20;
                          pvVar312 = (void *)((long)pvVar312 + 0x20);
                          pvVar344 = (void *)((long)pvVar344 + 0x20);
                          pvVar305 = (void *)((long)pvVar305 + 0x20);
                        }
                        for (; iVar343 + 1 < iVar260; iVar343 = iVar343 + 2) {
                          auVar377 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272)));
                          auVar378 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 4)));
                          auVar379 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 8)));
                          auVar380 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272)));
                          auVar381 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 4)));
                          auVar382 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 8)));
                          auVar383 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272)));
                          auVar384 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 4)));
                          auVar385 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 8)));
                          auVar386 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [32])(*pauVar298 + lVar272 * 4),
                                                auVar377,auVar393);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar378,auVar376);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar379,auVar14);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar380,auVar15);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar381,auVar387);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar382,auVar16);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar383,auVar17);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar384,auVar13);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar385,auVar389);
                          auVar377 = vfmadd213ps_avx512vl
                                               (auVar377,auVar388,
                                                *(undefined1 (*) [32])(*pauVar269 + lVar272 * 4));
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar390,auVar378);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar379,auVar391);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar392,auVar380);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar8,auVar381);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar382,auVar9);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar10,auVar383);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar11,auVar384);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar385,auVar12);
                          *(undefined1 (*) [32])(*pauVar298 + lVar272 * 4) = auVar386;
                          *(undefined1 (*) [32])(*pauVar269 + lVar272 * 4) = auVar377;
                          auVar377 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 0xc)));
                          auVar378 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 0xc)));
                          auVar380 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 0xc)));
                          auVar381 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 0x10)))
                          ;
                          auVar383 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 0x10)))
                          ;
                          auVar384 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 0x10)))
                          ;
                          auVar386 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [32])(pauVar298[1] + lVar272 * 4),
                                                auVar379,auVar393);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar377,auVar376);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar381,auVar14);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar382,auVar15);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar378,auVar387);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar383,auVar16);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar385,auVar17);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar380,auVar13);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar384,auVar389);
                          auVar379 = vfmadd213ps_avx512vl
                                               (auVar379,auVar388,
                                                *(undefined1 (*) [32])(pauVar269[1] + lVar272 * 4));
                          auVar377 = vfmadd231ps_avx512vl(auVar379,auVar390,auVar377);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar391,auVar381);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar392,auVar382);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar8,auVar378);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar9,auVar383);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar10,auVar385);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar11,auVar380);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar12,auVar384);
                          *(undefined1 (*) [32])(pauVar298[1] + lVar272 * 4) = auVar386;
                          *(undefined1 (*) [32])(pauVar269[1] + lVar272 * 4) = auVar377;
                          pauVar323 = pauVar323 + 2;
                          pauVar329 = pauVar329 + 2;
                          lVar272 = lVar272 + 0x10;
                          pvVar312 = (void *)((long)pvVar312 + 0x10);
                          pvVar344 = (void *)((long)pvVar344 + 0x10);
                          pvVar305 = (void *)((long)pvVar305 + 0x10);
                        }
                        puVar326 = (uint *)((long)pvVar345 + lVar272);
                        puVar340 = (uint *)((long)pvVar347 + lVar272);
                        puVar346 = (uint *)((long)pvVar313 + lVar272);
                        pauVar298 = pauVar323;
                        pauVar269 = pauVar329;
                        pvVar345 = pvVar312;
                        for (; iVar343 < iVar260; iVar343 = iVar343 + 1) {
                          auVar377 = vbroadcastss_avx512vl(ZEXT416(*puVar326));
                          auVar378 = vbroadcastss_avx512vl(ZEXT416(puVar326[1]));
                          auVar379 = vbroadcastss_avx512vl(ZEXT416(puVar326[2]));
                          puVar326 = puVar326 + 2;
                          auVar380 = vbroadcastss_avx512vl(ZEXT416(*puVar340));
                          auVar381 = vbroadcastss_avx512vl(ZEXT416(puVar340[1]));
                          auVar382 = vbroadcastss_avx512vl(ZEXT416(puVar340[2]));
                          auVar383 = vbroadcastss_avx512vl(ZEXT416(*puVar346));
                          auVar384 = vbroadcastss_avx512vl(ZEXT416(puVar346[1]));
                          puVar340 = puVar340 + 2;
                          auVar385 = vbroadcastss_avx512vl(ZEXT416(puVar346[2]));
                          puVar346 = puVar346 + 2;
                          auVar386 = vfmadd231ps_avx512vl(*pauVar298,auVar377,auVar393);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar378,auVar376);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar379,auVar14);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar380,auVar15);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar381,auVar387);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar382,auVar16);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar383,auVar17);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar384,auVar13);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar385,auVar389);
                          auVar377 = vfmadd213ps_avx512vl(auVar377,auVar388,*pauVar269);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar390,auVar378);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar391,auVar379);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar392,auVar380);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar8,auVar381);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar9,auVar382);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar10,auVar383);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar11,auVar384);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar12,auVar385);
                          *pauVar298 = auVar386;
                          *pauVar269 = auVar377;
                          pauVar298 = pauVar298 + 1;
                          pauVar269 = pauVar269 + 1;
                          pvVar345 = (void *)((long)pvVar345 + 8);
                          pvVar344 = (void *)((long)pvVar344 + 8);
                          pvVar305 = (void *)((long)pvVar305 + 8);
                        }
                        pvVar347 = pvVar344;
                        pvVar313 = pvVar305;
                      }
                      pauVar322 = pauVar322 + 9;
                      pauVar306 = pauVar306 + 9;
                    }
                  }
                  for (uVar281 = (long)iVar261 & 0xfffffffffffffffe; (long)uVar281 < (long)iVar261;
                      uVar281 = uVar281 + 1) {
                    uVar317 = (long)top_blob->h * (long)top_blob->w;
                    uVar318 = top_blob->elemsize;
                    uVar268 = (uVar318 * uVar317 + 0xf & 0xfffffffffffffff0) / uVar318;
                    if (top_blob->dims == 4) {
                      uVar268 = uVar317;
                    }
                    if (pvVar348 == (void *)0x0) {
                      uVar408 = 0;
                      uVar418 = 0;
                      uVar419 = 0;
                      uVar420 = 0;
                    }
                    else {
                      puVar310 = (undefined8 *)((long)pvVar348 + uVar281 * 0x20);
                      uVar408 = *puVar310;
                      uVar418 = puVar310[1];
                      uVar419 = puVar310[2];
                      uVar420 = puVar310[3];
                    }
                    pauVar325 = (undefined1 (*) [32])
                                (top_blob->cstep * uVar281 * uVar318 + (long)top_blob->data);
                    iVar328 = (int)uVar268 * top_blob->d;
                    pauVar306 = pauVar325;
                    if (iVar328 < 1) {
                      iVar328 = 0;
                    }
                    while (bVar349 = iVar328 != 0, iVar328 = iVar328 + -1, bVar349) {
                      *(undefined8 *)*pauVar306 = uVar408;
                      *(undefined8 *)(*pauVar306 + 8) = uVar418;
                      *(undefined8 *)(*pauVar306 + 0x10) = uVar419;
                      *(undefined8 *)(*pauVar306 + 0x18) = uVar420;
                      pauVar306 = pauVar306 + 1;
                    }
                    pauVar306 = (undefined1 (*) [32])
                                ((this->weight_data_tm).cstep * uVar281 *
                                 (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data
                                );
                    for (uVar318 = 0; uVar318 != uVar278; uVar318 = uVar318 + 1) {
                      pvVar313 = (void *)(local_d70.cstep * uVar318 * local_d70.elemsize +
                                         (long)local_d70.data);
                      pvVar345 = (void *)((long)pvVar313 + (long)local_d70.w * local_d70.elemsize);
                      pvVar347 = (void *)((long)pvVar313 +
                                         (long)local_d70.w * local_d70.elemsize * 2);
                      auVar393 = *pauVar306;
                      auVar376 = pauVar306[1];
                      auVar14 = pauVar306[2];
                      auVar15 = pauVar306[3];
                      auVar387 = pauVar306[4];
                      auVar16 = pauVar306[5];
                      auVar17 = pauVar306[6];
                      auVar13 = pauVar306[7];
                      auVar389 = pauVar306[8];
                      pauVar332 = pauVar325;
                      for (iVar328 = 0; iVar328 != iVar342; iVar328 = iVar328 + 1) {
                        pvVar312 = (void *)((long)pvVar313 + lVar271);
                        pvVar344 = (void *)((long)pvVar345 + lVar271);
                        pvVar305 = (void *)((long)pvVar347 + lVar271);
                        lVar272 = 0;
                        pauVar322 = pauVar332;
                        for (iVar343 = 0; iVar343 + 7 < iVar260; iVar343 = iVar343 + 8) {
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272);
                          auVar639._4_4_ = uVar407;
                          auVar639._0_4_ = uVar407;
                          auVar639._8_4_ = uVar407;
                          auVar639._12_4_ = uVar407;
                          auVar639._16_4_ = uVar407;
                          auVar639._20_4_ = uVar407;
                          auVar639._24_4_ = uVar407;
                          auVar639._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 8);
                          auVar663._4_4_ = uVar407;
                          auVar663._0_4_ = uVar407;
                          auVar663._8_4_ = uVar407;
                          auVar663._12_4_ = uVar407;
                          auVar663._16_4_ = uVar407;
                          auVar663._20_4_ = uVar407;
                          auVar663._24_4_ = uVar407;
                          auVar663._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 8);
                          auVar687._4_4_ = uVar407;
                          auVar687._0_4_ = uVar407;
                          auVar687._8_4_ = uVar407;
                          auVar687._12_4_ = uVar407;
                          auVar687._16_4_ = uVar407;
                          auVar687._20_4_ = uVar407;
                          auVar687._24_4_ = uVar407;
                          auVar687._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 8);
                          auVar710._4_4_ = uVar407;
                          auVar710._0_4_ = uVar407;
                          auVar710._8_4_ = uVar407;
                          auVar710._12_4_ = uVar407;
                          auVar710._16_4_ = uVar407;
                          auVar710._20_4_ = uVar407;
                          auVar710._24_4_ = uVar407;
                          auVar710._28_4_ = uVar407;
                          auVar360 = vfmadd213ps_fma(auVar639,auVar393,
                                                     *(undefined1 (*) [32])
                                                      (*pauVar332 + lVar272 * 4));
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 4);
                          auVar186._4_4_ = uVar407;
                          auVar186._0_4_ = uVar407;
                          auVar186._8_4_ = uVar407;
                          auVar186._12_4_ = uVar407;
                          auVar186._16_4_ = uVar407;
                          auVar186._20_4_ = uVar407;
                          auVar186._24_4_ = uVar407;
                          auVar186._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar376,auVar186);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar663,auVar14);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272);
                          auVar187._4_4_ = uVar407;
                          auVar187._0_4_ = uVar407;
                          auVar187._8_4_ = uVar407;
                          auVar187._12_4_ = uVar407;
                          auVar187._16_4_ = uVar407;
                          auVar187._20_4_ = uVar407;
                          auVar187._24_4_ = uVar407;
                          auVar187._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar15,auVar187);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 4);
                          auVar188._4_4_ = uVar407;
                          auVar188._0_4_ = uVar407;
                          auVar188._8_4_ = uVar407;
                          auVar188._12_4_ = uVar407;
                          auVar188._16_4_ = uVar407;
                          auVar188._20_4_ = uVar407;
                          auVar188._24_4_ = uVar407;
                          auVar188._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar387,auVar188);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar687,auVar16);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272);
                          auVar189._4_4_ = uVar407;
                          auVar189._0_4_ = uVar407;
                          auVar189._8_4_ = uVar407;
                          auVar189._12_4_ = uVar407;
                          auVar189._16_4_ = uVar407;
                          auVar189._20_4_ = uVar407;
                          auVar189._24_4_ = uVar407;
                          auVar189._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar17,auVar189);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 4);
                          auVar190._4_4_ = uVar407;
                          auVar190._0_4_ = uVar407;
                          auVar190._8_4_ = uVar407;
                          auVar190._12_4_ = uVar407;
                          auVar190._16_4_ = uVar407;
                          auVar190._20_4_ = uVar407;
                          auVar190._24_4_ = uVar407;
                          auVar190._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar13,auVar190);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar710,auVar389);
                          *(undefined1 (*) [32])(*pauVar332 + lVar272 * 4) = ZEXT1632(auVar360);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x10);
                          auVar640._4_4_ = uVar407;
                          auVar640._0_4_ = uVar407;
                          auVar640._8_4_ = uVar407;
                          auVar640._12_4_ = uVar407;
                          auVar640._16_4_ = uVar407;
                          auVar640._20_4_ = uVar407;
                          auVar640._24_4_ = uVar407;
                          auVar640._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x10);
                          auVar731._4_4_ = uVar407;
                          auVar731._0_4_ = uVar407;
                          auVar731._8_4_ = uVar407;
                          auVar731._12_4_ = uVar407;
                          auVar731._16_4_ = uVar407;
                          auVar731._20_4_ = uVar407;
                          auVar731._24_4_ = uVar407;
                          auVar731._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x10);
                          auVar747._4_4_ = uVar407;
                          auVar747._0_4_ = uVar407;
                          auVar747._8_4_ = uVar407;
                          auVar747._12_4_ = uVar407;
                          auVar747._16_4_ = uVar407;
                          auVar747._20_4_ = uVar407;
                          auVar747._24_4_ = uVar407;
                          auVar747._28_4_ = uVar407;
                          auVar360 = vfmadd213ps_fma(auVar663,auVar393,
                                                     *(undefined1 (*) [32])
                                                      (pauVar332[1] + lVar272 * 4));
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0xc);
                          auVar191._4_4_ = uVar407;
                          auVar191._0_4_ = uVar407;
                          auVar191._8_4_ = uVar407;
                          auVar191._12_4_ = uVar407;
                          auVar191._16_4_ = uVar407;
                          auVar191._20_4_ = uVar407;
                          auVar191._24_4_ = uVar407;
                          auVar191._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar376,auVar191);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar640,auVar14);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar15,auVar687);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0xc);
                          auVar192._4_4_ = uVar407;
                          auVar192._0_4_ = uVar407;
                          auVar192._8_4_ = uVar407;
                          auVar192._12_4_ = uVar407;
                          auVar192._16_4_ = uVar407;
                          auVar192._20_4_ = uVar407;
                          auVar192._24_4_ = uVar407;
                          auVar192._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar387,auVar192);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar731,auVar16);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar17,auVar710);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0xc);
                          auVar193._4_4_ = uVar407;
                          auVar193._0_4_ = uVar407;
                          auVar193._8_4_ = uVar407;
                          auVar193._12_4_ = uVar407;
                          auVar193._16_4_ = uVar407;
                          auVar193._20_4_ = uVar407;
                          auVar193._24_4_ = uVar407;
                          auVar193._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar13,auVar193);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar747,auVar389);
                          *(undefined1 (*) [32])(pauVar332[1] + lVar272 * 4) = ZEXT1632(auVar360);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x18);
                          auVar664._4_4_ = uVar407;
                          auVar664._0_4_ = uVar407;
                          auVar664._8_4_ = uVar407;
                          auVar664._12_4_ = uVar407;
                          auVar664._16_4_ = uVar407;
                          auVar664._20_4_ = uVar407;
                          auVar664._24_4_ = uVar407;
                          auVar664._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x18);
                          auVar688._4_4_ = uVar407;
                          auVar688._0_4_ = uVar407;
                          auVar688._8_4_ = uVar407;
                          auVar688._12_4_ = uVar407;
                          auVar688._16_4_ = uVar407;
                          auVar688._20_4_ = uVar407;
                          auVar688._24_4_ = uVar407;
                          auVar688._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x18);
                          auVar711._4_4_ = uVar407;
                          auVar711._0_4_ = uVar407;
                          auVar711._8_4_ = uVar407;
                          auVar711._12_4_ = uVar407;
                          auVar711._16_4_ = uVar407;
                          auVar711._20_4_ = uVar407;
                          auVar711._24_4_ = uVar407;
                          auVar711._28_4_ = uVar407;
                          auVar360 = vfmadd213ps_fma(auVar640,auVar393,
                                                     *(undefined1 (*) [32])
                                                      (pauVar332[2] + lVar272 * 4));
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x14);
                          auVar194._4_4_ = uVar407;
                          auVar194._0_4_ = uVar407;
                          auVar194._8_4_ = uVar407;
                          auVar194._12_4_ = uVar407;
                          auVar194._16_4_ = uVar407;
                          auVar194._20_4_ = uVar407;
                          auVar194._24_4_ = uVar407;
                          auVar194._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar376,auVar194);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar664,auVar14);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar15,auVar731);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x14);
                          auVar195._4_4_ = uVar407;
                          auVar195._0_4_ = uVar407;
                          auVar195._8_4_ = uVar407;
                          auVar195._12_4_ = uVar407;
                          auVar195._16_4_ = uVar407;
                          auVar195._20_4_ = uVar407;
                          auVar195._24_4_ = uVar407;
                          auVar195._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar387,auVar195);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar688,auVar16);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar17,auVar747);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x14);
                          auVar196._4_4_ = uVar407;
                          auVar196._0_4_ = uVar407;
                          auVar196._8_4_ = uVar407;
                          auVar196._12_4_ = uVar407;
                          auVar196._16_4_ = uVar407;
                          auVar196._20_4_ = uVar407;
                          auVar196._24_4_ = uVar407;
                          auVar196._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar13,auVar196);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar711,auVar389);
                          *(undefined1 (*) [32])(pauVar332[2] + lVar272 * 4) = ZEXT1632(auVar360);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x20);
                          auVar641._4_4_ = uVar407;
                          auVar641._0_4_ = uVar407;
                          auVar641._8_4_ = uVar407;
                          auVar641._12_4_ = uVar407;
                          auVar641._16_4_ = uVar407;
                          auVar641._20_4_ = uVar407;
                          auVar641._24_4_ = uVar407;
                          auVar641._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x20);
                          auVar732._4_4_ = uVar407;
                          auVar732._0_4_ = uVar407;
                          auVar732._8_4_ = uVar407;
                          auVar732._12_4_ = uVar407;
                          auVar732._16_4_ = uVar407;
                          auVar732._20_4_ = uVar407;
                          auVar732._24_4_ = uVar407;
                          auVar732._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x20);
                          auVar748._4_4_ = uVar407;
                          auVar748._0_4_ = uVar407;
                          auVar748._8_4_ = uVar407;
                          auVar748._12_4_ = uVar407;
                          auVar748._16_4_ = uVar407;
                          auVar748._20_4_ = uVar407;
                          auVar748._24_4_ = uVar407;
                          auVar748._28_4_ = uVar407;
                          auVar360 = vfmadd213ps_fma(auVar664,auVar393,
                                                     *(undefined1 (*) [32])
                                                      (pauVar332[3] + lVar272 * 4));
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x1c);
                          auVar197._4_4_ = uVar407;
                          auVar197._0_4_ = uVar407;
                          auVar197._8_4_ = uVar407;
                          auVar197._12_4_ = uVar407;
                          auVar197._16_4_ = uVar407;
                          auVar197._20_4_ = uVar407;
                          auVar197._24_4_ = uVar407;
                          auVar197._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar376,auVar197);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar641,auVar14);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar15,auVar688);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x1c);
                          auVar198._4_4_ = uVar407;
                          auVar198._0_4_ = uVar407;
                          auVar198._8_4_ = uVar407;
                          auVar198._12_4_ = uVar407;
                          auVar198._16_4_ = uVar407;
                          auVar198._20_4_ = uVar407;
                          auVar198._24_4_ = uVar407;
                          auVar198._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar387,auVar198);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar732,auVar16);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar17,auVar711);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x1c);
                          auVar199._4_4_ = uVar407;
                          auVar199._0_4_ = uVar407;
                          auVar199._8_4_ = uVar407;
                          auVar199._12_4_ = uVar407;
                          auVar199._16_4_ = uVar407;
                          auVar199._20_4_ = uVar407;
                          auVar199._24_4_ = uVar407;
                          auVar199._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar13,auVar199);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar748,auVar389);
                          *(undefined1 (*) [32])(pauVar332[3] + lVar272 * 4) = ZEXT1632(auVar360);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x28);
                          auVar665._4_4_ = uVar407;
                          auVar665._0_4_ = uVar407;
                          auVar665._8_4_ = uVar407;
                          auVar665._12_4_ = uVar407;
                          auVar665._16_4_ = uVar407;
                          auVar665._20_4_ = uVar407;
                          auVar665._24_4_ = uVar407;
                          auVar665._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x28);
                          auVar689._4_4_ = uVar407;
                          auVar689._0_4_ = uVar407;
                          auVar689._8_4_ = uVar407;
                          auVar689._12_4_ = uVar407;
                          auVar689._16_4_ = uVar407;
                          auVar689._20_4_ = uVar407;
                          auVar689._24_4_ = uVar407;
                          auVar689._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x28);
                          auVar712._4_4_ = uVar407;
                          auVar712._0_4_ = uVar407;
                          auVar712._8_4_ = uVar407;
                          auVar712._12_4_ = uVar407;
                          auVar712._16_4_ = uVar407;
                          auVar712._20_4_ = uVar407;
                          auVar712._24_4_ = uVar407;
                          auVar712._28_4_ = uVar407;
                          auVar360 = vfmadd213ps_fma(auVar641,auVar393,
                                                     *(undefined1 (*) [32])
                                                      (pauVar332[4] + lVar272 * 4));
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x24);
                          auVar200._4_4_ = uVar407;
                          auVar200._0_4_ = uVar407;
                          auVar200._8_4_ = uVar407;
                          auVar200._12_4_ = uVar407;
                          auVar200._16_4_ = uVar407;
                          auVar200._20_4_ = uVar407;
                          auVar200._24_4_ = uVar407;
                          auVar200._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar376,auVar200);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar665,auVar14);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar15,auVar732);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x24);
                          auVar201._4_4_ = uVar407;
                          auVar201._0_4_ = uVar407;
                          auVar201._8_4_ = uVar407;
                          auVar201._12_4_ = uVar407;
                          auVar201._16_4_ = uVar407;
                          auVar201._20_4_ = uVar407;
                          auVar201._24_4_ = uVar407;
                          auVar201._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar387,auVar201);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar689,auVar16);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar17,auVar748);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x24);
                          auVar202._4_4_ = uVar407;
                          auVar202._0_4_ = uVar407;
                          auVar202._8_4_ = uVar407;
                          auVar202._12_4_ = uVar407;
                          auVar202._16_4_ = uVar407;
                          auVar202._20_4_ = uVar407;
                          auVar202._24_4_ = uVar407;
                          auVar202._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar13,auVar202);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar712,auVar389);
                          *(undefined1 (*) [32])(pauVar332[4] + lVar272 * 4) = ZEXT1632(auVar360);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x30);
                          auVar642._4_4_ = uVar407;
                          auVar642._0_4_ = uVar407;
                          auVar642._8_4_ = uVar407;
                          auVar642._12_4_ = uVar407;
                          auVar642._16_4_ = uVar407;
                          auVar642._20_4_ = uVar407;
                          auVar642._24_4_ = uVar407;
                          auVar642._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x30);
                          auVar733._4_4_ = uVar407;
                          auVar733._0_4_ = uVar407;
                          auVar733._8_4_ = uVar407;
                          auVar733._12_4_ = uVar407;
                          auVar733._16_4_ = uVar407;
                          auVar733._20_4_ = uVar407;
                          auVar733._24_4_ = uVar407;
                          auVar733._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x30);
                          auVar749._4_4_ = uVar407;
                          auVar749._0_4_ = uVar407;
                          auVar749._8_4_ = uVar407;
                          auVar749._12_4_ = uVar407;
                          auVar749._16_4_ = uVar407;
                          auVar749._20_4_ = uVar407;
                          auVar749._24_4_ = uVar407;
                          auVar749._28_4_ = uVar407;
                          auVar360 = vfmadd213ps_fma(auVar665,auVar393,
                                                     *(undefined1 (*) [32])
                                                      (pauVar332[5] + lVar272 * 4));
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x2c);
                          auVar203._4_4_ = uVar407;
                          auVar203._0_4_ = uVar407;
                          auVar203._8_4_ = uVar407;
                          auVar203._12_4_ = uVar407;
                          auVar203._16_4_ = uVar407;
                          auVar203._20_4_ = uVar407;
                          auVar203._24_4_ = uVar407;
                          auVar203._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar376,auVar203);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar642,auVar14);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar15,auVar689);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x2c);
                          auVar204._4_4_ = uVar407;
                          auVar204._0_4_ = uVar407;
                          auVar204._8_4_ = uVar407;
                          auVar204._12_4_ = uVar407;
                          auVar204._16_4_ = uVar407;
                          auVar204._20_4_ = uVar407;
                          auVar204._24_4_ = uVar407;
                          auVar204._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar387,auVar204);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar733,auVar16);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar17,auVar712);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x2c);
                          auVar205._4_4_ = uVar407;
                          auVar205._0_4_ = uVar407;
                          auVar205._8_4_ = uVar407;
                          auVar205._12_4_ = uVar407;
                          auVar205._16_4_ = uVar407;
                          auVar205._20_4_ = uVar407;
                          auVar205._24_4_ = uVar407;
                          auVar205._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar13,auVar205);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar749,auVar389);
                          *(undefined1 (*) [32])(pauVar332[5] + lVar272 * 4) = ZEXT1632(auVar360);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x38);
                          auVar666._4_4_ = uVar407;
                          auVar666._0_4_ = uVar407;
                          auVar666._8_4_ = uVar407;
                          auVar666._12_4_ = uVar407;
                          auVar666._16_4_ = uVar407;
                          auVar666._20_4_ = uVar407;
                          auVar666._24_4_ = uVar407;
                          auVar666._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x38);
                          auVar690._4_4_ = uVar407;
                          auVar690._0_4_ = uVar407;
                          auVar690._8_4_ = uVar407;
                          auVar690._12_4_ = uVar407;
                          auVar690._16_4_ = uVar407;
                          auVar690._20_4_ = uVar407;
                          auVar690._24_4_ = uVar407;
                          auVar690._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x38);
                          auVar713._4_4_ = uVar407;
                          auVar713._0_4_ = uVar407;
                          auVar713._8_4_ = uVar407;
                          auVar713._12_4_ = uVar407;
                          auVar713._16_4_ = uVar407;
                          auVar713._20_4_ = uVar407;
                          auVar713._24_4_ = uVar407;
                          auVar713._28_4_ = uVar407;
                          auVar360 = vfmadd213ps_fma(auVar642,auVar393,
                                                     *(undefined1 (*) [32])
                                                      (pauVar332[6] + lVar272 * 4));
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x34);
                          auVar206._4_4_ = uVar407;
                          auVar206._0_4_ = uVar407;
                          auVar206._8_4_ = uVar407;
                          auVar206._12_4_ = uVar407;
                          auVar206._16_4_ = uVar407;
                          auVar206._20_4_ = uVar407;
                          auVar206._24_4_ = uVar407;
                          auVar206._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar376,auVar206);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar666,auVar14);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar15,auVar733);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x34);
                          auVar207._4_4_ = uVar407;
                          auVar207._0_4_ = uVar407;
                          auVar207._8_4_ = uVar407;
                          auVar207._12_4_ = uVar407;
                          auVar207._16_4_ = uVar407;
                          auVar207._20_4_ = uVar407;
                          auVar207._24_4_ = uVar407;
                          auVar207._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar387,auVar207);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar690,auVar16);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar17,auVar749);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x34);
                          auVar208._4_4_ = uVar407;
                          auVar208._0_4_ = uVar407;
                          auVar208._8_4_ = uVar407;
                          auVar208._12_4_ = uVar407;
                          auVar208._16_4_ = uVar407;
                          auVar208._20_4_ = uVar407;
                          auVar208._24_4_ = uVar407;
                          auVar208._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar13,auVar208);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar713,auVar389);
                          *(undefined1 (*) [32])(pauVar332[6] + lVar272 * 4) = ZEXT1632(auVar360);
                          auVar360 = vfmadd213ps_fma(auVar666,auVar393,
                                                     *(undefined1 (*) [32])
                                                      (pauVar332[7] + lVar272 * 4));
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x3c);
                          auVar209._4_4_ = uVar407;
                          auVar209._0_4_ = uVar407;
                          auVar209._8_4_ = uVar407;
                          auVar209._12_4_ = uVar407;
                          auVar209._16_4_ = uVar407;
                          auVar209._20_4_ = uVar407;
                          auVar209._24_4_ = uVar407;
                          auVar209._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar376,auVar209);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x40);
                          auVar210._4_4_ = uVar407;
                          auVar210._0_4_ = uVar407;
                          auVar210._8_4_ = uVar407;
                          auVar210._12_4_ = uVar407;
                          auVar210._16_4_ = uVar407;
                          auVar210._20_4_ = uVar407;
                          auVar210._24_4_ = uVar407;
                          auVar210._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar14,auVar210);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar15,auVar690);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x3c);
                          auVar211._4_4_ = uVar407;
                          auVar211._0_4_ = uVar407;
                          auVar211._8_4_ = uVar407;
                          auVar211._12_4_ = uVar407;
                          auVar211._16_4_ = uVar407;
                          auVar211._20_4_ = uVar407;
                          auVar211._24_4_ = uVar407;
                          auVar211._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar387,auVar211);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x40);
                          auVar212._4_4_ = uVar407;
                          auVar212._0_4_ = uVar407;
                          auVar212._8_4_ = uVar407;
                          auVar212._12_4_ = uVar407;
                          auVar212._16_4_ = uVar407;
                          auVar212._20_4_ = uVar407;
                          auVar212._24_4_ = uVar407;
                          auVar212._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar16,auVar212);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar17,auVar713);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x3c);
                          auVar213._4_4_ = uVar407;
                          auVar213._0_4_ = uVar407;
                          auVar213._8_4_ = uVar407;
                          auVar213._12_4_ = uVar407;
                          auVar213._16_4_ = uVar407;
                          auVar213._20_4_ = uVar407;
                          auVar213._24_4_ = uVar407;
                          auVar213._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar13,auVar213);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x40);
                          auVar214._4_4_ = uVar407;
                          auVar214._0_4_ = uVar407;
                          auVar214._8_4_ = uVar407;
                          auVar214._12_4_ = uVar407;
                          auVar214._16_4_ = uVar407;
                          auVar214._20_4_ = uVar407;
                          auVar214._24_4_ = uVar407;
                          auVar214._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar389,auVar214);
                          *(undefined1 (*) [32])(pauVar332[7] + lVar272 * 4) = auVar388;
                          pauVar322 = pauVar322 + 8;
                          lVar272 = lVar272 + 0x40;
                          pvVar312 = (void *)((long)pvVar312 + 0x40);
                          pvVar344 = (void *)((long)pvVar344 + 0x40);
                          pvVar305 = (void *)((long)pvVar305 + 0x40);
                        }
                        for (; iVar343 + 3 < iVar260; iVar343 = iVar343 + 4) {
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272);
                          auVar643._4_4_ = uVar407;
                          auVar643._0_4_ = uVar407;
                          auVar643._8_4_ = uVar407;
                          auVar643._12_4_ = uVar407;
                          auVar643._16_4_ = uVar407;
                          auVar643._20_4_ = uVar407;
                          auVar643._24_4_ = uVar407;
                          auVar643._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 8);
                          auVar667._4_4_ = uVar407;
                          auVar667._0_4_ = uVar407;
                          auVar667._8_4_ = uVar407;
                          auVar667._12_4_ = uVar407;
                          auVar667._16_4_ = uVar407;
                          auVar667._20_4_ = uVar407;
                          auVar667._24_4_ = uVar407;
                          auVar667._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 8);
                          auVar691._4_4_ = uVar407;
                          auVar691._0_4_ = uVar407;
                          auVar691._8_4_ = uVar407;
                          auVar691._12_4_ = uVar407;
                          auVar691._16_4_ = uVar407;
                          auVar691._20_4_ = uVar407;
                          auVar691._24_4_ = uVar407;
                          auVar691._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 8);
                          auVar714._4_4_ = uVar407;
                          auVar714._0_4_ = uVar407;
                          auVar714._8_4_ = uVar407;
                          auVar714._12_4_ = uVar407;
                          auVar714._16_4_ = uVar407;
                          auVar714._20_4_ = uVar407;
                          auVar714._24_4_ = uVar407;
                          auVar714._28_4_ = uVar407;
                          auVar360 = vfmadd213ps_fma(auVar643,auVar393,
                                                     *(undefined1 (*) [32])
                                                      (*pauVar332 + lVar272 * 4));
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 4);
                          auVar234._4_4_ = uVar407;
                          auVar234._0_4_ = uVar407;
                          auVar234._8_4_ = uVar407;
                          auVar234._12_4_ = uVar407;
                          auVar234._16_4_ = uVar407;
                          auVar234._20_4_ = uVar407;
                          auVar234._24_4_ = uVar407;
                          auVar234._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar376,auVar234);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar667,auVar14);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272);
                          auVar235._4_4_ = uVar407;
                          auVar235._0_4_ = uVar407;
                          auVar235._8_4_ = uVar407;
                          auVar235._12_4_ = uVar407;
                          auVar235._16_4_ = uVar407;
                          auVar235._20_4_ = uVar407;
                          auVar235._24_4_ = uVar407;
                          auVar235._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar15,auVar235);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 4);
                          auVar236._4_4_ = uVar407;
                          auVar236._0_4_ = uVar407;
                          auVar236._8_4_ = uVar407;
                          auVar236._12_4_ = uVar407;
                          auVar236._16_4_ = uVar407;
                          auVar236._20_4_ = uVar407;
                          auVar236._24_4_ = uVar407;
                          auVar236._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar387,auVar236);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar691,auVar16);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272);
                          auVar237._4_4_ = uVar407;
                          auVar237._0_4_ = uVar407;
                          auVar237._8_4_ = uVar407;
                          auVar237._12_4_ = uVar407;
                          auVar237._16_4_ = uVar407;
                          auVar237._20_4_ = uVar407;
                          auVar237._24_4_ = uVar407;
                          auVar237._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar17,auVar237);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 4);
                          auVar238._4_4_ = uVar407;
                          auVar238._0_4_ = uVar407;
                          auVar238._8_4_ = uVar407;
                          auVar238._12_4_ = uVar407;
                          auVar238._16_4_ = uVar407;
                          auVar238._20_4_ = uVar407;
                          auVar238._24_4_ = uVar407;
                          auVar238._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar13,auVar238);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar714,auVar389);
                          *(undefined1 (*) [32])(*pauVar332 + lVar272 * 4) = ZEXT1632(auVar360);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x10);
                          auVar644._4_4_ = uVar407;
                          auVar644._0_4_ = uVar407;
                          auVar644._8_4_ = uVar407;
                          auVar644._12_4_ = uVar407;
                          auVar644._16_4_ = uVar407;
                          auVar644._20_4_ = uVar407;
                          auVar644._24_4_ = uVar407;
                          auVar644._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x10);
                          auVar734._4_4_ = uVar407;
                          auVar734._0_4_ = uVar407;
                          auVar734._8_4_ = uVar407;
                          auVar734._12_4_ = uVar407;
                          auVar734._16_4_ = uVar407;
                          auVar734._20_4_ = uVar407;
                          auVar734._24_4_ = uVar407;
                          auVar734._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x10);
                          auVar750._4_4_ = uVar407;
                          auVar750._0_4_ = uVar407;
                          auVar750._8_4_ = uVar407;
                          auVar750._12_4_ = uVar407;
                          auVar750._16_4_ = uVar407;
                          auVar750._20_4_ = uVar407;
                          auVar750._24_4_ = uVar407;
                          auVar750._28_4_ = uVar407;
                          auVar360 = vfmadd213ps_fma(auVar667,auVar393,
                                                     *(undefined1 (*) [32])
                                                      (pauVar332[1] + lVar272 * 4));
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0xc);
                          auVar239._4_4_ = uVar407;
                          auVar239._0_4_ = uVar407;
                          auVar239._8_4_ = uVar407;
                          auVar239._12_4_ = uVar407;
                          auVar239._16_4_ = uVar407;
                          auVar239._20_4_ = uVar407;
                          auVar239._24_4_ = uVar407;
                          auVar239._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar376,auVar239);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar644,auVar14);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar15,auVar691);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0xc);
                          auVar240._4_4_ = uVar407;
                          auVar240._0_4_ = uVar407;
                          auVar240._8_4_ = uVar407;
                          auVar240._12_4_ = uVar407;
                          auVar240._16_4_ = uVar407;
                          auVar240._20_4_ = uVar407;
                          auVar240._24_4_ = uVar407;
                          auVar240._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar387,auVar240);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar734,auVar16);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar17,auVar714);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0xc);
                          auVar241._4_4_ = uVar407;
                          auVar241._0_4_ = uVar407;
                          auVar241._8_4_ = uVar407;
                          auVar241._12_4_ = uVar407;
                          auVar241._16_4_ = uVar407;
                          auVar241._20_4_ = uVar407;
                          auVar241._24_4_ = uVar407;
                          auVar241._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar13,auVar241);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar750,auVar389);
                          *(undefined1 (*) [32])(pauVar332[1] + lVar272 * 4) = ZEXT1632(auVar360);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x18);
                          auVar668._4_4_ = uVar407;
                          auVar668._0_4_ = uVar407;
                          auVar668._8_4_ = uVar407;
                          auVar668._12_4_ = uVar407;
                          auVar668._16_4_ = uVar407;
                          auVar668._20_4_ = uVar407;
                          auVar668._24_4_ = uVar407;
                          auVar668._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x18);
                          auVar692._4_4_ = uVar407;
                          auVar692._0_4_ = uVar407;
                          auVar692._8_4_ = uVar407;
                          auVar692._12_4_ = uVar407;
                          auVar692._16_4_ = uVar407;
                          auVar692._20_4_ = uVar407;
                          auVar692._24_4_ = uVar407;
                          auVar692._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x18);
                          auVar715._4_4_ = uVar407;
                          auVar715._0_4_ = uVar407;
                          auVar715._8_4_ = uVar407;
                          auVar715._12_4_ = uVar407;
                          auVar715._16_4_ = uVar407;
                          auVar715._20_4_ = uVar407;
                          auVar715._24_4_ = uVar407;
                          auVar715._28_4_ = uVar407;
                          auVar360 = vfmadd213ps_fma(auVar644,auVar393,
                                                     *(undefined1 (*) [32])
                                                      (pauVar332[2] + lVar272 * 4));
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x14);
                          auVar242._4_4_ = uVar407;
                          auVar242._0_4_ = uVar407;
                          auVar242._8_4_ = uVar407;
                          auVar242._12_4_ = uVar407;
                          auVar242._16_4_ = uVar407;
                          auVar242._20_4_ = uVar407;
                          auVar242._24_4_ = uVar407;
                          auVar242._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar376,auVar242);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar668,auVar14);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar15,auVar734);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x14);
                          auVar243._4_4_ = uVar407;
                          auVar243._0_4_ = uVar407;
                          auVar243._8_4_ = uVar407;
                          auVar243._12_4_ = uVar407;
                          auVar243._16_4_ = uVar407;
                          auVar243._20_4_ = uVar407;
                          auVar243._24_4_ = uVar407;
                          auVar243._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar387,auVar243);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar692,auVar16);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar17,auVar750);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x14);
                          auVar244._4_4_ = uVar407;
                          auVar244._0_4_ = uVar407;
                          auVar244._8_4_ = uVar407;
                          auVar244._12_4_ = uVar407;
                          auVar244._16_4_ = uVar407;
                          auVar244._20_4_ = uVar407;
                          auVar244._24_4_ = uVar407;
                          auVar244._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar13,auVar244);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar715,auVar389);
                          *(undefined1 (*) [32])(pauVar332[2] + lVar272 * 4) = ZEXT1632(auVar360);
                          auVar360 = vfmadd213ps_fma(auVar668,auVar393,
                                                     *(undefined1 (*) [32])
                                                      (pauVar332[3] + lVar272 * 4));
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x1c);
                          auVar245._4_4_ = uVar407;
                          auVar245._0_4_ = uVar407;
                          auVar245._8_4_ = uVar407;
                          auVar245._12_4_ = uVar407;
                          auVar245._16_4_ = uVar407;
                          auVar245._20_4_ = uVar407;
                          auVar245._24_4_ = uVar407;
                          auVar245._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar376,auVar245);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x20);
                          auVar246._4_4_ = uVar407;
                          auVar246._0_4_ = uVar407;
                          auVar246._8_4_ = uVar407;
                          auVar246._12_4_ = uVar407;
                          auVar246._16_4_ = uVar407;
                          auVar246._20_4_ = uVar407;
                          auVar246._24_4_ = uVar407;
                          auVar246._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar14,auVar246);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar15,auVar692);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x1c);
                          auVar247._4_4_ = uVar407;
                          auVar247._0_4_ = uVar407;
                          auVar247._8_4_ = uVar407;
                          auVar247._12_4_ = uVar407;
                          auVar247._16_4_ = uVar407;
                          auVar247._20_4_ = uVar407;
                          auVar247._24_4_ = uVar407;
                          auVar247._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar387,auVar247);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x20);
                          auVar248._4_4_ = uVar407;
                          auVar248._0_4_ = uVar407;
                          auVar248._8_4_ = uVar407;
                          auVar248._12_4_ = uVar407;
                          auVar248._16_4_ = uVar407;
                          auVar248._20_4_ = uVar407;
                          auVar248._24_4_ = uVar407;
                          auVar248._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar16,auVar248);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar17,auVar715);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x1c);
                          auVar249._4_4_ = uVar407;
                          auVar249._0_4_ = uVar407;
                          auVar249._8_4_ = uVar407;
                          auVar249._12_4_ = uVar407;
                          auVar249._16_4_ = uVar407;
                          auVar249._20_4_ = uVar407;
                          auVar249._24_4_ = uVar407;
                          auVar249._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar13,auVar249);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x20);
                          auVar250._4_4_ = uVar407;
                          auVar250._0_4_ = uVar407;
                          auVar250._8_4_ = uVar407;
                          auVar250._12_4_ = uVar407;
                          auVar250._16_4_ = uVar407;
                          auVar250._20_4_ = uVar407;
                          auVar250._24_4_ = uVar407;
                          auVar250._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar389,auVar250);
                          *(undefined1 (*) [32])(pauVar332[3] + lVar272 * 4) = auVar388;
                          pauVar322 = pauVar322 + 4;
                          lVar272 = lVar272 + 0x20;
                          pvVar312 = (void *)((long)pvVar312 + 0x20);
                          pvVar344 = (void *)((long)pvVar344 + 0x20);
                          pvVar305 = (void *)((long)pvVar305 + 0x20);
                        }
                        for (; iVar343 + 1 < iVar260; iVar343 = iVar343 + 2) {
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272);
                          auVar645._4_4_ = uVar407;
                          auVar645._0_4_ = uVar407;
                          auVar645._8_4_ = uVar407;
                          auVar645._12_4_ = uVar407;
                          auVar645._16_4_ = uVar407;
                          auVar645._20_4_ = uVar407;
                          auVar645._24_4_ = uVar407;
                          auVar645._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 8);
                          auVar669._4_4_ = uVar407;
                          auVar669._0_4_ = uVar407;
                          auVar669._8_4_ = uVar407;
                          auVar669._12_4_ = uVar407;
                          auVar669._16_4_ = uVar407;
                          auVar669._20_4_ = uVar407;
                          auVar669._24_4_ = uVar407;
                          auVar669._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 8);
                          auVar693._4_4_ = uVar407;
                          auVar693._0_4_ = uVar407;
                          auVar693._8_4_ = uVar407;
                          auVar693._12_4_ = uVar407;
                          auVar693._16_4_ = uVar407;
                          auVar693._20_4_ = uVar407;
                          auVar693._24_4_ = uVar407;
                          auVar693._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 8);
                          auVar716._4_4_ = uVar407;
                          auVar716._0_4_ = uVar407;
                          auVar716._8_4_ = uVar407;
                          auVar716._12_4_ = uVar407;
                          auVar716._16_4_ = uVar407;
                          auVar716._20_4_ = uVar407;
                          auVar716._24_4_ = uVar407;
                          auVar716._28_4_ = uVar407;
                          auVar360 = vfmadd213ps_fma(auVar645,auVar393,
                                                     *(undefined1 (*) [32])
                                                      (*pauVar332 + lVar272 * 4));
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 4);
                          auVar223._4_4_ = uVar407;
                          auVar223._0_4_ = uVar407;
                          auVar223._8_4_ = uVar407;
                          auVar223._12_4_ = uVar407;
                          auVar223._16_4_ = uVar407;
                          auVar223._20_4_ = uVar407;
                          auVar223._24_4_ = uVar407;
                          auVar223._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar376,auVar223);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar669,auVar14);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272);
                          auVar224._4_4_ = uVar407;
                          auVar224._0_4_ = uVar407;
                          auVar224._8_4_ = uVar407;
                          auVar224._12_4_ = uVar407;
                          auVar224._16_4_ = uVar407;
                          auVar224._20_4_ = uVar407;
                          auVar224._24_4_ = uVar407;
                          auVar224._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar15,auVar224);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 4);
                          auVar225._4_4_ = uVar407;
                          auVar225._0_4_ = uVar407;
                          auVar225._8_4_ = uVar407;
                          auVar225._12_4_ = uVar407;
                          auVar225._16_4_ = uVar407;
                          auVar225._20_4_ = uVar407;
                          auVar225._24_4_ = uVar407;
                          auVar225._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar387,auVar225);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar693,auVar16);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272);
                          auVar226._4_4_ = uVar407;
                          auVar226._0_4_ = uVar407;
                          auVar226._8_4_ = uVar407;
                          auVar226._12_4_ = uVar407;
                          auVar226._16_4_ = uVar407;
                          auVar226._20_4_ = uVar407;
                          auVar226._24_4_ = uVar407;
                          auVar226._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar17,auVar226);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 4);
                          auVar227._4_4_ = uVar407;
                          auVar227._0_4_ = uVar407;
                          auVar227._8_4_ = uVar407;
                          auVar227._12_4_ = uVar407;
                          auVar227._16_4_ = uVar407;
                          auVar227._20_4_ = uVar407;
                          auVar227._24_4_ = uVar407;
                          auVar227._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar13,auVar227);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar716,auVar389);
                          *(undefined1 (*) [32])(*pauVar332 + lVar272 * 4) = ZEXT1632(auVar360);
                          auVar360 = vfmadd213ps_fma(auVar669,auVar393,
                                                     *(undefined1 (*) [32])
                                                      (pauVar332[1] + lVar272 * 4));
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0xc);
                          auVar228._4_4_ = uVar407;
                          auVar228._0_4_ = uVar407;
                          auVar228._8_4_ = uVar407;
                          auVar228._12_4_ = uVar407;
                          auVar228._16_4_ = uVar407;
                          auVar228._20_4_ = uVar407;
                          auVar228._24_4_ = uVar407;
                          auVar228._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar376,auVar228);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x10);
                          auVar229._4_4_ = uVar407;
                          auVar229._0_4_ = uVar407;
                          auVar229._8_4_ = uVar407;
                          auVar229._12_4_ = uVar407;
                          auVar229._16_4_ = uVar407;
                          auVar229._20_4_ = uVar407;
                          auVar229._24_4_ = uVar407;
                          auVar229._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar14,auVar229);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar15,auVar693);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0xc);
                          auVar230._4_4_ = uVar407;
                          auVar230._0_4_ = uVar407;
                          auVar230._8_4_ = uVar407;
                          auVar230._12_4_ = uVar407;
                          auVar230._16_4_ = uVar407;
                          auVar230._20_4_ = uVar407;
                          auVar230._24_4_ = uVar407;
                          auVar230._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar387,auVar230);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x10);
                          auVar231._4_4_ = uVar407;
                          auVar231._0_4_ = uVar407;
                          auVar231._8_4_ = uVar407;
                          auVar231._12_4_ = uVar407;
                          auVar231._16_4_ = uVar407;
                          auVar231._20_4_ = uVar407;
                          auVar231._24_4_ = uVar407;
                          auVar231._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar16,auVar231);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar17,auVar716);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0xc);
                          auVar232._4_4_ = uVar407;
                          auVar232._0_4_ = uVar407;
                          auVar232._8_4_ = uVar407;
                          auVar232._12_4_ = uVar407;
                          auVar232._16_4_ = uVar407;
                          auVar232._20_4_ = uVar407;
                          auVar232._24_4_ = uVar407;
                          auVar232._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar13,auVar232);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x10);
                          auVar233._4_4_ = uVar407;
                          auVar233._0_4_ = uVar407;
                          auVar233._8_4_ = uVar407;
                          auVar233._12_4_ = uVar407;
                          auVar233._16_4_ = uVar407;
                          auVar233._20_4_ = uVar407;
                          auVar233._24_4_ = uVar407;
                          auVar233._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar389,auVar233);
                          *(undefined1 (*) [32])(pauVar332[1] + lVar272 * 4) = auVar388;
                          pauVar322 = pauVar322 + 2;
                          lVar272 = lVar272 + 0x10;
                          pvVar312 = (void *)((long)pvVar312 + 0x10);
                          pvVar344 = (void *)((long)pvVar344 + 0x10);
                          pvVar305 = (void *)((long)pvVar305 + 0x10);
                        }
                        puVar335 = (undefined4 *)((long)pvVar313 + lVar272);
                        puVar293 = (undefined4 *)((long)pvVar345 + lVar272);
                        puVar341 = (undefined4 *)((long)pvVar347 + lVar272);
                        pvVar313 = pvVar312;
                        pvVar347 = pvVar305;
                        pvVar345 = pvVar344;
                        for (; iVar343 < iVar260; iVar343 = iVar343 + 1) {
                          uVar407 = *puVar335;
                          auVar646._4_4_ = uVar407;
                          auVar646._0_4_ = uVar407;
                          auVar646._8_4_ = uVar407;
                          auVar646._12_4_ = uVar407;
                          auVar646._16_4_ = uVar407;
                          auVar646._20_4_ = uVar407;
                          auVar646._24_4_ = uVar407;
                          auVar646._28_4_ = uVar407;
                          auVar360 = vfmadd213ps_fma(auVar646,auVar393,*pauVar322);
                          uVar407 = puVar335[1];
                          auVar215._4_4_ = uVar407;
                          auVar215._0_4_ = uVar407;
                          auVar215._8_4_ = uVar407;
                          auVar215._12_4_ = uVar407;
                          auVar215._16_4_ = uVar407;
                          auVar215._20_4_ = uVar407;
                          auVar215._24_4_ = uVar407;
                          auVar215._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar376,auVar215);
                          uVar407 = puVar335[2];
                          auVar216._4_4_ = uVar407;
                          auVar216._0_4_ = uVar407;
                          auVar216._8_4_ = uVar407;
                          auVar216._12_4_ = uVar407;
                          auVar216._16_4_ = uVar407;
                          auVar216._20_4_ = uVar407;
                          auVar216._24_4_ = uVar407;
                          auVar216._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar14,auVar216);
                          uVar407 = *puVar293;
                          auVar217._4_4_ = uVar407;
                          auVar217._0_4_ = uVar407;
                          auVar217._8_4_ = uVar407;
                          auVar217._12_4_ = uVar407;
                          auVar217._16_4_ = uVar407;
                          auVar217._20_4_ = uVar407;
                          auVar217._24_4_ = uVar407;
                          auVar217._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar15,auVar217);
                          uVar407 = puVar293[1];
                          auVar218._4_4_ = uVar407;
                          auVar218._0_4_ = uVar407;
                          auVar218._8_4_ = uVar407;
                          auVar218._12_4_ = uVar407;
                          auVar218._16_4_ = uVar407;
                          auVar218._20_4_ = uVar407;
                          auVar218._24_4_ = uVar407;
                          auVar218._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar387,auVar218);
                          puVar335 = puVar335 + 2;
                          uVar407 = puVar293[2];
                          auVar219._4_4_ = uVar407;
                          auVar219._0_4_ = uVar407;
                          auVar219._8_4_ = uVar407;
                          auVar219._12_4_ = uVar407;
                          auVar219._16_4_ = uVar407;
                          auVar219._20_4_ = uVar407;
                          auVar219._24_4_ = uVar407;
                          auVar219._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar16,auVar219);
                          puVar293 = puVar293 + 2;
                          uVar407 = *puVar341;
                          auVar220._4_4_ = uVar407;
                          auVar220._0_4_ = uVar407;
                          auVar220._8_4_ = uVar407;
                          auVar220._12_4_ = uVar407;
                          auVar220._16_4_ = uVar407;
                          auVar220._20_4_ = uVar407;
                          auVar220._24_4_ = uVar407;
                          auVar220._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar17,auVar220);
                          uVar407 = puVar341[1];
                          auVar221._4_4_ = uVar407;
                          auVar221._0_4_ = uVar407;
                          auVar221._8_4_ = uVar407;
                          auVar221._12_4_ = uVar407;
                          auVar221._16_4_ = uVar407;
                          auVar221._20_4_ = uVar407;
                          auVar221._24_4_ = uVar407;
                          auVar221._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar13,auVar221);
                          uVar407 = puVar341[2];
                          auVar222._4_4_ = uVar407;
                          auVar222._0_4_ = uVar407;
                          auVar222._8_4_ = uVar407;
                          auVar222._12_4_ = uVar407;
                          auVar222._16_4_ = uVar407;
                          auVar222._20_4_ = uVar407;
                          auVar222._24_4_ = uVar407;
                          auVar222._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar389,auVar222);
                          puVar341 = puVar341 + 2;
                          *pauVar322 = auVar388;
                          pauVar322 = pauVar322 + 1;
                          pvVar313 = (void *)((long)pvVar313 + 8);
                          pvVar345 = (void *)((long)pvVar345 + 8);
                          pvVar347 = (void *)((long)pvVar347 + 8);
                        }
                        pauVar332 = pauVar322;
                      }
                      pauVar306 = pauVar306 + 9;
                    }
                  }
                }
                else {
                  iVar260 = top_blob->c;
                  uVar330 = 0;
                  uVar291 = top_blob->h;
                  if (top_blob->h < 1) {
                    uVar291 = uVar330;
                  }
                  uVar336 = local_d70.c;
                  if (local_d70.c < 1) {
                    uVar336 = uVar330;
                  }
                  iVar342 = top_blob->w;
                  uVar338 = iVar260 >> 1;
                  if (iVar260 >> 1 < 1) {
                    uVar338 = uVar330;
                  }
                  pvVar348 = (this->super_Convolution).bias_data.data;
                  for (uVar278 = 0; uVar278 != uVar338; uVar278 = uVar278 + 1) {
                    uVar268 = (long)top_blob->h * (long)top_blob->w;
                    uVar281 = top_blob->elemsize;
                    uVar318 = (uVar281 * uVar268 + 0xf & 0xfffffffffffffff0) / uVar281;
                    if (top_blob->dims == 4) {
                      uVar318 = uVar268;
                    }
                    lVar271 = uVar278 * 2 + 1;
                    if (pvVar348 == (void *)0x0) {
                      auVar393 = ZEXT1632(ZEXT816(0) << 0x40);
                      uVar408 = 0;
                      uVar418 = 0;
                      uVar419 = 0;
                      uVar420 = 0;
                    }
                    else {
                      auVar393 = *(undefined1 (*) [32])((long)pvVar348 + uVar278 * 0x40);
                      puVar310 = (undefined8 *)((long)pvVar348 + lVar271 * 0x20);
                      uVar408 = *puVar310;
                      uVar418 = puVar310[1];
                      uVar419 = puVar310[2];
                      uVar420 = puVar310[3];
                    }
                    lVar272 = uVar281 * top_blob->cstep;
                    pauVar325 = (undefined1 (*) [32])(lVar272 * uVar278 * 2 + (long)top_blob->data);
                    puVar310 = (undefined8 *)(lVar272 * lVar271 + (long)top_blob->data);
                    iVar328 = (int)uVar318 * top_blob->d;
                    pauVar306 = pauVar325;
                    iVar261 = iVar328;
                    if (iVar328 < 1) {
                      iVar328 = 0;
                      iVar261 = iVar328;
                    }
                    while (bVar349 = iVar328 != 0, iVar328 = iVar328 + -1, puVar283 = puVar310,
                          bVar349) {
                      *pauVar306 = auVar393;
                      pauVar306 = pauVar306 + 1;
                    }
                    while (bVar349 = iVar261 != 0, iVar261 = iVar261 + -1, bVar349) {
                      *puVar283 = uVar408;
                      puVar283[1] = uVar418;
                      puVar283[2] = uVar419;
                      puVar283[3] = uVar420;
                      puVar283 = puVar283 + 4;
                    }
                    pvVar345 = (this->weight_data_tm).data;
                    lVar272 = (this->weight_data_tm).elemsize * (this->weight_data_tm).cstep;
                    pauVar306 = (undefined1 (*) [32])(uVar278 * 2 * lVar272 + (long)pvVar345);
                    pauVar332 = (undefined1 (*) [32])(lVar272 * lVar271 + (long)pvVar345);
                    for (uVar281 = 0; uVar281 != uVar336; uVar281 = uVar281 + 1) {
                      pvVar313 = (void *)(local_d70.cstep * uVar281 * local_d70.elemsize +
                                         (long)local_d70.data);
                      pvVar345 = (void *)((long)pvVar313 + (long)local_d70.w * local_d70.elemsize);
                      pvVar347 = (void *)((long)pvVar313 +
                                         (long)local_d70.w * local_d70.elemsize * 2);
                      auVar393 = *pauVar306;
                      auVar376 = pauVar306[1];
                      auVar14 = pauVar306[2];
                      auVar15 = pauVar306[3];
                      auVar387 = pauVar306[4];
                      auVar16 = pauVar306[5];
                      auVar17 = pauVar306[6];
                      auVar13 = pauVar306[7];
                      auVar389 = pauVar306[8];
                      auVar388 = *pauVar332;
                      auVar390 = pauVar332[1];
                      auVar391 = pauVar332[2];
                      auVar392 = pauVar332[3];
                      auVar8 = pauVar332[4];
                      auVar9 = pauVar332[5];
                      auVar10 = pauVar332[6];
                      auVar11 = pauVar332[7];
                      auVar12 = pauVar332[8];
                      puVar283 = puVar310;
                      pauVar322 = pauVar325;
                      for (uVar330 = 0; uVar330 != uVar291; uVar330 = uVar330 + 1) {
                        lVar271 = 0;
                        pauVar269 = pauVar322;
                        puVar309 = puVar283;
                        for (iVar261 = 0; iVar261 + 3 < iVar342; iVar261 = iVar261 + 4) {
                          auVar377 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar271)));
                          auVar378 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar271 + 4)));
                          auVar379 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar271 + 8)));
                          auVar380 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar271)));
                          auVar381 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar271 + 4)));
                          auVar382 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar271 + 8)));
                          auVar383 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar271)));
                          auVar384 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar271 + 4)));
                          auVar385 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar271 + 8)));
                          auVar386 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [32])
                                                 ((long)*pauVar322 + lVar271 * 8),auVar377,auVar393)
                          ;
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar378,auVar376);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar379,auVar14);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar380,auVar15);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar381,auVar387);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar382,auVar16);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar383,auVar17);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar384,auVar13);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar385,auVar389);
                          auVar377 = vfmadd213ps_avx512vl
                                               (auVar377,auVar388,
                                                *(undefined1 (*) [32])(puVar283 + lVar271));
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar378,auVar390);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar379,auVar391);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar392,auVar380);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar381,auVar8);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar382,auVar9);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar10,auVar383);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar384,auVar11);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar385,auVar12);
                          *(undefined1 (*) [32])((long)*pauVar322 + lVar271 * 8) = auVar386;
                          *(undefined1 (*) [32])(puVar283 + lVar271) = auVar377;
                          auVar377 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar271 + 0xc)));
                          auVar380 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar271 + 0xc)));
                          auVar383 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar271 + 0xc)));
                          auVar386 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [32])(pauVar322[1] + lVar271 * 8),
                                                auVar378,auVar393);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar379,auVar376);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar377,auVar14);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar381,auVar15);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar382,auVar387);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar380,auVar16);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar384,auVar17);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar385,auVar13);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar383,auVar389);
                          auVar378 = vfmadd213ps_avx512vl
                                               (auVar378,auVar388,
                                                *(undefined1 (*) [32])(puVar283 + lVar271 + 4));
                          auVar378 = vfmadd231ps_avx512vl(auVar378,auVar379,auVar390);
                          auVar378 = vfmadd231ps_avx512vl(auVar378,auVar377,auVar391);
                          auVar378 = vfmadd231ps_avx512vl(auVar378,auVar392,auVar381);
                          auVar378 = vfmadd231ps_avx512vl(auVar378,auVar382,auVar8);
                          auVar378 = vfmadd231ps_avx512vl(auVar378,auVar380,auVar9);
                          auVar378 = vfmadd231ps_avx512vl(auVar378,auVar10,auVar384);
                          auVar378 = vfmadd231ps_avx512vl(auVar378,auVar385,auVar11);
                          auVar378 = vfmadd231ps_avx512vl(auVar378,auVar383,auVar12);
                          *(undefined1 (*) [32])(pauVar322[1] + lVar271 * 8) = auVar386;
                          *(undefined1 (*) [32])(puVar283 + lVar271 + 4) = auVar378;
                          auVar378 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar271 + 0x10)))
                          ;
                          auVar381 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar271 + 0x10)))
                          ;
                          auVar384 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar271 + 0x10)))
                          ;
                          auVar386 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [32])(pauVar322[2] + lVar271 * 8),
                                                auVar379,auVar393);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar377,auVar376);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar378,auVar14);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar382,auVar15);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar380,auVar387);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar381,auVar16);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar385,auVar17);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar383,auVar13);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar384,auVar389);
                          auVar379 = vfmadd213ps_avx512vl
                                               (auVar379,auVar388,
                                                *(undefined1 (*) [32])(puVar283 + lVar271 + 8));
                          auVar379 = vfmadd231ps_avx512vl(auVar379,auVar377,auVar390);
                          auVar379 = vfmadd231ps_avx512vl(auVar379,auVar378,auVar391);
                          auVar379 = vfmadd231ps_avx512vl(auVar379,auVar392,auVar382);
                          auVar379 = vfmadd231ps_avx512vl(auVar379,auVar380,auVar8);
                          auVar379 = vfmadd231ps_avx512vl(auVar379,auVar381,auVar9);
                          auVar379 = vfmadd231ps_avx512vl(auVar379,auVar10,auVar385);
                          auVar379 = vfmadd231ps_avx512vl(auVar379,auVar383,auVar11);
                          auVar379 = vfmadd231ps_avx512vl(auVar379,auVar384,auVar12);
                          *(undefined1 (*) [32])(pauVar322[2] + lVar271 * 8) = auVar386;
                          *(undefined1 (*) [32])(puVar283 + lVar271 + 8) = auVar379;
                          auVar379 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar271 + 0x14)))
                          ;
                          auVar382 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar271 + 0x14)))
                          ;
                          auVar385 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar271 + 0x14)))
                          ;
                          auVar386 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [32])(pauVar322[3] + lVar271 * 8),
                                                auVar377,auVar393);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar378,auVar376);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar379,auVar14);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar380,auVar15);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar381,auVar387);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar382,auVar16);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar383,auVar17);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar384,auVar13);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar385,auVar389);
                          auVar377 = vfmadd213ps_avx512vl
                                               (auVar377,auVar388,
                                                *(undefined1 (*) [32])(puVar283 + lVar271 + 0xc));
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar390,auVar378);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar391,auVar379);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar392,auVar380);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar8,auVar381);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar9,auVar382);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar10,auVar383);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar11,auVar384);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar12,auVar385);
                          *(undefined1 (*) [32])(pauVar322[3] + lVar271 * 8) = auVar386;
                          *(undefined1 (*) [32])(puVar283 + lVar271 + 0xc) = auVar377;
                          pauVar269 = pauVar269 + 4;
                          puVar309 = puVar309 + 0x10;
                          lVar271 = lVar271 + 0x10;
                        }
                        for (; iVar261 + 1 < iVar342; iVar261 = iVar261 + 2) {
                          auVar377 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar271)));
                          auVar378 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar271 + 4)));
                          auVar379 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar271 + 8)));
                          auVar380 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar271)));
                          auVar381 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar271 + 4)));
                          auVar382 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar271 + 8)));
                          auVar383 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar271)));
                          auVar384 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar271 + 4)));
                          auVar385 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar271 + 8)));
                          auVar386 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [32])
                                                 ((long)*pauVar322 + lVar271 * 8),auVar377,auVar393)
                          ;
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar378,auVar376);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar379,auVar14);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar380,auVar15);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar381,auVar387);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar382,auVar16);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar383,auVar17);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar384,auVar13);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar385,auVar389);
                          auVar377 = vfmadd213ps_avx512vl
                                               (auVar377,auVar388,
                                                *(undefined1 (*) [32])(puVar283 + lVar271));
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar378,auVar390);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar379,auVar391);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar392,auVar380);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar381,auVar8);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar382,auVar9);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar10,auVar383);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar384,auVar11);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar385,auVar12);
                          *(undefined1 (*) [32])((long)*pauVar322 + lVar271 * 8) = auVar386;
                          *(undefined1 (*) [32])(puVar283 + lVar271) = auVar377;
                          auVar377 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar271 + 0xc)));
                          auVar380 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar271 + 0xc)));
                          auVar383 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar271 + 0xc)));
                          auVar386 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [32])(pauVar322[1] + lVar271 * 8),
                                                auVar378,auVar393);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar379,auVar376);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar377,auVar14);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar381,auVar15);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar382,auVar387);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar380,auVar16);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar384,auVar17);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar385,auVar13);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar383,auVar389);
                          auVar378 = vfmadd213ps_avx512vl
                                               (auVar378,auVar388,
                                                *(undefined1 (*) [32])(puVar283 + lVar271 + 4));
                          auVar378 = vfmadd231ps_avx512vl(auVar378,auVar390,auVar379);
                          auVar377 = vfmadd231ps_avx512vl(auVar378,auVar391,auVar377);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar392,auVar381);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar8,auVar382);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar9,auVar380);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar10,auVar384);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar11,auVar385);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar12,auVar383);
                          *(undefined1 (*) [32])(pauVar322[1] + lVar271 * 8) = auVar386;
                          *(undefined1 (*) [32])(puVar283 + lVar271 + 4) = auVar377;
                          pauVar269 = pauVar269 + 2;
                          puVar309 = puVar309 + 8;
                          lVar271 = lVar271 + 8;
                        }
                        for (; iVar261 < iVar342; iVar261 = iVar261 + 1) {
                          auVar377 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar271)));
                          auVar378 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar271 + 4)));
                          auVar379 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar271 + 8)));
                          auVar380 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar271)));
                          auVar381 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar271 + 4)));
                          auVar382 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar271 + 8)));
                          auVar383 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar271)));
                          auVar384 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar271 + 4)));
                          auVar385 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar271 + 8)));
                          auVar386 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [32])
                                                 ((long)*pauVar322 + lVar271 * 8),auVar377,auVar393)
                          ;
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar378,auVar376);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar379,auVar14);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar380,auVar15);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar381,auVar387);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar382,auVar16);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar383,auVar17);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar384,auVar13);
                          auVar386 = vfmadd231ps_avx512vl(auVar386,auVar385,auVar389);
                          auVar377 = vfmadd213ps_avx512vl
                                               (auVar377,auVar388,
                                                *(undefined1 (*) [32])(puVar283 + lVar271));
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar390,auVar378);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar391,auVar379);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar392,auVar380);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar8,auVar381);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar9,auVar382);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar10,auVar383);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar11,auVar384);
                          auVar377 = vfmadd231ps_avx512vl(auVar377,auVar12,auVar385);
                          *(undefined1 (*) [32])((long)*pauVar322 + lVar271 * 8) = auVar386;
                          *(undefined1 (*) [32])(puVar283 + lVar271) = auVar377;
                          pauVar269 = pauVar269 + 1;
                          puVar309 = puVar309 + 4;
                          lVar271 = lVar271 + 4;
                        }
                        pvVar313 = (void *)((long)pvVar313 + lVar271 + 8);
                        pvVar345 = (void *)((long)pvVar345 + lVar271 + 8);
                        pvVar347 = (void *)((long)pvVar347 + lVar271 + 8);
                        puVar283 = puVar309;
                        pauVar322 = pauVar269;
                      }
                      pauVar306 = pauVar306 + 9;
                      pauVar332 = pauVar332 + 9;
                    }
                  }
                  for (uVar278 = (long)iVar260 & 0xfffffffffffffffe; (long)uVar278 < (long)iVar260;
                      uVar278 = uVar278 + 1) {
                    uVar268 = (long)top_blob->h * (long)top_blob->w;
                    uVar281 = top_blob->elemsize;
                    uVar318 = (uVar281 * uVar268 + 0xf & 0xfffffffffffffff0) / uVar281;
                    if (top_blob->dims == 4) {
                      uVar318 = uVar268;
                    }
                    if (pvVar348 == (void *)0x0) {
                      uVar408 = 0;
                      uVar418 = 0;
                      uVar419 = 0;
                      uVar420 = 0;
                    }
                    else {
                      puVar310 = (undefined8 *)((long)pvVar348 + uVar278 * 0x20);
                      uVar408 = *puVar310;
                      uVar418 = puVar310[1];
                      uVar419 = puVar310[2];
                      uVar420 = puVar310[3];
                    }
                    puVar283 = (undefined8 *)
                               (top_blob->cstep * uVar278 * uVar281 + (long)top_blob->data);
                    iVar261 = (int)uVar318 * top_blob->d;
                    puVar310 = puVar283;
                    if (iVar261 < 1) {
                      iVar261 = 0;
                    }
                    while (bVar349 = iVar261 != 0, iVar261 = iVar261 + -1, bVar349) {
                      *puVar310 = uVar408;
                      puVar310[1] = uVar418;
                      puVar310[2] = uVar419;
                      puVar310[3] = uVar420;
                      puVar310 = puVar310 + 4;
                    }
                    pauVar306 = (undefined1 (*) [32])
                                ((this->weight_data_tm).cstep * uVar278 *
                                 (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data
                                );
                    for (uVar281 = 0; uVar281 != uVar336; uVar281 = uVar281 + 1) {
                      pvVar313 = (void *)(local_d70.cstep * uVar281 * local_d70.elemsize +
                                         (long)local_d70.data);
                      pvVar345 = (void *)((long)pvVar313 + (long)local_d70.w * local_d70.elemsize);
                      pvVar347 = (void *)((long)pvVar313 +
                                         (long)local_d70.w * local_d70.elemsize * 2);
                      auVar393 = *pauVar306;
                      auVar376 = pauVar306[1];
                      auVar14 = pauVar306[2];
                      auVar15 = pauVar306[3];
                      auVar387 = pauVar306[4];
                      auVar16 = pauVar306[5];
                      auVar17 = pauVar306[6];
                      auVar13 = pauVar306[7];
                      auVar389 = pauVar306[8];
                      puVar310 = puVar283;
                      for (uVar330 = 0; uVar330 != uVar291; uVar330 = uVar330 + 1) {
                        lVar271 = 0;
                        puVar309 = puVar310;
                        for (iVar261 = 0; iVar261 + 3 < iVar342; iVar261 = iVar261 + 4) {
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271);
                          auVar684._4_4_ = uVar407;
                          auVar684._0_4_ = uVar407;
                          auVar684._8_4_ = uVar407;
                          auVar684._12_4_ = uVar407;
                          auVar684._16_4_ = uVar407;
                          auVar684._20_4_ = uVar407;
                          auVar684._24_4_ = uVar407;
                          auVar684._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 4);
                          auVar708._4_4_ = uVar407;
                          auVar708._0_4_ = uVar407;
                          auVar708._8_4_ = uVar407;
                          auVar708._12_4_ = uVar407;
                          auVar708._16_4_ = uVar407;
                          auVar708._20_4_ = uVar407;
                          auVar708._24_4_ = uVar407;
                          auVar708._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 8);
                          auVar636._4_4_ = uVar407;
                          auVar636._0_4_ = uVar407;
                          auVar636._8_4_ = uVar407;
                          auVar636._12_4_ = uVar407;
                          auVar636._16_4_ = uVar407;
                          auVar636._20_4_ = uVar407;
                          auVar636._24_4_ = uVar407;
                          auVar636._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 4);
                          auVar728._4_4_ = uVar407;
                          auVar728._0_4_ = uVar407;
                          auVar728._8_4_ = uVar407;
                          auVar728._12_4_ = uVar407;
                          auVar728._16_4_ = uVar407;
                          auVar728._20_4_ = uVar407;
                          auVar728._24_4_ = uVar407;
                          auVar728._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 8);
                          auVar745._4_4_ = uVar407;
                          auVar745._0_4_ = uVar407;
                          auVar745._8_4_ = uVar407;
                          auVar745._12_4_ = uVar407;
                          auVar745._16_4_ = uVar407;
                          auVar745._20_4_ = uVar407;
                          auVar745._24_4_ = uVar407;
                          auVar745._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 4);
                          auVar757._4_4_ = uVar407;
                          auVar757._0_4_ = uVar407;
                          auVar757._8_4_ = uVar407;
                          auVar757._12_4_ = uVar407;
                          auVar757._16_4_ = uVar407;
                          auVar757._20_4_ = uVar407;
                          auVar757._24_4_ = uVar407;
                          auVar757._28_4_ = uVar407;
                          auVar388 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar271 + 8)));
                          auVar360 = vfmadd213ps_fma(auVar684,auVar393,
                                                     *(undefined1 (*) [32])(puVar310 + lVar271));
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar708,auVar376);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar636,auVar14);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271);
                          auVar168._4_4_ = uVar407;
                          auVar168._0_4_ = uVar407;
                          auVar168._8_4_ = uVar407;
                          auVar168._12_4_ = uVar407;
                          auVar168._16_4_ = uVar407;
                          auVar168._20_4_ = uVar407;
                          auVar168._24_4_ = uVar407;
                          auVar168._28_4_ = uVar407;
                          auVar390 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar15,auVar168);
                          auVar360 = vfmadd231ps_fma(auVar390,auVar728,auVar387);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar745,auVar16);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271);
                          auVar169._4_4_ = uVar407;
                          auVar169._0_4_ = uVar407;
                          auVar169._8_4_ = uVar407;
                          auVar169._12_4_ = uVar407;
                          auVar169._16_4_ = uVar407;
                          auVar169._20_4_ = uVar407;
                          auVar169._24_4_ = uVar407;
                          auVar169._28_4_ = uVar407;
                          auVar390 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar17,auVar169);
                          auVar360 = vfmadd231ps_fma(auVar390,auVar757,auVar13);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0xc);
                          auVar661._4_4_ = uVar407;
                          auVar661._0_4_ = uVar407;
                          auVar661._8_4_ = uVar407;
                          auVar661._12_4_ = uVar407;
                          auVar661._16_4_ = uVar407;
                          auVar661._20_4_ = uVar407;
                          auVar661._24_4_ = uVar407;
                          auVar661._28_4_ = uVar407;
                          auVar390 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar271 + 0xc)));
                          auVar391 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar271 + 0xc)));
                          auVar392 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar388,auVar389);
                          *(undefined1 (*) [32])(puVar310 + lVar271) = auVar392;
                          auVar360 = vfmadd213ps_fma(auVar708,auVar393,
                                                     *(undefined1 (*) [32])(puVar310 + lVar271 + 4))
                          ;
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar636,auVar376);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar661,auVar14);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar15,auVar728);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar745,auVar387);
                          auVar392 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar390,auVar16);
                          auVar360 = vfmadd231ps_fma(auVar392,auVar17,auVar757);
                          auVar392 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar388,auVar13);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x10);
                          auVar685._4_4_ = uVar407;
                          auVar685._0_4_ = uVar407;
                          auVar685._8_4_ = uVar407;
                          auVar685._12_4_ = uVar407;
                          auVar685._16_4_ = uVar407;
                          auVar685._20_4_ = uVar407;
                          auVar685._24_4_ = uVar407;
                          auVar685._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x10);
                          auVar729._4_4_ = uVar407;
                          auVar729._0_4_ = uVar407;
                          auVar729._8_4_ = uVar407;
                          auVar729._12_4_ = uVar407;
                          auVar729._16_4_ = uVar407;
                          auVar729._20_4_ = uVar407;
                          auVar729._24_4_ = uVar407;
                          auVar729._28_4_ = uVar407;
                          auVar392 = vfmadd231ps_avx512vl(auVar392,auVar391,auVar389);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x10);
                          auVar758._4_4_ = uVar407;
                          auVar758._0_4_ = uVar407;
                          auVar758._8_4_ = uVar407;
                          auVar758._12_4_ = uVar407;
                          auVar758._16_4_ = uVar407;
                          auVar758._20_4_ = uVar407;
                          auVar758._24_4_ = uVar407;
                          auVar758._28_4_ = uVar407;
                          *(undefined1 (*) [32])(puVar310 + lVar271 + 4) = auVar392;
                          auVar360 = vfmadd213ps_fma(auVar636,auVar393,
                                                     *(undefined1 (*) [32])(puVar310 + lVar271 + 8))
                          ;
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar661,auVar376);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar685,auVar14);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar15,auVar745);
                          auVar392 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar390,auVar387);
                          auVar360 = vfmadd231ps_fma(auVar392,auVar729,auVar16);
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar17,auVar388);
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar391,auVar13);
                          auVar421 = vfmadd231ps_fma(auVar388,auVar758,auVar389);
                          auVar360 = vfmadd213ps_fma(auVar661,auVar393,
                                                     *(undefined1 (*) [32])
                                                      (puVar310 + lVar271 + 0xc));
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar376,auVar685);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x14);
                          auVar170._4_4_ = uVar407;
                          auVar170._0_4_ = uVar407;
                          auVar170._8_4_ = uVar407;
                          auVar170._12_4_ = uVar407;
                          auVar170._16_4_ = uVar407;
                          auVar170._20_4_ = uVar407;
                          auVar170._24_4_ = uVar407;
                          auVar170._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar14,auVar170);
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar15,auVar390);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar387,auVar729);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x14);
                          auVar171._4_4_ = uVar407;
                          auVar171._0_4_ = uVar407;
                          auVar171._8_4_ = uVar407;
                          auVar171._12_4_ = uVar407;
                          auVar171._16_4_ = uVar407;
                          auVar171._20_4_ = uVar407;
                          auVar171._24_4_ = uVar407;
                          auVar171._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar16,auVar171);
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar17,auVar391);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar13,auVar758);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x14);
                          auVar172._4_4_ = uVar407;
                          auVar172._0_4_ = uVar407;
                          auVar172._8_4_ = uVar407;
                          auVar172._12_4_ = uVar407;
                          auVar172._16_4_ = uVar407;
                          auVar172._20_4_ = uVar407;
                          auVar172._24_4_ = uVar407;
                          auVar172._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar389,auVar172);
                          *(undefined1 (*) [32])(puVar310 + lVar271 + 8) = ZEXT1632(auVar421);
                          *(undefined1 (*) [32])(puVar310 + lVar271 + 0xc) = auVar388;
                          puVar309 = puVar309 + 0x10;
                          lVar271 = lVar271 + 0x10;
                        }
                        for (; iVar261 + 1 < iVar342; iVar261 = iVar261 + 2) {
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271);
                          auVar637._4_4_ = uVar407;
                          auVar637._0_4_ = uVar407;
                          auVar637._8_4_ = uVar407;
                          auVar637._12_4_ = uVar407;
                          auVar637._16_4_ = uVar407;
                          auVar637._20_4_ = uVar407;
                          auVar637._24_4_ = uVar407;
                          auVar637._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 4);
                          auVar662._4_4_ = uVar407;
                          auVar662._0_4_ = uVar407;
                          auVar662._8_4_ = uVar407;
                          auVar662._12_4_ = uVar407;
                          auVar662._16_4_ = uVar407;
                          auVar662._20_4_ = uVar407;
                          auVar662._24_4_ = uVar407;
                          auVar662._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 8);
                          auVar686._4_4_ = uVar407;
                          auVar686._0_4_ = uVar407;
                          auVar686._8_4_ = uVar407;
                          auVar686._12_4_ = uVar407;
                          auVar686._16_4_ = uVar407;
                          auVar686._20_4_ = uVar407;
                          auVar686._24_4_ = uVar407;
                          auVar686._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 4);
                          auVar709._4_4_ = uVar407;
                          auVar709._0_4_ = uVar407;
                          auVar709._8_4_ = uVar407;
                          auVar709._12_4_ = uVar407;
                          auVar709._16_4_ = uVar407;
                          auVar709._20_4_ = uVar407;
                          auVar709._24_4_ = uVar407;
                          auVar709._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 8);
                          auVar730._4_4_ = uVar407;
                          auVar730._0_4_ = uVar407;
                          auVar730._8_4_ = uVar407;
                          auVar730._12_4_ = uVar407;
                          auVar730._16_4_ = uVar407;
                          auVar730._20_4_ = uVar407;
                          auVar730._24_4_ = uVar407;
                          auVar730._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 4);
                          auVar746._4_4_ = uVar407;
                          auVar746._0_4_ = uVar407;
                          auVar746._8_4_ = uVar407;
                          auVar746._12_4_ = uVar407;
                          auVar746._16_4_ = uVar407;
                          auVar746._20_4_ = uVar407;
                          auVar746._24_4_ = uVar407;
                          auVar746._28_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 8);
                          auVar759._4_4_ = uVar407;
                          auVar759._0_4_ = uVar407;
                          auVar759._8_4_ = uVar407;
                          auVar759._12_4_ = uVar407;
                          auVar759._16_4_ = uVar407;
                          auVar759._20_4_ = uVar407;
                          auVar759._24_4_ = uVar407;
                          auVar759._28_4_ = uVar407;
                          auVar360 = vfmadd213ps_fma(auVar637,auVar393,
                                                     *(undefined1 (*) [32])(puVar310 + lVar271));
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar662,auVar376);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar686,auVar14);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271);
                          auVar181._4_4_ = uVar407;
                          auVar181._0_4_ = uVar407;
                          auVar181._8_4_ = uVar407;
                          auVar181._12_4_ = uVar407;
                          auVar181._16_4_ = uVar407;
                          auVar181._20_4_ = uVar407;
                          auVar181._24_4_ = uVar407;
                          auVar181._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar15,auVar181);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar709,auVar387);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar730,auVar16);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271);
                          auVar182._4_4_ = uVar407;
                          auVar182._0_4_ = uVar407;
                          auVar182._8_4_ = uVar407;
                          auVar182._12_4_ = uVar407;
                          auVar182._16_4_ = uVar407;
                          auVar182._20_4_ = uVar407;
                          auVar182._24_4_ = uVar407;
                          auVar182._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar17,auVar182);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar746,auVar13);
                          auVar421 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar759,auVar389);
                          auVar360 = vfmadd213ps_fma(auVar662,auVar393,
                                                     *(undefined1 (*) [32])(puVar310 + lVar271 + 4))
                          ;
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar376,auVar686);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0xc);
                          auVar183._4_4_ = uVar407;
                          auVar183._0_4_ = uVar407;
                          auVar183._8_4_ = uVar407;
                          auVar183._12_4_ = uVar407;
                          auVar183._16_4_ = uVar407;
                          auVar183._20_4_ = uVar407;
                          auVar183._24_4_ = uVar407;
                          auVar183._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar14,auVar183);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar15,auVar709);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar387,auVar730);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0xc);
                          auVar184._4_4_ = uVar407;
                          auVar184._0_4_ = uVar407;
                          auVar184._8_4_ = uVar407;
                          auVar184._12_4_ = uVar407;
                          auVar184._16_4_ = uVar407;
                          auVar184._20_4_ = uVar407;
                          auVar184._24_4_ = uVar407;
                          auVar184._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar16,auVar184);
                          auVar360 = vfmadd231ps_fma(auVar388,auVar17,auVar746);
                          auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar13,auVar759);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0xc);
                          auVar185._4_4_ = uVar407;
                          auVar185._0_4_ = uVar407;
                          auVar185._8_4_ = uVar407;
                          auVar185._12_4_ = uVar407;
                          auVar185._16_4_ = uVar407;
                          auVar185._20_4_ = uVar407;
                          auVar185._24_4_ = uVar407;
                          auVar185._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar389,auVar185);
                          *(undefined1 (*) [32])(puVar310 + lVar271) = ZEXT1632(auVar421);
                          *(undefined1 (*) [32])(puVar310 + lVar271 + 4) = auVar388;
                          puVar309 = puVar309 + 8;
                          lVar271 = lVar271 + 8;
                        }
                        for (; iVar261 < iVar342; iVar261 = iVar261 + 1) {
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271);
                          auVar638._4_4_ = uVar407;
                          auVar638._0_4_ = uVar407;
                          auVar638._8_4_ = uVar407;
                          auVar638._12_4_ = uVar407;
                          auVar638._16_4_ = uVar407;
                          auVar638._20_4_ = uVar407;
                          auVar638._24_4_ = uVar407;
                          auVar638._28_4_ = uVar407;
                          auVar360 = vfmadd213ps_fma(auVar638,auVar393,
                                                     *(undefined1 (*) [32])(puVar310 + lVar271));
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 4);
                          auVar173._4_4_ = uVar407;
                          auVar173._0_4_ = uVar407;
                          auVar173._8_4_ = uVar407;
                          auVar173._12_4_ = uVar407;
                          auVar173._16_4_ = uVar407;
                          auVar173._20_4_ = uVar407;
                          auVar173._24_4_ = uVar407;
                          auVar173._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(ZEXT1632(auVar360),auVar376,auVar173);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 8);
                          auVar174._4_4_ = uVar407;
                          auVar174._0_4_ = uVar407;
                          auVar174._8_4_ = uVar407;
                          auVar174._12_4_ = uVar407;
                          auVar174._16_4_ = uVar407;
                          auVar174._20_4_ = uVar407;
                          auVar174._24_4_ = uVar407;
                          auVar174._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar14,auVar174);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271);
                          auVar175._4_4_ = uVar407;
                          auVar175._0_4_ = uVar407;
                          auVar175._8_4_ = uVar407;
                          auVar175._12_4_ = uVar407;
                          auVar175._16_4_ = uVar407;
                          auVar175._20_4_ = uVar407;
                          auVar175._24_4_ = uVar407;
                          auVar175._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar15,auVar175);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 4);
                          auVar176._4_4_ = uVar407;
                          auVar176._0_4_ = uVar407;
                          auVar176._8_4_ = uVar407;
                          auVar176._12_4_ = uVar407;
                          auVar176._16_4_ = uVar407;
                          auVar176._20_4_ = uVar407;
                          auVar176._24_4_ = uVar407;
                          auVar176._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar387,auVar176);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 8);
                          auVar177._4_4_ = uVar407;
                          auVar177._0_4_ = uVar407;
                          auVar177._8_4_ = uVar407;
                          auVar177._12_4_ = uVar407;
                          auVar177._16_4_ = uVar407;
                          auVar177._20_4_ = uVar407;
                          auVar177._24_4_ = uVar407;
                          auVar177._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar16,auVar177);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271);
                          auVar178._4_4_ = uVar407;
                          auVar178._0_4_ = uVar407;
                          auVar178._8_4_ = uVar407;
                          auVar178._12_4_ = uVar407;
                          auVar178._16_4_ = uVar407;
                          auVar178._20_4_ = uVar407;
                          auVar178._24_4_ = uVar407;
                          auVar178._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar17,auVar178);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 4);
                          auVar179._4_4_ = uVar407;
                          auVar179._0_4_ = uVar407;
                          auVar179._8_4_ = uVar407;
                          auVar179._12_4_ = uVar407;
                          auVar179._16_4_ = uVar407;
                          auVar179._20_4_ = uVar407;
                          auVar179._24_4_ = uVar407;
                          auVar179._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar13,auVar179);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 8);
                          auVar180._4_4_ = uVar407;
                          auVar180._0_4_ = uVar407;
                          auVar180._8_4_ = uVar407;
                          auVar180._12_4_ = uVar407;
                          auVar180._16_4_ = uVar407;
                          auVar180._20_4_ = uVar407;
                          auVar180._24_4_ = uVar407;
                          auVar180._28_4_ = uVar407;
                          auVar388 = vfmadd231ps_avx512vl(auVar388,auVar389,auVar180);
                          *(undefined1 (*) [32])(puVar310 + lVar271) = auVar388;
                          puVar309 = puVar309 + 4;
                          lVar271 = lVar271 + 4;
                        }
                        pvVar313 = (void *)((long)pvVar313 + lVar271 + 8);
                        pvVar345 = (void *)((long)pvVar345 + lVar271 + 8);
                        pvVar347 = (void *)((long)pvVar347 + lVar271 + 8);
                        puVar310 = puVar309;
                      }
                      pauVar306 = pauVar306 + 9;
                    }
                  }
                }
                goto LAB_00184042;
              }
LAB_001800c6:
              if ((((iVar260 == 8 && (uVar330 ^ 1) == 0) && (uVar262 == 0 && uVar289 == 0)) &&
                  ((uVar290 == 0 && uVar314 == 0) && uVar339 == 0)) && uVar331 == 0) {
                iVar260 = top_blob->w;
                uVar291 = top_blob->h;
                pvVar348 = (this->super_Convolution).bias_data.data;
                pvVar345 = (this->weight_data_tm).data;
                uVar278 = top_blob->elemsize;
                lVar271 = top_blob->cstep * uVar278;
                sVar765 = (this->weight_data_tm).elemsize;
                sVar18 = (this->weight_data_tm).cstep;
                iVar342 = 0;
                if (0 < iVar260) {
                  iVar342 = iVar260;
                }
                uVar281 = 0;
                if (0 < (int)uVar291) {
                  uVar281 = (ulong)uVar291;
                }
                iVar261 = top_blob->d;
                uVar330 = local_d70.c;
                if (local_d70.c < 1) {
                  uVar330 = 0;
                }
                uVar318 = (ulong)(uint)top_blob->c;
                if (top_blob->c < 1) {
                  uVar318 = 0;
                }
                pvVar347 = top_blob->data;
                iVar328 = top_blob->dims;
                pvVar313 = pvVar347;
                for (uVar268 = 0; uVar268 != uVar318; uVar268 = uVar268 + 1) {
                  iVar343 = (int)((uVar278 * (long)(int)uVar291 * (long)iVar260 + 0xf &
                                  0xfffffffffffffff0) / uVar278);
                  if (iVar328 == 4) {
                    iVar343 = (int)((long)(int)uVar291 * (long)iVar260);
                  }
                  if (pvVar348 == (void *)0x0) {
                    uVar407 = 0;
                  }
                  else {
                    uVar407 = *(undefined4 *)((long)pvVar348 + uVar268 * 4);
                  }
                  iVar343 = iVar343 * iVar261;
                  if (iVar343 < 1) {
                    iVar343 = 0;
                  }
                  for (lVar272 = 0; iVar343 != (int)lVar272; lVar272 = lVar272 + 1) {
                    *(undefined4 *)((long)pvVar313 + lVar272 * 4) = uVar407;
                  }
                  pfVar311 = (float *)(sVar765 * sVar18 * uVar268 + (long)pvVar345);
                  lVar272 = (long)local_d70.w * local_d70.elemsize;
                  lVar273 = 0;
                  for (uVar317 = 0; uVar317 != uVar330; uVar317 = uVar317 + 1) {
                    fVar534 = *pfVar311;
                    fVar552 = pfVar311[1];
                    fVar553 = pfVar311[2];
                    fVar554 = pfVar311[3];
                    fVar555 = pfVar311[4];
                    fVar556 = pfVar311[5];
                    fVar557 = pfVar311[6];
                    auVar393 = *(undefined1 (*) [32])(pfVar311 + 8);
                    auVar376 = *(undefined1 (*) [32])(pfVar311 + 0x10);
                    auVar14 = *(undefined1 (*) [32])(pfVar311 + 0x18);
                    auVar15 = *(undefined1 (*) [32])(pfVar311 + 0x20);
                    auVar387 = *(undefined1 (*) [32])(pfVar311 + 0x28);
                    auVar16 = *(undefined1 (*) [32])(pfVar311 + 0x30);
                    auVar17 = *(undefined1 (*) [32])(pfVar311 + 0x38);
                    auVar13 = *(undefined1 (*) [32])(pfVar311 + 0x40);
                    uVar321 = 0;
                    pfVar288 = (float *)(lVar271 * uVar268 + (long)pvVar347);
                    lVar274 = lVar273;
                    while (uVar321 != uVar281) {
                      uVar321 = uVar321 + 1;
                      lVar275 = lVar274;
                      iVar343 = iVar342;
                      while (bVar349 = iVar343 != 0, iVar343 = iVar343 + -1, bVar349) {
                        pfVar334 = (float *)((long)local_d70.data + lVar275);
                        auVar394._0_4_ = fVar534 * *pfVar334;
                        auVar394._4_4_ = fVar552 * pfVar334[1];
                        auVar394._8_4_ = fVar553 * pfVar334[2];
                        auVar394._12_4_ = fVar554 * pfVar334[3];
                        auVar394._16_4_ = fVar555 * pfVar334[4];
                        auVar394._20_4_ = fVar556 * pfVar334[5];
                        auVar394._28_36_ = in_ZMM10._28_36_;
                        auVar394._24_4_ = fVar557 * pfVar334[6];
                        pfVar334 = (float *)((long)local_d70.data + lVar275 + 0x20);
                        auVar396._0_4_ = auVar393._0_4_ * *pfVar334;
                        auVar396._4_4_ = auVar393._4_4_ * pfVar334[1];
                        auVar396._8_4_ = auVar393._8_4_ * pfVar334[2];
                        auVar396._12_4_ = auVar393._12_4_ * pfVar334[3];
                        auVar396._16_4_ = auVar393._16_4_ * pfVar334[4];
                        auVar396._20_4_ = auVar393._20_4_ * pfVar334[5];
                        auVar396._28_36_ = in_ZMM11._28_36_;
                        auVar396._24_4_ = auVar393._24_4_ * pfVar334[6];
                        pfVar334 = (float *)((long)local_d70.data + lVar275 + 0x40);
                        auVar397._0_4_ = auVar376._0_4_ * *pfVar334;
                        auVar397._4_4_ = auVar376._4_4_ * pfVar334[1];
                        auVar397._8_4_ = auVar376._8_4_ * pfVar334[2];
                        auVar397._12_4_ = auVar376._12_4_ * pfVar334[3];
                        auVar397._16_4_ = auVar376._16_4_ * pfVar334[4];
                        auVar397._20_4_ = auVar376._20_4_ * pfVar334[5];
                        auVar397._28_36_ = in_ZMM12._28_36_;
                        auVar397._24_4_ = auVar376._24_4_ * pfVar334[6];
                        auVar360 = vfmadd231ps_fma(auVar394._0_32_,auVar14,
                                                   *(undefined1 (*) [32])
                                                    ((long)local_d70.data + lVar275 + lVar272));
                        auVar421 = vfmadd231ps_fma(auVar396._0_32_,auVar15,
                                                   *(undefined1 (*) [32])
                                                    ((long)local_d70.data + lVar275 + lVar272 + 0x20
                                                    ));
                        auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar16,
                                                   *(undefined1 (*) [32])
                                                    ((long)local_d70.data + lVar275 + lVar272 * 2));
                        auVar421 = vfmadd231ps_fma(ZEXT1632(auVar421),auVar17,
                                                   *(undefined1 (*) [32])
                                                    ((long)local_d70.data +
                                                    lVar275 + lVar272 * 2 + 0x20));
                        auVar389 = vhaddps_avx(ZEXT1632(auVar360),ZEXT1632(auVar421));
                        auVar360 = vfmadd231ps_fma(auVar397._0_32_,auVar387,
                                                   *(undefined1 (*) [32])
                                                    ((long)local_d70.data + lVar275 + lVar272 + 0x40
                                                    ));
                        auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar13,
                                                   *(undefined1 (*) [32])
                                                    ((long)local_d70.data +
                                                    lVar275 + lVar272 * 2 + 0x40));
                        in_ZMM12 = ZEXT1664(auVar360);
                        auVar388 = vhaddps_avx(ZEXT1632(auVar360),
                                               SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                        auVar389 = vhaddps_avx(auVar389,auVar388);
                        auVar364._0_4_ = auVar389._16_4_ + auVar389._0_4_;
                        auVar364._4_4_ = auVar389._20_4_ + auVar389._4_4_;
                        auVar364._8_4_ = auVar389._24_4_ + auVar389._8_4_;
                        auVar364._12_4_ = auVar389._28_4_ + auVar389._12_4_;
                        auVar360 = vshufpd_avx(auVar364,auVar364,1);
                        auVar363._0_4_ = auVar360._0_4_ + auVar364._0_4_;
                        auVar363._4_4_ = auVar360._4_4_ + auVar364._4_4_;
                        auVar363._8_4_ = auVar360._8_4_ + auVar364._8_4_;
                        auVar363._12_4_ = auVar360._12_4_ + auVar364._12_4_;
                        auVar360 = vmovshdup_avx(auVar363);
                        fVar558 = auVar360._0_4_ + *pfVar288;
                        in_ZMM11 = ZEXT464((uint)fVar558);
                        fVar558 = fVar558 + auVar363._0_4_;
                        in_ZMM10 = ZEXT464((uint)fVar558);
                        *pfVar288 = fVar558;
                        pfVar288 = pfVar288 + 1;
                        lVar275 = lVar275 + 0x20;
                      }
                      lVar274 = lVar274 + lVar272;
                    }
                    pfVar311 = pfVar311 + 0x48;
                    lVar273 = lVar273 + local_d70.cstep * local_d70.elemsize;
                  }
                  pvVar313 = (void *)((long)pvVar313 + lVar271);
                }
                goto LAB_00184042;
              }
              if (!(bool)(bVar349 ^ 1) && uVar330 == 4) {
                bVar349 = uVar262 != 0 || uVar289 != 0;
                if ((uVar338 != 1 || stride_h != 1) || ((bVar349 || uVar254 != 0) || uVar255 != 0))
                {
                  if (((bVar349 || uVar254 != 0) || uVar255 != 0) || (stride_h != 2 || uVar338 != 2)
                     ) goto LAB_00182048;
                  iVar260 = top_blob->w;
                  iVar342 = top_blob->h;
                  iVar261 = top_blob->c;
                  if (iVar342 < 1) {
                    iVar342 = 0;
                  }
                  uVar278 = (ulong)(uint)local_d70.c;
                  if (local_d70.c < 1) {
                    uVar278 = 0;
                  }
                  pvVar348 = (this->super_Convolution).bias_data.data;
                  uVar281 = (ulong)(uint)(iVar261 >> 1);
                  if (iVar261 >> 1 < 1) {
                    uVar281 = 0;
                  }
                  lVar271 = (long)((local_d70.w - iVar260) * 2) * 4;
                  for (uVar318 = 0; uVar318 != uVar281; uVar318 = uVar318 + 1) {
                    uVar321 = (long)top_blob->h * (long)top_blob->w;
                    uVar268 = top_blob->elemsize;
                    uVar317 = (uVar268 * uVar321 + 0xf & 0xfffffffffffffff0) / uVar268;
                    if (top_blob->dims == 4) {
                      uVar317 = uVar321;
                    }
                    lVar272 = uVar318 * 2 + 1;
                    if (pvVar348 == (void *)0x0) {
                      auVar360 = ZEXT816(0) << 0x40;
                      uVar408 = 0;
                      uVar418 = 0;
                    }
                    else {
                      auVar360 = *(undefined1 (*) [16])((long)pvVar348 + uVar318 * 0x20);
                      puVar310 = (undefined8 *)((long)pvVar348 + lVar272 * 0x10);
                      uVar408 = *puVar310;
                      uVar418 = puVar310[1];
                    }
                    lVar273 = uVar268 * top_blob->cstep;
                    pauVar327 = (undefined1 (*) [16])(lVar273 * uVar318 * 2 + (long)top_blob->data);
                    puVar310 = (undefined8 *)(lVar273 * lVar272 + (long)top_blob->data);
                    iVar343 = (int)uVar317 * top_blob->d;
                    pauVar270 = pauVar327;
                    iVar328 = iVar343;
                    if (iVar343 < 1) {
                      iVar343 = 0;
                      iVar328 = iVar343;
                    }
                    while (bVar349 = iVar343 != 0, iVar343 = iVar343 + -1, puVar283 = puVar310,
                          bVar349) {
                      *pauVar270 = auVar360;
                      pauVar270 = pauVar270 + 1;
                    }
                    while (bVar349 = iVar328 != 0, iVar328 = iVar328 + -1, bVar349) {
                      *puVar283 = uVar408;
                      puVar283[1] = uVar418;
                      puVar283 = puVar283 + 2;
                    }
                    pvVar345 = (this->weight_data_tm).data;
                    lVar273 = (this->weight_data_tm).elemsize * (this->weight_data_tm).cstep;
                    pauVar270 = (undefined1 (*) [16])(uVar318 * 2 * lVar273 + (long)pvVar345);
                    pauVar307 = (undefined1 (*) [16])(lVar273 * lVar272 + (long)pvVar345);
                    for (uVar268 = 0; uVar268 != uVar278; uVar268 = uVar268 + 1) {
                      pvVar313 = (void *)(local_d70.cstep * uVar268 * local_d70.elemsize +
                                         (long)local_d70.data);
                      pvVar345 = (void *)((long)pvVar313 + (long)local_d70.w * local_d70.elemsize);
                      pvVar347 = (void *)((long)pvVar313 +
                                         (long)local_d70.w * local_d70.elemsize * 2);
                      auVar360 = *pauVar270;
                      auVar421 = pauVar270[1];
                      auVar364 = pauVar270[2];
                      auVar363 = pauVar270[3];
                      auVar362 = pauVar270[4];
                      auVar361 = pauVar270[5];
                      auVar365 = pauVar270[6];
                      auVar370 = pauVar270[7];
                      auVar366 = pauVar270[8];
                      auVar367 = *pauVar307;
                      auVar369 = pauVar307[1];
                      auVar368 = pauVar307[2];
                      auVar371 = pauVar307[3];
                      auVar372 = pauVar307[4];
                      auVar373 = pauVar307[5];
                      auVar374 = pauVar307[6];
                      auVar375 = pauVar307[7];
                      auVar7 = pauVar307[8];
                      puVar283 = puVar310;
                      pauVar333 = pauVar327;
                      for (iVar328 = 0; iVar328 != iVar342; iVar328 = iVar328 + 1) {
                        lVar272 = 0;
                        puVar309 = puVar283;
                        pauVar308 = pauVar333;
                        for (iVar343 = 0; iVar343 + 3 < iVar260; iVar343 = iVar343 + 4) {
                          auVar350 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272)));
                          auVar351 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 4)));
                          auVar352 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 8)));
                          auVar353 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272)));
                          auVar354 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 4)));
                          auVar355 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 8)));
                          auVar356 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272)));
                          auVar357 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 4)));
                          auVar358 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 8)));
                          auVar359 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [16])
                                                 ((long)*pauVar333 + lVar272 * 2),auVar350,auVar360)
                          ;
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar351,auVar421);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar352,auVar364);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar353,auVar363);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar354,auVar362);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar355,auVar361);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar356,auVar365);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar357,auVar370);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar358,auVar366);
                          auVar350 = vfmadd213ps_avx512vl
                                               (auVar350,auVar367,
                                                *(undefined1 (*) [16])((long)puVar283 + lVar272 * 2)
                                               );
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar369,auVar351);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar352,auVar368);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar371,auVar353);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar372,auVar354);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar355,auVar373);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar374,auVar356);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar375,auVar357);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar358,auVar7);
                          *(undefined1 (*) [16])((long)*pauVar333 + lVar272 * 2) = auVar359;
                          *(undefined1 (*) [16])((long)puVar283 + lVar272 * 2) = auVar350;
                          auVar350 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 0xc)));
                          auVar351 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 0xc)));
                          auVar353 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 0xc)));
                          auVar354 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 0x10)))
                          ;
                          auVar356 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 0x10)))
                          ;
                          auVar357 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 0x10)))
                          ;
                          auVar359 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [16])(pauVar333[1] + lVar272 * 2),
                                                auVar352,auVar360);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar350,auVar421);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar354,auVar364);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar355,auVar363);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar351,auVar362);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar356,auVar361);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar358,auVar365);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar353,auVar370);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar357,auVar366);
                          auVar352 = vfmadd213ps_avx512vl
                                               (auVar352,auVar367,
                                                *(undefined1 (*) [16])
                                                 ((long)puVar283 + lVar272 * 2 + 0x10));
                          auVar350 = vfmadd231ps_avx512vl(auVar352,auVar369,auVar350);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar354,auVar368);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar371,auVar355);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar372,auVar351);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar356,auVar373);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar374,auVar358);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar375,auVar353);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar357,auVar7);
                          *(undefined1 (*) [16])(pauVar333[1] + lVar272 * 2) = auVar359;
                          *(undefined1 (*) [16])((long)puVar283 + lVar272 * 2 + 0x10) = auVar350;
                          auVar350 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 0x14)))
                          ;
                          auVar351 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 0x14)))
                          ;
                          auVar352 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 0x14)))
                          ;
                          auVar353 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 0x18)))
                          ;
                          auVar355 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 0x18)))
                          ;
                          auVar358 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 0x18)))
                          ;
                          auVar359 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [16])(pauVar333[2] + lVar272 * 2),
                                                auVar354,auVar360);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar350,auVar421);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar353,auVar364);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar356,auVar363);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar351,auVar362);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar355,auVar361);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar357,auVar365);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar352,auVar370);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar358,auVar366);
                          auVar354 = vfmadd213ps_avx512vl
                                               (auVar354,auVar367,
                                                *(undefined1 (*) [16])
                                                 ((long)puVar283 + lVar272 * 2 + 0x20));
                          auVar350 = vfmadd231ps_avx512vl(auVar354,auVar369,auVar350);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar353,auVar368);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar371,auVar356);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar372,auVar351);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar355,auVar373);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar374,auVar357);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar375,auVar352);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar358,auVar7);
                          *(undefined1 (*) [16])(pauVar333[2] + lVar272 * 2) = auVar359;
                          *(undefined1 (*) [16])((long)puVar283 + lVar272 * 2 + 0x20) = auVar350;
                          auVar350 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 0x1c)))
                          ;
                          auVar351 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 0x1c)))
                          ;
                          auVar352 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 0x1c)))
                          ;
                          auVar354 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 0x20)))
                          ;
                          auVar356 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 0x20)))
                          ;
                          auVar357 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 0x20)))
                          ;
                          auVar359 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [16])(pauVar333[3] + lVar272 * 2),
                                                auVar353,auVar360);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar350,auVar421);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar354,auVar364);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar355,auVar363);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar351,auVar362);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar356,auVar361);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar358,auVar365);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar352,auVar370);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar357,auVar366);
                          auVar353 = vfmadd213ps_avx512vl
                                               (auVar353,auVar367,
                                                *(undefined1 (*) [16])
                                                 ((long)puVar283 + lVar272 * 2 + 0x30));
                          auVar350 = vfmadd231ps_avx512vl(auVar353,auVar369,auVar350);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar368,auVar354);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar371,auVar355);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar372,auVar351);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar373,auVar356);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar374,auVar358);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar375,auVar352);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar7,auVar357);
                          *(undefined1 (*) [16])(pauVar333[3] + lVar272 * 2) = auVar359;
                          *(undefined1 (*) [16])((long)puVar283 + lVar272 * 2 + 0x30) = auVar350;
                          pauVar308 = pauVar308 + 4;
                          puVar309 = puVar309 + 8;
                          lVar272 = lVar272 + 0x20;
                        }
                        for (; iVar343 + 1 < iVar260; iVar343 = iVar343 + 2) {
                          auVar350 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272)));
                          auVar351 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 4)));
                          auVar352 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 8)));
                          auVar353 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272)));
                          auVar354 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 4)));
                          auVar355 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 8)));
                          auVar356 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272)));
                          auVar357 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 4)));
                          auVar358 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 8)));
                          auVar359 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [16])
                                                 ((long)*pauVar333 + lVar272 * 2),auVar350,auVar360)
                          ;
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar351,auVar421);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar352,auVar364);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar353,auVar363);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar354,auVar362);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar355,auVar361);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar356,auVar365);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar357,auVar370);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar358,auVar366);
                          auVar350 = vfmadd213ps_avx512vl
                                               (auVar350,auVar367,
                                                *(undefined1 (*) [16])((long)puVar283 + lVar272 * 2)
                                               );
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar369,auVar351);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar352,auVar368);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar371,auVar353);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar372,auVar354);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar355,auVar373);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar374,auVar356);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar375,auVar357);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar358,auVar7);
                          *(undefined1 (*) [16])((long)*pauVar333 + lVar272 * 2) = auVar359;
                          *(undefined1 (*) [16])((long)puVar283 + lVar272 * 2) = auVar350;
                          auVar350 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 0xc)));
                          auVar351 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 0xc)));
                          auVar353 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 0xc)));
                          auVar354 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 0x10)))
                          ;
                          auVar356 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 0x10)))
                          ;
                          auVar357 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 0x10)))
                          ;
                          auVar359 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [16])(pauVar333[1] + lVar272 * 2),
                                                auVar352,auVar360);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar350,auVar421);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar354,auVar364);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar355,auVar363);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar351,auVar362);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar356,auVar361);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar358,auVar365);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar353,auVar370);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar357,auVar366);
                          auVar352 = vfmadd213ps_avx512vl
                                               (auVar352,auVar367,
                                                *(undefined1 (*) [16])
                                                 ((long)puVar283 + lVar272 * 2 + 0x10));
                          auVar350 = vfmadd231ps_avx512vl(auVar352,auVar369,auVar350);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar368,auVar354);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar371,auVar355);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar372,auVar351);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar373,auVar356);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar374,auVar358);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar375,auVar353);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar7,auVar357);
                          *(undefined1 (*) [16])(pauVar333[1] + lVar272 * 2) = auVar359;
                          *(undefined1 (*) [16])((long)puVar283 + lVar272 * 2 + 0x10) = auVar350;
                          pauVar308 = pauVar308 + 2;
                          puVar309 = puVar309 + 4;
                          lVar272 = lVar272 + 0x10;
                        }
                        for (; iVar343 < iVar260; iVar343 = iVar343 + 1) {
                          auVar350 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272)));
                          auVar351 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 4)));
                          auVar352 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar272 + 8)));
                          auVar353 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272)));
                          auVar354 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 4)));
                          auVar355 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar272 + 8)));
                          auVar356 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272)));
                          auVar357 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 4)));
                          auVar358 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar272 + 8)));
                          auVar359 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [16])
                                                 ((long)*pauVar333 + lVar272 * 2),auVar350,auVar360)
                          ;
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar351,auVar421);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar352,auVar364);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar353,auVar363);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar354,auVar362);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar355,auVar361);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar356,auVar365);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar357,auVar370);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar358,auVar366);
                          auVar350 = vfmadd213ps_avx512vl
                                               (auVar350,auVar367,
                                                *(undefined1 (*) [16])((long)puVar283 + lVar272 * 2)
                                               );
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar369,auVar351);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar368,auVar352);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar371,auVar353);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar372,auVar354);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar373,auVar355);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar374,auVar356);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar375,auVar357);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar7,auVar358);
                          *(undefined1 (*) [16])((long)*pauVar333 + lVar272 * 2) = auVar359;
                          *(undefined1 (*) [16])((long)puVar283 + lVar272 * 2) = auVar350;
                          pauVar308 = pauVar308 + 1;
                          puVar309 = puVar309 + 2;
                          lVar272 = lVar272 + 8;
                        }
                        pvVar313 = (void *)((long)pvVar313 + lVar272 + lVar271);
                        pvVar345 = (void *)((long)pvVar345 + lVar272 + lVar271);
                        pvVar347 = (void *)((long)pvVar347 + lVar272 + lVar271);
                        puVar283 = puVar309;
                        pauVar333 = pauVar308;
                      }
                      pauVar270 = pauVar270 + 9;
                      pauVar307 = pauVar307 + 9;
                    }
                  }
                  for (uVar281 = (long)iVar261 & 0xfffffffffffffffe; (long)uVar281 < (long)iVar261;
                      uVar281 = uVar281 + 1) {
                    uVar317 = (long)top_blob->h * (long)top_blob->w;
                    uVar318 = top_blob->elemsize;
                    uVar268 = (uVar318 * uVar317 + 0xf & 0xfffffffffffffff0) / uVar318;
                    if (top_blob->dims == 4) {
                      uVar268 = uVar317;
                    }
                    if (pvVar348 == (void *)0x0) {
                      uVar408 = 0;
                      uVar418 = 0;
                    }
                    else {
                      puVar310 = (undefined8 *)((long)pvVar348 + uVar281 * 0x10);
                      uVar408 = *puVar310;
                      uVar418 = puVar310[1];
                    }
                    pauVar327 = (undefined1 (*) [16])
                                (top_blob->cstep * uVar281 * uVar318 + (long)top_blob->data);
                    iVar328 = (int)uVar268 * top_blob->d;
                    pauVar270 = pauVar327;
                    if (iVar328 < 1) {
                      iVar328 = 0;
                    }
                    while (bVar349 = iVar328 != 0, iVar328 = iVar328 + -1, bVar349) {
                      *(undefined8 *)*pauVar270 = uVar408;
                      *(undefined8 *)(*pauVar270 + 8) = uVar418;
                      pauVar270 = pauVar270 + 1;
                    }
                    pauVar270 = (undefined1 (*) [16])
                                ((this->weight_data_tm).cstep * uVar281 *
                                 (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data
                                );
                    for (uVar318 = 0; uVar318 != uVar278; uVar318 = uVar318 + 1) {
                      pvVar347 = (void *)(local_d70.cstep * uVar318 * local_d70.elemsize +
                                         (long)local_d70.data);
                      pvVar345 = (void *)((long)pvVar347 + (long)local_d70.w * local_d70.elemsize);
                      auVar360 = *pauVar270;
                      auVar421 = pauVar270[1];
                      auVar364 = pauVar270[2];
                      auVar363 = pauVar270[3];
                      auVar362 = pauVar270[4];
                      auVar361 = pauVar270[5];
                      auVar365 = pauVar270[6];
                      auVar370 = pauVar270[7];
                      auVar366 = pauVar270[8];
                      pauVar307 = pauVar327;
                      pvVar313 = (void *)((long)pvVar347 +
                                         (long)local_d70.w * local_d70.elemsize * 2);
                      for (iVar328 = 0; iVar328 != iVar342; iVar328 = iVar328 + 1) {
                        pvVar312 = (void *)((long)pvVar347 + lVar271);
                        pvVar344 = (void *)((long)pvVar345 + lVar271);
                        pvVar305 = (void *)(lVar271 + (long)pvVar313);
                        lVar272 = 0;
                        pauVar333 = pauVar307;
                        for (iVar343 = 0; iVar343 + 7 < iVar260; iVar343 = iVar343 + 8) {
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272);
                          auVar625._4_4_ = uVar407;
                          auVar625._0_4_ = uVar407;
                          auVar625._8_4_ = uVar407;
                          auVar625._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 8);
                          auVar651._4_4_ = uVar407;
                          auVar651._0_4_ = uVar407;
                          auVar651._8_4_ = uVar407;
                          auVar651._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 8);
                          auVar674._4_4_ = uVar407;
                          auVar674._0_4_ = uVar407;
                          auVar674._8_4_ = uVar407;
                          auVar674._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 8);
                          auVar698._4_4_ = uVar407;
                          auVar698._0_4_ = uVar407;
                          auVar698._8_4_ = uVar407;
                          auVar698._12_4_ = uVar407;
                          auVar367 = vfmadd213ps_fma(auVar625,auVar360,
                                                     *(undefined1 (*) [16])
                                                      (*pauVar307 + lVar272 * 2));
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 4);
                          auVar369._4_4_ = uVar407;
                          auVar369._0_4_ = uVar407;
                          auVar369._8_4_ = uVar407;
                          auVar369._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar421,auVar369);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar651,auVar364);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272);
                          auVar368._4_4_ = uVar407;
                          auVar368._0_4_ = uVar407;
                          auVar368._8_4_ = uVar407;
                          auVar368._12_4_ = uVar407;
                          auVar369 = vfmadd231ps_avx512vl(auVar367,auVar363,auVar368);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 4);
                          auVar367._4_4_ = uVar407;
                          auVar367._0_4_ = uVar407;
                          auVar367._8_4_ = uVar407;
                          auVar367._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar369,auVar362,auVar367);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar674,auVar361);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272);
                          auVar371._4_4_ = uVar407;
                          auVar371._0_4_ = uVar407;
                          auVar371._8_4_ = uVar407;
                          auVar371._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar365,auVar371);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 4);
                          auVar372._4_4_ = uVar407;
                          auVar372._0_4_ = uVar407;
                          auVar372._8_4_ = uVar407;
                          auVar372._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar370,auVar372);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar698,auVar366);
                          *(undefined1 (*) [16])(*pauVar307 + lVar272 * 2) = auVar367;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x10);
                          auVar626._4_4_ = uVar407;
                          auVar626._0_4_ = uVar407;
                          auVar626._8_4_ = uVar407;
                          auVar626._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x10);
                          auVar722._4_4_ = uVar407;
                          auVar722._0_4_ = uVar407;
                          auVar722._8_4_ = uVar407;
                          auVar722._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x10);
                          auVar739._4_4_ = uVar407;
                          auVar739._0_4_ = uVar407;
                          auVar739._8_4_ = uVar407;
                          auVar739._12_4_ = uVar407;
                          auVar367 = vfmadd213ps_fma(auVar651,auVar360,
                                                     *(undefined1 (*) [16])
                                                      (pauVar307[1] + lVar272 * 2));
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0xc);
                          auVar373._4_4_ = uVar407;
                          auVar373._0_4_ = uVar407;
                          auVar373._8_4_ = uVar407;
                          auVar373._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar421,auVar373);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar626,auVar364);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar363,auVar674);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0xc);
                          auVar374._4_4_ = uVar407;
                          auVar374._0_4_ = uVar407;
                          auVar374._8_4_ = uVar407;
                          auVar374._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar362,auVar374);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar722,auVar361);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar365,auVar698);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0xc);
                          auVar375._4_4_ = uVar407;
                          auVar375._0_4_ = uVar407;
                          auVar375._8_4_ = uVar407;
                          auVar375._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar370,auVar375);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar739,auVar366);
                          *(undefined1 (*) [16])(pauVar307[1] + lVar272 * 2) = auVar367;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x18);
                          auVar652._4_4_ = uVar407;
                          auVar652._0_4_ = uVar407;
                          auVar652._8_4_ = uVar407;
                          auVar652._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x18);
                          auVar675._4_4_ = uVar407;
                          auVar675._0_4_ = uVar407;
                          auVar675._8_4_ = uVar407;
                          auVar675._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x18);
                          auVar699._4_4_ = uVar407;
                          auVar699._0_4_ = uVar407;
                          auVar699._8_4_ = uVar407;
                          auVar699._12_4_ = uVar407;
                          auVar367 = vfmadd213ps_fma(auVar626,auVar360,
                                                     *(undefined1 (*) [16])
                                                      (pauVar307[2] + lVar272 * 2));
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x14);
                          auVar7._4_4_ = uVar407;
                          auVar7._0_4_ = uVar407;
                          auVar7._8_4_ = uVar407;
                          auVar7._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar421,auVar7);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar652,auVar364);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar363,auVar722);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x14);
                          auVar350._4_4_ = uVar407;
                          auVar350._0_4_ = uVar407;
                          auVar350._8_4_ = uVar407;
                          auVar350._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar362,auVar350);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar675,auVar361);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar365,auVar739);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x14);
                          auVar351._4_4_ = uVar407;
                          auVar351._0_4_ = uVar407;
                          auVar351._8_4_ = uVar407;
                          auVar351._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar370,auVar351);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar699,auVar366);
                          *(undefined1 (*) [16])(pauVar307[2] + lVar272 * 2) = auVar367;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x20);
                          auVar627._4_4_ = uVar407;
                          auVar627._0_4_ = uVar407;
                          auVar627._8_4_ = uVar407;
                          auVar627._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x20);
                          auVar723._4_4_ = uVar407;
                          auVar723._0_4_ = uVar407;
                          auVar723._8_4_ = uVar407;
                          auVar723._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x20);
                          auVar740._4_4_ = uVar407;
                          auVar740._0_4_ = uVar407;
                          auVar740._8_4_ = uVar407;
                          auVar740._12_4_ = uVar407;
                          auVar367 = vfmadd213ps_fma(auVar652,auVar360,
                                                     *(undefined1 (*) [16])
                                                      (pauVar307[3] + lVar272 * 2));
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x1c);
                          auVar352._4_4_ = uVar407;
                          auVar352._0_4_ = uVar407;
                          auVar352._8_4_ = uVar407;
                          auVar352._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar421,auVar352);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar627,auVar364);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar363,auVar675);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x1c);
                          auVar353._4_4_ = uVar407;
                          auVar353._0_4_ = uVar407;
                          auVar353._8_4_ = uVar407;
                          auVar353._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar362,auVar353);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar723,auVar361);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar365,auVar699);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x1c);
                          auVar354._4_4_ = uVar407;
                          auVar354._0_4_ = uVar407;
                          auVar354._8_4_ = uVar407;
                          auVar354._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar370,auVar354);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar740,auVar366);
                          *(undefined1 (*) [16])(pauVar307[3] + lVar272 * 2) = auVar367;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x28);
                          auVar653._4_4_ = uVar407;
                          auVar653._0_4_ = uVar407;
                          auVar653._8_4_ = uVar407;
                          auVar653._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x28);
                          auVar676._4_4_ = uVar407;
                          auVar676._0_4_ = uVar407;
                          auVar676._8_4_ = uVar407;
                          auVar676._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x28);
                          auVar700._4_4_ = uVar407;
                          auVar700._0_4_ = uVar407;
                          auVar700._8_4_ = uVar407;
                          auVar700._12_4_ = uVar407;
                          auVar367 = vfmadd213ps_fma(auVar627,auVar360,
                                                     *(undefined1 (*) [16])
                                                      (pauVar307[4] + lVar272 * 2));
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x24);
                          auVar355._4_4_ = uVar407;
                          auVar355._0_4_ = uVar407;
                          auVar355._8_4_ = uVar407;
                          auVar355._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar421,auVar355);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar653,auVar364);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar363,auVar723);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x24);
                          auVar356._4_4_ = uVar407;
                          auVar356._0_4_ = uVar407;
                          auVar356._8_4_ = uVar407;
                          auVar356._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar362,auVar356);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar676,auVar361);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar365,auVar740);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x24);
                          auVar357._4_4_ = uVar407;
                          auVar357._0_4_ = uVar407;
                          auVar357._8_4_ = uVar407;
                          auVar357._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar370,auVar357);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar700,auVar366);
                          *(undefined1 (*) [16])(pauVar307[4] + lVar272 * 2) = auVar367;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x30);
                          auVar628._4_4_ = uVar407;
                          auVar628._0_4_ = uVar407;
                          auVar628._8_4_ = uVar407;
                          auVar628._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x30);
                          auVar724._4_4_ = uVar407;
                          auVar724._0_4_ = uVar407;
                          auVar724._8_4_ = uVar407;
                          auVar724._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x30);
                          auVar741._4_4_ = uVar407;
                          auVar741._0_4_ = uVar407;
                          auVar741._8_4_ = uVar407;
                          auVar741._12_4_ = uVar407;
                          auVar367 = vfmadd213ps_fma(auVar653,auVar360,
                                                     *(undefined1 (*) [16])
                                                      (pauVar307[5] + lVar272 * 2));
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x2c);
                          auVar358._4_4_ = uVar407;
                          auVar358._0_4_ = uVar407;
                          auVar358._8_4_ = uVar407;
                          auVar358._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar421,auVar358);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar628,auVar364);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar363,auVar676);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x2c);
                          auVar359._4_4_ = uVar407;
                          auVar359._0_4_ = uVar407;
                          auVar359._8_4_ = uVar407;
                          auVar359._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar362,auVar359);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar724,auVar361);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar365,auVar700);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x2c);
                          auVar40._4_4_ = uVar407;
                          auVar40._0_4_ = uVar407;
                          auVar40._8_4_ = uVar407;
                          auVar40._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar370,auVar40);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar741,auVar366);
                          *(undefined1 (*) [16])(pauVar307[5] + lVar272 * 2) = auVar367;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x38);
                          auVar654._4_4_ = uVar407;
                          auVar654._0_4_ = uVar407;
                          auVar654._8_4_ = uVar407;
                          auVar654._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x38);
                          auVar677._4_4_ = uVar407;
                          auVar677._0_4_ = uVar407;
                          auVar677._8_4_ = uVar407;
                          auVar677._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x38);
                          auVar701._4_4_ = uVar407;
                          auVar701._0_4_ = uVar407;
                          auVar701._8_4_ = uVar407;
                          auVar701._12_4_ = uVar407;
                          auVar367 = vfmadd213ps_fma(auVar628,auVar360,
                                                     *(undefined1 (*) [16])
                                                      (pauVar307[6] + lVar272 * 2));
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x34);
                          auVar41._4_4_ = uVar407;
                          auVar41._0_4_ = uVar407;
                          auVar41._8_4_ = uVar407;
                          auVar41._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar421,auVar41);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar654,auVar364);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar363,auVar724);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x34);
                          auVar42._4_4_ = uVar407;
                          auVar42._0_4_ = uVar407;
                          auVar42._8_4_ = uVar407;
                          auVar42._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar362,auVar42);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar677,auVar361);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar365,auVar741);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x34);
                          auVar43._4_4_ = uVar407;
                          auVar43._0_4_ = uVar407;
                          auVar43._8_4_ = uVar407;
                          auVar43._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar370,auVar43);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar701,auVar366);
                          *(undefined1 (*) [16])(pauVar307[6] + lVar272 * 2) = auVar367;
                          auVar367 = vfmadd213ps_fma(auVar654,auVar360,
                                                     *(undefined1 (*) [16])
                                                      (pauVar307[7] + lVar272 * 2));
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x3c);
                          auVar44._4_4_ = uVar407;
                          auVar44._0_4_ = uVar407;
                          auVar44._8_4_ = uVar407;
                          auVar44._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar421,auVar44);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x40);
                          auVar45._4_4_ = uVar407;
                          auVar45._0_4_ = uVar407;
                          auVar45._8_4_ = uVar407;
                          auVar45._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar364,auVar45);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar363,auVar677);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x3c);
                          auVar46._4_4_ = uVar407;
                          auVar46._0_4_ = uVar407;
                          auVar46._8_4_ = uVar407;
                          auVar46._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar362,auVar46);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x40);
                          auVar47._4_4_ = uVar407;
                          auVar47._0_4_ = uVar407;
                          auVar47._8_4_ = uVar407;
                          auVar47._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar361,auVar47);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar365,auVar701);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x3c);
                          auVar48._4_4_ = uVar407;
                          auVar48._0_4_ = uVar407;
                          auVar48._8_4_ = uVar407;
                          auVar48._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar370,auVar48);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x40);
                          auVar49._4_4_ = uVar407;
                          auVar49._0_4_ = uVar407;
                          auVar49._8_4_ = uVar407;
                          auVar49._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar366,auVar49);
                          *(undefined1 (*) [16])(pauVar307[7] + lVar272 * 2) = auVar367;
                          pauVar333 = pauVar333 + 8;
                          lVar272 = lVar272 + 0x40;
                          pvVar312 = (void *)((long)pvVar312 + 0x40);
                          pvVar344 = (void *)((long)pvVar344 + 0x40);
                          pvVar305 = (void *)((long)pvVar305 + 0x40);
                        }
                        for (; iVar343 + 3 < iVar260; iVar343 = iVar343 + 4) {
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272);
                          auVar629._4_4_ = uVar407;
                          auVar629._0_4_ = uVar407;
                          auVar629._8_4_ = uVar407;
                          auVar629._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 8);
                          auVar655._4_4_ = uVar407;
                          auVar655._0_4_ = uVar407;
                          auVar655._8_4_ = uVar407;
                          auVar655._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 8);
                          auVar678._4_4_ = uVar407;
                          auVar678._0_4_ = uVar407;
                          auVar678._8_4_ = uVar407;
                          auVar678._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 8);
                          auVar702._4_4_ = uVar407;
                          auVar702._0_4_ = uVar407;
                          auVar702._8_4_ = uVar407;
                          auVar702._12_4_ = uVar407;
                          auVar367 = vfmadd213ps_fma(auVar629,auVar360,
                                                     *(undefined1 (*) [16])
                                                      (*pauVar307 + lVar272 * 2));
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 4);
                          auVar69._4_4_ = uVar407;
                          auVar69._0_4_ = uVar407;
                          auVar69._8_4_ = uVar407;
                          auVar69._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar421,auVar69);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar655,auVar364);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272);
                          auVar70._4_4_ = uVar407;
                          auVar70._0_4_ = uVar407;
                          auVar70._8_4_ = uVar407;
                          auVar70._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar363,auVar70);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 4);
                          auVar71._4_4_ = uVar407;
                          auVar71._0_4_ = uVar407;
                          auVar71._8_4_ = uVar407;
                          auVar71._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar362,auVar71);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar678,auVar361);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272);
                          auVar72._4_4_ = uVar407;
                          auVar72._0_4_ = uVar407;
                          auVar72._8_4_ = uVar407;
                          auVar72._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar365,auVar72);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 4);
                          auVar73._4_4_ = uVar407;
                          auVar73._0_4_ = uVar407;
                          auVar73._8_4_ = uVar407;
                          auVar73._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar370,auVar73);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar702,auVar366);
                          *(undefined1 (*) [16])(*pauVar307 + lVar272 * 2) = auVar367;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x10);
                          auVar630._4_4_ = uVar407;
                          auVar630._0_4_ = uVar407;
                          auVar630._8_4_ = uVar407;
                          auVar630._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x10);
                          auVar725._4_4_ = uVar407;
                          auVar725._0_4_ = uVar407;
                          auVar725._8_4_ = uVar407;
                          auVar725._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x10);
                          auVar742._4_4_ = uVar407;
                          auVar742._0_4_ = uVar407;
                          auVar742._8_4_ = uVar407;
                          auVar742._12_4_ = uVar407;
                          auVar367 = vfmadd213ps_fma(auVar655,auVar360,
                                                     *(undefined1 (*) [16])
                                                      (pauVar307[1] + lVar272 * 2));
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0xc);
                          auVar74._4_4_ = uVar407;
                          auVar74._0_4_ = uVar407;
                          auVar74._8_4_ = uVar407;
                          auVar74._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar421,auVar74);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar630,auVar364);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar363,auVar678);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0xc);
                          auVar75._4_4_ = uVar407;
                          auVar75._0_4_ = uVar407;
                          auVar75._8_4_ = uVar407;
                          auVar75._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar362,auVar75);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar725,auVar361);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar365,auVar702);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0xc);
                          auVar76._4_4_ = uVar407;
                          auVar76._0_4_ = uVar407;
                          auVar76._8_4_ = uVar407;
                          auVar76._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar370,auVar76);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar742,auVar366);
                          *(undefined1 (*) [16])(pauVar307[1] + lVar272 * 2) = auVar367;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x18);
                          auVar656._4_4_ = uVar407;
                          auVar656._0_4_ = uVar407;
                          auVar656._8_4_ = uVar407;
                          auVar656._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x18);
                          auVar679._4_4_ = uVar407;
                          auVar679._0_4_ = uVar407;
                          auVar679._8_4_ = uVar407;
                          auVar679._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x18);
                          auVar703._4_4_ = uVar407;
                          auVar703._0_4_ = uVar407;
                          auVar703._8_4_ = uVar407;
                          auVar703._12_4_ = uVar407;
                          auVar367 = vfmadd213ps_fma(auVar630,auVar360,
                                                     *(undefined1 (*) [16])
                                                      (pauVar307[2] + lVar272 * 2));
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x14);
                          auVar77._4_4_ = uVar407;
                          auVar77._0_4_ = uVar407;
                          auVar77._8_4_ = uVar407;
                          auVar77._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar421,auVar77);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar656,auVar364);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar363,auVar725);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x14);
                          auVar78._4_4_ = uVar407;
                          auVar78._0_4_ = uVar407;
                          auVar78._8_4_ = uVar407;
                          auVar78._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar362,auVar78);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar679,auVar361);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar365,auVar742);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x14);
                          auVar79._4_4_ = uVar407;
                          auVar79._0_4_ = uVar407;
                          auVar79._8_4_ = uVar407;
                          auVar79._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar370,auVar79);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar703,auVar366);
                          *(undefined1 (*) [16])(pauVar307[2] + lVar272 * 2) = auVar367;
                          auVar367 = vfmadd213ps_fma(auVar656,auVar360,
                                                     *(undefined1 (*) [16])
                                                      (pauVar307[3] + lVar272 * 2));
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x1c);
                          auVar80._4_4_ = uVar407;
                          auVar80._0_4_ = uVar407;
                          auVar80._8_4_ = uVar407;
                          auVar80._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar421,auVar80);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x20);
                          auVar81._4_4_ = uVar407;
                          auVar81._0_4_ = uVar407;
                          auVar81._8_4_ = uVar407;
                          auVar81._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar364,auVar81);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar363,auVar679);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x1c);
                          auVar82._4_4_ = uVar407;
                          auVar82._0_4_ = uVar407;
                          auVar82._8_4_ = uVar407;
                          auVar82._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar362,auVar82);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x20);
                          auVar83._4_4_ = uVar407;
                          auVar83._0_4_ = uVar407;
                          auVar83._8_4_ = uVar407;
                          auVar83._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar361,auVar83);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar365,auVar703);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x1c);
                          auVar84._4_4_ = uVar407;
                          auVar84._0_4_ = uVar407;
                          auVar84._8_4_ = uVar407;
                          auVar84._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar370,auVar84);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x20);
                          auVar85._4_4_ = uVar407;
                          auVar85._0_4_ = uVar407;
                          auVar85._8_4_ = uVar407;
                          auVar85._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar366,auVar85);
                          *(undefined1 (*) [16])(pauVar307[3] + lVar272 * 2) = auVar367;
                          pauVar333 = pauVar333 + 4;
                          lVar272 = lVar272 + 0x20;
                          pvVar312 = (void *)((long)pvVar312 + 0x20);
                          pvVar344 = (void *)((long)pvVar344 + 0x20);
                          pvVar305 = (void *)((long)pvVar305 + 0x20);
                        }
                        for (; iVar343 + 1 < iVar260; iVar343 = iVar343 + 2) {
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272);
                          auVar631._4_4_ = uVar407;
                          auVar631._0_4_ = uVar407;
                          auVar631._8_4_ = uVar407;
                          auVar631._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 8);
                          auVar657._4_4_ = uVar407;
                          auVar657._0_4_ = uVar407;
                          auVar657._8_4_ = uVar407;
                          auVar657._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 8);
                          auVar680._4_4_ = uVar407;
                          auVar680._0_4_ = uVar407;
                          auVar680._8_4_ = uVar407;
                          auVar680._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 8);
                          auVar704._4_4_ = uVar407;
                          auVar704._0_4_ = uVar407;
                          auVar704._8_4_ = uVar407;
                          auVar704._12_4_ = uVar407;
                          auVar367 = vfmadd213ps_fma(auVar631,auVar360,
                                                     *(undefined1 (*) [16])
                                                      (*pauVar307 + lVar272 * 2));
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 4);
                          auVar58._4_4_ = uVar407;
                          auVar58._0_4_ = uVar407;
                          auVar58._8_4_ = uVar407;
                          auVar58._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar421,auVar58);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar657,auVar364);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272);
                          auVar59._4_4_ = uVar407;
                          auVar59._0_4_ = uVar407;
                          auVar59._8_4_ = uVar407;
                          auVar59._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar363,auVar59);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 4);
                          auVar60._4_4_ = uVar407;
                          auVar60._0_4_ = uVar407;
                          auVar60._8_4_ = uVar407;
                          auVar60._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar362,auVar60);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar680,auVar361);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272);
                          auVar61._4_4_ = uVar407;
                          auVar61._0_4_ = uVar407;
                          auVar61._8_4_ = uVar407;
                          auVar61._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar365,auVar61);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 4);
                          auVar62._4_4_ = uVar407;
                          auVar62._0_4_ = uVar407;
                          auVar62._8_4_ = uVar407;
                          auVar62._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar370,auVar62);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar704,auVar366);
                          *(undefined1 (*) [16])(*pauVar307 + lVar272 * 2) = auVar367;
                          auVar367 = vfmadd213ps_fma(auVar657,auVar360,
                                                     *(undefined1 (*) [16])
                                                      (pauVar307[1] + lVar272 * 2));
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0xc);
                          auVar63._4_4_ = uVar407;
                          auVar63._0_4_ = uVar407;
                          auVar63._8_4_ = uVar407;
                          auVar63._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar421,auVar63);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar272 + 0x10);
                          auVar64._4_4_ = uVar407;
                          auVar64._0_4_ = uVar407;
                          auVar64._8_4_ = uVar407;
                          auVar64._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar364,auVar64);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar363,auVar680);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0xc);
                          auVar65._4_4_ = uVar407;
                          auVar65._0_4_ = uVar407;
                          auVar65._8_4_ = uVar407;
                          auVar65._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar362,auVar65);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar272 + 0x10);
                          auVar66._4_4_ = uVar407;
                          auVar66._0_4_ = uVar407;
                          auVar66._8_4_ = uVar407;
                          auVar66._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar361,auVar66);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar365,auVar704);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0xc);
                          auVar67._4_4_ = uVar407;
                          auVar67._0_4_ = uVar407;
                          auVar67._8_4_ = uVar407;
                          auVar67._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar370,auVar67);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar272 + 0x10);
                          auVar68._4_4_ = uVar407;
                          auVar68._0_4_ = uVar407;
                          auVar68._8_4_ = uVar407;
                          auVar68._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar366,auVar68);
                          *(undefined1 (*) [16])(pauVar307[1] + lVar272 * 2) = auVar367;
                          pauVar333 = pauVar333 + 2;
                          lVar272 = lVar272 + 0x10;
                          pvVar312 = (void *)((long)pvVar312 + 0x10);
                          pvVar344 = (void *)((long)pvVar344 + 0x10);
                          pvVar305 = (void *)((long)pvVar305 + 0x10);
                        }
                        puVar335 = (undefined4 *)((long)pvVar347 + lVar272);
                        puVar293 = (undefined4 *)((long)pvVar345 + lVar272);
                        puVar341 = (undefined4 *)((long)pvVar313 + lVar272);
                        pvVar345 = pvVar344;
                        pauVar307 = pauVar333;
                        for (; iVar343 < iVar260; iVar343 = iVar343 + 1) {
                          uVar407 = *puVar335;
                          auVar632._4_4_ = uVar407;
                          auVar632._0_4_ = uVar407;
                          auVar632._8_4_ = uVar407;
                          auVar632._12_4_ = uVar407;
                          auVar367 = vfmadd213ps_fma(auVar632,auVar360,*pauVar307);
                          uVar407 = puVar335[1];
                          auVar50._4_4_ = uVar407;
                          auVar50._0_4_ = uVar407;
                          auVar50._8_4_ = uVar407;
                          auVar50._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar421,auVar50);
                          uVar407 = puVar335[2];
                          auVar51._4_4_ = uVar407;
                          auVar51._0_4_ = uVar407;
                          auVar51._8_4_ = uVar407;
                          auVar51._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar364,auVar51);
                          uVar407 = *puVar293;
                          auVar52._4_4_ = uVar407;
                          auVar52._0_4_ = uVar407;
                          auVar52._8_4_ = uVar407;
                          auVar52._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar363,auVar52);
                          uVar407 = puVar293[1];
                          auVar53._4_4_ = uVar407;
                          auVar53._0_4_ = uVar407;
                          auVar53._8_4_ = uVar407;
                          auVar53._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar362,auVar53);
                          puVar335 = puVar335 + 2;
                          uVar407 = puVar293[2];
                          auVar54._4_4_ = uVar407;
                          auVar54._0_4_ = uVar407;
                          auVar54._8_4_ = uVar407;
                          auVar54._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar361,auVar54);
                          puVar293 = puVar293 + 2;
                          uVar407 = *puVar341;
                          auVar55._4_4_ = uVar407;
                          auVar55._0_4_ = uVar407;
                          auVar55._8_4_ = uVar407;
                          auVar55._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar365,auVar55);
                          uVar407 = puVar341[1];
                          auVar56._4_4_ = uVar407;
                          auVar56._0_4_ = uVar407;
                          auVar56._8_4_ = uVar407;
                          auVar56._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar370,auVar56);
                          uVar407 = puVar341[2];
                          auVar57._4_4_ = uVar407;
                          auVar57._0_4_ = uVar407;
                          auVar57._8_4_ = uVar407;
                          auVar57._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar366,auVar57);
                          puVar341 = puVar341 + 2;
                          *pauVar307 = auVar367;
                          pauVar307 = pauVar307 + 1;
                          pvVar312 = (void *)((long)pvVar312 + 8);
                          pvVar345 = (void *)((long)pvVar345 + 8);
                          pvVar305 = (void *)((long)pvVar305 + 8);
                        }
                        pvVar347 = pvVar312;
                        pvVar313 = pvVar305;
                      }
                      pauVar270 = pauVar270 + 9;
                    }
                  }
                }
                else {
                  iVar260 = top_blob->w;
                  iVar342 = top_blob->h;
                  iVar261 = top_blob->c;
                  pvVar348 = (this->super_Convolution).bias_data.data;
                  if (iVar342 < 1) {
                    iVar342 = 0;
                  }
                  uVar278 = (ulong)(uint)local_d70.c;
                  if (local_d70.c < 1) {
                    uVar278 = 0;
                  }
                  uVar291 = iVar261 >> 1;
                  if (iVar261 >> 1 < 1) {
                    uVar291 = 0;
                  }
                  for (uVar281 = 0; uVar281 != uVar291; uVar281 = uVar281 + 1) {
                    uVar317 = (long)top_blob->h * (long)top_blob->w;
                    uVar318 = top_blob->elemsize;
                    uVar268 = (uVar318 * uVar317 + 0xf & 0xfffffffffffffff0) / uVar318;
                    if (top_blob->dims == 4) {
                      uVar268 = uVar317;
                    }
                    lVar271 = uVar281 * 2 + 1;
                    if (pvVar348 == (void *)0x0) {
                      auVar360 = ZEXT816(0) << 0x40;
                      uVar408 = 0;
                      uVar418 = 0;
                    }
                    else {
                      auVar360 = *(undefined1 (*) [16])((long)pvVar348 + uVar281 * 0x20);
                      puVar310 = (undefined8 *)((long)pvVar348 + lVar271 * 0x10);
                      uVar408 = *puVar310;
                      uVar418 = puVar310[1];
                    }
                    lVar272 = uVar318 * top_blob->cstep;
                    pauVar327 = (undefined1 (*) [16])(lVar272 * uVar281 * 2 + (long)top_blob->data);
                    puVar310 = (undefined8 *)(lVar272 * lVar271 + (long)top_blob->data);
                    iVar343 = (int)uVar268 * top_blob->d;
                    pauVar270 = pauVar327;
                    iVar328 = iVar343;
                    if (iVar343 < 1) {
                      iVar343 = 0;
                      iVar328 = iVar343;
                    }
                    while (bVar349 = iVar343 != 0, iVar343 = iVar343 + -1, puVar283 = puVar310,
                          bVar349) {
                      *pauVar270 = auVar360;
                      pauVar270 = pauVar270 + 1;
                    }
                    while (bVar349 = iVar328 != 0, iVar328 = iVar328 + -1, bVar349) {
                      *puVar283 = uVar408;
                      puVar283[1] = uVar418;
                      puVar283 = puVar283 + 2;
                    }
                    pvVar345 = (this->weight_data_tm).data;
                    lVar272 = (this->weight_data_tm).elemsize * (this->weight_data_tm).cstep;
                    pauVar307 = (undefined1 (*) [16])(uVar281 * 2 * lVar272 + (long)pvVar345);
                    pauVar270 = (undefined1 (*) [16])(lVar272 * lVar271 + (long)pvVar345);
                    for (uVar318 = 0; uVar318 != uVar278; uVar318 = uVar318 + 1) {
                      pvVar313 = (void *)(local_d70.cstep * uVar318 * local_d70.elemsize +
                                         (long)local_d70.data);
                      pvVar345 = (void *)((long)pvVar313 + (long)local_d70.w * local_d70.elemsize);
                      pvVar347 = (void *)((long)pvVar313 +
                                         (long)local_d70.w * local_d70.elemsize * 2);
                      auVar360 = *pauVar307;
                      auVar421 = pauVar307[1];
                      auVar364 = pauVar307[2];
                      auVar363 = pauVar307[3];
                      auVar362 = pauVar307[4];
                      auVar361 = pauVar307[5];
                      auVar365 = pauVar307[6];
                      auVar370 = pauVar307[7];
                      auVar366 = pauVar307[8];
                      auVar367 = *pauVar270;
                      auVar369 = pauVar270[1];
                      auVar368 = pauVar270[2];
                      auVar371 = pauVar270[3];
                      auVar372 = pauVar270[4];
                      auVar373 = pauVar270[5];
                      auVar374 = pauVar270[6];
                      auVar375 = pauVar270[7];
                      auVar7 = pauVar270[8];
                      pauVar333 = pauVar327;
                      puVar283 = puVar310;
                      for (iVar328 = 0; iVar328 != iVar342; iVar328 = iVar328 + 1) {
                        lVar271 = 0;
                        pauVar308 = pauVar333;
                        puVar309 = puVar283;
                        for (iVar343 = 0; iVar343 + 3 < iVar260; iVar343 = iVar343 + 4) {
                          auVar350 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar271)));
                          auVar351 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar271 + 4)));
                          auVar352 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar271 + 8)));
                          auVar353 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar271)));
                          auVar354 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar271 + 4)));
                          auVar355 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar271 + 8)));
                          auVar356 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar271)));
                          auVar357 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar271 + 4)));
                          auVar358 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar271 + 8)));
                          auVar359 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [16])
                                                 ((long)*pauVar333 + lVar271 * 4),auVar350,auVar360)
                          ;
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar351,auVar421);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar352,auVar364);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar353,auVar363);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar354,auVar362);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar355,auVar361);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar356,auVar365);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar357,auVar370);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar358,auVar366);
                          auVar350 = vfmadd213ps_avx512vl
                                               (auVar350,auVar367,
                                                *(undefined1 (*) [16])((long)puVar283 + lVar271 * 4)
                                               );
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar351,auVar369);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar352,auVar368);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar371,auVar353);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar354,auVar372);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar355,auVar373);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar374,auVar356);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar357,auVar375);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar358,auVar7);
                          *(undefined1 (*) [16])((long)*pauVar333 + lVar271 * 4) = auVar359;
                          *(undefined1 (*) [16])((long)puVar283 + lVar271 * 4) = auVar350;
                          auVar350 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar271 + 0xc)));
                          auVar353 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar271 + 0xc)));
                          auVar356 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar271 + 0xc)));
                          auVar359 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [16])(pauVar333[1] + lVar271 * 4),
                                                auVar351,auVar360);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar352,auVar421);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar350,auVar364);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar354,auVar363);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar355,auVar362);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar353,auVar361);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar357,auVar365);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar358,auVar370);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar356,auVar366);
                          auVar351 = vfmadd213ps_avx512vl
                                               (auVar351,auVar367,
                                                *(undefined1 (*) [16])
                                                 ((long)puVar283 + lVar271 * 4 + 0x10));
                          auVar351 = vfmadd231ps_avx512vl(auVar351,auVar352,auVar369);
                          auVar351 = vfmadd231ps_avx512vl(auVar351,auVar350,auVar368);
                          auVar351 = vfmadd231ps_avx512vl(auVar351,auVar371,auVar354);
                          auVar351 = vfmadd231ps_avx512vl(auVar351,auVar355,auVar372);
                          auVar351 = vfmadd231ps_avx512vl(auVar351,auVar353,auVar373);
                          auVar351 = vfmadd231ps_avx512vl(auVar351,auVar374,auVar357);
                          auVar351 = vfmadd231ps_avx512vl(auVar351,auVar358,auVar375);
                          auVar351 = vfmadd231ps_avx512vl(auVar351,auVar356,auVar7);
                          *(undefined1 (*) [16])(pauVar333[1] + lVar271 * 4) = auVar359;
                          *(undefined1 (*) [16])((long)puVar283 + lVar271 * 4 + 0x10) = auVar351;
                          auVar351 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar271 + 0x10)))
                          ;
                          auVar354 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar271 + 0x10)))
                          ;
                          auVar357 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar271 + 0x10)))
                          ;
                          auVar359 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [16])(pauVar333[2] + lVar271 * 4),
                                                auVar352,auVar360);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar350,auVar421);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar351,auVar364);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar355,auVar363);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar353,auVar362);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar354,auVar361);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar358,auVar365);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar356,auVar370);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar357,auVar366);
                          auVar352 = vfmadd213ps_avx512vl
                                               (auVar352,auVar367,
                                                *(undefined1 (*) [16])
                                                 ((long)puVar283 + lVar271 * 4 + 0x20));
                          auVar352 = vfmadd231ps_avx512vl(auVar352,auVar350,auVar369);
                          auVar352 = vfmadd231ps_avx512vl(auVar352,auVar351,auVar368);
                          auVar352 = vfmadd231ps_avx512vl(auVar352,auVar371,auVar355);
                          auVar352 = vfmadd231ps_avx512vl(auVar352,auVar353,auVar372);
                          auVar352 = vfmadd231ps_avx512vl(auVar352,auVar354,auVar373);
                          auVar352 = vfmadd231ps_avx512vl(auVar352,auVar374,auVar358);
                          auVar352 = vfmadd231ps_avx512vl(auVar352,auVar356,auVar375);
                          auVar352 = vfmadd231ps_avx512vl(auVar352,auVar357,auVar7);
                          *(undefined1 (*) [16])(pauVar333[2] + lVar271 * 4) = auVar359;
                          *(undefined1 (*) [16])((long)puVar283 + lVar271 * 4 + 0x20) = auVar352;
                          auVar352 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar271 + 0x14)))
                          ;
                          auVar355 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar271 + 0x14)))
                          ;
                          auVar358 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar271 + 0x14)))
                          ;
                          auVar359 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [16])(pauVar333[3] + lVar271 * 4),
                                                auVar350,auVar360);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar351,auVar421);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar352,auVar364);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar353,auVar363);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar354,auVar362);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar355,auVar361);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar356,auVar365);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar357,auVar370);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar358,auVar366);
                          auVar350 = vfmadd213ps_avx512vl
                                               (auVar350,auVar367,
                                                *(undefined1 (*) [16])
                                                 ((long)puVar283 + lVar271 * 4 + 0x30));
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar369,auVar351);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar368,auVar352);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar371,auVar353);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar372,auVar354);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar373,auVar355);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar374,auVar356);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar375,auVar357);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar7,auVar358);
                          *(undefined1 (*) [16])(pauVar333[3] + lVar271 * 4) = auVar359;
                          *(undefined1 (*) [16])((long)puVar283 + lVar271 * 4 + 0x30) = auVar350;
                          pauVar308 = pauVar308 + 4;
                          puVar309 = puVar309 + 8;
                          lVar271 = lVar271 + 0x10;
                        }
                        for (; iVar343 + 1 < iVar260; iVar343 = iVar343 + 2) {
                          auVar350 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar271)));
                          auVar351 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar271 + 4)));
                          auVar352 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar271 + 8)));
                          auVar353 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar271)));
                          auVar354 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar271 + 4)));
                          auVar355 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar271 + 8)));
                          auVar356 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar271)));
                          auVar357 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar271 + 4)));
                          auVar358 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar271 + 8)));
                          auVar359 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [16])
                                                 ((long)*pauVar333 + lVar271 * 4),auVar350,auVar360)
                          ;
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar351,auVar421);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar352,auVar364);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar353,auVar363);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar354,auVar362);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar355,auVar361);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar356,auVar365);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar357,auVar370);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar358,auVar366);
                          auVar350 = vfmadd213ps_avx512vl
                                               (auVar350,auVar367,
                                                *(undefined1 (*) [16])((long)puVar283 + lVar271 * 4)
                                               );
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar351,auVar369);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar352,auVar368);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar371,auVar353);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar354,auVar372);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar355,auVar373);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar374,auVar356);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar357,auVar375);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar358,auVar7);
                          *(undefined1 (*) [16])((long)*pauVar333 + lVar271 * 4) = auVar359;
                          *(undefined1 (*) [16])((long)puVar283 + lVar271 * 4) = auVar350;
                          auVar350 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar271 + 0xc)));
                          auVar353 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar271 + 0xc)));
                          auVar356 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar271 + 0xc)));
                          auVar359 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [16])(pauVar333[1] + lVar271 * 4),
                                                auVar351,auVar360);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar352,auVar421);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar350,auVar364);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar354,auVar363);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar355,auVar362);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar353,auVar361);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar357,auVar365);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar358,auVar370);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar356,auVar366);
                          auVar351 = vfmadd213ps_avx512vl
                                               (auVar351,auVar367,
                                                *(undefined1 (*) [16])
                                                 ((long)puVar283 + lVar271 * 4 + 0x10));
                          auVar351 = vfmadd231ps_avx512vl(auVar351,auVar369,auVar352);
                          auVar350 = vfmadd231ps_avx512vl(auVar351,auVar368,auVar350);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar371,auVar354);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar372,auVar355);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar373,auVar353);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar374,auVar357);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar375,auVar358);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar7,auVar356);
                          *(undefined1 (*) [16])(pauVar333[1] + lVar271 * 4) = auVar359;
                          *(undefined1 (*) [16])((long)puVar283 + lVar271 * 4 + 0x10) = auVar350;
                          pauVar308 = pauVar308 + 2;
                          puVar309 = puVar309 + 4;
                          lVar271 = lVar271 + 8;
                        }
                        for (; iVar343 < iVar260; iVar343 = iVar343 + 1) {
                          auVar350 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar271)));
                          auVar351 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar271 + 4)));
                          auVar352 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar313 + lVar271 + 8)));
                          auVar353 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar271)));
                          auVar354 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar271 + 4)));
                          auVar355 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar271 + 8)));
                          auVar356 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar271)));
                          auVar357 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar271 + 4)));
                          auVar358 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar271 + 8)));
                          auVar359 = vfmadd231ps_avx512vl
                                               (*(undefined1 (*) [16])
                                                 ((long)*pauVar333 + lVar271 * 4),auVar350,auVar360)
                          ;
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar351,auVar421);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar352,auVar364);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar353,auVar363);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar354,auVar362);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar355,auVar361);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar356,auVar365);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar357,auVar370);
                          auVar359 = vfmadd231ps_avx512vl(auVar359,auVar358,auVar366);
                          auVar350 = vfmadd213ps_avx512vl
                                               (auVar350,auVar367,
                                                *(undefined1 (*) [16])((long)puVar283 + lVar271 * 4)
                                               );
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar369,auVar351);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar368,auVar352);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar371,auVar353);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar372,auVar354);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar373,auVar355);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar374,auVar356);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar375,auVar357);
                          auVar350 = vfmadd231ps_avx512vl(auVar350,auVar7,auVar358);
                          *(undefined1 (*) [16])((long)*pauVar333 + lVar271 * 4) = auVar359;
                          *(undefined1 (*) [16])((long)puVar283 + lVar271 * 4) = auVar350;
                          pauVar308 = pauVar308 + 1;
                          puVar309 = puVar309 + 2;
                          lVar271 = lVar271 + 4;
                        }
                        pvVar313 = (void *)((long)pvVar313 + lVar271 + 8);
                        pvVar345 = (void *)((long)pvVar345 + lVar271 + 8);
                        pvVar347 = (void *)((long)pvVar347 + lVar271 + 8);
                        pauVar333 = pauVar308;
                        puVar283 = puVar309;
                      }
                      pauVar307 = pauVar307 + 9;
                      pauVar270 = pauVar270 + 9;
                    }
                  }
                  for (uVar281 = (long)iVar261 & 0xfffffffffffffffe; (long)uVar281 < (long)iVar261;
                      uVar281 = uVar281 + 1) {
                    uVar317 = (long)top_blob->h * (long)top_blob->w;
                    uVar318 = top_blob->elemsize;
                    uVar268 = (uVar318 * uVar317 + 0xf & 0xfffffffffffffff0) / uVar318;
                    if (top_blob->dims == 4) {
                      uVar268 = uVar317;
                    }
                    if (pvVar348 == (void *)0x0) {
                      uVar408 = 0;
                      uVar418 = 0;
                    }
                    else {
                      puVar310 = (undefined8 *)((long)pvVar348 + uVar281 * 0x10);
                      uVar408 = *puVar310;
                      uVar418 = puVar310[1];
                    }
                    puVar283 = (undefined8 *)
                               (top_blob->cstep * uVar281 * uVar318 + (long)top_blob->data);
                    iVar328 = (int)uVar268 * top_blob->d;
                    puVar310 = puVar283;
                    if (iVar328 < 1) {
                      iVar328 = 0;
                    }
                    while (bVar349 = iVar328 != 0, iVar328 = iVar328 + -1, bVar349) {
                      *puVar310 = uVar408;
                      puVar310[1] = uVar418;
                      puVar310 = puVar310 + 2;
                    }
                    pauVar270 = (undefined1 (*) [16])
                                ((this->weight_data_tm).cstep * uVar281 *
                                 (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data
                                );
                    for (uVar318 = 0; uVar318 != uVar278; uVar318 = uVar318 + 1) {
                      pvVar313 = (void *)(local_d70.cstep * uVar318 * local_d70.elemsize +
                                         (long)local_d70.data);
                      pvVar345 = (void *)((long)pvVar313 + (long)local_d70.w * local_d70.elemsize);
                      pvVar347 = (void *)((long)pvVar313 +
                                         (long)local_d70.w * local_d70.elemsize * 2);
                      auVar360 = *pauVar270;
                      auVar421 = pauVar270[1];
                      auVar364 = pauVar270[2];
                      auVar363 = pauVar270[3];
                      auVar362 = pauVar270[4];
                      auVar361 = pauVar270[5];
                      auVar365 = pauVar270[6];
                      auVar370 = pauVar270[7];
                      auVar366 = pauVar270[8];
                      puVar310 = puVar283;
                      for (iVar328 = 0; iVar328 != iVar342; iVar328 = iVar328 + 1) {
                        lVar271 = 0;
                        puVar309 = puVar310;
                        for (iVar343 = 0; iVar343 + 3 < iVar260; iVar343 = iVar343 + 4) {
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271);
                          auVar671._4_4_ = uVar407;
                          auVar671._0_4_ = uVar407;
                          auVar671._8_4_ = uVar407;
                          auVar671._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 4);
                          auVar696._4_4_ = uVar407;
                          auVar696._0_4_ = uVar407;
                          auVar696._8_4_ = uVar407;
                          auVar696._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 8);
                          auVar622._4_4_ = uVar407;
                          auVar622._0_4_ = uVar407;
                          auVar622._8_4_ = uVar407;
                          auVar622._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 4);
                          auVar719._4_4_ = uVar407;
                          auVar719._0_4_ = uVar407;
                          auVar719._8_4_ = uVar407;
                          auVar719._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 8);
                          auVar737._4_4_ = uVar407;
                          auVar737._0_4_ = uVar407;
                          auVar737._8_4_ = uVar407;
                          auVar737._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 4);
                          auVar752._4_4_ = uVar407;
                          auVar752._0_4_ = uVar407;
                          auVar752._8_4_ = uVar407;
                          auVar752._12_4_ = uVar407;
                          auVar369 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar271 + 8)));
                          auVar367 = vfmadd213ps_fma(auVar671,auVar360,
                                                     *(undefined1 (*) [16])
                                                      ((long)puVar310 + lVar271 * 4));
                          auVar367 = vfmadd231ps_fma(auVar367,auVar696,auVar421);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar622,auVar364);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271);
                          auVar22._4_4_ = uVar407;
                          auVar22._0_4_ = uVar407;
                          auVar22._8_4_ = uVar407;
                          auVar22._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar363,auVar22);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar719,auVar362);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar737,auVar361);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271);
                          auVar23._4_4_ = uVar407;
                          auVar23._0_4_ = uVar407;
                          auVar23._8_4_ = uVar407;
                          auVar23._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar365,auVar23);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar752,auVar370);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0xc);
                          auVar649._4_4_ = uVar407;
                          auVar649._0_4_ = uVar407;
                          auVar649._8_4_ = uVar407;
                          auVar649._12_4_ = uVar407;
                          auVar368 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar345 + lVar271 + 0xc)));
                          auVar371 = vbroadcastss_avx512vl
                                               (ZEXT416(*(uint *)((long)pvVar347 + lVar271 + 0xc)));
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar369,auVar366);
                          *(undefined1 (*) [16])((long)puVar310 + lVar271 * 4) = auVar367;
                          auVar367 = vfmadd213ps_fma(auVar696,auVar360,
                                                     *(undefined1 (*) [16])
                                                      ((long)puVar310 + lVar271 * 4 + 0x10));
                          auVar367 = vfmadd231ps_fma(auVar367,auVar622,auVar421);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar649,auVar364);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar363,auVar719);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar737,auVar362);
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar368,auVar361);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar365,auVar752);
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar369,auVar370);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x10);
                          auVar672._4_4_ = uVar407;
                          auVar672._0_4_ = uVar407;
                          auVar672._8_4_ = uVar407;
                          auVar672._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x10);
                          auVar720._4_4_ = uVar407;
                          auVar720._0_4_ = uVar407;
                          auVar720._8_4_ = uVar407;
                          auVar720._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar371,auVar366);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x10);
                          auVar753._4_4_ = uVar407;
                          auVar753._0_4_ = uVar407;
                          auVar753._8_4_ = uVar407;
                          auVar753._12_4_ = uVar407;
                          *(undefined1 (*) [16])((long)puVar310 + lVar271 * 4 + 0x10) = auVar367;
                          auVar367 = vfmadd213ps_fma(auVar622,auVar360,
                                                     *(undefined1 (*) [16])
                                                      ((long)puVar310 + lVar271 * 4 + 0x20));
                          auVar367 = vfmadd231ps_fma(auVar367,auVar649,auVar421);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar672,auVar364);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar363,auVar737);
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar368,auVar362);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar720,auVar361);
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar365,auVar369);
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar371,auVar370);
                          auVar369 = vfmadd231ps_fma(auVar367,auVar753,auVar366);
                          auVar367 = vfmadd213ps_fma(auVar649,auVar360,
                                                     *(undefined1 (*) [16])
                                                      ((long)puVar310 + lVar271 * 4 + 0x30));
                          auVar367 = vfmadd231ps_fma(auVar367,auVar421,auVar672);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0x14);
                          auVar24._4_4_ = uVar407;
                          auVar24._0_4_ = uVar407;
                          auVar24._8_4_ = uVar407;
                          auVar24._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar364,auVar24);
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar363,auVar368);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar362,auVar720);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0x14);
                          auVar25._4_4_ = uVar407;
                          auVar25._0_4_ = uVar407;
                          auVar25._8_4_ = uVar407;
                          auVar25._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar361,auVar25);
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar365,auVar371);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar370,auVar753);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0x14);
                          auVar26._4_4_ = uVar407;
                          auVar26._0_4_ = uVar407;
                          auVar26._8_4_ = uVar407;
                          auVar26._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar366,auVar26);
                          *(undefined1 (*) [16])((long)puVar310 + lVar271 * 4 + 0x20) = auVar369;
                          *(undefined1 (*) [16])((long)puVar310 + lVar271 * 4 + 0x30) = auVar367;
                          puVar309 = puVar309 + 8;
                          lVar271 = lVar271 + 0x10;
                        }
                        for (; iVar343 + 1 < iVar260; iVar343 = iVar343 + 2) {
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271);
                          auVar623._4_4_ = uVar407;
                          auVar623._0_4_ = uVar407;
                          auVar623._8_4_ = uVar407;
                          auVar623._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 4);
                          auVar650._4_4_ = uVar407;
                          auVar650._0_4_ = uVar407;
                          auVar650._8_4_ = uVar407;
                          auVar650._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 8);
                          auVar673._4_4_ = uVar407;
                          auVar673._0_4_ = uVar407;
                          auVar673._8_4_ = uVar407;
                          auVar673._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 4);
                          auVar697._4_4_ = uVar407;
                          auVar697._0_4_ = uVar407;
                          auVar697._8_4_ = uVar407;
                          auVar697._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 8);
                          auVar721._4_4_ = uVar407;
                          auVar721._0_4_ = uVar407;
                          auVar721._8_4_ = uVar407;
                          auVar721._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 4);
                          auVar738._4_4_ = uVar407;
                          auVar738._0_4_ = uVar407;
                          auVar738._8_4_ = uVar407;
                          auVar738._12_4_ = uVar407;
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 8);
                          auVar754._4_4_ = uVar407;
                          auVar754._0_4_ = uVar407;
                          auVar754._8_4_ = uVar407;
                          auVar754._12_4_ = uVar407;
                          auVar367 = vfmadd213ps_fma(auVar623,auVar360,
                                                     *(undefined1 (*) [16])
                                                      ((long)puVar310 + lVar271 * 4));
                          auVar367 = vfmadd231ps_fma(auVar367,auVar650,auVar421);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar673,auVar364);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271);
                          auVar35._4_4_ = uVar407;
                          auVar35._0_4_ = uVar407;
                          auVar35._8_4_ = uVar407;
                          auVar35._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar363,auVar35);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar697,auVar362);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar721,auVar361);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271);
                          auVar36._4_4_ = uVar407;
                          auVar36._0_4_ = uVar407;
                          auVar36._8_4_ = uVar407;
                          auVar36._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar365,auVar36);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar738,auVar370);
                          auVar369 = vfmadd231ps_fma(auVar367,auVar754,auVar366);
                          auVar367 = vfmadd213ps_fma(auVar650,auVar360,
                                                     *(undefined1 (*) [16])
                                                      ((long)puVar310 + lVar271 * 4 + 0x10));
                          auVar367 = vfmadd231ps_fma(auVar367,auVar421,auVar673);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 0xc);
                          auVar37._4_4_ = uVar407;
                          auVar37._0_4_ = uVar407;
                          auVar37._8_4_ = uVar407;
                          auVar37._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar364,auVar37);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar363,auVar697);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar362,auVar721);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 0xc);
                          auVar38._4_4_ = uVar407;
                          auVar38._0_4_ = uVar407;
                          auVar38._8_4_ = uVar407;
                          auVar38._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar361,auVar38);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar365,auVar738);
                          auVar367 = vfmadd231ps_fma(auVar367,auVar370,auVar754);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 0xc);
                          auVar39._4_4_ = uVar407;
                          auVar39._0_4_ = uVar407;
                          auVar39._8_4_ = uVar407;
                          auVar39._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar366,auVar39);
                          *(undefined1 (*) [16])((long)puVar310 + lVar271 * 4) = auVar369;
                          *(undefined1 (*) [16])((long)puVar310 + lVar271 * 4 + 0x10) = auVar367;
                          puVar309 = puVar309 + 4;
                          lVar271 = lVar271 + 8;
                        }
                        for (; iVar343 < iVar260; iVar343 = iVar343 + 1) {
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271);
                          auVar624._4_4_ = uVar407;
                          auVar624._0_4_ = uVar407;
                          auVar624._8_4_ = uVar407;
                          auVar624._12_4_ = uVar407;
                          auVar367 = vfmadd213ps_fma(auVar624,auVar360,
                                                     *(undefined1 (*) [16])
                                                      ((long)puVar310 + lVar271 * 4));
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 4);
                          auVar27._4_4_ = uVar407;
                          auVar27._0_4_ = uVar407;
                          auVar27._8_4_ = uVar407;
                          auVar27._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar421,auVar27);
                          uVar407 = *(undefined4 *)((long)pvVar313 + lVar271 + 8);
                          auVar28._4_4_ = uVar407;
                          auVar28._0_4_ = uVar407;
                          auVar28._8_4_ = uVar407;
                          auVar28._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar364,auVar28);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271);
                          auVar29._4_4_ = uVar407;
                          auVar29._0_4_ = uVar407;
                          auVar29._8_4_ = uVar407;
                          auVar29._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar363,auVar29);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 4);
                          auVar30._4_4_ = uVar407;
                          auVar30._0_4_ = uVar407;
                          auVar30._8_4_ = uVar407;
                          auVar30._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar362,auVar30);
                          uVar407 = *(undefined4 *)((long)pvVar345 + lVar271 + 8);
                          auVar31._4_4_ = uVar407;
                          auVar31._0_4_ = uVar407;
                          auVar31._8_4_ = uVar407;
                          auVar31._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar361,auVar31);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271);
                          auVar32._4_4_ = uVar407;
                          auVar32._0_4_ = uVar407;
                          auVar32._8_4_ = uVar407;
                          auVar32._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar365,auVar32);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 4);
                          auVar33._4_4_ = uVar407;
                          auVar33._0_4_ = uVar407;
                          auVar33._8_4_ = uVar407;
                          auVar33._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar370,auVar33);
                          uVar407 = *(undefined4 *)((long)pvVar347 + lVar271 + 8);
                          auVar34._4_4_ = uVar407;
                          auVar34._0_4_ = uVar407;
                          auVar34._8_4_ = uVar407;
                          auVar34._12_4_ = uVar407;
                          auVar367 = vfmadd231ps_avx512vl(auVar367,auVar366,auVar34);
                          *(undefined1 (*) [16])((long)puVar310 + lVar271 * 4) = auVar367;
                          puVar309 = puVar309 + 2;
                          lVar271 = lVar271 + 4;
                        }
                        pvVar313 = (void *)((long)pvVar313 + lVar271 + 8);
                        pvVar345 = (void *)((long)pvVar345 + lVar271 + 8);
                        pvVar347 = (void *)((long)pvVar347 + lVar271 + 8);
                        puVar310 = puVar309;
                      }
                      pauVar270 = pauVar270 + 9;
                    }
                  }
                }
                goto LAB_00184042;
              }
LAB_00182048:
              convolution_packed(&local_d70,top_blob,&this->weight_data_tm,
                                 &(this->super_Convolution).bias_data,uVar291,uVar336,dilation_w,
                                 dilation_h,uVar338,stride_h,
                                 (this->super_Convolution).activation_type,
                                 &(this->super_Convolution).activation_params,opt_00);
            }
            iVar263 = 0;
          }
        }
      }
    }
LAB_0018602d:
    piVar267 = (int *)CONCAT44(local_d70.refcount._4_4_,local_d70.refcount._0_4_);
    if (piVar267 == (int *)0x0) {
      return iVar263;
    }
    LOCK();
    *piVar267 = *piVar267 + -1;
    UNLOCK();
    if (*piVar267 != 0) {
      return iVar263;
    }
    __ptr = (undefined1  [8])local_d70.data;
    if (local_d70.allocator != (Allocator *)0x0) {
      (*(local_d70.allocator)->_vptr_Allocator[3])();
      return iVar263;
    }
    goto LAB_00186065;
  }
  local_c40 = 0;
  local_c80 = (undefined1  [8])0x0;
  afStack_c78[0] = 0.0;
  afStack_c78[1] = 0.0;
  uStack_c70 = 0;
  afStack_c68[0] = 0.0;
  pAStack_c60 = (Allocator *)0x0;
  iStack_c58 = 0;
  fStack_c54 = 0.0;
  fStack_c50 = 0.0;
  iStack_c4c = 0;
  iStack_c48 = 0;
  if ((bottom_blob->elemsize & 0xf) == 0) {
    if ((Mat *)local_c80 == bottom_blob) {
      iStack_c48 = bottom_blob->w;
    }
    else {
      piVar267 = bottom_blob->refcount;
      if (piVar267 != (int *)0x0) {
        LOCK();
        *piVar267 = *piVar267 + 1;
        UNLOCK();
      }
      local_c80 = (undefined1  [8])bottom_blob->data;
      afStack_c78[0] = SUB84(bottom_blob->refcount,0);
      afStack_c78[1] = (float)((ulong)bottom_blob->refcount >> 0x20);
      uStack_c70 = bottom_blob->elemsize;
      afStack_c68[0] = (float)bottom_blob->elempack;
      pAStack_c60 = bottom_blob->allocator;
      iStack_c48 = bottom_blob->w;
      iStack_c4c = bottom_blob->d;
    }
    iStack_c58 = 3;
    fStack_c54 = 1.4013e-45;
    fStack_c50 = 1.4013e-45;
    local_c40 = 1;
LAB_0017c783:
    local_e20 = 0;
    local_e60 = (undefined1  [8])0x0;
    fStack_e58 = 0.0;
    uStack_e54 = 0;
    local_e50 = 0;
    uStack_e4f = 0;
    local_e48 = 0.0;
    local_e40 = (Allocator *)0x0;
    iStack_e38 = 0;
    fStack_e34 = 0.0;
    fStack_e30 = 0.0;
    iStack_e2c = 0;
    iStack_e28 = 0;
    iVar263 = (*(this->super_Convolution).super_Layer._vptr_Layer[7])
                        (this,local_c80,(Mat *)local_e60,opt);
    if (iVar263 == 0) {
      if ((local_e50 & 0xf) == 0) {
        if ((Mat *)local_e60 != top_blob) {
          piVar267 = (int *)CONCAT44(uStack_e54,fStack_e58);
          if (piVar267 != (int *)0x0) {
            LOCK();
            *piVar267 = *piVar267 + 1;
            UNLOCK();
          }
          piVar267 = top_blob->refcount;
          if (piVar267 != (int *)0x0) {
            LOCK();
            *piVar267 = *piVar267 + -1;
            UNLOCK();
            if (*piVar267 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = (void *)local_e60;
          top_blob->refcount = (int *)CONCAT44(uStack_e54,fStack_e58);
          top_blob->elemsize = CONCAT71(uStack_e4f,local_e50);
          top_blob->elempack = (int)local_e48;
          top_blob->allocator = local_e40;
          top_blob->dims = iStack_e38;
          top_blob->w = (int)fStack_e34;
          top_blob->h = (int)fStack_e30;
          top_blob->d = iStack_e2c;
          top_blob->c = iStack_e28;
          top_blob->cstep = local_e20;
        }
        top_blob->dims = 1;
        top_blob->w = iStack_e28;
        top_blob->h = 1;
        top_blob->c = 1;
        local_c40 = (size_t)iStack_e28;
      }
      else {
        Mat::reshape(&local_ec0,(Mat *)local_e60,iStack_e28,opt->blob_allocator);
        piVar267 = (int *)CONCAT44(local_ec0.refcount._4_4_,local_ec0.refcount._0_4_);
        if (&local_ec0 != top_blob) {
          if (piVar267 != (int *)0x0) {
            LOCK();
            *piVar267 = *piVar267 + 1;
            UNLOCK();
          }
          piVar267 = top_blob->refcount;
          if (piVar267 != (int *)0x0) {
            LOCK();
            *piVar267 = *piVar267 + -1;
            UNLOCK();
            if (*piVar267 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          piVar267 = (int *)CONCAT44(local_ec0.refcount._4_4_,local_ec0.refcount._0_4_);
          top_blob->data = local_ec0.data;
          top_blob->refcount = (int *)CONCAT44(local_ec0.refcount._4_4_,local_ec0.refcount._0_4_);
          top_blob->elemsize = local_ec0.elemsize;
          top_blob->elempack = local_ec0.elempack;
          top_blob->allocator = local_ec0.allocator;
          top_blob->dims = local_ec0.dims;
          top_blob->w = local_ec0.w;
          top_blob->h = local_ec0.h;
          top_blob->d = local_ec0.d;
          top_blob->c = local_ec0.c;
          top_blob->cstep = local_ec0.cstep;
        }
        if (piVar267 != (int *)0x0) {
          LOCK();
          *piVar267 = *piVar267 + -1;
          UNLOCK();
          if (*piVar267 == 0) {
            if (local_ec0.allocator == (Allocator *)0x0) {
              free(local_ec0.data);
            }
            else {
              (*(local_ec0.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar263 = -100;
        if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
        goto LAB_0017dab9;
      }
      iVar263 = 0;
    }
LAB_0017dab9:
    piVar267 = (int *)CONCAT44(uStack_e54,fStack_e58);
    if (piVar267 != (int *)0x0) {
      LOCK();
      *piVar267 = *piVar267 + -1;
      UNLOCK();
      if (*piVar267 == 0) {
        if (local_e40 == (Allocator *)0x0) {
          free((void *)local_e60);
        }
        else {
          (*local_e40->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    Mat::reshape((Mat *)local_e60,bottom_blob,1,1,bottom_blob->w,opt->workspace_allocator);
    piVar267 = (int *)CONCAT44(uStack_e54,fStack_e58);
    if (piVar267 != (int *)0x0) {
      LOCK();
      *piVar267 = *piVar267 + 1;
      UNLOCK();
    }
    piVar267 = (int *)CONCAT44(afStack_c78[1],afStack_c78[0]);
    if (piVar267 != (int *)0x0) {
      LOCK();
      *piVar267 = *piVar267 + -1;
      UNLOCK();
      if (*piVar267 == 0) {
        if (pAStack_c60 == (Allocator *)0x0) {
          free((void *)local_c80);
        }
        else {
          (*pAStack_c60->_vptr_Allocator[3])();
        }
      }
    }
    piVar267 = (int *)CONCAT44(uStack_e54,fStack_e58);
    local_c80 = local_e60;
    afStack_c78[0] = fStack_e58;
    afStack_c78[1] = (float)uStack_e54;
    uStack_c70 = CONCAT71(uStack_e4f,local_e50);
    afStack_c68[0] = local_e48;
    pAStack_c60 = local_e40;
    iStack_c58 = iStack_e38;
    fStack_c54 = fStack_e34;
    fStack_c50 = fStack_e30;
    iStack_c4c = iStack_e2c;
    iStack_c48 = iStack_e28;
    local_c40 = local_e20;
    if (piVar267 != (int *)0x0) {
      LOCK();
      *piVar267 = *piVar267 + -1;
      UNLOCK();
      if (*piVar267 == 0) {
        if (local_e40 == (Allocator *)0x0) {
          free((void *)local_e60);
        }
        else {
          (*local_e40->_vptr_Allocator[3])();
        }
      }
    }
    iVar263 = -100;
    if ((local_c80 != (undefined1  [8])0x0) && ((long)iStack_c48 * local_c40 != 0))
    goto LAB_0017c783;
  }
  piVar267 = (int *)CONCAT44(afStack_c78[1],afStack_c78[0]);
  if (piVar267 == (int *)0x0) {
    return iVar263;
  }
  LOCK();
  *piVar267 = *piVar267 + -1;
  UNLOCK();
  if (*piVar267 != 0) {
    return iVar263;
  }
  __ptr = local_c80;
  if (pAStack_c60 != (Allocator *)0x0) {
    (*pAStack_c60->_vptr_Allocator[3])();
    return iVar263;
  }
LAB_00186065:
  free((void *)__ptr);
  return iVar263;
}

Assistant:

int Convolution_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        Mat bottom_blob_3d;
        if (bottom_blob.elemsize % 16 == 0)
        {
            bottom_blob_3d = bottom_blob;
            bottom_blob_3d.dims = 3;
            bottom_blob_3d.w = 1;
            bottom_blob_3d.h = 1;
            bottom_blob_3d.c = bottom_blob.w;
            bottom_blob_3d.cstep = 1;
        }
        else
        {
            bottom_blob_3d = bottom_blob.reshape(1, 1, bottom_blob.w, opt.workspace_allocator);
            if (bottom_blob_3d.empty())
                return -100;
        }

        Mat top_blob_3d;
        int ret = forward(bottom_blob_3d, top_blob_3d, opt);
        if (ret != 0)
            return ret;

        if (top_blob_3d.elemsize % 16 == 0)
        {
            top_blob = top_blob_3d;
            top_blob.dims = 1;
            top_blob.w = top_blob_3d.c;
            top_blob.h = 1;
            top_blob.c = 1;
            bottom_blob_3d.cstep = top_blob_3d.c;
        }
        else
        {
            top_blob = top_blob_3d.reshape(top_blob_3d.c, opt.blob_allocator);
            if (top_blob.empty())
                return -100;
        }

        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        if (outw >= dilation_w && outh >= dilation_h)
        {
            return forwardDilation_x86(bottom_blob_bordered, top_blob, opt);
        }
    }

    const int num_input = channels * elempack;

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
        bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
        bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

        if (prefer_winograd23 && (!opt.use_winograd23_convolution || weight_winograd23_data.empty()))
        {
            // f23 fallback to f43
            prefer_winograd23 = false;
            prefer_winograd43 = true;
        }

        if (prefer_winograd63 && (!opt.use_winograd63_convolution || weight_winograd63_data.empty()))
        {
            // f63 fallback to f43
            prefer_winograd63 = false;
            prefer_winograd43 = true;
        }

        if (prefer_winograd43 && (!opt.use_winograd43_convolution || weight_winograd43_data.empty()))
        {
            // f43 fallback to f63 or f23
            prefer_winograd43 = false;
            if (opt.use_winograd63_convolution && !weight_winograd63_data.empty())
            {
                prefer_winograd63 = true;
            }
            else
            {
                prefer_winograd23 = true;
            }
        }

        int _nT = nT ? nT : opt.num_threads;
        if (nT != 0 && opt.num_threads != nT)
        {
            // force num_threads the same as in create_pipeline
            // so we could use pre-packed A/B from the same tile config
            NCNN_LOGE("opt.num_threads %d changed, convolution winograd will use load-time value %d", opt.num_threads, nT);
        }

        int ret = 0;
        if (prefer_winograd23)
        {
            ret = conv3x3s1_winograd23(bottom_blob_bordered, top_blob, weight_winograd23_data, bias_data, _nT, opt);
        }
        else if (prefer_winograd43)
        {
            ret = conv3x3s1_winograd43(bottom_blob_bordered, top_blob, weight_winograd43_data, bias_data, _nT, opt);
        }
        else if (prefer_winograd63)
        {
            ret = conv3x3s1_winograd63(bottom_blob_bordered, top_blob, weight_winograd63_data, bias_data, _nT, opt);
        }
        else
        {
            // should never reach here
        }
        if (ret != 0)
            return ret;

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        int _nT = nT ? nT : opt.num_threads;
        if (nT != 0 && opt.num_threads != nT)
        {
            // force num_threads the same as in create_pipeline
            // so we could use pre-packed A/B from the same tile config
            NCNN_LOGE("opt.num_threads %d changed, convolution gemm will use load-time value %d", opt.num_threads, nT);
        }

        int ret = convolution_im2col_gemm(bottom_blob_bordered, top_blob, weight_sgemm_data, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, _nT, opt);
        if (ret != 0)
            return ret;

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
        return 0;
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 1)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack16to1_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __AVX512F__

    if (elempack == 8 && out_elempack == 8)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv2x2s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack8to1_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __AVX__

    if (elempack == 1 && out_elempack == 4)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __SSE2__

    convolution_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);

    return 0;
}